

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O2

yyjson_doc *
duckdb_yyjson::yyjson_read_opts
          (char *dat,usize len,yyjson_read_flag flg,yyjson_alc *alc_ptr,yyjson_read_err *err)

{
  ulong *puVar1;
  ushort uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  sbyte sVar67;
  yyjson_alc alc;
  yyjson_val **ppyVar68;
  undefined1 *puVar69;
  bool bVar70;
  short sVar71;
  yyjson_read_code yVar72;
  ulong uVar73;
  yyjson_doc *pyVar74;
  yyjson_doc *pyVar75;
  yyjson_doc *pyVar76;
  _func_void_void_ptr_void_ptr *p_Var77;
  yyjson_doc *pyVar78;
  _func_void_ptr_void_ptr_size_t *p_Var79;
  yyjson_read_err *pyVar80;
  char *pcVar81;
  yyjson_read_err *pyVar82;
  code *pcVar83;
  byte bVar84;
  long lVar85;
  yyjson_doc *pyVar86;
  yyjson_read_err *pyVar87;
  char *pcVar88;
  code cVar89;
  yyjson_doc *pyVar90;
  long lVar91;
  long lVar92;
  yyjson_doc *pyVar93;
  yyjson_doc *pyVar94;
  undefined1 *puVar95;
  yyjson_doc *pyVar96;
  u8 *cur_3;
  ulong uVar97;
  yyjson_doc *pyVar98;
  code cVar99;
  byte bVar100;
  code cVar101;
  int iVar102;
  uint uVar103;
  yyjson_doc *pyVar104;
  ulong uVar105;
  ulong uVar106;
  code *pcVar107;
  _func_void_ptr_void_ptr_size_t *p_Var108;
  yyjson_doc *pyVar109;
  uint uVar110;
  yyjson_val *pyVar111;
  ulong uVar112;
  _func_void_ptr_void_ptr_void_ptr_size_t_size_t *p_Var113;
  _func_void_void_ptr_void_ptr *p_Var114;
  int iVar115;
  uint uVar116;
  long lVar117;
  ulong uVar118;
  u8 *cur;
  size_t sVar119;
  yyjson_doc *pyVar120;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  ulong uStackY_580;
  char local_554;
  yyjson_doc *local_550;
  yyjson_doc *local_548;
  yyjson_doc *local_540;
  yyjson_doc *local_538;
  yyjson_doc *local_530;
  yyjson_doc *local_528;
  yyjson_doc *local_520;
  yyjson_doc *local_518;
  yyjson_doc *local_510;
  yyjson_doc *local_508;
  yyjson_doc *local_500;
  char *msg;
  yyjson_doc *local_4f0;
  undefined1 *local_4e8;
  yyjson_read_err *local_4e0;
  void *local_4d8;
  yyjson_doc *local_4d0;
  i32 exp;
  _func_void_void_ptr_void_ptr *local_4c0;
  yyjson_read_err *local_4b8;
  _func_void_ptr_void_ptr_void_ptr_size_t_size_t *local_4b0;
  ulong local_4a8;
  yyjson_read_err dummy_err;
  yyjson_doc *local_488;
  yyjson_doc *local_478;
  usize local_470;
  undefined1 local_468 [8];
  bigint big_full;
  uint local_238 [2];
  long local_230 [64];
  
  pyVar82 = err;
  if (err == (yyjson_read_err *)0x0) {
    pyVar82 = &dummy_err;
  }
  if (alc_ptr == (yyjson_alc *)0x0) {
    pcVar107 = default_malloc;
    local_4b0 = default_realloc;
    local_4c0 = default_free;
    local_4d8 = (void *)0x0;
  }
  else {
    pcVar107 = alc_ptr->malloc;
    local_4b0 = alc_ptr->realloc;
    local_4c0 = alc_ptr->free;
    local_4d8 = alc_ptr->ctx;
  }
  if (dat == (char *)0x0) {
    pyVar87 = &dummy_err;
    if (err != (yyjson_read_err *)0x0) {
      pyVar87 = err;
    }
    pyVar87->pos = 0;
    pcVar88 = "input data is NULL";
LAB_00f142a9:
    pyVar87->msg = pcVar88;
    pyVar82->code = 1;
    return (yyjson_doc *)0x0;
  }
  if (len == 0) {
    pyVar87 = &dummy_err;
    if (err != (yyjson_read_err *)0x0) {
      pyVar87 = err;
    }
    pyVar87->pos = 0;
    pcVar88 = "input length is 0";
    goto LAB_00f142a9;
  }
  local_4b8 = err;
  local_470 = len;
  if ((flg & 1) == 0) {
    if ((0xfffffffffffffffa < len) ||
       (local_488 = (yyjson_doc *)(*pcVar107)(local_4d8,len + 4), local_488 == (yyjson_doc *)0x0)) {
      pyVar87 = &dummy_err;
      if (err != (yyjson_read_err *)0x0) {
        pyVar87 = err;
      }
      pyVar87->pos = 0;
      pyVar87->msg = "memory allocation failed";
      pyVar82->code = 2;
      return (yyjson_doc *)0x0;
    }
    pyVar120 = (yyjson_doc *)((long)&local_488->root + len);
    local_478 = local_488;
    switchD_00917c1c::default(local_488,dat,len);
    *(undefined4 *)((long)&local_488->root + len) = 0;
    dat = (char *)local_488;
  }
  else {
    pyVar120 = (yyjson_doc *)(dat + len);
    local_488 = (yyjson_doc *)0x0;
    local_478 = (yyjson_doc *)dat;
  }
  cVar101 = *(code *)&((yyjson_doc *)dat)->root;
  bVar84 = char_table[(byte)cVar101];
  pyVar78 = (yyjson_doc *)dat;
  local_518 = (yyjson_doc *)dat;
  local_4d0 = pyVar120;
  if ((bVar84 & 0x21) == 0) {
LAB_00f1260e:
    pyVar120 = local_518;
    if (((byte)cVar101 & 0xdf) == 0x5b) {
      pyVar120 = (yyjson_doc *)((long)&pyVar78->root + 1);
      local_554 = (char)flg;
      local_550 = pyVar78;
      local_4e0 = pyVar82;
      if (((char_table[(byte)*(code *)((long)&pyVar78->root + 1)] & 1) != 0) &&
         ((char_table[(byte)*(code *)((long)&pyVar78->root + 2)] & 1) != 0)) {
        uVar118 = (ulong)((long)local_4d0 - (long)pyVar78) >> 4;
        if (0xffffffffffffff6 < uVar118) {
          uVar118 = 0xffffffffffffff7;
        }
        local_540 = (yyjson_doc *)0x18;
        if ((flg & 2) == 0) {
          local_540 = (yyjson_doc *)(uVar118 + 8);
        }
        sVar119 = (long)local_540 * 0x10;
        pyVar75 = (yyjson_doc *)(*pcVar107)(local_4d8,sVar119);
        if (pyVar75 != (yyjson_doc *)0x0) {
          pyVar74 = pyVar75 + 1;
          pyVar76 = (yyjson_doc *)0x0;
          if ((flg & 0xa0) != 0) {
            pyVar76 = (yyjson_doc *)local_468;
          }
          local_468 = (undefined1  [8])0x0;
          local_550 = (yyjson_doc *)((long)&pyVar78->root + 2);
          local_4e8 = (undefined1 *)((long)pyVar75 + (sVar119 - 0x20));
          if (*(code *)&pyVar78->root != (code)0x7b) {
            pyVar75[1].root = (yyjson_val *)0x6;
            pyVar75[1].alc.malloc = (_func_void_ptr_void_ptr_size_t *)0x0;
            if (*(code *)&pyVar120->root == (code)0xa) {
              pyVar120 = local_550;
            }
            pyVar78 = (yyjson_doc *)0x0;
            local_550 = pyVar120;
            local_548 = pyVar75;
            local_538 = pyVar74;
            pyVar98 = pyVar74;
            pyVar120 = local_518;
            goto LAB_00f129ea;
          }
          pyVar75[1].root = (yyjson_val *)0x7;
          pyVar75[1].alc.malloc = (_func_void_ptr_void_ptr_size_t *)0x0;
          pyVar109 = local_540;
          if (*(code *)&pyVar120->root != (code)0xa) goto LAB_00f13501;
LAB_00f129ac:
          pyVar78 = (yyjson_doc *)0x0;
          local_530 = pyVar74;
LAB_00f191bf:
          pyVar120 = local_530;
LAB_00f191c4:
          for (; sVar71 = *(short *)&local_550->root, pyVar98 = local_550, sVar71 == 0x2020;
              local_550 = (yyjson_doc *)&(local_550->alc).ctx) {
            sVar71 = *(short *)((long)&local_550->root + 2);
            pyVar98 = (yyjson_doc *)((long)&local_550->root + 2);
            if (sVar71 != 0x2020) break;
            sVar71 = *(short *)((long)&local_550->root + 4);
            pyVar98 = (yyjson_doc *)((long)&local_550->root + 4);
            if (sVar71 != 0x2020) break;
            sVar71 = *(short *)((long)&local_550->root + 6);
            pyVar98 = (yyjson_doc *)((long)&local_550->root + 6);
            if (sVar71 != 0x2020) break;
            sVar71 = *(short *)&(local_550->alc).malloc;
            pyVar98 = (yyjson_doc *)&local_550->alc;
            if (sVar71 != 0x2020) break;
            sVar71 = *(short *)((long)&(local_550->alc).malloc + 2);
            pyVar98 = (yyjson_doc *)((long)&(local_550->alc).malloc + 2);
            if (sVar71 != 0x2020) break;
            sVar71 = *(short *)((long)&(local_550->alc).malloc + 4);
            pyVar98 = (yyjson_doc *)((long)&(local_550->alc).malloc + 4);
            if (sVar71 != 0x2020) break;
            sVar71 = *(short *)((long)&(local_550->alc).malloc + 6);
            pyVar98 = (yyjson_doc *)((long)&(local_550->alc).malloc + 6);
            if (sVar71 != 0x2020) break;
            sVar71 = *(short *)&(local_550->alc).realloc;
            pyVar98 = (yyjson_doc *)&(local_550->alc).realloc;
            if (sVar71 != 0x2020) break;
            sVar71 = *(short *)((long)&(local_550->alc).realloc + 2);
            pyVar98 = (yyjson_doc *)((long)&(local_550->alc).realloc + 2);
            if (sVar71 != 0x2020) break;
            sVar71 = *(short *)((long)&(local_550->alc).realloc + 4);
            pyVar98 = (yyjson_doc *)((long)&(local_550->alc).realloc + 4);
            if (sVar71 != 0x2020) break;
            sVar71 = *(short *)((long)&(local_550->alc).realloc + 6);
            pyVar98 = (yyjson_doc *)((long)&(local_550->alc).realloc + 6);
            if (sVar71 != 0x2020) break;
            sVar71 = *(short *)&(local_550->alc).free;
            pyVar98 = (yyjson_doc *)&(local_550->alc).free;
            if (sVar71 != 0x2020) break;
            sVar71 = *(short *)((long)&(local_550->alc).free + 2);
            pyVar98 = (yyjson_doc *)((long)&(local_550->alc).free + 2);
            if (sVar71 != 0x2020) break;
            sVar71 = *(short *)((long)&(local_550->alc).free + 4);
            pyVar98 = (yyjson_doc *)((long)&(local_550->alc).free + 4);
            if (sVar71 != 0x2020) break;
            sVar71 = *(short *)((long)&(local_550->alc).free + 6);
            pyVar98 = (yyjson_doc *)((long)&(local_550->alc).free + 6);
            if (sVar71 != 0x2020) break;
          }
          local_550 = pyVar98;
          bVar84 = (byte)sVar71;
          local_530 = pyVar120;
          if (bVar84 == 0x22) {
            pyVar74 = (yyjson_doc *)&(pyVar74->alc).realloc;
            local_520 = pyVar78;
            local_508 = pyVar109;
            if (local_4e8 <= pyVar74) {
              local_508 = (yyjson_doc *)((long)&pyVar109->root + ((ulong)pyVar109 >> 1));
              sVar119 = (long)local_508 * 0x10;
              local_528 = pyVar76;
              pyVar98 = (yyjson_doc *)(*local_4b0)(local_4d8,pyVar75,(long)pyVar109 << 4,sVar119);
              pyVar78 = local_550;
              if (pyVar98 == (yyjson_doc *)0x0) goto LAB_00f146d8;
              lVar117 = (long)pyVar74 - (long)pyVar75;
              lVar85 = (long)pyVar120 - (long)pyVar75;
              local_4e8 = (undefined1 *)((long)pyVar98 + (sVar119 - 0x20));
              pyVar76 = local_528;
              pyVar75 = pyVar98;
              pyVar74 = (yyjson_doc *)(lVar117 + (long)pyVar98);
              local_530 = (yyjson_doc *)(lVar85 + (long)pyVar98);
            }
            local_540 = pyVar74;
            local_538 = (yyjson_doc *)((long)&local_520->root + 1);
            pyVar120 = (yyjson_doc *)((long)&local_550->root + 1);
            uStackY_580 = 0xd;
            pyVar78 = pyVar120;
            goto LAB_00f19464;
          }
          local_540 = pyVar109;
          local_548 = pyVar75;
          local_538 = pyVar74;
          if (bVar84 != 0x7d) {
            if ((char_table[bVar84] & 1) == 0) {
              pyVar120 = local_518;
              local_528 = pyVar76;
              pyVar75 = local_520;
              if ((flg & 8) == 0) goto LAB_00f19777;
              bVar70 = skip_spaces_and_comments((u8 **)&local_550);
              pyVar109 = local_540;
              pyVar120 = local_530;
              pyVar76 = local_528;
              pyVar75 = local_548;
              pyVar74 = local_538;
              if (!bVar70) {
                sVar71 = *(short *)&local_550->root;
                pyVar98 = local_518;
LAB_00f1c88c:
                pyVar120 = pyVar98;
                pyVar75 = local_520;
                if (sVar71 != 0x2a2f) goto LAB_00f19777;
                goto LAB_00f1ac1f;
              }
            }
            else {
              do {
                local_550 = (yyjson_doc *)((long)&local_550->root + 1);
                local_528 = pyVar76;
              } while ((char_table[(byte)*(code *)&local_550->root] & 1) != 0);
            }
            goto LAB_00f191c4;
          }
          local_550 = (yyjson_doc *)((long)&local_550->root + 1);
          if (pyVar78 == (yyjson_doc *)0x0) {
            pyVar78 = (yyjson_doc *)0x0;
            local_528 = pyVar76;
          }
          else {
            local_528 = pyVar76;
            if ((flg & 4) == 0) goto LAB_00f1b581;
          }
          while( true ) {
            local_508 = pyVar109;
            p_Var77 = (_func_void_void_ptr_void_ptr *)(local_530->alc).malloc;
            (local_530->alc).malloc =
                 (_func_void_ptr_void_ptr_size_t *)((long)local_538 + (0x10 - (long)local_530));
            local_530->root = (yyjson_val *)((long)pyVar78 << 7 | 7);
            pyVar75 = local_548;
            pyVar76 = local_528;
            if (p_Var77 == (_func_void_void_ptr_void_ptr *)0x0) break;
            pyVar98 = (yyjson_doc *)((long)local_530 - (long)p_Var77);
            pyVar111 = pyVar98->root;
            if (*(code *)&local_550->root == (code)0xa) {
              local_550 = (yyjson_doc *)((long)&local_550->root + 1);
            }
            uVar116 = (uint)pyVar111;
            pyVar104 = local_548;
            pyVar78 = local_530;
            pyVar120 = local_518;
            while (local_548 = pyVar75, local_520 = (yyjson_doc *)((ulong)pyVar111 >> 8),
                  local_530 = pyVar98, pyVar75 = local_548, (~uVar116 & 7) != 0) {
LAB_00f18fb0:
              local_530 = pyVar78;
              pyVar75 = local_548;
              while (pyVar78 = local_520, *(short *)&local_550->root != 0xa2c) {
                bVar84 = (byte)*(short *)&local_550->root;
                if (bVar84 == 0x5d) {
                  local_550 = (yyjson_doc *)((long)&local_550->root + 1);
                  goto LAB_00f1905c;
                }
                if (bVar84 == 0x2c) {
                  local_550 = (yyjson_doc *)((long)&local_550->root + 1);
                  goto LAB_00f190ce;
                }
                if ((char_table[bVar84] & 1) == 0) {
                  pyVar75 = local_520;
                  if ((flg & 8) == 0) goto LAB_00f19777;
                  local_530 = pyVar98;
                  bVar70 = skip_spaces_and_comments((u8 **)&local_550);
                  pyVar98 = local_530;
                  pyVar75 = local_548;
                  if (!bVar70) {
                    sVar71 = *(short *)&local_550->root;
                    goto joined_r0x00f1abfd;
                  }
                }
                else {
                  do {
                    local_550 = (yyjson_doc *)((long)&local_550->root + 1);
                  } while ((char_table[(byte)*(code *)&local_550->root] & 1) != 0);
                }
              }
              local_550 = (yyjson_doc *)((long)&local_550->root + 2);
LAB_00f190ce:
              local_540 = local_508;
              local_548 = pyVar75;
LAB_00f129ea:
              for (; uVar116 = (uint)*(ushort *)&local_550->root, pyVar74 = local_550,
                  *(ushort *)&local_550->root == 0x2020;
                  local_550 = (yyjson_doc *)&(local_550->alc).ctx) {
                uVar2 = *(ushort *)((long)&local_550->root + 2);
                uVar116 = (uint)uVar2;
                pyVar74 = (yyjson_doc *)((long)&local_550->root + 2);
                if (uVar2 != 0x2020) break;
                uVar2 = *(ushort *)((long)&local_550->root + 4);
                uVar116 = (uint)uVar2;
                pyVar74 = (yyjson_doc *)((long)&local_550->root + 4);
                if (uVar2 != 0x2020) break;
                uVar2 = *(ushort *)((long)&local_550->root + 6);
                uVar116 = (uint)uVar2;
                pyVar74 = (yyjson_doc *)((long)&local_550->root + 6);
                if (uVar2 != 0x2020) break;
                uVar2 = *(ushort *)&(local_550->alc).malloc;
                uVar116 = (uint)uVar2;
                pyVar74 = (yyjson_doc *)&local_550->alc;
                if (uVar2 != 0x2020) break;
                uVar2 = *(ushort *)((long)&(local_550->alc).malloc + 2);
                uVar116 = (uint)uVar2;
                pyVar74 = (yyjson_doc *)((long)&(local_550->alc).malloc + 2);
                if (uVar2 != 0x2020) break;
                uVar2 = *(ushort *)((long)&(local_550->alc).malloc + 4);
                uVar116 = (uint)uVar2;
                pyVar74 = (yyjson_doc *)((long)&(local_550->alc).malloc + 4);
                if (uVar2 != 0x2020) break;
                uVar2 = *(ushort *)((long)&(local_550->alc).malloc + 6);
                uVar116 = (uint)uVar2;
                pyVar74 = (yyjson_doc *)((long)&(local_550->alc).malloc + 6);
                if (uVar2 != 0x2020) break;
                uVar2 = *(ushort *)&(local_550->alc).realloc;
                uVar116 = (uint)uVar2;
                pyVar74 = (yyjson_doc *)&(local_550->alc).realloc;
                if (uVar2 != 0x2020) break;
                uVar2 = *(ushort *)((long)&(local_550->alc).realloc + 2);
                uVar116 = (uint)uVar2;
                pyVar74 = (yyjson_doc *)((long)&(local_550->alc).realloc + 2);
                if (uVar2 != 0x2020) break;
                uVar2 = *(ushort *)((long)&(local_550->alc).realloc + 4);
                uVar116 = (uint)uVar2;
                pyVar74 = (yyjson_doc *)((long)&(local_550->alc).realloc + 4);
                if (uVar2 != 0x2020) break;
                uVar2 = *(ushort *)((long)&(local_550->alc).realloc + 6);
                uVar116 = (uint)uVar2;
                pyVar74 = (yyjson_doc *)((long)&(local_550->alc).realloc + 6);
                if (uVar2 != 0x2020) break;
                uVar2 = *(ushort *)&(local_550->alc).free;
                uVar116 = (uint)uVar2;
                pyVar74 = (yyjson_doc *)&(local_550->alc).free;
                if (uVar2 != 0x2020) break;
                uVar2 = *(ushort *)((long)&(local_550->alc).free + 2);
                uVar116 = (uint)uVar2;
                pyVar74 = (yyjson_doc *)((long)&(local_550->alc).free + 2);
                if (uVar2 != 0x2020) break;
                uVar2 = *(ushort *)((long)&(local_550->alc).free + 4);
                uVar116 = (uint)uVar2;
                pyVar74 = (yyjson_doc *)((long)&(local_550->alc).free + 4);
                if (uVar2 != 0x2020) break;
                uVar2 = *(ushort *)((long)&(local_550->alc).free + 6);
                uVar116 = (uint)uVar2;
                pyVar74 = (yyjson_doc *)((long)&(local_550->alc).free + 6);
                if (uVar2 != 0x2020) break;
              }
              local_550 = pyVar74;
              bVar84 = (byte)uVar116;
              pyVar74 = local_538;
              if (bVar84 == 0x5b) {
                local_508 = local_540;
LAB_00f1342a:
                local_550 = (yyjson_doc *)((long)&local_550->root + 1);
                pyVar98->root =
                     (yyjson_val *)
                     ((ulong)(byte)*(code *)&pyVar98->root + (long)pyVar78 * 0x100 + 0x100);
                pyVar74 = (yyjson_doc *)&(pyVar74->alc).realloc;
                if (pyVar74 < local_4e8) {
                  local_540 = local_508;
                }
                else {
                  local_540 = (yyjson_doc *)((long)&local_508->root + ((ulong)local_508 >> 1));
                  sVar119 = (long)local_540 * 0x10;
                  local_528 = pyVar76;
                  pyVar109 = (yyjson_doc *)
                             (*local_4b0)(local_4d8,pyVar75,(long)local_508 << 4,sVar119);
                  pyVar78 = local_550;
                  if (pyVar109 == (yyjson_doc *)0x0) goto LAB_00f146d8;
                  pyVar74 = (yyjson_doc *)(((long)pyVar74 - (long)pyVar75) + (long)pyVar109);
                  pyVar98 = (yyjson_doc *)(((long)pyVar98 - (long)pyVar75) + (long)pyVar109);
                  local_4e8 = (undefined1 *)((long)pyVar109 + (sVar119 - 0x20));
                  pyVar120 = local_518;
                  pyVar76 = local_528;
                  pyVar75 = pyVar109;
                }
                pyVar74->root = (yyjson_val *)0x6;
                (pyVar74->alc).malloc =
                     (_func_void_ptr_void_ptr_size_t *)((long)pyVar74 - (long)pyVar98);
                if (*(code *)&local_550->root == (code)0xa) {
                  local_550 = (yyjson_doc *)((long)&local_550->root + 1);
                }
                pyVar78 = (yyjson_doc *)0x0;
                local_548 = pyVar75;
                local_538 = pyVar74;
                pyVar98 = pyVar74;
                goto LAB_00f129ea;
              }
              pyVar109 = local_540;
              if ((uVar116 & 0xff) == 0x7b) goto LAB_00f134a5;
              if ((char_table[bVar84] & 2) != 0) {
                local_538 = (yyjson_doc *)&(local_538->alc).realloc;
                if (local_538 < local_4e8) {
                  local_508 = local_540;
                  local_548 = pyVar75;
                  local_528 = pyVar76;
                  local_520 = pyVar78;
                }
                else {
                  local_508 = (yyjson_doc *)((long)&local_540->root + ((ulong)local_540 >> 1));
                  sVar119 = (long)local_508 * 0x10;
                  local_528 = pyVar76;
                  local_520 = pyVar78;
                  pyVar76 = (yyjson_doc *)
                            (*local_4b0)(local_4d8,pyVar75,(long)local_540 << 4,sVar119);
                  pyVar78 = local_550;
                  pyVar75 = local_548;
                  if (pyVar76 == (yyjson_doc *)0x0) goto LAB_00f146d8;
                  local_538 = (yyjson_doc *)(((long)local_538 - (long)local_548) + (long)pyVar76);
                  pyVar98 = (yyjson_doc *)(((long)pyVar98 - (long)local_548) + (long)pyVar76);
                  local_4e8 = (undefined1 *)((long)pyVar76 + (sVar119 - 0x20));
                  pyVar120 = local_518;
                  local_548 = pyVar76;
                }
                pyVar76 = local_528;
                pyVar104 = local_550;
                exp = 0;
                local_520 = (yyjson_doc *)((long)&local_520->root + 1);
                local_530 = pyVar98;
                if (-1 < local_554 && (flg & 0xa0) != 0) {
                  bVar70 = read_number_raw((u8 **)&local_550,(u8 **)local_528,flg,
                                           (yyjson_val *)local_538,&msg);
                  pyVar98 = local_530;
                  pyVar75 = local_548;
                  pyVar78 = local_530;
                  if (bVar70) goto LAB_00f18fb0;
                  goto LAB_00f1c788;
                }
                cVar101 = *(code *)&local_550->root;
                local_500 = (yyjson_doc *)CONCAT71(local_500._1_7_,cVar101);
                uVar118 = (ulong)(cVar101 == (code)0x2d);
                pyVar109 = (yyjson_doc *)((long)&local_550->root + uVar118);
                cVar99 = *(code *)((long)&local_550->root + uVar118);
                uVar73 = (ulong)(byte)cVar99;
                pyVar75 = local_548;
                pyVar78 = pyVar98;
                if ((digi_table[uVar73] & 2) != 0) {
                  p_Var108 = (_func_void_ptr_void_ptr_size_t *)(uVar73 - 0x30);
                  cVar99 = *(code *)((long)&pyVar109->root + 1);
                  uVar118 = (ulong)(byte)cVar99 - 0x30;
                  pyVar74 = pyVar109;
                  if (9 < uVar118) {
                    pyVar94 = (yyjson_doc *)((long)&pyVar109->root + 1);
                    if ((digi_table[(byte)cVar99] & 0x30) != 0) {
                      p_Var77 = (_func_void_void_ptr_void_ptr *)0x0;
                      local_510 = (yyjson_doc *)0x0;
                      pyVar120 = local_518;
                      local_540 = pyVar94;
                      local_4f0 = pyVar94;
                      if (cVar99 != (code)0x2e) goto LAB_00f14440;
                      goto LAB_00f17eef;
                    }
                    local_538->root = (yyjson_val *)((ulong)(cVar101 == (code)0x2d) * 8 + 4);
                    if (cVar101 == (code)0x2d) {
                      p_Var108 = (_func_void_ptr_void_ptr_size_t *)(0x30 - uVar73);
                    }
                    (local_538->alc).malloc = p_Var108;
                    pyVar120 = local_518;
                    local_550 = pyVar94;
                    goto LAB_00f18fb0;
                  }
                  p_Var108 = (_func_void_ptr_void_ptr_size_t *)(uVar118 + (long)p_Var108 * 10);
                  cVar99 = *(code *)((long)&pyVar109->root + 2);
                  uVar118 = (ulong)(byte)cVar99 - 0x30;
                  if (uVar118 < 10) {
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)(uVar118 + (long)p_Var108 * 10);
                    cVar99 = *(code *)((long)&pyVar109->root + 3);
                    uVar118 = (ulong)(byte)cVar99 - 0x30;
                    if (9 < uVar118) {
                      pyVar94 = (yyjson_doc *)((long)&pyVar109->root + 3);
                      if ((digi_table[(byte)cVar99] & 0x30) != 0) {
                        p_Var77 = (_func_void_void_ptr_void_ptr *)0x0;
                        local_510 = (yyjson_doc *)0x0;
                        pyVar120 = local_518;
                        local_540 = pyVar94;
                        local_4f0 = pyVar94;
                        if (cVar99 == (code)0x2e) goto LAB_00f17f4b;
                        goto LAB_00f14440;
                      }
LAB_00f1571f:
                      local_538->root = (yyjson_val *)((ulong)(cVar101 == (code)0x2d) * 8 + 4);
                      p_Var79 = (_func_void_ptr_void_ptr_size_t *)-(long)p_Var108;
                      if (cVar101 != (code)0x2d) {
                        p_Var79 = p_Var108;
                      }
                      (local_538->alc).malloc = p_Var79;
                      pyVar120 = local_518;
                      local_550 = pyVar94;
                      goto LAB_00f18fb0;
                    }
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)(uVar118 + (long)p_Var108 * 10);
                    cVar99 = *(code *)((long)&pyVar109->root + 4);
                    uVar118 = (ulong)(byte)cVar99 - 0x30;
                    if (uVar118 < 10) {
                      p_Var108 = (_func_void_ptr_void_ptr_size_t *)(uVar118 + (long)p_Var108 * 10);
                      cVar99 = *(code *)((long)&pyVar109->root + 5);
                      uVar118 = (ulong)(byte)cVar99 - 0x30;
                      if (9 < uVar118) {
                        pyVar94 = (yyjson_doc *)((long)&pyVar109->root + 5);
                        if ((digi_table[(byte)cVar99] & 0x30) == 0) goto LAB_00f1571f;
                        p_Var77 = (_func_void_void_ptr_void_ptr *)0x0;
                        local_510 = (yyjson_doc *)0x0;
                        pyVar120 = local_518;
                        local_540 = pyVar94;
                        local_4f0 = pyVar94;
                        if (cVar99 == (code)0x2e) goto LAB_00f17fa7;
                        goto LAB_00f14440;
                      }
                      p_Var108 = (_func_void_ptr_void_ptr_size_t *)(uVar118 + (long)p_Var108 * 10);
                      cVar99 = *(code *)((long)&pyVar109->root + 6);
                      uVar118 = (ulong)(byte)cVar99 - 0x30;
                      if (uVar118 < 10) {
                        p_Var108 = (_func_void_ptr_void_ptr_size_t *)(uVar118 + (long)p_Var108 * 10)
                        ;
                        cVar99 = *(code *)((long)&pyVar109->root + 7);
                        uVar118 = (ulong)(byte)cVar99 - 0x30;
                        if (9 < uVar118) {
                          pyVar94 = (yyjson_doc *)((long)&pyVar109->root + 7);
                          if ((digi_table[(byte)cVar99] & 0x30) == 0) goto LAB_00f1571f;
                          p_Var77 = (_func_void_void_ptr_void_ptr *)0x0;
                          local_510 = (yyjson_doc *)0x0;
                          pyVar120 = local_518;
                          local_540 = pyVar94;
                          local_4f0 = pyVar94;
                          if (cVar99 == (code)0x2e) goto LAB_00f18003;
                          goto LAB_00f14440;
                        }
                        p_Var108 = (_func_void_ptr_void_ptr_size_t *)(uVar118 + (long)p_Var108 * 10)
                        ;
                        cVar99 = *(code *)&(pyVar109->alc).malloc;
                        uVar118 = (ulong)(byte)cVar99 - 0x30;
                        if (uVar118 < 10) {
                          p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                                     (uVar118 + (long)p_Var108 * 10);
                          cVar99 = *(code *)((long)&(pyVar109->alc).malloc + 1);
                          uVar118 = (ulong)(byte)cVar99 - 0x30;
                          if (9 < uVar118) {
                            pyVar94 = (yyjson_doc *)((long)&(pyVar109->alc).malloc + 1);
                            if ((digi_table[(byte)cVar99] & 0x30) == 0) goto LAB_00f1571f;
                            p_Var77 = (_func_void_void_ptr_void_ptr *)0x0;
                            local_510 = (yyjson_doc *)0x0;
                            pyVar120 = local_518;
                            local_540 = pyVar94;
                            local_4f0 = pyVar94;
                            if (cVar99 == (code)0x2e) goto LAB_00f1805f;
                            goto LAB_00f14440;
                          }
                          p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                                     (uVar118 + (long)p_Var108 * 10);
                          cVar99 = *(code *)((long)&(pyVar109->alc).malloc + 2);
                          uVar118 = (ulong)(byte)cVar99 - 0x30;
                          if (uVar118 < 10) {
                            p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                                       (uVar118 + (long)p_Var108 * 10);
                            cVar99 = *(code *)((long)&(pyVar109->alc).malloc + 3);
                            uVar118 = (ulong)(byte)cVar99 - 0x30;
                            if (9 < uVar118) {
                              pyVar94 = (yyjson_doc *)((long)&(pyVar109->alc).malloc + 3);
                              if ((digi_table[(byte)cVar99] & 0x30) == 0) goto LAB_00f1571f;
                              p_Var77 = (_func_void_void_ptr_void_ptr *)0x0;
                              local_510 = (yyjson_doc *)0x0;
                              pyVar120 = local_518;
                              local_540 = pyVar94;
                              local_4f0 = pyVar94;
                              if (cVar99 == (code)0x2e) goto LAB_00f180bb;
                              goto LAB_00f14440;
                            }
                            p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                                       (uVar118 + (long)p_Var108 * 10);
                            cVar99 = *(code *)((long)&(pyVar109->alc).malloc + 4);
                            uVar118 = (ulong)(byte)cVar99 - 0x30;
                            if (uVar118 < 10) {
                              p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                                         (uVar118 + (long)p_Var108 * 10);
                              cVar99 = *(code *)((long)&(pyVar109->alc).malloc + 5);
                              uVar118 = (ulong)(byte)cVar99 - 0x30;
                              if (9 < uVar118) {
                                pyVar94 = (yyjson_doc *)((long)&(pyVar109->alc).malloc + 5);
                                if ((digi_table[(byte)cVar99] & 0x30) == 0) goto LAB_00f1571f;
                                p_Var77 = (_func_void_void_ptr_void_ptr *)0x0;
                                local_510 = (yyjson_doc *)0x0;
                                pyVar120 = local_518;
                                local_540 = pyVar94;
                                local_4f0 = pyVar94;
                                if (cVar99 == (code)0x2e) goto LAB_00f18117;
                                goto LAB_00f14440;
                              }
                              p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                                         (uVar118 + (long)p_Var108 * 10);
                              cVar99 = *(code *)((long)&(pyVar109->alc).malloc + 6);
                              uVar118 = (ulong)(byte)cVar99 - 0x30;
                              if (uVar118 < 10) {
                                p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                                           (uVar118 + (long)p_Var108 * 10);
                                cVar99 = *(code *)((long)&(pyVar109->alc).malloc + 7);
                                uVar118 = (ulong)(byte)cVar99 - 0x30;
                                if (9 < uVar118) {
                                  pyVar94 = (yyjson_doc *)((long)&(pyVar109->alc).malloc + 7);
                                  if ((digi_table[(byte)cVar99] & 0x30) == 0) goto LAB_00f1571f;
                                  p_Var77 = (_func_void_void_ptr_void_ptr *)0x0;
                                  local_510 = (yyjson_doc *)0x0;
                                  pyVar120 = local_518;
                                  local_540 = pyVar94;
                                  local_4f0 = pyVar94;
                                  if (cVar99 == (code)0x2e) goto LAB_00f18173;
                                  goto LAB_00f14440;
                                }
                                p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                                           (uVar118 + (long)p_Var108 * 10);
                                bVar84 = *(byte *)&(pyVar109->alc).realloc;
                                uVar118 = (ulong)bVar84 - 0x30;
                                if (uVar118 < 10) {
                                  p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                                             (uVar118 + (long)p_Var108 * 10);
                                  bVar84 = *(undefined1 *)((long)&(pyVar109->alc).realloc + 1);
                                  uVar118 = (ulong)bVar84 - 0x30;
                                  if (9 < uVar118) {
                                    pyVar94 = (yyjson_doc *)((long)&(pyVar109->alc).realloc + 1);
                                    if ((digi_table[bVar84] & 0x30) == 0) goto LAB_00f1571f;
                                    p_Var77 = (_func_void_void_ptr_void_ptr *)0x0;
                                    local_510 = (yyjson_doc *)0x0;
                                    pyVar120 = local_518;
                                    local_540 = pyVar94;
                                    local_4f0 = pyVar94;
                                    if (bVar84 == 0x2e) goto LAB_00f181cf;
                                    goto LAB_00f14440;
                                  }
                                  p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                                             (uVar118 + (long)p_Var108 * 10);
                                  bVar84 = *(undefined1 *)((long)&(pyVar109->alc).realloc + 2);
                                  uVar118 = (ulong)bVar84 - 0x30;
                                  if (uVar118 < 10) {
                                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                                               (uVar118 + (long)p_Var108 * 10);
                                    local_540 = (yyjson_doc *)((long)&(pyVar109->alc).realloc + 3);
                                    bVar100 = *(undefined1 *)((long)&(pyVar109->alc).realloc + 3);
                                    bVar84 = digi_table[bVar100];
                                    if ((bVar84 & 0x33) == 0) {
                                      if ((cVar101 == (code)0x2d) &&
                                         ((_func_void_ptr_void_ptr_size_t *)0x8000000000000000 <
                                          p_Var108)) {
                                        if (local_554 < '\0') {
                                          if (local_528->root != (yyjson_val *)0x0) {
                                            *(code *)&local_528->root->tag = (code)0x0;
                                          }
                                          local_538->root =
                                               (yyjson_val *)
                                               (((long)local_540 - (long)local_550) * 0x100 + 1);
                                          (local_538->alc).malloc =
                                               (_func_void_ptr_void_ptr_size_t *)local_550;
                                          local_528->root = (yyjson_val *)local_540;
                                          pyVar120 = local_518;
                                          local_550 = local_540;
                                        }
                                        else {
                                          auVar123._8_4_ = (int)((ulong)p_Var108 >> 0x20);
                                          auVar123._0_8_ = p_Var108;
                                          auVar123._12_4_ = 0x45300000;
                                          local_538->root = (yyjson_val *)0x14;
                                          (local_538->alc).malloc =
                                               (_func_void_ptr_void_ptr_size_t *)
                                               -((auVar123._8_8_ - 1.9342813113834067e+25) +
                                                ((double)CONCAT44(0x43300000,(int)p_Var108) -
                                                4503599627370496.0));
                                          local_550 = local_540;
                                        }
                                      }
                                      else {
                                        local_538->root =
                                             (yyjson_val *)((ulong)(cVar101 == (code)0x2d) * 8 + 4);
                                        p_Var79 = (_func_void_ptr_void_ptr_size_t *)-(long)p_Var108;
                                        if (cVar101 != (code)0x2d) {
                                          p_Var79 = p_Var108;
                                        }
                                        (local_538->alc).malloc = p_Var79;
                                        local_550 = local_540;
                                      }
                                      goto LAB_00f18fb0;
                                    }
                                    if (((bVar84 & 3) != 0) &&
                                       ((digi_table
                                         [(byte)*(undefined1 *)((long)&(pyVar109->alc).realloc + 4)]
                                        & 0x33) == 0)) {
                                      puVar95 = (undefined1 *)((long)&(pyVar109->alc).realloc + 4);
                                      uVar118 = (ulong)bVar100 - 0x30;
                                      if ((p_Var108 <
                                           (_func_void_ptr_void_ptr_size_t *)0x1999999999999999) ||
                                         ((p_Var108 ==
                                           (_func_void_ptr_void_ptr_size_t *)0x1999999999999999 &&
                                          (uVar118 < 6)))) {
                                        p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                                                   (uVar118 + (long)p_Var108 * 10);
                                        if (cVar101 == (code)0x2d) {
                                          if (local_554 < '\0') {
                                            if (local_528->root != (yyjson_val *)0x0) {
                                              *(code *)&local_528->root->tag = (code)0x0;
                                            }
                                            local_538->root =
                                                 (yyjson_val *)
                                                 (((long)puVar95 - (long)local_550) * 0x100 + 1);
                                            (local_538->alc).malloc =
                                                 (_func_void_ptr_void_ptr_size_t *)local_550;
                                            local_528->root = (yyjson_val *)puVar95;
                                            pyVar120 = local_518;
                                            local_550 = (yyjson_doc *)puVar95;
                                          }
                                          else {
                                            auVar124._8_4_ = (int)((ulong)p_Var108 >> 0x20);
                                            auVar124._0_8_ = p_Var108;
                                            auVar124._12_4_ = 0x45300000;
                                            local_538->root = (yyjson_val *)0x14;
                                            (local_538->alc).malloc =
                                                 (_func_void_ptr_void_ptr_size_t *)
                                                 -((auVar124._8_8_ - 1.9342813113834067e+25) +
                                                  ((double)CONCAT44(0x43300000,(int)p_Var108) -
                                                  4503599627370496.0));
                                            local_550 = (yyjson_doc *)puVar95;
                                          }
                                        }
                                        else {
                                          local_538->root = (yyjson_val *)0x4;
                                          (local_538->alc).malloc = p_Var108;
                                          local_550 = (yyjson_doc *)puVar95;
                                        }
                                        goto LAB_00f18fb0;
                                      }
                                    }
                                    p_Var77 = (_func_void_void_ptr_void_ptr *)0x0;
                                    if ((bVar84 & 0x20) != 0) {
                                      local_4f0 = (yyjson_doc *)0x0;
                                      local_510 = (yyjson_doc *)0x0;
                                      pyVar94 = local_540;
                                      goto LAB_00f14440;
                                    }
                                    pyVar74 = local_540;
                                    pyVar94 = (yyjson_doc *)0x0;
                                    if (bVar100 != 0x2e) goto LAB_00f141f7;
                                    bVar100 = *(undefined1 *)((long)&(pyVar109->alc).realloc + 4);
                                    pyVar74 = (yyjson_doc *)((long)&(pyVar109->alc).realloc + 4);
                                    pyVar94 = local_540;
                                    if ((digi_table[bVar100] & 3) != 0) goto LAB_00f141f7;
                                    msg = "no digit after decimal point";
                                    local_550 = pyVar74;
                                    goto LAB_00f1c788;
                                  }
                                  pyVar94 = (yyjson_doc *)((long)&(pyVar109->alc).realloc + 2);
                                  if ((digi_table[bVar84] & 0x30) != 0) {
                                    p_Var77 = (_func_void_void_ptr_void_ptr *)0x0;
                                    local_510 = (yyjson_doc *)0x0;
                                    pyVar120 = local_518;
                                    local_540 = pyVar94;
                                    local_4f0 = pyVar94;
                                    if (bVar84 == 0x2e) goto LAB_00f181fd;
                                    goto LAB_00f14440;
                                  }
                                }
                                else {
                                  pyVar94 = (yyjson_doc *)&(pyVar109->alc).realloc;
                                  if ((digi_table[bVar84] & 0x30) != 0) {
                                    p_Var77 = (_func_void_void_ptr_void_ptr *)0x0;
                                    local_510 = (yyjson_doc *)0x0;
                                    pyVar120 = local_518;
                                    local_540 = pyVar94;
                                    local_4f0 = pyVar94;
                                    if (bVar84 == 0x2e) goto LAB_00f181a1;
                                    goto LAB_00f14440;
                                  }
                                }
                              }
                              else {
                                pyVar94 = (yyjson_doc *)((long)&(pyVar109->alc).malloc + 6);
                                if ((digi_table[(byte)cVar99] & 0x30) != 0) {
                                  p_Var77 = (_func_void_void_ptr_void_ptr *)0x0;
                                  local_510 = (yyjson_doc *)0x0;
                                  pyVar120 = local_518;
                                  local_540 = pyVar94;
                                  local_4f0 = pyVar94;
                                  if (cVar99 == (code)0x2e) goto LAB_00f18145;
                                  goto LAB_00f14440;
                                }
                              }
                            }
                            else {
                              pyVar94 = (yyjson_doc *)((long)&(pyVar109->alc).malloc + 4);
                              if ((digi_table[(byte)cVar99] & 0x30) != 0) {
                                p_Var77 = (_func_void_void_ptr_void_ptr *)0x0;
                                local_510 = (yyjson_doc *)0x0;
                                pyVar120 = local_518;
                                local_540 = pyVar94;
                                local_4f0 = pyVar94;
                                if (cVar99 == (code)0x2e) goto LAB_00f180e9;
                                goto LAB_00f14440;
                              }
                            }
                          }
                          else {
                            pyVar94 = (yyjson_doc *)((long)&(pyVar109->alc).malloc + 2);
                            if ((digi_table[(byte)cVar99] & 0x30) != 0) {
                              p_Var77 = (_func_void_void_ptr_void_ptr *)0x0;
                              local_510 = (yyjson_doc *)0x0;
                              pyVar120 = local_518;
                              local_540 = pyVar94;
                              local_4f0 = pyVar94;
                              if (cVar99 == (code)0x2e) goto LAB_00f1808d;
                              goto LAB_00f14440;
                            }
                          }
                        }
                        else {
                          pyVar94 = (yyjson_doc *)&pyVar109->alc;
                          if ((digi_table[(byte)cVar99] & 0x30) != 0) {
                            p_Var77 = (_func_void_void_ptr_void_ptr *)0x0;
                            local_510 = (yyjson_doc *)0x0;
                            pyVar120 = local_518;
                            local_540 = pyVar94;
                            local_4f0 = pyVar94;
                            if (cVar99 == (code)0x2e) goto LAB_00f18031;
                            goto LAB_00f14440;
                          }
                        }
                      }
                      else {
                        pyVar94 = (yyjson_doc *)((long)&pyVar109->root + 6);
                        if ((digi_table[(byte)cVar99] & 0x30) != 0) {
                          p_Var77 = (_func_void_void_ptr_void_ptr *)0x0;
                          local_510 = (yyjson_doc *)0x0;
                          pyVar120 = local_518;
                          local_540 = pyVar94;
                          local_4f0 = pyVar94;
                          if (cVar99 == (code)0x2e) goto LAB_00f17fd5;
                          goto LAB_00f14440;
                        }
                      }
                    }
                    else {
                      pyVar94 = (yyjson_doc *)((long)&pyVar109->root + 4);
                      if ((digi_table[(byte)cVar99] & 0x30) != 0) {
                        p_Var77 = (_func_void_void_ptr_void_ptr *)0x0;
                        local_510 = (yyjson_doc *)0x0;
                        pyVar120 = local_518;
                        local_540 = pyVar94;
                        local_4f0 = pyVar94;
                        if (cVar99 == (code)0x2e) goto LAB_00f17f79;
                        goto LAB_00f14440;
                      }
                    }
                  }
                  else {
                    pyVar94 = (yyjson_doc *)((long)&pyVar109->root + 2);
                    if ((digi_table[(byte)cVar99] & 0x30) != 0) {
                      p_Var77 = (_func_void_void_ptr_void_ptr *)0x0;
                      local_510 = (yyjson_doc *)0x0;
                      pyVar120 = local_518;
                      local_540 = pyVar94;
                      local_4f0 = pyVar94;
                      if (cVar99 == (code)0x2e) goto LAB_00f17f1d;
                      goto LAB_00f14440;
                    }
                  }
                  local_538->root = (yyjson_val *)((ulong)(cVar101 == (code)0x2d) * 8 + 4);
                  p_Var79 = (_func_void_ptr_void_ptr_size_t *)-(long)p_Var108;
                  if (cVar101 != (code)0x2d) {
                    p_Var79 = p_Var108;
                  }
LAB_00f1579d:
                  (local_538->alc).malloc = p_Var79;
                  pyVar120 = local_518;
                  local_550 = pyVar94;
                  goto LAB_00f18fb0;
                }
                if (cVar99 != (code)0x30) {
                  if ((flg & 0x10) == 0) goto LAB_00f17e71;
                  p_Var79 = (_func_void_ptr_void_ptr_size_t *)
                            ((long)pyVar109 - (ulong)(cVar101 == (code)0x2d));
                  if (uVar73 == 0x49) {
LAB_00f18a8b:
                    if ((((byte)*(code *)((long)&pyVar109->root + 1) | 0x20) == 0x6e) &&
                       (((byte)*(code *)((long)&pyVar109->root + 2) | 0x20) == 0x66)) {
                      pyVar94 = (yyjson_doc *)((long)&pyVar109->root + 3);
                      if ((((byte)*(code *)((long)&pyVar109->root + 3) | 0x20) == 0x69) &&
                         ((((((byte)*(code *)((long)&pyVar109->root + 4) | 0x20) == 0x6e &&
                            (((byte)*(code *)((long)&pyVar109->root + 5) | 0x20) == 0x69)) &&
                           (((byte)*(code *)((long)&pyVar109->root + 6) | 0x20) == 0x74)) &&
                          (((byte)*(code *)((long)&pyVar109->root + 7) | 0x20) == 0x79)))) {
                        pyVar94 = (yyjson_doc *)&pyVar109->alc;
                      }
                      if ((flg & 0xa0) == 0) {
                        local_538->root = (yyjson_val *)0x14;
                        p_Var79 = (_func_void_ptr_void_ptr_size_t *)
                                  (((ulong)(cVar101 != (code)0x2d) << 0x3f) + -0x10000000000000);
                      }
                      else {
                        if (local_528->root != (yyjson_val *)0x0) {
                          *(code *)&local_528->root->tag = (code)0x0;
                        }
                        local_528->root = (yyjson_val *)pyVar94;
                        local_538->root =
                             (yyjson_val *)(((long)pyVar94 - (long)p_Var79) * 0x100 + 1);
                      }
                      goto LAB_00f1579d;
                    }
                    if (((byte)cVar99 | 0x20) != 0x6e) goto LAB_00f17e71;
                  }
                  else if ((cVar99 != (code)0x4e) && (cVar99 != (code)0x6e)) {
                    if (cVar99 == (code)0x69) goto LAB_00f18a8b;
                    goto LAB_00f17e71;
                  }
                  if ((((byte)*(code *)((long)&pyVar109->root + 1) | 0x20) != 0x61) ||
                     (((byte)*(code *)((long)&pyVar109->root + 2) | 0x20) != 0x6e))
                  goto LAB_00f17e71;
                  local_550 = (yyjson_doc *)((long)&pyVar109->root + 3);
                  if ((flg & 0xa0) == 0) {
                    local_538->root = (yyjson_val *)0x14;
                    p_Var79 = (_func_void_ptr_void_ptr_size_t *)
                              (((ulong)(cVar101 != (code)0x2d) << 0x3f) + -0x8000000000000);
                  }
                  else {
                    if (local_528->root != (yyjson_val *)0x0) {
                      *(code *)&local_528->root->tag = (code)0x0;
                    }
                    local_528->root = (yyjson_val *)local_550;
                    local_538->root = (yyjson_val *)((ulong)(cVar101 == (code)0x2d) * 0x100 + 0x301)
                    ;
                  }
                  (local_538->alc).malloc = p_Var79;
                  pyVar120 = local_518;
                  goto LAB_00f18fb0;
                }
                pyVar94 = (yyjson_doc *)((long)&pyVar109->root + 1);
                cVar99 = *(code *)((long)&pyVar109->root + 1);
                bVar84 = digi_table[(byte)cVar99];
                if ((bVar84 & 0x33) == 0) {
                  local_538->root = (yyjson_val *)((ulong)(cVar101 == (code)0x2d) * 8 + 4);
                  (local_538->alc).malloc = (_func_void_ptr_void_ptr_size_t *)0x0;
                  pyVar120 = local_518;
                  local_550 = pyVar94;
                  goto LAB_00f18fb0;
                }
                if (cVar99 != (code)0x2e) goto LAB_00f18b32;
                pyVar74 = local_520;
                if ((digi_table[(byte)*(code *)((long)&pyVar109->root + 2)] & 3) == 0)
                goto LAB_00f1c761;
                pyVar94 = (yyjson_doc *)((long)&local_550->root + uVar118 + 1);
                do {
                  pyVar74 = pyVar94;
                  uVar118 = (ulong)(byte)*(code *)((long)&pyVar74->root + 1);
                  pyVar94 = (yyjson_doc *)((long)&pyVar74->root + 1);
                } while (uVar118 == 0x30);
                bVar84 = digi_table[uVar118];
                if ((bVar84 & 3) == 0) {
LAB_00f18b32:
                  if ((bVar84 & 3) != 0) goto LAB_00f1cc13;
                  if ((bVar84 & 0x20) != 0) {
                    bVar70 = (digi_table[(byte)*(code *)((long)&pyVar94->root + 1)] & 0xc) == 0;
                    p_Var77 = (_func_void_void_ptr_void_ptr *)((long)pyVar94 + (2 - (ulong)bVar70));
                    pyVar94 = (yyjson_doc *)((long)pyVar94 + (2 - (ulong)bVar70));
                    if ((digi_table[(byte)*p_Var77] & 3) != 0) {
                      do {
                        ppyVar68 = &pyVar94->root;
                        pyVar94 = (yyjson_doc *)((long)&pyVar94->root + 1);
                      } while ((digi_table[(byte)*(code *)((long)ppyVar68 + 1)] & 3) != 0);
                      goto LAB_00f18b46;
                    }
                    goto LAB_00f1cd2b;
                  }
LAB_00f18b46:
                  local_538->root = (yyjson_val *)0x14;
                  (local_538->alc).malloc =
                       (_func_void_ptr_void_ptr_size_t *)((ulong)(cVar101 == (code)0x2d) << 0x3f);
                  pyVar120 = local_518;
                  local_550 = pyVar94;
                }
                else {
                  p_Var108 = (_func_void_ptr_void_ptr_size_t *)(uVar118 - 0x30);
LAB_00f17eef:
                  pyVar94 = (yyjson_doc *)((long)&pyVar109->root + 1);
                  local_4f0 = (yyjson_doc *)((long)&pyVar74->root + 2);
                  uVar118 = (ulong)(byte)*(code *)((long)&pyVar74->root + 2);
                  local_540 = pyVar94;
                  if (uVar118 - 0x30 < 10) {
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               ((uVar118 - 0x30) + (long)p_Var108 * 10);
LAB_00f17f1d:
                    local_4f0 = (yyjson_doc *)((long)&pyVar74->root + 3);
                    uVar118 = (ulong)(byte)*(code *)((long)&pyVar74->root + 3);
                    local_540 = pyVar94;
                    if (9 < uVar118 - 0x30) goto LAB_00f18257;
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               ((uVar118 - 0x30) + (long)p_Var108 * 10);
LAB_00f17f4b:
                    local_4f0 = (yyjson_doc *)((long)&pyVar74->root + 4);
                    uVar118 = (ulong)(byte)*(code *)((long)&pyVar74->root + 4);
                    local_540 = pyVar94;
                    if (9 < uVar118 - 0x30) goto LAB_00f18257;
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               ((uVar118 - 0x30) + (long)p_Var108 * 10);
LAB_00f17f79:
                    local_4f0 = (yyjson_doc *)((long)&pyVar74->root + 5);
                    uVar118 = (ulong)(byte)*(code *)((long)&pyVar74->root + 5);
                    local_540 = pyVar94;
                    if (9 < uVar118 - 0x30) goto LAB_00f18257;
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               ((uVar118 - 0x30) + (long)p_Var108 * 10);
LAB_00f17fa7:
                    local_4f0 = (yyjson_doc *)((long)&pyVar74->root + 6);
                    uVar118 = (ulong)(byte)*(code *)((long)&pyVar74->root + 6);
                    local_540 = pyVar94;
                    if (9 < uVar118 - 0x30) goto LAB_00f18257;
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               ((uVar118 - 0x30) + (long)p_Var108 * 10);
LAB_00f17fd5:
                    local_4f0 = (yyjson_doc *)((long)&pyVar74->root + 7);
                    uVar118 = (ulong)(byte)*(code *)((long)&pyVar74->root + 7);
                    local_540 = pyVar94;
                    if (9 < uVar118 - 0x30) goto LAB_00f18257;
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               ((uVar118 - 0x30) + (long)p_Var108 * 10);
LAB_00f18003:
                    local_4f0 = (yyjson_doc *)&pyVar74->alc;
                    uVar118 = (ulong)(byte)*(code *)&(pyVar74->alc).malloc;
                    local_540 = pyVar94;
                    if (9 < uVar118 - 0x30) goto LAB_00f18257;
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               ((uVar118 - 0x30) + (long)p_Var108 * 10);
LAB_00f18031:
                    local_4f0 = (yyjson_doc *)((long)&(pyVar74->alc).malloc + 1);
                    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar74->alc).malloc + 1);
                    local_540 = pyVar94;
                    if (9 < uVar118 - 0x30) goto LAB_00f18257;
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               ((uVar118 - 0x30) + (long)p_Var108 * 10);
LAB_00f1805f:
                    local_4f0 = (yyjson_doc *)((long)&(pyVar74->alc).malloc + 2);
                    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar74->alc).malloc + 2);
                    local_540 = pyVar94;
                    if (9 < uVar118 - 0x30) goto LAB_00f18257;
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               ((uVar118 - 0x30) + (long)p_Var108 * 10);
LAB_00f1808d:
                    local_4f0 = (yyjson_doc *)((long)&(pyVar74->alc).malloc + 3);
                    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar74->alc).malloc + 3);
                    local_540 = pyVar94;
                    if (9 < uVar118 - 0x30) goto LAB_00f18257;
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               ((uVar118 - 0x30) + (long)p_Var108 * 10);
LAB_00f180bb:
                    local_4f0 = (yyjson_doc *)((long)&(pyVar74->alc).malloc + 4);
                    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar74->alc).malloc + 4);
                    local_540 = pyVar94;
                    if (9 < uVar118 - 0x30) goto LAB_00f18257;
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               ((uVar118 - 0x30) + (long)p_Var108 * 10);
LAB_00f180e9:
                    local_4f0 = (yyjson_doc *)((long)&(pyVar74->alc).malloc + 5);
                    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar74->alc).malloc + 5);
                    local_540 = pyVar94;
                    if (9 < uVar118 - 0x30) goto LAB_00f18257;
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               ((uVar118 - 0x30) + (long)p_Var108 * 10);
LAB_00f18117:
                    local_4f0 = (yyjson_doc *)((long)&(pyVar74->alc).malloc + 6);
                    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar74->alc).malloc + 6);
                    local_540 = pyVar94;
                    if (9 < uVar118 - 0x30) goto LAB_00f18257;
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               ((uVar118 - 0x30) + (long)p_Var108 * 10);
LAB_00f18145:
                    local_4f0 = (yyjson_doc *)((long)&(pyVar74->alc).malloc + 7);
                    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar74->alc).malloc + 7);
                    local_540 = pyVar94;
                    if (9 < uVar118 - 0x30) goto LAB_00f18257;
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               ((uVar118 - 0x30) + (long)p_Var108 * 10);
LAB_00f18173:
                    local_4f0 = (yyjson_doc *)&(pyVar74->alc).realloc;
                    uVar118 = (ulong)*(byte *)&(pyVar74->alc).realloc;
                    local_540 = pyVar94;
                    if (9 < uVar118 - 0x30) goto LAB_00f18257;
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               ((uVar118 - 0x30) + (long)p_Var108 * 10);
LAB_00f181a1:
                    local_4f0 = (yyjson_doc *)((long)&(pyVar74->alc).realloc + 1);
                    uVar118 = (ulong)(byte)*(undefined1 *)((long)&(pyVar74->alc).realloc + 1);
                    local_540 = pyVar94;
                    if (9 < uVar118 - 0x30) goto LAB_00f18257;
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               ((uVar118 - 0x30) + (long)p_Var108 * 10);
LAB_00f181cf:
                    local_4f0 = (yyjson_doc *)((long)&(pyVar74->alc).realloc + 2);
                    uVar118 = (ulong)(byte)*(undefined1 *)((long)&(pyVar74->alc).realloc + 2);
                    local_540 = pyVar94;
                    if (9 < uVar118 - 0x30) goto LAB_00f18257;
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               ((uVar118 - 0x30) + (long)p_Var108 * 10);
LAB_00f181fd:
                    local_4f0 = (yyjson_doc *)((long)&(pyVar74->alc).realloc + 3);
                    uVar118 = (ulong)(byte)*(undefined1 *)((long)&(pyVar74->alc).realloc + 3);
                    local_540 = pyVar94;
                    if (9 < uVar118 - 0x30) goto LAB_00f18257;
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               ((uVar118 - 0x30) + (long)p_Var108 * 10);
                    bVar100 = *(undefined1 *)((long)&(pyVar74->alc).realloc + 4);
                    uVar118 = (ulong)bVar100;
                    local_4f0 = (yyjson_doc *)((long)&(pyVar74->alc).realloc + 4);
                    pyVar74 = local_4f0;
                    pyVar120 = local_518;
                    if ((digi_table[uVar118] & 3) == 0) goto LAB_00f18257;
LAB_00f141f7:
                    pyVar111 = (yyjson_val *)((long)pyVar74 * 0x100 + (long)local_550 * -0x100 + 1);
                    pyVar109 = (yyjson_doc *)((long)&pyVar74->root + 1);
                    do {
                      pyVar93 = pyVar109;
                      bVar84 = digi_table[(byte)*(code *)&pyVar93->root];
                      pyVar109 = (yyjson_doc *)((long)&pyVar93->root + 1);
                      pyVar111 = pyVar111 + 0x10;
                    } while ((bVar84 & 3) != 0);
                    p_Var108 = p_Var108 + (0x34 < bVar100);
                    pyVar96 = pyVar94;
                    pyVar86 = pyVar93;
                    if (pyVar94 != (yyjson_doc *)0x0) {
LAB_00f143e6:
                      pyVar109 = pyVar86;
                      do {
                        do {
                          pyVar109 = (yyjson_doc *)((long)&pyVar109[-1].str_pool + 7);
                        } while (*(code *)&pyVar109->root == (code)0x30);
                      } while (*(code *)&pyVar109->root == (code)0x2e);
                      p_Var77 = (_func_void_void_ptr_void_ptr *)
                                ((long)pyVar96 + ((ulong)(pyVar96 < pyVar74) - (long)pyVar74));
                      local_510 = pyVar74;
                      local_4f0 = pyVar86;
                      if (pyVar109 < pyVar74) {
                        local_510 = (yyjson_doc *)0x0;
                        local_4f0 = (yyjson_doc *)0x0;
                      }
                      pyVar94 = pyVar86;
                      local_540 = pyVar96;
                      if ((bVar84 & 0x20) != 0) goto LAB_00f14440;
                      goto LAB_00f144e1;
                    }
                    if ((-1 < local_554) || ((bVar84 & 0x30) != 0)) {
                      pyVar96 = pyVar93;
                      if (*(code *)&pyVar93->root != (code)0x2e) goto LAB_00f143e6;
                      if ((digi_table[(byte)*(code *)&pyVar109->root] & 3) != 0) {
                        do {
                          pyVar86 = (yyjson_doc *)((long)&pyVar93->root + 1);
                          bVar84 = digi_table[(byte)*(code *)((long)&pyVar93->root + 1)];
                          pyVar93 = pyVar86;
                        } while ((bVar84 & 3) != 0);
                        goto LAB_00f143e6;
                      }
                      msg = "no digit after decimal point";
                      local_550 = pyVar109;
                      goto LAB_00f1c788;
                    }
                    if (local_528->root != (yyjson_val *)0x0) {
                      *(code *)&local_528->root->tag = (code)0x0;
                    }
                    local_538->root = pyVar111;
                    (local_538->alc).malloc = (_func_void_ptr_void_ptr_size_t *)local_550;
                    local_528->root = (yyjson_val *)pyVar93;
                    pyVar120 = local_518;
                    local_550 = pyVar93;
                  }
                  else {
LAB_00f18257:
                    pyVar74 = local_520;
                    if ((yyjson_doc *)((long)&local_540->root + 1U) == local_4f0) goto LAB_00f1c85a;
                    p_Var77 = (_func_void_void_ptr_void_ptr *)
                              ((long)local_540 + (1 - (long)local_4f0));
                    local_510 = (yyjson_doc *)0x0;
                    pyVar94 = local_4f0;
                    pyVar120 = local_518;
                    if ((digi_table[uVar118] & 0x20) == 0) {
                      local_510 = (yyjson_doc *)0x0;
                      pyVar86 = local_4f0;
                      if ((long)p_Var77 < -0x157) {
                        local_538->root = (yyjson_val *)0x14;
                        (local_538->alc).malloc =
                             (_func_void_ptr_void_ptr_size_t *)
                             ((ulong)(cVar101 == (code)0x2d) << 0x3f);
                        local_550 = local_4f0;
                      }
                      else {
LAB_00f14503:
                        exp = (i32)p_Var77;
                        if (((ulong)p_Var108 >> 0x35 == 0) && (exp + 0x16U < 0x2d)) {
                          if (exp < 0) {
                            p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                                       ((double)(long)p_Var108 /
                                       *(double *)(f64_pow10_table + (ulong)(uint)-exp * 8));
                          }
                          else {
                            p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                                       ((double)(long)p_Var108 *
                                       *(double *)(f64_pow10_table + (ulong)(exp & 0x7fffffff) * 8))
                            ;
                          }
                          local_538->root = (yyjson_val *)0x14;
                          p_Var79 = (_func_void_ptr_void_ptr_size_t *)
                                    ((ulong)p_Var108 ^ 0x8000000000000000);
                          if (cVar101 != (code)0x2d) {
                            p_Var79 = p_Var108;
                          }
                          (local_538->alc).malloc = p_Var79;
                          local_550 = pyVar86;
                        }
                        else {
                          if ((exp + 0x132U < 0x252) && (local_510 == (yyjson_doc *)0x0)) {
                            lVar85 = (long)(exp * 2 + 0x2ae);
                            uVar118 = 0x3f;
                            if (p_Var108 != (_func_void_ptr_void_ptr_size_t *)0x0) {
                              for (; (ulong)p_Var108 >> uVar118 == 0; uVar118 = uVar118 - 1) {
                              }
                            }
                            iVar102 = (int)(uVar118 ^ 0x3f);
                            uVar118 = (long)p_Var108 << ((byte)(uVar118 ^ 0x3f) & 0x3f);
                            auVar5._8_8_ = 0;
                            auVar5._0_8_ = uVar118;
                            auVar25._8_8_ = 0;
                            auVar25._0_8_ = *(ulong *)(pow10_sig_table + lVar85 * 8);
                            auVar5 = auVar5 * auVar25;
                            lVar91 = auVar5._8_8_;
                            uVar73 = auVar5._0_8_;
                            iVar115 = exp * 0x3526a + -0x3f0000 >> 0x10;
                            if (0x1fd < (ulong)(auVar5._8_4_ & 0x1ff) - 1) {
                              lVar117 = (long)(exp * 2 + 0x2af);
                              auVar6._8_8_ = 0;
                              auVar6._0_8_ = uVar118;
                              auVar26._8_8_ = 0;
                              auVar26._0_8_ = *(ulong *)(pow10_sig_table + lVar117 * 8);
                              lVar92 = SUB168(auVar6 * auVar26,8);
                              if (0xfffffffffffffffd < (lVar92 + uVar73) - 1) goto LAB_00f15fa0;
                              lVar91 = lVar91 + (ulong)(lVar92 + uVar73 < uVar73);
                            }
                            uVar118 = lVar91 << (-1 < lVar91);
                            uVar118 = (uVar118 & 0x400) + uVar118;
                            local_538->root = (yyjson_val *)0x14;
                            (local_538->alc).malloc =
                                 (_func_void_ptr_void_ptr_size_t *)
                                 ((ulong)(cVar101 == (code)0x2d) << 0x3f |
                                 uVar118 >> 0xb & 0xfffffffffffff |
                                 (ulong)(((iVar115 - iVar102) - (uint)(-1 < lVar91)) + 0x47e +
                                        (uint)(uVar118 < 0x400)) << 0x34);
                            pyVar120 = local_518;
                            local_550 = pyVar86;
                            goto LAB_00f18fb0;
                          }
                          uVar118 = 0x3f;
                          if (p_Var108 != (_func_void_ptr_void_ptr_size_t *)0x0) {
                            for (; (ulong)p_Var108 >> uVar118 == 0; uVar118 = uVar118 - 1) {
                            }
                          }
                          iVar102 = (int)(uVar118 ^ 0x3f);
                          uVar118 = (long)p_Var108 << ((byte)(uVar118 ^ 0x3f) & 0x3f);
                          lVar85 = (long)(exp * 2 + 0x2ae);
                          lVar117 = (long)(exp * 2 + 0x2af);
                          iVar115 = exp * 0x3526a + -0x3f0000 >> 0x10;
LAB_00f15fa0:
                          lVar91 = ((ulong)(local_510 != (yyjson_doc *)0x0) << 2) <<
                                   ((byte)iVar102 & 0x3f);
                          auVar8._8_8_ = 0;
                          auVar8._0_8_ = uVar118;
                          auVar28._8_8_ = 0;
                          auVar28._0_8_ =
                               *(long *)(pow10_sig_table + lVar85 * 8) -
                               (*(long *)(pow10_sig_table + lVar117 * 8) >> 0x3f);
                          uVar73 = SUB168(auVar8 * auVar28,8) - (SUB168(auVar8 * auVar28,0) >> 0x3f)
                          ;
                          uVar118 = 0x3f;
                          if (uVar73 != 0) {
                            for (; uVar73 >> uVar118 == 0; uVar118 = uVar118 - 1) {
                            }
                          }
                          bVar84 = (byte)(uVar118 ^ 0x3f);
                          uVar73 = uVar73 << (bVar84 & 0x3f);
                          uVar116 = ((iVar115 - (int)(uVar118 ^ 0x3f)) - iVar102) + 0x40;
                          uVar118 = (9 - (ulong)(lVar91 == 0)) + lVar91 << (bVar84 & 0x3f);
                          if ((int)uVar116 < -0x43d) {
                            iVar102 = 0x40;
                            if ((uVar116 < 0xfffffb8f) ||
                               (iVar102 = -0x432 - uVar116, uVar116 < 0xfffffb92)) {
                              bVar84 = (char)iVar102 - 0x3c;
                              uVar73 = uVar73 >> (bVar84 & 0x3f);
                              uVar116 = (uVar116 + iVar102) - 0x3c;
                              uVar118 = (uVar118 >> (bVar84 & 0x3f)) + 9;
                              iVar102 = 0x3c;
                            }
                          }
                          else {
                            iVar102 = 0xb;
                          }
                          bVar84 = (byte)iVar102;
                          lVar85 = 8L << (bVar84 - 1 & 0x3f);
                          uVar105 = (~(-1L << (bVar84 & 0x3f)) & uVar73) * 8;
                          uVar112 = lVar85 + uVar118;
                          uVar97 = 0;
                          uVar73 = (ulong)(uVar112 <= uVar105) + (uVar73 >> (bVar84 & 0x3f));
                          if (uVar73 == 0) {
LAB_00f160bb:
                            if ((uVar105 <= lVar85 - uVar118) || (uVar112 <= uVar105)) {
                              local_538->root = (yyjson_val *)0x14;
                              (local_538->alc).malloc =
                                   (_func_void_ptr_void_ptr_size_t *)
                                   (uVar97 | (ulong)(cVar101 == (code)0x2d) << 0x3f);
                              pyVar120 = local_518;
                              local_550 = pyVar86;
                              goto LAB_00f18fb0;
                            }
                            iVar102 = -0x433;
                            if (0xfffffffffffff < uVar97) {
                              iVar102 = (uint)(uVar97 >> 0x34) - 0x434;
                            }
                            local_4a8 = CONCAT44(local_4a8._4_4_,iVar102);
                            uVar118 = (uVar97 & 0xfffffffffffff) + 0x10000000000000;
                            if (0xfffffffffffff >= uVar97) {
                              uVar118 = uVar97;
                            }
                            bigint_set_buf(&big_full,(u64)p_Var108,&exp,(u8 *)local_510,
                                           (u8 *)local_4f0,(u8 *)local_540);
                            local_230[0] = uVar118 * 2 + 1;
                            iVar102 = exp;
                            if (exp < 0) {
                              uVar118 = 1;
                              for (iVar102 = -exp; 0x12 < iVar102; iVar102 = iVar102 + -0x13) {
                                for (uVar73 = 0;
                                    (uVar112 = uVar118, uVar118 != uVar73 &&
                                    (uVar112 = uVar73,
                                    *(long *)((long)local_238 + (uVar73 + 1) * 8) == 0));
                                    uVar73 = uVar73 + 1) {
                                }
                                uVar73 = 0;
                                for (; auVar55._8_8_ = 0, auVar55._0_8_ = uVar73, uVar112 < uVar118;
                                    uVar112 = uVar112 + 1) {
                                  auVar33._8_8_ = 0;
                                  auVar33._0_8_ = *(ulong *)((long)local_238 + (uVar112 + 1) * 8);
                                  auVar55 = ZEXT816(10000000000000000000) * auVar33 + auVar55;
                                  uVar73 = auVar55._8_8_;
                                  *(long *)((long)local_238 + (uVar112 + 1) * 8) = auVar55._0_8_;
                                }
                                uVar112 = uVar118;
                                if (uVar73 != 0) {
                                  uVar112 = (ulong)((int)uVar118 + 1);
                                  *(ulong *)((long)local_238 + (uVar118 + 1) * 8) = uVar73;
                                }
                                uVar118 = uVar112;
                              }
                              uVar73 = uVar118;
                              if (iVar102 != 0) {
                                uVar112 = *(ulong *)(u64_pow10_table + (long)iVar102 * 8);
                                for (uVar105 = 0;
                                    (uVar106 = uVar118, uVar118 != uVar105 &&
                                    (uVar106 = uVar105,
                                    *(long *)((long)local_238 + (uVar105 + 1) * 8) == 0));
                                    uVar105 = uVar105 + 1) {
                                }
                                uVar105 = 0;
                                for (; auVar58._8_8_ = 0, auVar58._0_8_ = uVar105, uVar106 < uVar118
                                    ; uVar106 = uVar106 + 1) {
                                  auVar12._8_8_ = 0;
                                  auVar12._0_8_ = uVar112;
                                  auVar36._8_8_ = 0;
                                  auVar36._0_8_ = *(ulong *)((long)local_238 + (uVar106 + 1) * 8);
                                  auVar58 = auVar12 * auVar36 + auVar58;
                                  uVar105 = auVar58._8_8_;
                                  *(long *)((long)local_238 + (uVar106 + 1) * 8) = auVar58._0_8_;
                                }
                                if (uVar105 != 0) {
                                  local_238[0] = (int)uVar118 + 1;
                                  uVar73 = (ulong)local_238[0];
                                  *(ulong *)((long)local_238 + (uVar118 + 1) * 8) = uVar105;
                                }
                              }
                            }
                            else {
                              for (; uVar118 = (ulong)big_full.used, 0x12 < iVar102;
                                  iVar102 = iVar102 + -0x13) {
                                for (uVar73 = 0;
                                    (uVar112 = uVar118, uVar118 != uVar73 &&
                                    (uVar112 = uVar73, big_full.bits[uVar73] == 0));
                                    uVar73 = uVar73 + 1) {
                                }
                                uVar73 = 0;
                                for (; auVar53._8_8_ = 0, auVar53._0_8_ = uVar73, uVar112 < uVar118;
                                    uVar112 = uVar112 + 1) {
                                  auVar31._8_8_ = 0;
                                  auVar31._0_8_ = big_full.bits[uVar112];
                                  auVar53 = ZEXT816(10000000000000000000) * auVar31 + auVar53;
                                  uVar73 = auVar53._8_8_;
                                  big_full.bits[uVar112] = auVar53._0_8_;
                                }
                                if (uVar73 != 0) {
                                  big_full.used = big_full.used + 1;
                                  big_full.bits[uVar118] = uVar73;
                                }
                              }
                              uVar73 = 1;
                              if (iVar102 != 0) {
                                uVar112 = *(ulong *)(u64_pow10_table + (long)iVar102 * 8);
                                for (uVar105 = 0;
                                    (uVar106 = uVar118, uVar118 != uVar105 &&
                                    (uVar106 = uVar105, big_full.bits[uVar105] == 0));
                                    uVar105 = uVar105 + 1) {
                                }
                                uVar105 = 0;
                                for (; auVar57._8_8_ = 0, auVar57._0_8_ = uVar105, uVar106 < uVar118
                                    ; uVar106 = uVar106 + 1) {
                                  auVar11._8_8_ = 0;
                                  auVar11._0_8_ = uVar112;
                                  auVar35._8_8_ = 0;
                                  auVar35._0_8_ = big_full.bits[uVar106];
                                  auVar57 = auVar11 * auVar35 + auVar57;
                                  uVar105 = auVar57._8_8_;
                                  big_full.bits[uVar106] = auVar57._0_8_;
                                }
                                if (uVar105 != 0) {
                                  big_full.used = big_full.used + 1;
                                  big_full.bits[uVar118] = uVar105;
                                }
                              }
                            }
                            uVar116 = (uint)uVar73;
                            if ((int)(uint)local_4a8 < 1) {
                              uVar110 = -(uint)local_4a8 >> 6;
                              uVar118 = (ulong)uVar110;
                              uVar73 = (ulong)big_full.used;
                              uVar103 = -(uint)local_4a8 & 0x3f;
                              if (uVar103 == 0) {
                                while (uVar73 != 0) {
                                  big_full.bits[(int)uVar73 + (uVar110 - 1)] =
                                       big_full.bits[uVar73 - 1];
                                  uVar73 = uVar73 - 1;
                                }
                                big_full.used = big_full.used + uVar110;
                                while (uVar118 != 0) {
                                  big_full.bits[uVar118 - 1] = 0;
                                  uVar118 = uVar118 - 1;
                                }
                              }
                              else {
                                big_full.bits[uVar73] = 0;
                                sVar67 = (sbyte)uVar103;
                                uVar103 = big_full.used + uVar110;
                                while (uVar112 = uVar73 - 1, uVar112 != 0xffffffffffffffff) {
                                  big_full.bits[uVar103] =
                                       big_full.bits[uVar112 & 0xffffffff] >>
                                       (0x40U - sVar67 & 0x3f) | big_full.bits[uVar73] << sVar67;
                                  uVar103 = uVar103 - 1;
                                  uVar73 = uVar112;
                                }
                                big_full.bits[uVar118] = big_full.bits[0] << sVar67;
                                big_full.used =
                                     (big_full.used + uVar110 + 1) -
                                     (uint)(big_full.bits[big_full.used + uVar110] == 0);
                                while (uVar118 != 0) {
                                  big_full.bits[uVar118 - 1] = 0;
                                  uVar118 = uVar118 - 1;
                                }
                              }
                            }
                            else {
                              uVar103 = (uint)local_4a8 >> 6;
                              uVar118 = (ulong)uVar103;
                              bVar84 = (byte)local_4a8 & 0x3f;
                              if ((local_4a8 & 0x3f) == 0) {
                                while (uVar73 != 0) {
                                  *(undefined8 *)
                                   ((long)local_238 + ((ulong)((int)uVar73 + (uVar103 - 1)) + 1) * 8
                                   ) = *(undefined8 *)((long)local_238 + uVar73 * 8);
                                  uVar73 = uVar73 - 1;
                                }
                                uVar116 = uVar116 + uVar103;
                                while (uVar118 != 0) {
                                  *(undefined8 *)((long)local_238 + uVar118 * 8) = 0;
                                  uVar118 = uVar118 - 1;
                                }
                              }
                              else {
                                *(undefined8 *)((long)local_238 + (uVar73 + 1) * 8) = 0;
                                uVar110 = uVar116 + uVar103;
                                while (uVar112 = uVar73 - 1, uVar112 != 0xffffffffffffffff) {
                                  *(ulong *)((long)local_238 + ((ulong)uVar110 + 1) * 8) =
                                       *(ulong *)((long)local_238 + ((uVar112 & 0xffffffff) + 1) * 8
                                                 ) >> (0x40 - bVar84 & 0x3f) |
                                       *(long *)((long)local_238 + (uVar73 + 1) * 8) << bVar84;
                                  uVar110 = uVar110 - 1;
                                  uVar73 = uVar112;
                                }
                                *(long *)((long)local_238 + (uVar118 + 1) * 8) =
                                     local_230[0] << bVar84;
                                uVar116 = (uVar116 + uVar103 + 1) -
                                          (uint)(*(long *)((long)local_238 +
                                                          ((ulong)(uVar116 + uVar103) + 1) * 8) == 0
                                                );
                                while (uVar118 != 0) {
                                  *(undefined8 *)((long)local_238 + uVar118 * 8) = 0;
                                  uVar118 = uVar118 - 1;
                                }
                              }
                            }
                            uVar118 = 0;
                            if ((uVar116 <= big_full.used) &&
                               (uVar118 = 1, big_full.used <= uVar116)) {
                              uVar118 = 0;
                              uVar73 = (ulong)big_full.used;
                              do {
                                if (uVar73 == 0) {
                                  uVar118 = (ulong)((uint)uVar97 & 1);
                                  goto LAB_00f1881e;
                                }
                                puVar1 = (ulong *)((long)local_238 + uVar73 * 8);
                                lVar85 = uVar73 - 1;
                                if (big_full.bits[lVar85] < *puVar1) goto LAB_00f1881e;
                                uVar73 = uVar73 - 1;
                              } while (big_full.bits[lVar85] <= *puVar1);
                              uVar118 = 1;
                            }
LAB_00f1881e:
                            pyVar76 = local_528;
                            pyVar120 = local_518;
                            pyVar98 = local_530;
                            pyVar78 = local_530;
                            if (uVar118 + uVar97 == 0x7ff0000000000000) {
                              if (local_554 < '\0') {
                                if (local_528->root != (yyjson_val *)0x0) {
                                  *(code *)&local_528->root->tag = (code)0x0;
                                }
                                local_538->root =
                                     (yyjson_val *)(((long)pyVar86 - (long)pyVar104) * 0x100 + 1);
                                (local_538->alc).malloc = (_func_void_ptr_void_ptr_size_t *)pyVar104
                                ;
                                local_528->root = (yyjson_val *)pyVar86;
                                local_550 = pyVar86;
                                goto LAB_00f18fb0;
                              }
                              if ((flg & 0x10) == 0) goto LAB_00f16b58;
                              local_538->root = (yyjson_val *)0x14;
                              p_Var108 = (_func_void_ptr_void_ptr_size_t *)0x7ff0000000000000;
                              if ((char)local_500 == '-') {
                                p_Var108 = (_func_void_ptr_void_ptr_size_t *)0xfff0000000000000;
                              }
                            }
                            else {
                              local_538->root = (yyjson_val *)0x14;
                              p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                                         (uVar118 + uVar97 | (ulong)((char)local_500 == '-') << 0x3f
                                         );
                            }
                            (local_538->alc).malloc = p_Var108;
                            local_550 = pyVar86;
                            goto LAB_00f18fb0;
                          }
                          uVar97 = 0x3f;
                          if (uVar73 != 0) {
                            for (; uVar73 >> uVar97 == 0; uVar97 = uVar97 - 1) {
                            }
                          }
                          uVar116 = (uVar116 + iVar102) - (int)(uVar97 ^ 0x3f);
                          if ((int)uVar116 < 0x3c1) {
                            uVar73 = (uVar73 << ((byte)(uVar97 ^ 0x3f) & 0x3f)) >> 0xb;
                            if ((int)uVar116 < -0x43d) {
                              uVar97 = 0;
                              if (0xfffffb8e < uVar116) {
                                uVar97 = uVar73 >> (-(char)uVar116 - 0x3dU & 0x3f);
                              }
                            }
                            else {
                              uVar97 = uVar73 & 0xfffffffffffff | (ulong)(uVar116 + 0x43e) << 0x34;
                              if (uVar97 == 0x7ff0000000000000) goto LAB_00f16b3f;
                            }
                            goto LAB_00f160bb;
                          }
LAB_00f16b3f:
                          if (local_554 < '\0') {
                            if (local_528->root != (yyjson_val *)0x0) {
                              *(code *)&local_528->root->tag = (code)0x0;
                            }
                            local_538->root =
                                 (yyjson_val *)(((long)pyVar86 - (long)local_550) * 0x100 + 1);
                            (local_538->alc).malloc = (_func_void_ptr_void_ptr_size_t *)local_550;
                            local_528->root = (yyjson_val *)pyVar86;
                            pyVar120 = local_518;
                            local_550 = pyVar86;
                          }
                          else {
                            if ((flg & 0x10) == 0) {
LAB_00f16b58:
                              msg = "number is infinity when parsed as double";
                              pyVar120 = local_518;
                              pyVar75 = local_548;
                              local_550 = pyVar104;
                              goto LAB_00f1c788;
                            }
                            local_538->root = (yyjson_val *)0x14;
                            (local_538->alc).malloc =
                                 (_func_void_ptr_void_ptr_size_t *)
                                 (((ulong)(cVar101 != (code)0x2d) << 0x3f) + -0x10000000000000);
                            pyVar120 = local_518;
                            local_550 = pyVar86;
                          }
                        }
                      }
                    }
                    else {
LAB_00f14440:
                      cVar99 = *(code *)((long)&pyVar94->root + 1);
                      uVar118 = (ulong)((digi_table[(byte)cVar99] & 0xc) != 0);
                      if ((digi_table[(byte)*(code *)((long)&pyVar94->root + uVar118 + 1)] & 3) == 0
                         ) {
                        msg = "no digit after exponent sign";
                        local_550 = (yyjson_doc *)((long)&pyVar94->root + uVar118 + 1);
                        goto LAB_00f1c788;
                      }
                      pyVar86 = (yyjson_doc *)((long)&pyVar94->root + uVar118);
                      pyVar111 = (yyjson_val *)
                                 ((long)pyVar86 * 0x100 + (long)local_550 * -0x100 + 1);
                      do {
                        cVar89 = *(code *)((long)&pyVar86->root + 1);
                        pyVar86 = (yyjson_doc *)((long)&pyVar86->root + 1);
                        pyVar111 = pyVar111 + 0x10;
                      } while (cVar89 == (code)0x30);
                      lVar117 = 0;
                      lVar85 = 0;
                      while ((digi_table[(byte)cVar89] & 3) != 0) {
                        lVar85 = lVar85 * 10 + (ulong)(byte)((char)cVar89 - 0x30);
                        cVar89 = *(code *)((long)&pyVar86->root + 1);
                        pyVar86 = (yyjson_doc *)((long)&pyVar86->root + 1);
                        pyVar111 = pyVar111 + 0x10;
                        lVar117 = lVar117 + 1;
                      }
                      if (lVar117 < 0x13) {
                        lVar117 = -lVar85;
                        if (cVar99 != (code)0x2d) {
                          lVar117 = lVar85;
                        }
                        p_Var77 = p_Var77 + lVar117;
LAB_00f144e1:
                        if ((long)p_Var77 < -0x157) {
                          local_538->root = (yyjson_val *)0x14;
                          (local_538->alc).malloc =
                               (_func_void_ptr_void_ptr_size_t *)
                               ((ulong)(cVar101 == (code)0x2d) << 0x3f);
                          local_550 = pyVar86;
                        }
                        else {
                          if ((long)p_Var77 < 0x135) goto LAB_00f14503;
                          if (local_554 < '\0') {
                            if (local_528->root != (yyjson_val *)0x0) {
                              *(code *)&local_528->root->tag = (code)0x0;
                            }
                            local_538->root =
                                 (yyjson_val *)(((long)pyVar86 - (long)local_550) * 0x100 + 1);
                            (local_538->alc).malloc = (_func_void_ptr_void_ptr_size_t *)local_550;
                            local_528->root = (yyjson_val *)pyVar86;
                            pyVar120 = local_518;
                            local_550 = pyVar86;
                          }
                          else {
                            if ((flg & 0x10) == 0) goto LAB_00f1b4f3;
                            local_538->root = (yyjson_val *)0x14;
                            (local_538->alc).malloc =
                                 (_func_void_ptr_void_ptr_size_t *)
                                 (((ulong)(cVar101 != (code)0x2d) << 0x3f) + -0x10000000000000);
                            pyVar120 = local_518;
                            local_550 = pyVar86;
                          }
                        }
                      }
                      else if (cVar99 == (code)0x2d) {
                        local_538->root = (yyjson_val *)0x14;
                        (local_538->alc).malloc =
                             (_func_void_ptr_void_ptr_size_t *)
                             ((ulong)(cVar101 == (code)0x2d) << 0x3f);
                        pyVar120 = local_518;
                        local_550 = pyVar86;
                      }
                      else if (local_554 < '\0') {
                        if (local_528->root != (yyjson_val *)0x0) {
                          *(code *)&local_528->root->tag = (code)0x0;
                        }
                        local_538->root = pyVar111;
                        (local_538->alc).malloc = (_func_void_ptr_void_ptr_size_t *)local_550;
                        local_528->root = (yyjson_val *)pyVar86;
                        pyVar120 = local_518;
                        local_550 = pyVar86;
                      }
                      else {
                        if ((flg & 0x10) == 0) goto LAB_00f1b4f3;
                        local_538->root = (yyjson_val *)0x14;
                        (local_538->alc).malloc =
                             (_func_void_ptr_void_ptr_size_t *)
                             (((ulong)(cVar101 != (code)0x2d) << 0x3f) + -0x10000000000000);
                        pyVar120 = local_518;
                        local_550 = pyVar86;
                      }
                    }
                  }
                }
                goto LAB_00f18fb0;
              }
              if (bVar84 == 0x74) {
                local_538 = (yyjson_doc *)&(local_538->alc).realloc;
                if (local_538 < local_4e8) {
                  local_508 = local_540;
                  local_548 = pyVar75;
                  local_520 = pyVar78;
                }
                else {
                  local_508 = (yyjson_doc *)((long)&local_540->root + ((ulong)local_540 >> 1));
                  sVar119 = (long)local_508 * 0x10;
                  local_528 = pyVar76;
                  local_520 = pyVar78;
                  pyVar74 = (yyjson_doc *)
                            (*local_4b0)(local_4d8,pyVar75,(long)local_540 << 4,sVar119);
                  pyVar78 = local_550;
                  pyVar75 = local_548;
                  if (pyVar74 == (yyjson_doc *)0x0) goto LAB_00f146d8;
                  local_538 = (yyjson_doc *)(((long)local_538 - (long)local_548) + (long)pyVar74);
                  pyVar98 = (yyjson_doc *)(((long)pyVar98 - (long)local_548) + (long)pyVar74);
                  local_4e8 = (undefined1 *)((long)pyVar74 + (sVar119 - 0x20));
                  pyVar120 = local_518;
                  pyVar76 = local_528;
                  local_548 = pyVar74;
                }
                pyVar94 = local_520;
                if (*(int *)&local_550->root != 0x65757274) goto LAB_00f15aeb;
                local_520 = (yyjson_doc *)((long)&local_520->root + 1);
                local_538->root = (yyjson_val *)0xb;
LAB_00f13b86:
                local_550 = (yyjson_doc *)((long)&local_550->root + 4);
                pyVar78 = local_530;
                goto LAB_00f18fb0;
              }
              uVar103 = uVar116 & 0xff;
              if (uVar103 != 0x5d) {
                if (uVar103 == 0x66) {
                  local_538 = (yyjson_doc *)&(local_538->alc).realloc;
                  if (local_538 < local_4e8) {
                    local_508 = local_540;
                    local_548 = pyVar75;
                    local_520 = pyVar78;
                  }
                  else {
                    local_508 = (yyjson_doc *)((long)&local_540->root + ((ulong)local_540 >> 1));
                    sVar119 = (long)local_508 * 0x10;
                    local_528 = pyVar76;
                    local_520 = pyVar78;
                    pyVar74 = (yyjson_doc *)
                              (*local_4b0)(local_4d8,pyVar75,(long)local_540 << 4,sVar119);
                    pyVar78 = local_550;
                    pyVar75 = local_548;
                    if (pyVar74 == (yyjson_doc *)0x0) goto LAB_00f146d8;
                    local_538 = (yyjson_doc *)(((long)local_538 - (long)local_548) + (long)pyVar74);
                    pyVar98 = (yyjson_doc *)(((long)pyVar98 - (long)local_548) + (long)pyVar74);
                    local_4e8 = (undefined1 *)((long)pyVar74 + (sVar119 - 0x20));
                    pyVar120 = local_518;
                    pyVar76 = local_528;
                    local_548 = pyVar74;
                  }
                  pyVar94 = local_520;
                  if (*(int *)((long)&local_550->root + 1) != 0x65736c61) goto LAB_00f15aeb;
                  local_520 = (yyjson_doc *)((long)&local_520->root + 1);
                  local_538->root = (yyjson_val *)0x3;
                  local_550 = (yyjson_doc *)((long)&local_550->root + 5);
                  pyVar78 = local_530;
                  goto LAB_00f18fb0;
                }
                if (uVar103 == 0x6e) {
                  local_538 = (yyjson_doc *)&(local_538->alc).realloc;
                  if (local_538 < local_4e8) {
                    local_508 = local_540;
                    local_548 = pyVar75;
                    local_520 = pyVar78;
                  }
                  else {
                    local_508 = (yyjson_doc *)((long)&local_540->root + ((ulong)local_540 >> 1));
                    sVar119 = (long)local_508 * 0x10;
                    local_528 = pyVar76;
                    local_520 = pyVar78;
                    pyVar74 = (yyjson_doc *)
                              (*local_4b0)(local_4d8,pyVar75,(long)local_540 << 4,sVar119);
                    pyVar78 = local_550;
                    pyVar75 = local_548;
                    if (pyVar74 == (yyjson_doc *)0x0) goto LAB_00f146d8;
                    local_538 = (yyjson_doc *)(((long)local_538 - (long)local_548) + (long)pyVar74);
                    pyVar98 = (yyjson_doc *)(((long)pyVar98 - (long)local_548) + (long)pyVar74);
                    local_4e8 = (undefined1 *)((long)pyVar74 + (sVar119 - 0x20));
                    pyVar120 = local_518;
                    pyVar76 = local_528;
                    local_548 = pyVar74;
                  }
                  local_520 = (yyjson_doc *)((long)&local_520->root + 1);
                  uVar116 = *(uint *)&local_550->root;
                  if (uVar116 == 0x6c6c756e) {
                    local_538->root = (yyjson_val *)0x2;
                    goto LAB_00f13b86;
                  }
                  pyVar94 = local_520;
                  if (((((flg & 0x10) == 0) || ((uVar116 & 0xff | 0x20) != 0x6e)) ||
                      ((uVar116 >> 8 & 0xff | 0x20) != 0x61)) ||
                     ((uVar116 >> 0x10 & 0xff | 0x20) != 0x6e)) goto LAB_00f15aeb;
                  pyVar75 = (yyjson_doc *)((long)&local_550->root + 3);
                  pyVar120 = local_518;
                  pyVar78 = local_530;
                  if ((flg & 0xa0) == 0) {
                    local_538->root = (yyjson_val *)0x14;
                    (local_538->alc).malloc = (_func_void_ptr_void_ptr_size_t *)0x7ff8000000000000;
                    local_550 = pyVar75;
                  }
                  else {
                    if (pyVar76->root != (yyjson_val *)0x0) {
                      *(code *)&pyVar76->root->tag = (code)0x0;
                    }
                    pyVar76->root = (yyjson_val *)pyVar75;
                    local_538->root = (yyjson_val *)0x301;
                    (local_538->alc).malloc = (_func_void_ptr_void_ptr_size_t *)local_550;
                    local_550 = pyVar75;
                  }
                  goto LAB_00f18fb0;
                }
                if (uVar103 != 0x22) {
                  if ((char_table[bVar84] & 1) == 0) {
                    if ((((flg & 0x10) != 0) && (uVar103 - 0x49 < 0x21)) &&
                       ((0x100000021U >> ((ulong)(uVar103 - 0x49) & 0x3f) & 1) != 0)) {
                      local_538 = (yyjson_doc *)&(local_538->alc).realloc;
                      local_530 = pyVar98;
                      if (local_538 < local_4e8) {
                        local_508 = local_540;
                        local_520 = pyVar78;
                      }
                      else {
                        local_508 = (yyjson_doc *)((long)&local_540->root + ((ulong)local_540 >> 1))
                        ;
                        sVar119 = (long)local_508 * 0x10;
                        local_520 = pyVar78;
                        pyVar120 = (yyjson_doc *)
                                   (*local_4b0)(local_4d8,local_548,(long)local_540 << 4,sVar119);
                        pyVar78 = local_550;
                        pyVar75 = local_548;
                        if (pyVar120 == (yyjson_doc *)0x0) goto LAB_00f146d8;
                        local_538 = (yyjson_doc *)
                                    (((long)local_538 - (long)local_548) + (long)pyVar120);
                        local_530 = (yyjson_doc *)
                                    (((long)local_530 - (long)local_548) + (long)pyVar120);
                        local_4e8 = (undefined1 *)((long)pyVar120 + (sVar119 - 0x20));
                        uVar116 = (uint)(byte)*(code *)&local_550->root;
                        local_548 = pyVar120;
                      }
                      local_520 = (yyjson_doc *)((long)&local_520->root + 1);
                      uVar103 = uVar116 & 0xff;
                      pyVar120 = local_518;
                      pyVar98 = local_530;
                      pyVar78 = local_530;
                      pyVar75 = local_520;
                      if ((char)uVar116 == 'I') {
LAB_00f12cc9:
                        if ((((byte)*(code *)((long)&local_550->root + 1) | 0x20) != 0x6e) ||
                           (((byte)*(code *)((long)&local_550->root + 2) | 0x20) != 0x66)) {
                          if ((uVar103 | 0x20) == 0x6e) goto LAB_00f15e9d;
                          goto LAB_00f19777;
                        }
                        pyVar75 = (yyjson_doc *)((long)&local_550->root + 3);
                        if ((((((byte)*(code *)((long)&local_550->root + 3) | 0x20) == 0x69) &&
                             (((byte)*(code *)((long)&local_550->root + 4) | 0x20) == 0x6e)) &&
                            (((byte)*(code *)((long)&local_550->root + 5) | 0x20) == 0x69)) &&
                           ((((byte)*(code *)((long)&local_550->root + 6) | 0x20) == 0x74 &&
                            (((byte)*(code *)((long)&local_550->root + 7) | 0x20) == 0x79)))) {
                          pyVar75 = (yyjson_doc *)&local_550->alc;
                        }
                        if ((flg & 0xa0) != 0) {
                          if (pyVar76->root != (yyjson_val *)0x0) {
                            *(code *)&pyVar76->root->tag = (code)0x0;
                          }
                          pyVar76->root = (yyjson_val *)pyVar75;
                          local_538->root =
                               (yyjson_val *)(((long)pyVar75 - (long)local_550) * 0x100 + 1);
                          (local_538->alc).malloc = (_func_void_ptr_void_ptr_size_t *)local_550;
                          local_550 = pyVar75;
                          goto LAB_00f18fb0;
                        }
                        local_538->root = (yyjson_val *)0x14;
                        p_Var108 = (_func_void_ptr_void_ptr_size_t *)0x7ff0000000000000;
                        local_550 = pyVar75;
                      }
                      else {
                        if ((uVar103 != 0x4e) && (uVar103 != 0x6e)) {
                          if (uVar103 == 0x69) goto LAB_00f12cc9;
                          goto LAB_00f19777;
                        }
LAB_00f15e9d:
                        if ((((byte)*(code *)((long)&local_550->root + 1) | 0x20) != 0x61) ||
                           (((byte)*(code *)((long)&local_550->root + 2) | 0x20) != 0x6e))
                        goto LAB_00f19777;
                        pyVar75 = (yyjson_doc *)((long)&local_550->root + 3);
                        if ((flg & 0xa0) != 0) {
                          if (pyVar76->root != (yyjson_val *)0x0) {
                            *(code *)&pyVar76->root->tag = (code)0x0;
                          }
                          pyVar76->root = (yyjson_val *)pyVar75;
                          local_538->root = (yyjson_val *)0x301;
                          (local_538->alc).malloc = (_func_void_ptr_void_ptr_size_t *)local_550;
                          local_550 = pyVar75;
                          goto LAB_00f18fb0;
                        }
                        local_538->root = (yyjson_val *)0x14;
                        p_Var108 = (_func_void_ptr_void_ptr_size_t *)0x7ff8000000000000;
                        local_550 = pyVar75;
                      }
                      (local_538->alc).malloc = p_Var108;
                      goto LAB_00f18fb0;
                    }
                    pyVar75 = local_520;
                    if ((flg & 8) == 0) goto LAB_00f19777;
                    local_520 = pyVar78;
                    bVar70 = skip_spaces_and_comments((u8 **)&local_550);
                    pyVar75 = local_548;
                    pyVar78 = local_520;
                    if (!bVar70) goto LAB_00f18dee;
                  }
                  else {
                    do {
                      local_550 = (yyjson_doc *)((long)&local_550->root + 1);
                    } while ((char_table[(byte)*(code *)&local_550->root] & 1) != 0);
                  }
                  goto LAB_00f129ea;
                }
                local_538 = (yyjson_doc *)&(local_538->alc).realloc;
                if (local_538 < local_4e8) {
                  local_508 = local_540;
                  local_548 = pyVar75;
                  local_520 = pyVar78;
                }
                else {
                  local_508 = (yyjson_doc *)((long)&local_540->root + ((ulong)local_540 >> 1));
                  sVar119 = (long)local_508 * 0x10;
                  local_528 = pyVar76;
                  local_520 = pyVar78;
                  pyVar74 = (yyjson_doc *)
                            (*local_4b0)(local_4d8,pyVar75,(long)local_540 << 4,sVar119);
                  pyVar78 = local_550;
                  pyVar75 = local_548;
                  if (pyVar74 == (yyjson_doc *)0x0) goto LAB_00f146d8;
                  local_538 = (yyjson_doc *)(((long)local_538 - (long)local_548) + (long)pyVar74);
                  pyVar98 = (yyjson_doc *)(((long)pyVar98 - (long)local_548) + (long)pyVar74);
                  local_4e8 = (undefined1 *)((long)pyVar74 + (sVar119 - 0x20));
                  pyVar120 = local_518;
                  pyVar76 = local_528;
                  local_548 = pyVar74;
                }
                local_520 = (yyjson_doc *)((long)&local_520->root + 1);
                pyVar75 = (yyjson_doc *)((long)&local_550->root + 1);
                pyVar78 = pyVar75;
LAB_00f138cc:
                while (uVar118 = (ulong)(byte)*(code *)&pyVar78->root,
                      (char_table[uVar118] & 0xc) == 0) {
                  uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 1);
                  if ((char_table[uVar118] & 0xc) != 0) {
                    pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 1);
                    break;
                  }
                  uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 2);
                  if ((char_table[uVar118] & 0xc) != 0) {
                    pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 2);
                    break;
                  }
                  uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 3);
                  if ((char_table[uVar118] & 0xc) != 0) {
                    pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 3);
                    break;
                  }
                  uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 4);
                  if ((char_table[uVar118] & 0xc) != 0) {
                    pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 4);
                    break;
                  }
                  uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 5);
                  if ((char_table[uVar118] & 0xc) != 0) {
                    pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 5);
                    break;
                  }
                  uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 6);
                  if ((char_table[uVar118] & 0xc) != 0) {
                    pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 6);
                    break;
                  }
                  uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 7);
                  if ((char_table[uVar118] & 0xc) != 0) {
                    pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 7);
                    break;
                  }
                  uVar118 = (ulong)(byte)*(code *)&(pyVar78->alc).malloc;
                  if ((char_table[uVar118] & 0xc) != 0) {
                    pyVar78 = (yyjson_doc *)&pyVar78->alc;
                    break;
                  }
                  uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 1);
                  if ((char_table[uVar118] & 0xc) != 0) {
                    pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 1);
                    break;
                  }
                  uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 2);
                  if ((char_table[uVar118] & 0xc) != 0) {
                    pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 2);
                    break;
                  }
                  uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 3);
                  if ((char_table[uVar118] & 0xc) != 0) {
                    pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 3);
                    break;
                  }
                  uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 4);
                  if ((char_table[uVar118] & 0xc) != 0) {
                    pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 4);
                    break;
                  }
                  uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 5);
                  if ((char_table[uVar118] & 0xc) != 0) {
                    pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 5);
                    break;
                  }
                  uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 6);
                  if ((char_table[uVar118] & 0xc) != 0) {
                    pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 6);
                    break;
                  }
                  uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 7);
                  if ((char_table[uVar118] & 0xc) != 0) {
                    pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 7);
                    break;
                  }
                  pyVar78 = (yyjson_doc *)&(pyVar78->alc).realloc;
                }
                pyVar74 = pyVar78;
                if ((char)uVar118 == '\"') {
                  uStackY_580 = 0xd;
                  goto LAB_00f13b9a;
                }
                pyVar120 = local_518;
                local_528 = pyVar76;
                if ((char)uVar118 < '\0') {
                  lVar85 = 0;
                  for (; ((uVar116 = *(uint *)&pyVar78->root, (uVar116 & 0xc0c0f0) == 0x8080e0 &&
                          ((uVar116 & 0x200f) != 0)) && ((uVar116 & 0x200f) != 0x200d));
                      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 3)) {
                    lVar85 = lVar85 + -3;
                  }
                  if ((char)uVar116 < '\0') {
                    while (((uVar116 & 0xc0e0) == 0x80c0 && ((uVar116 & 0x1e) != 0))) {
                      ppyVar68 = &pyVar78->root;
                      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 2);
                      lVar85 = lVar85 + -2;
                      uVar116 = *(uint *)((long)ppyVar68 + 2);
                    }
                    while ((((uVar116 & 0xc0c0c0f8) == 0x808080f0 && ((uVar116 & 0x3007) != 0)) &&
                           (((byte)uVar116 >> 2 & (uVar116 & 0x3003) != 0) == 0))) {
                      ppyVar68 = &pyVar78->root;
                      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 4);
                      lVar85 = lVar85 + -4;
                      uVar116 = *(uint *)((long)ppyVar68 + 4);
                    }
                    if (lVar85 == 0) {
                      if ((flg & 0x40) == 0) goto LAB_00f1c707;
                      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 1);
                    }
                  }
                  goto LAB_00f138cc;
                }
LAB_00f16e08:
                if (SUB81(uVar118,0) == (code)0x5c) {
                  cVar101 = *(code *)((long)&pyVar74->root + 1);
                  switch(cVar101) {
                  case (code)0x6e:
                    *(code *)&pyVar78->root = (code)0xa;
                    break;
                  case (code)0x6f:
                  case (code)0x70:
                  case (code)0x71:
                  case (code)0x73:
                    goto switchD_00f16e5b_caseD_6f;
                  case (code)0x72:
                    *(code *)&pyVar78->root = (code)0xd;
                    break;
                  case (code)0x74:
                    *(code *)&pyVar78->root = (code)0x9;
                    break;
                  case (code)0x75:
                    uVar2 = CONCAT11(hex_conv_table[(byte)*(code *)((long)&pyVar74->root + 3)],
                                     hex_conv_table[(byte)*(code *)((long)&pyVar74->root + 5)]);
                    if (((uVar2 | CONCAT11(hex_conv_table[(byte)*(code *)((long)&pyVar74->root + 2)]
                                           ,hex_conv_table
                                            [(byte)*(code *)((long)&pyVar74->root + 4)])) & 0xf0f0)
                        != 0) goto LAB_00f1be85;
                    uVar116 = (uint)CONCAT11(hex_conv_table
                                             [(byte)*(code *)((long)&pyVar74->root + 2)],
                                             hex_conv_table
                                             [(byte)*(code *)((long)&pyVar74->root + 4)]) << 4;
                    uVar103 = uVar2 | uVar116;
                    pyVar109 = (yyjson_doc *)((long)&pyVar74->root + 6);
                    if ((uVar103 & 0xf800) != 0xd800) {
                      cVar101 = SUB41(uVar103,0);
                      if ((ushort)uVar103 < 0x800) {
                        if ((ushort)uVar103 < 0x80) {
                          *(code *)&pyVar78->root = cVar101;
                          pyVar104 = (yyjson_doc *)((long)&pyVar78->root + 1);
                        }
                        else {
                          *(byte *)&pyVar78->root = (byte)(uVar103 >> 6) | 0xc0;
                          *(byte *)((long)&pyVar78->root + 1) = (byte)cVar101 & 0x3f | 0x80;
                          pyVar104 = (yyjson_doc *)((long)&pyVar78->root + 2);
                        }
                      }
                      else {
                        *(byte *)&pyVar78->root =
                             (byte)(((uint)uVar2 | uVar116 & 0xffff) >> 0xc) | 0xe0;
                        *(byte *)((long)&pyVar78->root + 1) = (byte)(uVar103 >> 6) & 0x3f | 0x80;
                        *(byte *)((long)&pyVar78->root + 2) = (byte)cVar101 & 0x3f | 0x80;
                        pyVar104 = (yyjson_doc *)((long)&pyVar78->root + 3);
                      }
                      goto LAB_00f16f37;
                    }
                    if ((uVar103 & 0xdc00) != 0xd800) goto LAB_00f1c6f2;
                    if (*(short *)&pyVar109->root != 0x755c) goto LAB_00f1c6fe;
                    if (((CONCAT11(hex_conv_table[(byte)*(code *)((long)&(pyVar74->alc).malloc + 1)]
                                   ,hex_conv_table
                                    [(byte)*(code *)((long)&(pyVar74->alc).malloc + 3)]) |
                         CONCAT11(hex_conv_table[(byte)*(code *)&(pyVar74->alc).malloc],
                                  hex_conv_table[(byte)*(code *)((long)&(pyVar74->alc).malloc + 2)])
                         ) & 0xf0f0) != 0) goto LAB_00f1c71f;
                    uVar116 = (CONCAT11(hex_conv_table[(byte)*(code *)&(pyVar74->alc).malloc],
                                        hex_conv_table
                                        [(byte)*(code *)((long)&(pyVar74->alc).malloc + 2)]) & 0xfff
                              ) << 4 | (uint)CONCAT11(hex_conv_table
                                                      [(byte)*(code *)((long)&(pyVar74->alc).malloc
                                                                      + 1)],
                                                      hex_conv_table
                                                      [(byte)*(code *)((long)&(pyVar74->alc).malloc
                                                                      + 3)]);
                    if ((uVar116 & 0xfc00) != 0xdc00) goto LAB_00f1c728;
                    iVar102 = (uVar103 & 0xdbff) * 0x400;
                    uVar103 = iVar102 + uVar116 + 0xfca02400;
                    *(byte *)&pyVar78->root = (byte)(uVar103 >> 0x12) | 0xf0;
                    *(byte *)((long)&pyVar78->root + 1) = (byte)(uVar103 >> 0xc) & 0x3f | 0x80;
                    *(byte *)((long)&pyVar78->root + 2) =
                         (byte)(uVar116 + iVar102 + 0x400 >> 6) & 0x3f | 0x80;
                    *(byte *)((long)&pyVar78->root + 3) = (byte)uVar116 & 0x3f | 0x80;
                    pyVar109 = (yyjson_doc *)((long)&(pyVar74->alc).malloc + 4);
                    pyVar104 = (yyjson_doc *)((long)&pyVar78->root + 4);
                    goto LAB_00f16f37;
                  default:
                    if (cVar101 == (code)0x66) {
                      *(code *)&pyVar78->root = (code)0xc;
                    }
                    else if (cVar101 == (code)0x2f) {
                      *(code *)&pyVar78->root = (code)0x2f;
                    }
                    else if (cVar101 == (code)0x5c) {
                      *(code *)&pyVar78->root = (code)0x5c;
                    }
                    else if (cVar101 == (code)0x62) {
                      *(code *)&pyVar78->root = (code)0x8;
                    }
                    else {
                      if (cVar101 != (code)0x22) goto switchD_00f16e5b_caseD_6f;
                      *(code *)&pyVar78->root = (code)0x22;
                    }
                  }
                  pyVar109 = (yyjson_doc *)((long)&pyVar74->root + 2);
                  pyVar104 = (yyjson_doc *)((long)&pyVar78->root + 1);
                }
                else {
                  if ((int)uVar118 == 0x22) goto LAB_00f17858;
                  if ((flg & 0x40) == 0) goto LAB_00f1c744;
                  if (local_4d0 <= pyVar74) goto LAB_00f1c713;
                  pyVar109 = (yyjson_doc *)((long)&pyVar74->root + 1);
                  *(code *)&pyVar78->root = SUB81(uVar118,0);
                  pyVar104 = (yyjson_doc *)((long)&pyVar78->root + 1);
                }
LAB_00f16f37:
                do {
                  pyVar78 = pyVar104;
                  pyVar74 = pyVar109;
                  if ((char_table[(byte)*(code *)&pyVar109->root] & 0xc) != 0) {
LAB_00f1718a:
                    while( true ) {
                      uVar118 = (ulong)(byte)*(code *)&pyVar74->root;
                      if (-1 < (char)*(code *)&pyVar74->root) goto LAB_00f16e08;
                      lVar85 = 0;
                      pyVar104 = pyVar78;
                      for (pyVar109 = pyVar74;
                          ((uVar116 = *(uint *)&pyVar109->root, (uVar116 & 0xc0c0f0) == 0x8080e0 &&
                           ((uVar116 & 0x200f) != 0)) && ((uVar116 & 0x200f) != 0x200d));
                          pyVar109 = (yyjson_doc *)((long)&pyVar109->root + 3)) {
                        *(uint *)&pyVar104->root = uVar116;
                        pyVar104 = (yyjson_doc *)((long)&pyVar104->root + 3);
                        lVar85 = lVar85 + 3;
                      }
                      if (-1 < (char)uVar116) break;
                      while (((uVar116 & 0xc0e0) == 0x80c0 && ((uVar116 & 0x1e) != 0))) {
                        *(short *)&pyVar104->root = (short)uVar116;
                        pyVar104 = (yyjson_doc *)((long)&pyVar104->root + 2);
                        ppyVar68 = &pyVar109->root;
                        pyVar109 = (yyjson_doc *)((long)&pyVar109->root + 2);
                        lVar85 = lVar85 + 2;
                        uVar116 = *(uint *)((long)ppyVar68 + 2);
                      }
                      while ((((uVar116 & 0x3007) != 0 && ((uVar116 & 0xc0c0c0f8) == 0x808080f0)) &&
                             (((byte)uVar116 >> 2 & (uVar116 & 0x3003) != 0) == 0))) {
                        *(uint *)((long)&pyVar78->root + lVar85) = uVar116;
                        lVar117 = lVar85 + 4;
                        lVar85 = lVar85 + 4;
                        uVar116 = *(uint *)((long)&pyVar74->root + lVar117);
                      }
                      pyVar109 = (yyjson_doc *)((long)&pyVar74->root + lVar85);
                      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + lVar85);
                      pyVar104 = pyVar78;
                      if (lVar85 != 0) break;
                      if ((flg & 0x40) == 0) goto LAB_00f18e27;
LAB_00f17042:
                      *(short *)&pyVar78->root = (short)uVar116;
                      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 1);
                      pyVar74 = (yyjson_doc *)((long)&pyVar109->root + 1);
                    }
                    goto LAB_00f16f37;
                  }
                  if ((char_table[(byte)*(code *)((long)&pyVar109->root + 1)] & 0xc) != 0) {
                    uVar116 = (uint)*(ushort *)&pyVar109->root;
                    goto LAB_00f17042;
                  }
                  if ((char_table[(byte)*(code *)((long)&pyVar109->root + 2)] & 0xc) != 0) {
                    pyVar74 = (yyjson_doc *)((long)&pyVar109->root + 2);
                    *(undefined2 *)&pyVar78->root = *(undefined2 *)&pyVar109->root;
                    pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 2);
                    goto LAB_00f1718a;
                  }
                  if ((char_table[(byte)*(code *)((long)&pyVar109->root + 3)] & 0xc) != 0) {
                    pyVar74 = (yyjson_doc *)((long)&pyVar109->root + 3);
                    *(undefined4 *)&pyVar78->root = *(undefined4 *)&pyVar109->root;
                    pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 3);
                    goto LAB_00f1718a;
                  }
                  if ((char_table[(byte)*(code *)((long)&pyVar109->root + 4)] & 0xc) != 0) {
                    pyVar74 = (yyjson_doc *)((long)&pyVar109->root + 4);
                    *(undefined4 *)&pyVar78->root = *(undefined4 *)&pyVar109->root;
                    pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 4);
                    goto LAB_00f1718a;
                  }
                  if ((char_table[(byte)*(code *)((long)&pyVar109->root + 5)] & 0xc) != 0) {
                    *(undefined4 *)&pyVar78->root = *(undefined4 *)&pyVar109->root;
                    *(undefined2 *)((long)&pyVar78->root + 4) =
                         *(undefined2 *)((long)&pyVar109->root + 4);
                    pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 5);
                    pyVar74 = (yyjson_doc *)((long)&pyVar109->root + 5);
                    goto LAB_00f1718a;
                  }
                  if ((char_table[(byte)*(code *)((long)&pyVar109->root + 6)] & 0xc) != 0) {
                    *(undefined4 *)&pyVar78->root = *(undefined4 *)&pyVar109->root;
                    *(undefined2 *)((long)&pyVar78->root + 4) =
                         *(undefined2 *)((long)&pyVar109->root + 4);
                    pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 6);
                    pyVar74 = (yyjson_doc *)((long)&pyVar109->root + 6);
                    goto LAB_00f1718a;
                  }
                  if ((char_table[(byte)*(code *)((long)&pyVar109->root + 7)] & 0xc) != 0) {
                    pyVar74 = (yyjson_doc *)((long)&pyVar109->root + 7);
                    pyVar78->root = pyVar109->root;
                    pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 7);
                    goto LAB_00f1718a;
                  }
                  if ((char_table[(byte)*(code *)&(pyVar109->alc).malloc] & 0xc) != 0) {
                    pyVar74 = (yyjson_doc *)&pyVar109->alc;
                    pyVar78->root = pyVar109->root;
                    pyVar78 = (yyjson_doc *)&pyVar78->alc;
                    goto LAB_00f1718a;
                  }
                  if ((char_table[(byte)*(code *)((long)&(pyVar109->alc).malloc + 1)] & 0xc) != 0) {
                    pyVar78->root = pyVar109->root;
                    *(undefined2 *)&(pyVar78->alc).malloc = *(undefined2 *)&(pyVar109->alc).malloc;
                    pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 1);
                    pyVar74 = (yyjson_doc *)((long)&(pyVar109->alc).malloc + 1);
                    goto LAB_00f1718a;
                  }
                  if ((char_table[(byte)*(code *)((long)&(pyVar109->alc).malloc + 2)] & 0xc) != 0) {
                    pyVar78->root = pyVar109->root;
                    *(undefined2 *)&(pyVar78->alc).malloc = *(undefined2 *)&(pyVar109->alc).malloc;
                    pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 2);
                    pyVar74 = (yyjson_doc *)((long)&(pyVar109->alc).malloc + 2);
                    goto LAB_00f1718a;
                  }
                  if ((char_table[(byte)*(code *)((long)&(pyVar109->alc).malloc + 3)] & 0xc) != 0) {
                    pyVar78->root = pyVar109->root;
                    *(undefined4 *)&(pyVar78->alc).malloc = *(undefined4 *)&(pyVar109->alc).malloc;
                    pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 3);
                    pyVar74 = (yyjson_doc *)((long)&(pyVar109->alc).malloc + 3);
                    goto LAB_00f1718a;
                  }
                  if ((char_table[(byte)*(code *)((long)&(pyVar109->alc).malloc + 4)] & 0xc) != 0) {
                    pyVar78->root = pyVar109->root;
                    *(undefined4 *)&(pyVar78->alc).malloc = *(undefined4 *)&(pyVar109->alc).malloc;
                    pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 4);
                    pyVar74 = (yyjson_doc *)((long)&(pyVar109->alc).malloc + 4);
                    goto LAB_00f1718a;
                  }
                  if ((char_table[(byte)*(code *)((long)&(pyVar109->alc).malloc + 5)] & 0xc) != 0) {
                    pyVar78->root = pyVar109->root;
                    *(undefined4 *)&(pyVar78->alc).malloc = *(undefined4 *)&(pyVar109->alc).malloc;
                    *(undefined2 *)((long)&(pyVar78->alc).malloc + 4) =
                         *(undefined2 *)((long)&(pyVar109->alc).malloc + 4);
                    pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 5);
                    pyVar74 = (yyjson_doc *)((long)&(pyVar109->alc).malloc + 5);
                    goto LAB_00f1718a;
                  }
                  if ((char_table[(byte)*(code *)((long)&(pyVar109->alc).malloc + 6)] & 0xc) != 0) {
                    pyVar78->root = pyVar109->root;
                    *(undefined4 *)&(pyVar78->alc).malloc = *(undefined4 *)&(pyVar109->alc).malloc;
                    *(undefined2 *)((long)&(pyVar78->alc).malloc + 4) =
                         *(undefined2 *)((long)&(pyVar109->alc).malloc + 4);
                    pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 6);
                    pyVar74 = (yyjson_doc *)((long)&(pyVar109->alc).malloc + 6);
                    goto LAB_00f1718a;
                  }
                  bVar84 = char_table[(byte)*(code *)((long)&(pyVar109->alc).malloc + 7)];
                  p_Var77 = (_func_void_void_ptr_void_ptr *)(pyVar109->alc).malloc;
                  pyVar78->root = pyVar109->root;
                  (pyVar78->alc).malloc = (_func_void_ptr_void_ptr_size_t *)p_Var77;
                  if ((bVar84 & 0xc) != 0) {
                    pyVar74 = (yyjson_doc *)((long)&(pyVar109->alc).malloc + 7);
                    pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 7);
                    goto LAB_00f1718a;
                  }
                  pyVar109 = (yyjson_doc *)&(pyVar109->alc).realloc;
                  pyVar104 = (yyjson_doc *)&(pyVar78->alc).realloc;
                } while( true );
              }
              local_550 = (yyjson_doc *)((long)&local_550->root + 1);
              if (pyVar78 == (yyjson_doc *)0x0) {
                local_508 = local_540;
                pyVar78 = (yyjson_doc *)0x0;
              }
              else {
                if ((flg & 4) == 0) goto LAB_00f158f0;
                local_508 = local_540;
                pyVar120 = local_518;
                pyVar75 = local_548;
              }
LAB_00f1905c:
              p_Var77 = (_func_void_void_ptr_void_ptr *)(pyVar98->alc).malloc;
              (pyVar98->alc).malloc =
                   (_func_void_ptr_void_ptr_size_t *)((long)local_538 + (0x10 - (long)pyVar98));
              pyVar98->root = (yyjson_val *)((long)pyVar78 << 8 | 6);
              if (p_Var77 == (_func_void_void_ptr_void_ptr *)0x0) goto LAB_00f1a584;
              pyVar98 = (yyjson_doc *)((long)pyVar98 - (long)p_Var77);
              pyVar111 = pyVar98->root;
              if (*(code *)&local_550->root == (code)0xa) {
                local_550 = (yyjson_doc *)((long)&local_550->root + 1);
              }
              pyVar104 = local_548;
              pyVar78 = local_530;
              uVar116 = (uint)pyVar111;
            }
LAB_00f190ad:
            local_548 = pyVar104;
            pyVar98 = local_518;
            while( true ) {
              uVar2 = *(ushort *)&local_550->root;
              pyVar78 = local_520;
              pyVar109 = local_508;
              pyVar74 = local_538;
              if ((ulong)uVar2 == 0xa2c) {
                local_550 = (yyjson_doc *)((long)&local_550->root + 2);
                goto LAB_00f191bf;
              }
              if ((char)uVar2 == ',') {
                local_550 = (yyjson_doc *)((long)&local_550->root + 1);
                goto LAB_00f191bf;
              }
              local_528 = pyVar76;
              local_548 = pyVar75;
              if ((uVar2 & 0xff) == 0x7d) break;
              if ((char_table[(ulong)uVar2 & 0xff] & 1) == 0) {
                pyVar120 = local_518;
                pyVar75 = local_520;
                if ((flg & 8) == 0) goto LAB_00f19777;
                bVar70 = skip_spaces_and_comments((u8 **)&local_550);
                pyVar76 = local_528;
                pyVar75 = local_548;
                if (!bVar70) {
                  sVar71 = *(short *)&local_550->root;
                  goto LAB_00f1c88c;
                }
              }
              else {
                do {
                  local_550 = (yyjson_doc *)((long)&local_550->root + 1);
                } while ((char_table[(byte)*(code *)&local_550->root] & 1) != 0);
              }
            }
            local_550 = (yyjson_doc *)((long)&local_550->root + 1);
          }
LAB_00f1a584:
          local_528 = pyVar76;
          local_548 = pyVar75;
          if ((local_4d0 <= local_550) || ((flg & 2) != 0)) goto LAB_00f1a592;
          if ((flg & 8) == 0) {
            while ((char_table[(byte)*(code *)&local_550->root] & 1) != 0) {
              local_550 = (yyjson_doc *)((long)&local_550->root + 1);
            }
          }
          else {
            skip_spaces_and_comments((u8 **)&local_550);
            pyVar98 = local_518;
            if (*(short *)&local_550->root == 0x2a2f) goto LAB_00f1ac1f;
          }
          pyVar75 = local_4d0;
          pyVar78 = local_518;
          pyVar120 = local_550;
          if (local_4d0 <= local_550) goto LAB_00f1a592;
          bVar70 = is_truncated_end((u8 *)local_518,(u8 *)local_550,(u8 *)local_4d0,4,flg);
          if (bVar70) {
            pyVar120 = pyVar75;
          }
          pcVar88 = "unexpected content after document";
          if (bVar70) {
            pcVar88 = "unexpected end of data";
          }
          pyVar82 = local_4b8;
          if (local_4b8 == (yyjson_read_err *)0x0) {
            pyVar82 = &dummy_err;
          }
          pyVar82->pos = (long)pyVar120 - (long)pyVar78;
          goto LAB_00f1cdc2;
        }
        pyVar75 = (yyjson_doc *)0x0;
LAB_00f146d8:
        pyVar76 = local_4d0;
        pyVar120 = local_518;
        bVar70 = is_truncated_end((u8 *)local_518,(u8 *)pyVar78,(u8 *)local_4d0,2,flg);
        if (bVar70) {
          pyVar78 = pyVar76;
        }
        pcVar88 = "memory allocation failed";
        if (bVar70) {
          pcVar88 = "unexpected end of data";
        }
        pyVar82 = local_4b8;
        if (local_4b8 == (yyjson_read_err *)0x0) {
          pyVar82 = &dummy_err;
        }
        pyVar82->pos = (long)pyVar78 - (long)pyVar120;
        local_4e0->code = (uint)bVar70 * 3 + 2;
        pyVar82->msg = pcVar88;
        pyVar82 = local_4e0;
        pyVar87 = local_4b8;
        goto joined_r0x00f14751;
      }
      local_548 = (yyjson_doc *)0x0;
      uVar73 = (ulong)((long)local_4d0 - (long)pyVar78) / 6;
      uVar118 = 0xffffffffffffff7;
      if (uVar73 < 0xffffffffffffff7) {
        uVar118 = uVar73;
      }
      pyVar76 = (yyjson_doc *)0x32;
      if ((flg & 2) == 0) {
        pyVar76 = (yyjson_doc *)(uVar118 + 8);
      }
      pyVar74 = (yyjson_doc *)(*pcVar107)(local_4d8,(long)pyVar76 * 0x10);
      pyVar98 = local_548;
      if (pyVar74 != (yyjson_doc *)0x0) {
        pyVar109 = pyVar74 + 1;
        pyVar98 = (yyjson_doc *)0x0;
        if ((flg & 0xa0) != 0) {
          pyVar98 = (yyjson_doc *)local_468;
        }
        local_468 = (undefined1  [8])0x0;
        pyVar104 = (yyjson_doc *)((long)pyVar74 + ((long)pyVar76 * 0x10 - 0x20U));
        local_550 = pyVar120;
        pyVar120 = pyVar109;
        if (*(code *)&pyVar78->root != (code)0x7b) {
          pyVar74[1].root = (yyjson_val *)0x6;
          pyVar74[1].alc.malloc = (_func_void_ptr_void_ptr_size_t *)0x0;
          puVar95 = (undefined1 *)0x0;
          goto LAB_00f12707;
        }
        pyVar74[1].root = (yyjson_val *)0x7;
        pyVar74[1].alc.malloc = (_func_void_ptr_void_ptr_size_t *)0x0;
        local_4e8 = (undefined1 *)0x0;
        local_540 = pyVar104;
        pyVar78 = pyVar109;
LAB_00f1d05d:
        pyVar109 = pyVar78;
        while( true ) {
          cVar101 = *(code *)&local_550->root;
          if (cVar101 == (code)0x22) break;
          if (cVar101 == (code)0x7d) {
            local_550 = (yyjson_doc *)((long)&local_550->root + 1);
            pyVar104 = local_540;
            if (local_4e8 == (undefined1 *)0x0) {
              puVar95 = (undefined1 *)0x0;
            }
            else {
              puVar95 = local_4e8;
              local_548 = pyVar74;
              if ((flg & 4) == 0) goto LAB_00f1f33a;
            }
            do {
              p_Var108 = (pyVar109->alc).malloc;
              (pyVar109->alc).malloc =
                   (_func_void_ptr_void_ptr_size_t *)((long)pyVar120 + (0x10 - (long)pyVar109));
              pyVar109->root = (yyjson_val *)((long)puVar95 << 7 | 7);
              while( true ) {
                if (p_Var108 == (_func_void_ptr_void_ptr_size_t *)0x0) {
                  local_548 = pyVar74;
                  if ((local_4d0 <= local_550) || ((flg & 2) != 0)) goto LAB_00f1dcab;
                  if ((flg & 8) == 0) goto LAB_00f1f311;
                  skip_spaces_and_comments((u8 **)&local_550);
                  if (*(short *)&local_550->root != 0x2a2f) goto LAB_00f204e5;
                  goto LAB_00f1e9d9;
                }
                pyVar109 = (yyjson_doc *)((long)pyVar109 - (long)p_Var108);
                local_4e8 = (undefined1 *)((ulong)pyVar109->root >> 8);
                puVar95 = local_4e8;
                pyVar75 = pyVar74;
                if ((~(uint)pyVar109->root & 7) == 0) break;
LAB_00f1ce8a:
                local_548 = pyVar74;
LAB_00f1ce94:
                cVar101 = *(code *)&local_550->root;
                if (cVar101 != (code)0x5d) {
                  if (cVar101 != (code)0x2c) {
                    if ((char_table[(byte)cVar101] & 1) == 0) {
                      puVar69 = local_4e8;
                      if ((flg & 8) == 0) goto LAB_00f1efed;
                      local_540 = pyVar104;
                      local_520 = pyVar76;
                      local_4e8 = puVar95;
                      bVar70 = skip_spaces_and_comments((u8 **)&local_550);
                      puVar95 = local_4e8;
                      pyVar104 = local_540;
                      pyVar74 = local_548;
                      pyVar76 = local_520;
                      if (!bVar70) goto LAB_00f18ddc;
                    }
                    else {
                      do {
                        local_550 = (yyjson_doc *)((long)&local_550->root + 1);
                      } while ((char_table[(byte)*(code *)&local_550->root] & 1) != 0);
                    }
                    goto LAB_00f1ce94;
                  }
                  local_550 = (yyjson_doc *)((long)&local_550->root + 1);
LAB_00f12707:
                  pyVar75 = pyVar74;
                  local_548 = pyVar74;
LAB_00f12716:
                  cVar101 = *(code *)&local_550->root;
                  pyVar78 = pyVar76;
                  if ((ulong)(byte)cVar101 == 0x5b) goto LAB_00f1cddc;
                  pyVar94 = pyVar76;
                  if (cVar101 == (code)0x7b) goto LAB_00f1db49;
                  if ((char_table[(byte)cVar101] & 2) == 0) {
                    if (cVar101 == (code)0x74) {
                      pyVar120 = (yyjson_doc *)&(pyVar120->alc).realloc;
                      if (pyVar104 <= pyVar120) {
                        pyVar78 = (yyjson_doc *)((long)&pyVar76->root + ((ulong)pyVar76 >> 1));
                        sVar119 = (long)pyVar78 * 0x10;
                        local_538 = pyVar109;
                        local_500 = pyVar98;
                        pyVar75 = (yyjson_doc *)
                                  (*local_4b0)(local_4d8,pyVar75,(long)pyVar76 << 4,sVar119);
                        pyVar98 = local_548;
                        if (pyVar75 == (yyjson_doc *)0x0) goto LAB_00f1e929;
                        pyVar120 = (yyjson_doc *)
                                   (((long)pyVar120 - (long)local_548) + (long)pyVar75);
                        pyVar109 = (yyjson_doc *)
                                   (((long)local_538 - (long)local_548) + (long)pyVar75);
                        pyVar104 = (yyjson_doc *)((long)pyVar75 + (sVar119 - 0x20));
                        pyVar76 = pyVar78;
                        pyVar98 = local_500;
                      }
                      local_548 = pyVar75;
                      puVar69 = local_4e8;
                      if (*(int *)&local_550->root != 0x65757274) goto LAB_00f14f45;
                      pyVar120->root = (yyjson_val *)0xb;
                      local_550 = (yyjson_doc *)((long)&local_550->root + 4);
LAB_00f13369:
                      puVar95 = puVar95 + 1;
                      pyVar74 = pyVar75;
                      goto LAB_00f1ce8a;
                    }
                    if (cVar101 == (code)0x5d) {
                      local_550 = (yyjson_doc *)((long)&local_550->root + 1);
                      if (puVar95 == (undefined1 *)0x0) {
                        puVar95 = (undefined1 *)0x0;
                        pyVar74 = pyVar75;
                      }
                      else {
                        pyVar74 = local_548;
                        if ((flg & 4) == 0) goto LAB_00f14e5b;
                      }
                      goto LAB_00f1cf3a;
                    }
                    if (cVar101 == (code)0x66) {
                      pyVar120 = (yyjson_doc *)&(pyVar120->alc).realloc;
                      if (pyVar104 <= pyVar120) {
                        pyVar78 = (yyjson_doc *)((long)&pyVar76->root + ((ulong)pyVar76 >> 1));
                        sVar119 = (long)pyVar78 * 0x10;
                        local_538 = pyVar109;
                        local_500 = pyVar98;
                        pyVar75 = (yyjson_doc *)
                                  (*local_4b0)(local_4d8,pyVar75,(long)pyVar76 << 4,sVar119);
                        pyVar98 = local_548;
                        if (pyVar75 == (yyjson_doc *)0x0) goto LAB_00f1e929;
                        pyVar120 = (yyjson_doc *)
                                   (((long)pyVar120 - (long)local_548) + (long)pyVar75);
                        pyVar109 = (yyjson_doc *)
                                   (((long)local_538 - (long)local_548) + (long)pyVar75);
                        pyVar104 = (yyjson_doc *)((long)pyVar75 + (sVar119 - 0x20));
                        pyVar76 = pyVar78;
                        pyVar98 = local_500;
                      }
                      local_548 = pyVar75;
                      puVar69 = local_4e8;
                      if (*(int *)((long)&local_550->root + 1) == 0x65736c61) {
                        pyVar120->root = (yyjson_val *)0x3;
                        local_550 = (yyjson_doc *)((long)&local_550->root + 5);
                        goto LAB_00f13369;
                      }
                      goto LAB_00f14f45;
                    }
                    if (cVar101 == (code)0x6e) {
                      pyVar120 = (yyjson_doc *)&(pyVar120->alc).realloc;
                      if (pyVar104 <= pyVar120) {
                        pyVar78 = (yyjson_doc *)((long)&pyVar76->root + ((ulong)pyVar76 >> 1));
                        sVar119 = (long)pyVar78 * 0x10;
                        local_538 = pyVar109;
                        local_500 = pyVar98;
                        pyVar75 = (yyjson_doc *)
                                  (*local_4b0)(local_4d8,pyVar75,(long)pyVar76 << 4,sVar119);
                        pyVar98 = local_548;
                        if (pyVar75 == (yyjson_doc *)0x0) goto LAB_00f1e929;
                        pyVar120 = (yyjson_doc *)
                                   (((long)pyVar120 - (long)local_548) + (long)pyVar75);
                        pyVar109 = (yyjson_doc *)
                                   (((long)local_538 - (long)local_548) + (long)pyVar75);
                        pyVar104 = (yyjson_doc *)((long)pyVar75 + (sVar119 - 0x20));
                        pyVar76 = pyVar78;
                        pyVar98 = local_500;
                      }
                      puVar95 = puVar95 + 1;
                      uVar116 = *(uint *)&local_550->root;
                      pyVar74 = pyVar75;
                      if (uVar116 == 0x6c6c756e) {
                        pyVar120->root = (yyjson_val *)0x2;
                        local_550 = (yyjson_doc *)((long)&local_550->root + 4);
                      }
                      else {
                        local_548 = pyVar75;
                        puVar69 = local_4e8;
                        if (((((flg & 0x10) == 0) || ((uVar116 & 0xff | 0x20) != 0x6e)) ||
                            ((uVar116 >> 8 & 0xff | 0x20) != 0x61)) ||
                           ((uVar116 >> 0x10 & 0xff | 0x20) != 0x6e)) goto LAB_00f14f45;
                        pyVar78 = (yyjson_doc *)((long)&local_550->root + 3);
                        if ((flg & 0xa0) == 0) {
                          pyVar120->root = (yyjson_val *)0x14;
                          (pyVar120->alc).malloc =
                               (_func_void_ptr_void_ptr_size_t *)0x7ff8000000000000;
                          local_550 = pyVar78;
                        }
                        else {
                          if (pyVar98->root != (yyjson_val *)0x0) {
                            *(code *)&pyVar98->root->tag = (code)0x0;
                          }
                          pyVar98->root = (yyjson_val *)pyVar78;
                          pyVar120->root = (yyjson_val *)0x301;
                          (pyVar120->alc).malloc = (_func_void_ptr_void_ptr_size_t *)local_550;
                          local_550 = pyVar78;
                        }
                      }
                      goto LAB_00f1ce8a;
                    }
                    if (cVar101 == (code)0x22) {
                      pyVar120 = (yyjson_doc *)&(pyVar120->alc).realloc;
                      local_520 = pyVar76;
                      if (pyVar104 <= pyVar120) {
                        local_520 = (yyjson_doc *)((long)&pyVar76->root + ((ulong)pyVar76 >> 1));
                        sVar119 = (long)local_520 * 0x10;
                        local_500 = pyVar98;
                        pyVar75 = (yyjson_doc *)
                                  (*local_4b0)(local_4d8,pyVar75,(long)pyVar76 << 4,sVar119);
                        pyVar98 = local_548;
                        if (pyVar75 == (yyjson_doc *)0x0) goto LAB_00f1e929;
                        pyVar120 = (yyjson_doc *)
                                   (((long)pyVar120 - (long)local_548) + (long)pyVar75);
                        pyVar109 = (yyjson_doc *)
                                   (((long)pyVar109 - (long)local_548) + (long)pyVar75);
                        pyVar104 = (yyjson_doc *)((long)pyVar75 + (sVar119 - 0x20));
                        pyVar98 = local_500;
                      }
                      pyVar76 = (yyjson_doc *)((long)&local_550->root + 1);
                      uStackY_580 = 0xd;
                      pyVar78 = pyVar76;
                      goto LAB_00f13043;
                    }
                    if ((char_table[(byte)cVar101] & 1) != 0) goto LAB_00f127cd;
                    if ((((flg & 0x10) != 0) && ((byte)cVar101 - 0x49 < 0x21)) &&
                       ((0x100000021U >> ((ulong)((byte)cVar101 - 0x49) & 0x3f) & 1) != 0)) {
                      pyVar120 = (yyjson_doc *)&(pyVar120->alc).realloc;
                      local_520 = pyVar76;
                      local_500 = pyVar98;
                      if (pyVar104 <= pyVar120) {
                        local_520 = (yyjson_doc *)((long)&pyVar76->root + ((ulong)pyVar76 >> 1));
                        sVar119 = (long)local_520 * 0x10;
                        pyVar78 = (yyjson_doc *)
                                  (*local_4b0)(local_4d8,local_548,(long)pyVar76 << 4,sVar119);
                        pyVar98 = local_548;
                        if (pyVar78 == (yyjson_doc *)0x0) goto LAB_00f1e929;
                        pyVar120 = (yyjson_doc *)
                                   (((long)pyVar120 - (long)local_548) + (long)pyVar78);
                        pyVar109 = (yyjson_doc *)
                                   (((long)pyVar109 - (long)local_548) + (long)pyVar78);
                        pyVar104 = (yyjson_doc *)((long)pyVar78 + (sVar119 - 0x20));
                        cVar101 = *(code *)&local_550->root;
                        local_548 = pyVar78;
                      }
                      pyVar78 = local_550;
                      pyVar76 = local_520;
                      pyVar74 = local_548;
                      pyVar98 = local_500;
                      puVar69 = local_4e8;
                      if (cVar101 == (code)0x49) {
LAB_00f12847:
                        if ((((byte)*(code *)((long)&local_550->root + 1) | 0x20) != 0x6e) ||
                           (((byte)*(code *)((long)&local_550->root + 2) | 0x20) != 0x66)) {
                          if (((byte)cVar101 | 0x20) == 0x6e) goto LAB_00f157c9;
                          goto LAB_00f1efed;
                        }
                        pyVar75 = (yyjson_doc *)((long)&local_550->root + 3);
                        if ((((((byte)*(code *)((long)&local_550->root + 3) | 0x20) == 0x69) &&
                             (((byte)*(code *)((long)&local_550->root + 4) | 0x20) == 0x6e)) &&
                            (((byte)*(code *)((long)&local_550->root + 5) | 0x20) == 0x69)) &&
                           ((((byte)*(code *)((long)&local_550->root + 6) | 0x20) == 0x74 &&
                            (((byte)*(code *)((long)&local_550->root + 7) | 0x20) == 0x79)))) {
                          pyVar75 = (yyjson_doc *)&local_550->alc;
                        }
                        if ((flg & 0xa0) == 0) {
                          pyVar120->root = (yyjson_val *)0x14;
                          p_Var77 = (_func_void_void_ptr_void_ptr *)0x7ff0000000000000;
                          local_550 = pyVar75;
                          goto LAB_00f15f42;
                        }
                        if (local_500->root != (yyjson_val *)0x0) {
                          *(code *)&local_500->root->tag = (code)0x0;
                        }
                        local_500->root = (yyjson_val *)pyVar75;
                        pyVar120->root =
                             (yyjson_val *)(((long)pyVar75 - (long)local_550) * 0x100 + 1);
                        local_550 = pyVar75;
                      }
                      else {
                        if ((cVar101 != (code)0x4e) && (cVar101 != (code)0x6e)) {
                          if (cVar101 == (code)0x69) goto LAB_00f12847;
                          goto LAB_00f1efed;
                        }
LAB_00f157c9:
                        if ((((byte)*(code *)((long)&local_550->root + 1) | 0x20) != 0x61) ||
                           (((byte)*(code *)((long)&local_550->root + 2) | 0x20) != 0x6e))
                        goto LAB_00f1efed;
                        local_550 = (yyjson_doc *)((long)&local_550->root + 3);
                        if ((flg & 0xa0) == 0) {
                          pyVar120->root = (yyjson_val *)0x14;
                          p_Var77 = (_func_void_void_ptr_void_ptr *)0x7ff8000000000000;
LAB_00f15f42:
                          (pyVar120->alc).malloc = (_func_void_ptr_void_ptr_size_t *)p_Var77;
                          puVar95 = puVar95 + 1;
                          goto LAB_00f1ce8a;
                        }
                        if (local_500->root != (yyjson_val *)0x0) {
                          *(code *)&local_500->root->tag = (code)0x0;
                        }
                        local_500->root = (yyjson_val *)local_550;
                        pyVar120->root = (yyjson_val *)0x301;
                      }
                      (pyVar120->alc).malloc = (_func_void_ptr_void_ptr_size_t *)pyVar78;
                      puVar95 = puVar95 + 1;
                      goto LAB_00f1ce8a;
                    }
                    puVar69 = local_4e8;
                    if ((flg & 8) == 0) goto LAB_00f1efed;
                    local_540 = pyVar104;
                    local_508 = pyVar120;
                    local_4e8 = puVar95;
                    bVar70 = skip_spaces_and_comments((u8 **)&local_550);
                    puVar95 = local_4e8;
                    pyVar104 = local_540;
                    pyVar75 = local_548;
                    pyVar120 = local_508;
                    if (!bVar70) goto LAB_00f18ddc;
                    goto LAB_00f12716;
                  }
                  pyVar120 = (yyjson_doc *)&(pyVar120->alc).realloc;
                  local_520 = pyVar76;
                  if (pyVar104 <= pyVar120) {
                    local_520 = (yyjson_doc *)((long)&pyVar76->root + ((ulong)pyVar76 >> 1));
                    sVar119 = (long)local_520 * 0x10;
                    local_500 = pyVar98;
                    pyVar75 = (yyjson_doc *)
                              (*local_4b0)(local_4d8,pyVar75,(long)pyVar76 << 4,sVar119);
                    pyVar98 = local_548;
                    if (pyVar75 == (yyjson_doc *)0x0) goto LAB_00f1e929;
                    pyVar120 = (yyjson_doc *)(((long)pyVar120 - (long)local_548) + (long)pyVar75);
                    pyVar109 = (yyjson_doc *)(((long)pyVar109 - (long)local_548) + (long)pyVar75);
                    pyVar104 = (yyjson_doc *)((long)pyVar75 + (sVar119 - 0x20));
                    pyVar98 = local_500;
                  }
                  pyVar78 = local_550;
                  exp = 0;
                  local_4e8 = puVar95 + 1;
                  local_540 = pyVar104;
                  pyVar74 = pyVar75;
                  local_538 = pyVar109;
                  local_508 = pyVar120;
                  if (-1 < local_554 && (flg & 0xa0) != 0) {
                    bVar70 = read_number_raw((u8 **)&local_550,(u8 **)pyVar98,flg,
                                             (yyjson_val *)pyVar120,&msg);
                    puVar95 = local_4e8;
                    pyVar104 = local_540;
                    pyVar109 = local_538;
                    pyVar120 = local_508;
                    pyVar76 = local_520;
                    if (bVar70) goto LAB_00f1ce8a;
                    goto LAB_00f1e222;
                  }
                  cVar101 = *(code *)&local_550->root;
                  local_530 = (yyjson_doc *)CONCAT71(local_530._1_7_,cVar101);
                  uVar118 = (ulong)(cVar101 == (code)0x2d);
                  pyVar94 = (yyjson_doc *)((long)&local_550->root + uVar118);
                  cVar99 = *(code *)((long)&local_550->root + uVar118);
                  uVar73 = (ulong)(byte)cVar99;
                  pyVar76 = local_520;
                  puVar95 = local_4e8;
                  local_548 = pyVar75;
                  if ((digi_table[uVar73] & 2) != 0) {
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)(uVar73 - 0x30);
                    cVar99 = *(code *)((long)&pyVar94->root + 1);
                    uVar118 = (ulong)(byte)cVar99 - 0x30;
                    pyVar86 = pyVar94;
                    if (9 < uVar118) {
                      pyVar93 = (yyjson_doc *)((long)&pyVar94->root + 1);
                      if ((digi_table[(byte)cVar99] & 0x30) != 0) {
                        p_Var77 = (_func_void_void_ptr_void_ptr *)0x0;
                        local_528 = (yyjson_doc *)0x0;
                        pyVar96 = pyVar93;
                        local_510 = pyVar93;
                        if (cVar99 != (code)0x2e) goto LAB_00f13f63;
                        goto LAB_00f17967;
                      }
                      pyVar120->root = (yyjson_val *)((ulong)(cVar101 == (code)0x2d) * 8 + 4);
                      if (cVar101 == (code)0x2d) {
                        p_Var108 = (_func_void_ptr_void_ptr_size_t *)(0x30 - uVar73);
                      }
                      (pyVar120->alc).malloc = p_Var108;
                      local_550 = pyVar93;
                      goto LAB_00f1ce8a;
                    }
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)(uVar118 + (long)p_Var108 * 10);
                    cVar99 = *(code *)((long)&pyVar94->root + 2);
                    uVar118 = (ulong)(byte)cVar99 - 0x30;
                    if (uVar118 < 10) {
                      p_Var108 = (_func_void_ptr_void_ptr_size_t *)(uVar118 + (long)p_Var108 * 10);
                      cVar99 = *(code *)((long)&pyVar94->root + 3);
                      uVar118 = (ulong)(byte)cVar99 - 0x30;
                      if (9 < uVar118) {
                        pyVar93 = (yyjson_doc *)((long)&pyVar94->root + 3);
                        if ((digi_table[(byte)cVar99] & 0x30) != 0) {
                          p_Var77 = (_func_void_void_ptr_void_ptr *)0x0;
                          local_528 = (yyjson_doc *)0x0;
                          pyVar96 = pyVar93;
                          local_510 = pyVar93;
                          if (cVar99 == (code)0x2e) goto LAB_00f179bd;
                          goto LAB_00f13f63;
                        }
LAB_00f14c5d:
                        pyVar120->root = (yyjson_val *)((ulong)(cVar101 == (code)0x2d) * 8 + 4);
                        p_Var79 = (_func_void_ptr_void_ptr_size_t *)-(long)p_Var108;
                        if (cVar101 != (code)0x2d) {
                          p_Var79 = p_Var108;
                        }
                        goto LAB_00f14cba;
                      }
                      p_Var108 = (_func_void_ptr_void_ptr_size_t *)(uVar118 + (long)p_Var108 * 10);
                      cVar99 = *(code *)((long)&pyVar94->root + 4);
                      uVar118 = (ulong)(byte)cVar99 - 0x30;
                      if (uVar118 < 10) {
                        p_Var108 = (_func_void_ptr_void_ptr_size_t *)(uVar118 + (long)p_Var108 * 10)
                        ;
                        cVar99 = *(code *)((long)&pyVar94->root + 5);
                        uVar118 = (ulong)(byte)cVar99 - 0x30;
                        if (9 < uVar118) {
                          pyVar93 = (yyjson_doc *)((long)&pyVar94->root + 5);
                          if ((digi_table[(byte)cVar99] & 0x30) == 0) goto LAB_00f14c5d;
                          p_Var77 = (_func_void_void_ptr_void_ptr *)0x0;
                          local_528 = (yyjson_doc *)0x0;
                          pyVar96 = pyVar93;
                          local_510 = pyVar93;
                          if (cVar99 == (code)0x2e) goto LAB_00f17a13;
                          goto LAB_00f13f63;
                        }
                        p_Var108 = (_func_void_ptr_void_ptr_size_t *)(uVar118 + (long)p_Var108 * 10)
                        ;
                        cVar99 = *(code *)((long)&pyVar94->root + 6);
                        uVar118 = (ulong)(byte)cVar99 - 0x30;
                        if (uVar118 < 10) {
                          p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                                     (uVar118 + (long)p_Var108 * 10);
                          cVar99 = *(code *)((long)&pyVar94->root + 7);
                          uVar118 = (ulong)(byte)cVar99 - 0x30;
                          if (9 < uVar118) {
                            pyVar93 = (yyjson_doc *)((long)&pyVar94->root + 7);
                            if ((digi_table[(byte)cVar99] & 0x30) == 0) goto LAB_00f14c5d;
                            p_Var77 = (_func_void_void_ptr_void_ptr *)0x0;
                            local_528 = (yyjson_doc *)0x0;
                            pyVar96 = pyVar93;
                            local_510 = pyVar93;
                            if (cVar99 == (code)0x2e) goto LAB_00f17a69;
                            goto LAB_00f13f63;
                          }
                          p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                                     (uVar118 + (long)p_Var108 * 10);
                          cVar99 = *(code *)&pyVar94->alc;
                          uVar118 = (ulong)(byte)cVar99 - 0x30;
                          if (uVar118 < 10) {
                            p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                                       (uVar118 + (long)p_Var108 * 10);
                            cVar99 = *(code *)((long)&pyVar94->alc + 1);
                            uVar118 = (ulong)(byte)cVar99 - 0x30;
                            if (9 < uVar118) {
                              pyVar93 = (yyjson_doc *)((long)&pyVar94->alc + 1);
                              if ((digi_table[(byte)cVar99] & 0x30) == 0) goto LAB_00f14c5d;
                              p_Var77 = (_func_void_void_ptr_void_ptr *)0x0;
                              local_528 = (yyjson_doc *)0x0;
                              pyVar96 = pyVar93;
                              local_510 = pyVar93;
                              if (cVar99 == (code)0x2e) goto LAB_00f17abf;
                              goto LAB_00f13f63;
                            }
                            p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                                       (uVar118 + (long)p_Var108 * 10);
                            cVar99 = *(code *)((long)&pyVar94->alc + 2);
                            uVar118 = (ulong)(byte)cVar99 - 0x30;
                            if (uVar118 < 10) {
                              p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                                         (uVar118 + (long)p_Var108 * 10);
                              cVar99 = *(code *)((long)&pyVar94->alc + 3);
                              uVar118 = (ulong)(byte)cVar99 - 0x30;
                              if (9 < uVar118) {
                                pyVar93 = (yyjson_doc *)((long)&pyVar94->alc + 3);
                                if ((digi_table[(byte)cVar99] & 0x30) == 0) goto LAB_00f14c5d;
                                p_Var77 = (_func_void_void_ptr_void_ptr *)0x0;
                                local_528 = (yyjson_doc *)0x0;
                                pyVar96 = pyVar93;
                                local_510 = pyVar93;
                                if (cVar99 == (code)0x2e) goto LAB_00f17b15;
                                goto LAB_00f13f63;
                              }
                              p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                                         (uVar118 + (long)p_Var108 * 10);
                              cVar99 = *(code *)((long)&pyVar94->alc + 4);
                              uVar118 = (ulong)(byte)cVar99 - 0x30;
                              if (uVar118 < 10) {
                                p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                                           (uVar118 + (long)p_Var108 * 10);
                                cVar99 = *(code *)((long)&pyVar94->alc + 5);
                                uVar118 = (ulong)(byte)cVar99 - 0x30;
                                if (9 < uVar118) {
                                  pyVar93 = (yyjson_doc *)((long)&pyVar94->alc + 5);
                                  if ((digi_table[(byte)cVar99] & 0x30) == 0) goto LAB_00f14c5d;
                                  p_Var77 = (_func_void_void_ptr_void_ptr *)0x0;
                                  local_528 = (yyjson_doc *)0x0;
                                  pyVar96 = pyVar93;
                                  local_510 = pyVar93;
                                  if (cVar99 == (code)0x2e) goto LAB_00f17b6b;
                                  goto LAB_00f13f63;
                                }
                                p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                                           (uVar118 + (long)p_Var108 * 10);
                                cVar99 = *(code *)((long)&pyVar94->alc + 6);
                                uVar118 = (ulong)(byte)cVar99 - 0x30;
                                if (uVar118 < 10) {
                                  p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                                             (uVar118 + (long)p_Var108 * 10);
                                  cVar99 = *(code *)((long)&pyVar94->alc + 7);
                                  uVar118 = (ulong)(byte)cVar99 - 0x30;
                                  if (9 < uVar118) {
                                    pyVar93 = (yyjson_doc *)((long)&pyVar94->alc + 7);
                                    if ((digi_table[(byte)cVar99] & 0x30) == 0) goto LAB_00f14c5d;
                                    p_Var77 = (_func_void_void_ptr_void_ptr *)0x0;
                                    local_528 = (yyjson_doc *)0x0;
                                    pyVar96 = pyVar93;
                                    local_510 = pyVar93;
                                    if (cVar99 == (code)0x2e) goto LAB_00f17bc1;
                                    goto LAB_00f13f63;
                                  }
                                  p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                                             (uVar118 + (long)p_Var108 * 10);
                                  cVar99 = *(code *)((yyjson_val_uni *)&pyVar94->alc + 1);
                                  uVar118 = (ulong)(byte)cVar99 - 0x30;
                                  if (uVar118 < 10) {
                                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                                               (uVar118 + (long)p_Var108 * 10);
                                    cVar99 = *(code *)((long)&pyVar94->alc + 9);
                                    uVar118 = (ulong)(byte)cVar99 - 0x30;
                                    if (9 < uVar118) {
                                      pyVar93 = (yyjson_doc *)((long)&pyVar94->alc + 9);
                                      if ((digi_table[(byte)cVar99] & 0x30) == 0) goto LAB_00f14c5d;
                                      p_Var77 = (_func_void_void_ptr_void_ptr *)0x0;
                                      local_528 = (yyjson_doc *)0x0;
                                      pyVar96 = pyVar93;
                                      local_510 = pyVar93;
                                      if (cVar99 == (code)0x2e) goto LAB_00f17c17;
                                      goto LAB_00f13f63;
                                    }
                                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                                               (uVar118 + (long)p_Var108 * 10);
                                    cVar99 = *(code *)((long)&pyVar94->alc + 10);
                                    uVar118 = (ulong)(byte)cVar99 - 0x30;
                                    if (uVar118 < 10) {
                                      p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                                                 (uVar118 + (long)p_Var108 * 10);
                                      pyVar93 = (yyjson_doc *)((long)&pyVar94->alc + 0xb);
                                      cVar99 = *(code *)((long)&pyVar94->alc + 0xb);
                                      bVar84 = digi_table[(byte)cVar99];
                                      if ((bVar84 & 0x33) == 0) {
                                        if ((cVar101 == (code)0x2d) &&
                                           ((_func_void_ptr_void_ptr_size_t *)0x8000000000000000 <
                                            p_Var108)) {
                                          if (local_554 < '\0') {
                                            if (pyVar98->root != (yyjson_val *)0x0) {
                                              *(code *)&pyVar98->root->tag = (code)0x0;
                                            }
                                            pyVar120->root =
                                                 (yyjson_val *)
                                                 (((long)pyVar93 - (long)local_550) * 0x100 + 1);
                                            (pyVar120->alc).malloc =
                                                 (_func_void_ptr_void_ptr_size_t *)local_550;
                                            pyVar98->root = (yyjson_val *)pyVar93;
                                            local_550 = pyVar93;
                                          }
                                          else {
                                            auVar121._8_4_ = (int)((ulong)p_Var108 >> 0x20);
                                            auVar121._0_8_ = p_Var108;
                                            auVar121._12_4_ = 0x45300000;
                                            pyVar120->root = (yyjson_val *)0x14;
                                            (pyVar120->alc).malloc =
                                                 (_func_void_ptr_void_ptr_size_t *)
                                                 -((auVar121._8_8_ - 1.9342813113834067e+25) +
                                                  ((double)CONCAT44(0x43300000,(int)p_Var108) -
                                                  4503599627370496.0));
                                            local_550 = pyVar93;
                                          }
                                        }
                                        else {
                                          pyVar120->root =
                                               (yyjson_val *)
                                               ((ulong)(cVar101 == (code)0x2d) * 8 + 4);
                                          p_Var79 = (_func_void_ptr_void_ptr_size_t *)
                                                    -(long)p_Var108;
                                          if (cVar101 != (code)0x2d) {
                                            p_Var79 = p_Var108;
                                          }
                                          (pyVar120->alc).malloc = p_Var79;
                                          local_550 = pyVar93;
                                        }
                                        goto LAB_00f1ce8a;
                                      }
                                      if (((bVar84 & 3) != 0) &&
                                         ((digi_table[(byte)*(code *)((long)&pyVar94->alc + 0xc)] &
                                          0x33) == 0)) {
                                        pcVar83 = (code *)((long)&pyVar94->alc + 0xc);
                                        uVar118 = (ulong)(byte)cVar99 - 0x30;
                                        if ((p_Var108 <
                                             (_func_void_ptr_void_ptr_size_t *)0x1999999999999999)
                                           || ((p_Var108 ==
                                                (_func_void_ptr_void_ptr_size_t *)0x1999999999999999
                                               && (uVar118 < 6)))) {
                                          p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                                                     (uVar118 + (long)p_Var108 * 10);
                                          if (cVar101 == (code)0x2d) {
                                            if (local_554 < '\0') {
                                              if (pyVar98->root != (yyjson_val *)0x0) {
                                                *(code *)&pyVar98->root->tag = (code)0x0;
                                              }
                                              pyVar120->root =
                                                   (yyjson_val *)
                                                   (((long)pcVar83 - (long)local_550) * 0x100 + 1);
                                              (pyVar120->alc).malloc =
                                                   (_func_void_ptr_void_ptr_size_t *)local_550;
                                              pyVar98->root = (yyjson_val *)pcVar83;
                                              local_550 = (yyjson_doc *)pcVar83;
                                            }
                                            else {
                                              auVar122._8_4_ = (int)((ulong)p_Var108 >> 0x20);
                                              auVar122._0_8_ = p_Var108;
                                              auVar122._12_4_ = 0x45300000;
                                              pyVar120->root = (yyjson_val *)0x14;
                                              (pyVar120->alc).malloc =
                                                   (_func_void_ptr_void_ptr_size_t *)
                                                   -((auVar122._8_8_ - 1.9342813113834067e+25) +
                                                    ((double)CONCAT44(0x43300000,(int)p_Var108) -
                                                    4503599627370496.0));
                                              local_550 = (yyjson_doc *)pcVar83;
                                            }
                                          }
                                          else {
                                            pyVar120->root = (yyjson_val *)0x4;
                                            (pyVar120->alc).malloc = p_Var108;
                                            local_550 = (yyjson_doc *)pcVar83;
                                          }
                                          goto LAB_00f1ce8a;
                                        }
                                      }
                                      p_Var77 = (_func_void_void_ptr_void_ptr *)0x0;
                                      if ((bVar84 & 0x20) != 0) {
                                        local_510 = (yyjson_doc *)0x0;
                                        local_528 = (yyjson_doc *)0x0;
                                        pyVar96 = pyVar93;
                                        goto LAB_00f13f63;
                                      }
                                      pyVar86 = pyVar93;
                                      pyVar90 = (yyjson_doc *)0x0;
                                      if (cVar99 != (code)0x2e) goto LAB_00f13cb2;
                                      cVar99 = *(code *)((long)&pyVar94->alc + 0xc);
                                      pyVar86 = (yyjson_doc *)((long)&pyVar94->alc + 0xc);
                                      pyVar90 = pyVar93;
                                      if ((digi_table[(byte)cVar99] & 3) != 0) goto LAB_00f13cb2;
                                      msg = "no digit after decimal point";
                                      local_550 = pyVar86;
                                      goto LAB_00f1e222;
                                    }
                                    pyVar93 = (yyjson_doc *)((long)&pyVar94->alc + 10);
                                    if ((digi_table[(byte)cVar99] & 0x30) != 0) {
                                      p_Var77 = (_func_void_void_ptr_void_ptr *)0x0;
                                      local_528 = (yyjson_doc *)0x0;
                                      pyVar96 = pyVar93;
                                      local_510 = pyVar93;
                                      if (cVar99 == (code)0x2e) goto LAB_00f17c42;
                                      goto LAB_00f13f63;
                                    }
                                  }
                                  else {
                                    pyVar93 = (yyjson_doc *)((yyjson_val_uni *)&pyVar94->alc + 1);
                                    if ((digi_table[(byte)cVar99] & 0x30) != 0) {
                                      p_Var77 = (_func_void_void_ptr_void_ptr *)0x0;
                                      local_528 = (yyjson_doc *)0x0;
                                      pyVar96 = pyVar93;
                                      local_510 = pyVar93;
                                      if (cVar99 == (code)0x2e) goto LAB_00f17bec;
                                      goto LAB_00f13f63;
                                    }
                                  }
                                }
                                else {
                                  pyVar93 = (yyjson_doc *)((long)&pyVar94->alc + 6);
                                  if ((digi_table[(byte)cVar99] & 0x30) != 0) {
                                    p_Var77 = (_func_void_void_ptr_void_ptr *)0x0;
                                    local_528 = (yyjson_doc *)0x0;
                                    pyVar96 = pyVar93;
                                    local_510 = pyVar93;
                                    if (cVar99 == (code)0x2e) goto LAB_00f17b96;
                                    goto LAB_00f13f63;
                                  }
                                }
                              }
                              else {
                                pyVar93 = (yyjson_doc *)((long)&pyVar94->alc + 4);
                                if ((digi_table[(byte)cVar99] & 0x30) != 0) {
                                  p_Var77 = (_func_void_void_ptr_void_ptr *)0x0;
                                  local_528 = (yyjson_doc *)0x0;
                                  pyVar96 = pyVar93;
                                  local_510 = pyVar93;
                                  if (cVar99 == (code)0x2e) goto LAB_00f17b40;
                                  goto LAB_00f13f63;
                                }
                              }
                            }
                            else {
                              pyVar93 = (yyjson_doc *)((long)&pyVar94->alc + 2);
                              if ((digi_table[(byte)cVar99] & 0x30) != 0) {
                                p_Var77 = (_func_void_void_ptr_void_ptr *)0x0;
                                local_528 = (yyjson_doc *)0x0;
                                pyVar96 = pyVar93;
                                local_510 = pyVar93;
                                if (cVar99 == (code)0x2e) goto LAB_00f17aea;
                                goto LAB_00f13f63;
                              }
                            }
                          }
                          else {
                            pyVar93 = (yyjson_doc *)&pyVar94->alc;
                            if ((digi_table[(byte)cVar99] & 0x30) != 0) {
                              p_Var77 = (_func_void_void_ptr_void_ptr *)0x0;
                              local_528 = (yyjson_doc *)0x0;
                              pyVar96 = pyVar93;
                              local_510 = pyVar93;
                              if (cVar99 == (code)0x2e) goto LAB_00f17a94;
                              goto LAB_00f13f63;
                            }
                          }
                        }
                        else {
                          pyVar93 = (yyjson_doc *)((long)&pyVar94->root + 6);
                          if ((digi_table[(byte)cVar99] & 0x30) != 0) {
                            p_Var77 = (_func_void_void_ptr_void_ptr *)0x0;
                            local_528 = (yyjson_doc *)0x0;
                            pyVar96 = pyVar93;
                            local_510 = pyVar93;
                            if (cVar99 == (code)0x2e) goto LAB_00f17a3e;
                            goto LAB_00f13f63;
                          }
                        }
                      }
                      else {
                        pyVar93 = (yyjson_doc *)((long)&pyVar94->root + 4);
                        if ((digi_table[(byte)cVar99] & 0x30) != 0) {
                          p_Var77 = (_func_void_void_ptr_void_ptr *)0x0;
                          local_528 = (yyjson_doc *)0x0;
                          pyVar96 = pyVar93;
                          local_510 = pyVar93;
                          if (cVar99 == (code)0x2e) goto LAB_00f179e8;
                          goto LAB_00f13f63;
                        }
                      }
                    }
                    else {
                      pyVar93 = (yyjson_doc *)((long)&pyVar94->root + 2);
                      if ((digi_table[(byte)cVar99] & 0x30) != 0) {
                        p_Var77 = (_func_void_void_ptr_void_ptr *)0x0;
                        local_528 = (yyjson_doc *)0x0;
                        pyVar96 = pyVar93;
                        local_510 = pyVar93;
                        if (cVar99 == (code)0x2e) goto LAB_00f17992;
                        goto LAB_00f13f63;
                      }
                    }
                    pyVar120->root = (yyjson_val *)((ulong)(cVar101 == (code)0x2d) * 8 + 4);
                    p_Var79 = (_func_void_ptr_void_ptr_size_t *)-(long)p_Var108;
                    if (cVar101 != (code)0x2d) {
                      p_Var79 = p_Var108;
                    }
                    goto LAB_00f14cba;
                  }
                  if (cVar99 != (code)0x30) {
                    if ((flg & 0x10) == 0) goto LAB_00f178f4;
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               ((long)pyVar94 - (ulong)(cVar101 == (code)0x2d));
                    if (uVar73 == 0x49) {
LAB_00f1898a:
                      if ((((byte)*(code *)((long)&pyVar94->root + 1) | 0x20) == 0x6e) &&
                         (((byte)*(code *)((long)&pyVar94->root + 2) | 0x20) == 0x66)) {
                        local_550 = (yyjson_doc *)((long)&pyVar94->root + 3);
                        if (((((byte)*(code *)((long)&pyVar94->root + 3) | 0x20) == 0x69) &&
                            (((((byte)*(code *)((long)&pyVar94->root + 4) | 0x20) == 0x6e &&
                              (((byte)*(code *)((long)&pyVar94->root + 5) | 0x20) == 0x69)) &&
                             (((byte)*(code *)((long)&pyVar94->root + 6) | 0x20) == 0x74)))) &&
                           (((byte)*(code *)((long)&pyVar94->root + 7) | 0x20) == 0x79)) {
                          local_550 = (yyjson_doc *)&pyVar94->alc;
                        }
                        if ((flg & 0xa0) == 0) {
                          pyVar120->root = (yyjson_val *)0x14;
                          p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                                     (((ulong)(cVar101 != (code)0x2d) << 0x3f) + -0x10000000000000);
                        }
                        else {
                          if (pyVar98->root != (yyjson_val *)0x0) {
                            *(code *)&pyVar98->root->tag = (code)0x0;
                          }
                          pyVar98->root = (yyjson_val *)local_550;
                          pyVar120->root =
                               (yyjson_val *)(((long)local_550 - (long)p_Var108) * 0x100 + 1);
                        }
                        (pyVar120->alc).malloc = p_Var108;
                        goto LAB_00f1ce8a;
                      }
                      if (((byte)cVar99 | 0x20) != 0x6e) goto LAB_00f178f4;
                    }
                    else if ((cVar99 != (code)0x4e) && (cVar99 != (code)0x6e)) {
                      if (cVar99 == (code)0x69) goto LAB_00f1898a;
                      goto LAB_00f178f4;
                    }
                    if ((((byte)*(code *)((long)&pyVar94->root + 1) | 0x20) != 0x61) ||
                       (((byte)*(code *)((long)&pyVar94->root + 2) | 0x20) != 0x6e))
                    goto LAB_00f178f4;
                    local_550 = (yyjson_doc *)((long)&pyVar94->root + 3);
                    if ((flg & 0xa0) == 0) {
                      pyVar120->root = (yyjson_val *)0x14;
                      p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                                 (((ulong)(cVar101 != (code)0x2d) << 0x3f) + -0x8000000000000);
                    }
                    else {
                      if (pyVar98->root != (yyjson_val *)0x0) {
                        *(code *)&pyVar98->root->tag = (code)0x0;
                      }
                      pyVar98->root = (yyjson_val *)local_550;
                      pyVar120->root =
                           (yyjson_val *)((ulong)(cVar101 == (code)0x2d) * 0x100 + 0x301);
                    }
                    (pyVar120->alc).malloc = p_Var108;
                    goto LAB_00f1ce8a;
                  }
                  pyVar93 = (yyjson_doc *)((long)&pyVar94->root + 1);
                  cVar99 = *(code *)((long)&pyVar94->root + 1);
                  bVar84 = digi_table[(byte)cVar99];
                  if ((bVar84 & 0x33) == 0) {
                    pyVar120->root = (yyjson_val *)((ulong)(cVar101 == (code)0x2d) * 8 + 4);
                    (pyVar120->alc).malloc = (_func_void_ptr_void_ptr_size_t *)0x0;
                    local_550 = pyVar93;
                    goto LAB_00f1ce8a;
                  }
                  if (cVar99 != (code)0x2e) goto LAB_00f18a27;
                  if ((digi_table[(byte)*(code *)((long)&pyVar94->root + 2)] & 3) == 0)
                  goto LAB_00f20054;
                  pyVar93 = (yyjson_doc *)((long)&local_550->root + uVar118 + 1);
                  do {
                    pyVar86 = pyVar93;
                    uVar118 = (ulong)(byte)*(code *)((long)&pyVar86->root + 1);
                    pyVar93 = (yyjson_doc *)((long)&pyVar86->root + 1);
                  } while (uVar118 == 0x30);
                  bVar84 = digi_table[uVar118];
                  if ((bVar84 & 3) == 0) goto LAB_00f18a27;
                  p_Var108 = (_func_void_ptr_void_ptr_size_t *)(uVar118 - 0x30);
LAB_00f17967:
                  pyVar93 = (yyjson_doc *)((long)&pyVar94->root + 1);
                  local_510 = (yyjson_doc *)((long)&pyVar86->root + 2);
                  uVar118 = (ulong)(byte)*(code *)((long)&pyVar86->root + 2);
                  if (uVar118 - 0x30 < 10) {
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               ((uVar118 - 0x30) + (long)p_Var108 * 10);
LAB_00f17992:
                    local_510 = (yyjson_doc *)((long)&pyVar86->root + 3);
                    uVar118 = (ulong)(byte)*(code *)((long)&pyVar86->root + 3);
                    if (9 < uVar118 - 0x30) goto LAB_00f17c8e;
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               ((uVar118 - 0x30) + (long)p_Var108 * 10);
LAB_00f179bd:
                    local_510 = (yyjson_doc *)((long)&pyVar86->root + 4);
                    uVar118 = (ulong)(byte)*(code *)((long)&pyVar86->root + 4);
                    if (9 < uVar118 - 0x30) goto LAB_00f17c8e;
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               ((uVar118 - 0x30) + (long)p_Var108 * 10);
LAB_00f179e8:
                    local_510 = (yyjson_doc *)((long)&pyVar86->root + 5);
                    uVar118 = (ulong)(byte)*(code *)((long)&pyVar86->root + 5);
                    if (9 < uVar118 - 0x30) goto LAB_00f17c8e;
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               ((uVar118 - 0x30) + (long)p_Var108 * 10);
LAB_00f17a13:
                    local_510 = (yyjson_doc *)((long)&pyVar86->root + 6);
                    uVar118 = (ulong)(byte)*(code *)((long)&pyVar86->root + 6);
                    if (9 < uVar118 - 0x30) goto LAB_00f17c8e;
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               ((uVar118 - 0x30) + (long)p_Var108 * 10);
LAB_00f17a3e:
                    local_510 = (yyjson_doc *)((long)&pyVar86->root + 7);
                    uVar118 = (ulong)(byte)*(code *)((long)&pyVar86->root + 7);
                    if (9 < uVar118 - 0x30) goto LAB_00f17c8e;
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               ((uVar118 - 0x30) + (long)p_Var108 * 10);
LAB_00f17a69:
                    local_510 = (yyjson_doc *)&pyVar86->alc;
                    uVar118 = (ulong)(byte)*(code *)&pyVar86->alc;
                    if (9 < uVar118 - 0x30) goto LAB_00f17c8e;
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               ((uVar118 - 0x30) + (long)p_Var108 * 10);
LAB_00f17a94:
                    local_510 = (yyjson_doc *)((long)&pyVar86->alc + 1);
                    uVar118 = (ulong)(byte)*(code *)((long)&pyVar86->alc + 1);
                    if (9 < uVar118 - 0x30) goto LAB_00f17c8e;
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               ((uVar118 - 0x30) + (long)p_Var108 * 10);
LAB_00f17abf:
                    local_510 = (yyjson_doc *)((long)&pyVar86->alc + 2);
                    uVar118 = (ulong)(byte)*(code *)((long)&pyVar86->alc + 2);
                    if (9 < uVar118 - 0x30) goto LAB_00f17c8e;
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               ((uVar118 - 0x30) + (long)p_Var108 * 10);
LAB_00f17aea:
                    local_510 = (yyjson_doc *)((long)&pyVar86->alc + 3);
                    uVar118 = (ulong)(byte)*(code *)((long)&pyVar86->alc + 3);
                    if (9 < uVar118 - 0x30) goto LAB_00f17c8e;
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               ((uVar118 - 0x30) + (long)p_Var108 * 10);
LAB_00f17b15:
                    local_510 = (yyjson_doc *)((long)&pyVar86->alc + 4);
                    uVar118 = (ulong)(byte)*(code *)((long)&pyVar86->alc + 4);
                    if (9 < uVar118 - 0x30) goto LAB_00f17c8e;
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               ((uVar118 - 0x30) + (long)p_Var108 * 10);
LAB_00f17b40:
                    local_510 = (yyjson_doc *)((long)&pyVar86->alc + 5);
                    uVar118 = (ulong)(byte)*(code *)((long)&pyVar86->alc + 5);
                    if (9 < uVar118 - 0x30) goto LAB_00f17c8e;
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               ((uVar118 - 0x30) + (long)p_Var108 * 10);
LAB_00f17b6b:
                    local_510 = (yyjson_doc *)((long)&pyVar86->alc + 6);
                    uVar118 = (ulong)(byte)*(code *)((long)&pyVar86->alc + 6);
                    if (9 < uVar118 - 0x30) goto LAB_00f17c8e;
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               ((uVar118 - 0x30) + (long)p_Var108 * 10);
LAB_00f17b96:
                    local_510 = (yyjson_doc *)((long)&pyVar86->alc + 7);
                    uVar118 = (ulong)(byte)*(code *)((long)&pyVar86->alc + 7);
                    if (9 < uVar118 - 0x30) goto LAB_00f17c8e;
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               ((uVar118 - 0x30) + (long)p_Var108 * 10);
LAB_00f17bc1:
                    local_510 = (yyjson_doc *)((yyjson_val_uni *)&pyVar86->alc + 1);
                    uVar118 = (ulong)(byte)*(code *)((yyjson_val_uni *)&pyVar86->alc + 1);
                    if (9 < uVar118 - 0x30) goto LAB_00f17c8e;
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               ((uVar118 - 0x30) + (long)p_Var108 * 10);
LAB_00f17bec:
                    local_510 = (yyjson_doc *)((long)&pyVar86->alc + 9);
                    uVar118 = (ulong)(byte)*(code *)((long)&pyVar86->alc + 9);
                    if (9 < uVar118 - 0x30) goto LAB_00f17c8e;
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               ((uVar118 - 0x30) + (long)p_Var108 * 10);
LAB_00f17c17:
                    local_510 = (yyjson_doc *)((long)&pyVar86->alc + 10);
                    uVar118 = (ulong)(byte)*(code *)((long)&pyVar86->alc + 10);
                    if (9 < uVar118 - 0x30) goto LAB_00f17c8e;
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               ((uVar118 - 0x30) + (long)p_Var108 * 10);
LAB_00f17c42:
                    local_510 = (yyjson_doc *)((long)&pyVar86->alc + 0xb);
                    uVar118 = (ulong)(byte)*(code *)((long)&pyVar86->alc + 0xb);
                    if (9 < uVar118 - 0x30) goto LAB_00f17c8e;
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               ((uVar118 - 0x30) + (long)p_Var108 * 10);
                    cVar99 = *(code *)((long)&pyVar86->alc + 0xc);
                    uVar118 = (ulong)(byte)cVar99;
                    local_510 = (yyjson_doc *)((long)&pyVar86->alc + 0xc);
                    pyVar86 = local_510;
                    pyVar90 = pyVar93;
                    if ((digi_table[uVar118] & 3) == 0) goto LAB_00f17c8e;
LAB_00f13cb2:
                    pyVar111 = (yyjson_val *)((long)pyVar86 * 0x100 + (long)local_550 * -0x100 + 1);
                    pyVar94 = (yyjson_doc *)((long)&pyVar86->root + 1);
                    do {
                      pyVar75 = pyVar94;
                      bVar84 = digi_table[(byte)*(code *)&pyVar75->root];
                      pyVar94 = (yyjson_doc *)((long)&pyVar75->root + 1);
                      pyVar111 = pyVar111 + 0x10;
                    } while ((bVar84 & 3) != 0);
                    p_Var108 = p_Var108 + (0x34 < (byte)cVar99);
                    pyVar93 = pyVar90;
                    pyVar96 = pyVar75;
                    if (pyVar90 != (yyjson_doc *)0x0) {
LAB_00f13f0d:
                      pyVar75 = pyVar96;
                      do {
                        do {
                          pyVar75 = (yyjson_doc *)((long)&pyVar75[-1].str_pool + 7);
                        } while (*(code *)&pyVar75->root == (code)0x30);
                      } while (*(code *)&pyVar75->root == (code)0x2e);
                      p_Var77 = (_func_void_void_ptr_void_ptr *)
                                ((long)pyVar93 + ((ulong)(pyVar93 < pyVar86) - (long)pyVar86));
                      local_528 = pyVar86;
                      local_510 = pyVar96;
                      if (pyVar75 < pyVar86) {
                        local_528 = (yyjson_doc *)0x0;
                        local_510 = (yyjson_doc *)0x0;
                      }
                      if ((bVar84 & 0x20) != 0) goto LAB_00f13f63;
                      goto LAB_00f14005;
                    }
                    if ((-1 < local_554) || ((bVar84 & 0x30) != 0)) {
                      pyVar93 = pyVar75;
                      if (*(code *)&pyVar75->root != (code)0x2e) goto LAB_00f13f0d;
                      if ((digi_table[(byte)*(code *)&pyVar94->root] & 3) != 0) {
                        do {
                          pyVar96 = (yyjson_doc *)((long)&pyVar75->root + 1);
                          bVar84 = digi_table[(byte)*(code *)((long)&pyVar75->root + 1)];
                          pyVar75 = pyVar96;
                        } while ((bVar84 & 3) != 0);
                        goto LAB_00f13f0d;
                      }
                      goto LAB_00f1e204;
                    }
                    if (pyVar98->root != (yyjson_val *)0x0) {
                      *(code *)&pyVar98->root->tag = (code)0x0;
                    }
                    pyVar120->root = pyVar111;
                    (pyVar120->alc).malloc = (_func_void_ptr_void_ptr_size_t *)local_550;
                    pyVar98->root = (yyjson_val *)pyVar75;
                    local_550 = pyVar75;
                    goto LAB_00f1ce8a;
                  }
LAB_00f17c8e:
                  if ((yyjson_doc *)((long)&pyVar93->root + 1U) == local_510) goto LAB_00f2040c;
                  p_Var77 = (_func_void_void_ptr_void_ptr *)((long)pyVar93 + (1 - (long)local_510));
                  local_528 = (yyjson_doc *)0x0;
                  pyVar96 = local_510;
                  if ((digi_table[uVar118] & 0x20) == 0) {
                    local_528 = (yyjson_doc *)0x0;
                    if ((long)p_Var77 < -0x157) {
                      pyVar120->root = (yyjson_val *)0x14;
                      (pyVar120->alc).malloc =
                           (_func_void_ptr_void_ptr_size_t *)
                           ((ulong)(cVar101 == (code)0x2d) << 0x3f);
                      local_550 = local_510;
                    }
                    else {
LAB_00f14029:
                      exp = (i32)p_Var77;
                      if (((ulong)p_Var108 >> 0x35 == 0) && (exp + 0x16U < 0x2d)) {
                        if (exp < 0) {
                          p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                                     ((double)(long)p_Var108 /
                                     *(double *)(f64_pow10_table + (ulong)(uint)-exp * 8));
                        }
                        else {
                          p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                                     ((double)(long)p_Var108 *
                                     *(double *)(f64_pow10_table + (ulong)(exp & 0x7fffffff) * 8));
                        }
                        pyVar120->root = (yyjson_val *)0x14;
                        p_Var79 = (_func_void_ptr_void_ptr_size_t *)
                                  ((ulong)p_Var108 ^ 0x8000000000000000);
                        if (cVar101 != (code)0x2d) {
                          p_Var79 = p_Var108;
                        }
                        (pyVar120->alc).malloc = p_Var79;
                        local_550 = pyVar96;
                      }
                      else {
                        local_500 = pyVar98;
                        if ((exp + 0x132U < 0x252) && (local_528 == (yyjson_doc *)0x0)) {
                          lVar85 = (long)(exp * 2 + 0x2ae);
                          uVar118 = 0x3f;
                          if (p_Var108 != (_func_void_ptr_void_ptr_size_t *)0x0) {
                            for (; (ulong)p_Var108 >> uVar118 == 0; uVar118 = uVar118 - 1) {
                            }
                          }
                          iVar102 = (int)(uVar118 ^ 0x3f);
                          uVar118 = (long)p_Var108 << ((byte)(uVar118 ^ 0x3f) & 0x3f);
                          auVar3._8_8_ = 0;
                          auVar3._0_8_ = uVar118;
                          auVar23._8_8_ = 0;
                          auVar23._0_8_ = *(ulong *)(pow10_sig_table + lVar85 * 8);
                          auVar3 = auVar3 * auVar23;
                          lVar91 = auVar3._8_8_;
                          uVar73 = auVar3._0_8_;
                          iVar115 = exp * 0x3526a + -0x3f0000 >> 0x10;
                          if (0x1fd < (ulong)(auVar3._8_4_ & 0x1ff) - 1) {
                            lVar117 = (long)(exp * 2 + 0x2af);
                            auVar4._8_8_ = 0;
                            auVar4._0_8_ = uVar118;
                            auVar24._8_8_ = 0;
                            auVar24._0_8_ = *(ulong *)(pow10_sig_table + lVar117 * 8);
                            lVar92 = SUB168(auVar4 * auVar24,8);
                            if (0xfffffffffffffffd < (lVar92 + uVar73) - 1) goto LAB_00f15b80;
                            lVar91 = lVar91 + (ulong)(lVar92 + uVar73 < uVar73);
                          }
                          uVar118 = lVar91 << (-1 < lVar91);
                          uVar118 = (uVar118 & 0x400) + uVar118;
                          pyVar120->root = (yyjson_val *)0x14;
                          (pyVar120->alc).malloc =
                               (_func_void_ptr_void_ptr_size_t *)
                               ((ulong)(cVar101 == (code)0x2d) << 0x3f |
                               uVar118 >> 0xb & 0xfffffffffffff |
                               (ulong)(((iVar115 - iVar102) - (uint)(-1 < lVar91)) + 0x47e +
                                      (uint)(uVar118 < 0x400)) << 0x34);
                          local_550 = pyVar96;
                        }
                        else {
                          uVar118 = 0x3f;
                          if (p_Var108 != (_func_void_ptr_void_ptr_size_t *)0x0) {
                            for (; (ulong)p_Var108 >> uVar118 == 0; uVar118 = uVar118 - 1) {
                            }
                          }
                          iVar102 = (int)(uVar118 ^ 0x3f);
                          uVar118 = (long)p_Var108 << ((byte)(uVar118 ^ 0x3f) & 0x3f);
                          lVar85 = (long)(exp * 2 + 0x2ae);
                          lVar117 = (long)(exp * 2 + 0x2af);
                          iVar115 = exp * 0x3526a + -0x3f0000 >> 0x10;
LAB_00f15b80:
                          lVar91 = ((ulong)(local_528 != (yyjson_doc *)0x0) << 2) <<
                                   ((byte)iVar102 & 0x3f);
                          auVar7._8_8_ = 0;
                          auVar7._0_8_ = uVar118;
                          auVar27._8_8_ = 0;
                          auVar27._0_8_ =
                               *(long *)(pow10_sig_table + lVar85 * 8) -
                               (*(long *)(pow10_sig_table + lVar117 * 8) >> 0x3f);
                          uVar73 = SUB168(auVar7 * auVar27,8) - (SUB168(auVar7 * auVar27,0) >> 0x3f)
                          ;
                          uVar118 = 0x3f;
                          if (uVar73 != 0) {
                            for (; uVar73 >> uVar118 == 0; uVar118 = uVar118 - 1) {
                            }
                          }
                          bVar84 = (byte)(uVar118 ^ 0x3f);
                          uVar73 = uVar73 << (bVar84 & 0x3f);
                          uVar112 = (9 - (ulong)(lVar91 == 0)) + lVar91 << (bVar84 & 0x3f);
                          uVar116 = ((iVar115 - (int)(uVar118 ^ 0x3f)) - iVar102) + 0x40;
                          uStackY_580._0_4_ = 0xb;
                          if (((int)uVar116 < -0x43d) &&
                             ((uStackY_580._0_4_ = 0x40, uVar116 < 0xfffffb8f ||
                              (uStackY_580._0_4_ = -0x432 - uVar116, uVar116 < 0xfffffb92)))) {
                            bVar84 = (char)(int)uStackY_580 - 0x3c;
                            uVar73 = uVar73 >> (bVar84 & 0x3f);
                            uVar116 = (uVar116 + (int)uStackY_580) - 0x3c;
                            uVar112 = (uVar112 >> (bVar84 & 0x3f)) + 9;
                            uStackY_580._0_4_ = 0x3c;
                          }
                          bVar84 = (byte)(int)uStackY_580;
                          lVar85 = 8L << (bVar84 - 1 & 0x3f);
                          uVar105 = (~(-1L << (bVar84 & 0x3f)) & uVar73) * 8;
                          uVar118 = lVar85 + uVar112;
                          uVar97 = 0;
                          uVar73 = (ulong)(uVar118 <= uVar105) + (uVar73 >> (bVar84 & 0x3f));
                          if (uVar73 == 0) {
LAB_00f15c8a:
                            if ((lVar85 - uVar112 < uVar105) && (uVar105 < uVar118)) {
                              iVar102 = -0x433;
                              if (0xfffffffffffff < uVar97) {
                                iVar102 = (uint)(uVar97 >> 0x34) - 0x434;
                              }
                              local_4f0 = (yyjson_doc *)CONCAT44(local_4f0._4_4_,iVar102);
                              uVar118 = (uVar97 & 0xfffffffffffff) + 0x10000000000000;
                              if (0xfffffffffffff >= uVar97) {
                                uVar118 = uVar97;
                              }
                              local_4a8 = uVar97;
                              bigint_set_buf(&big_full,(u64)p_Var108,&exp,(u8 *)local_528,
                                             (u8 *)local_510,(u8 *)pyVar93);
                              local_230[0] = uVar118 * 2 + 1;
                              iVar102 = exp;
                              if (exp < 0) {
                                uVar116 = 1;
                                for (iVar102 = -exp; uVar118 = (ulong)uVar116, 0x12 < iVar102;
                                    iVar102 = iVar102 + -0x13) {
                                  for (uVar73 = 0;
                                      (uVar112 = uVar118, uVar118 != uVar73 &&
                                      (uVar112 = uVar73,
                                      *(long *)((long)local_238 + (uVar73 + 1) * 8) == 0));
                                      uVar73 = uVar73 + 1) {
                                  }
                                  uVar73 = 0;
                                  for (; auVar52._8_8_ = 0, auVar52._0_8_ = uVar73,
                                      uVar112 < uVar118; uVar112 = uVar112 + 1) {
                                    auVar30._8_8_ = 0;
                                    auVar30._0_8_ = *(ulong *)((long)local_238 + (uVar112 + 1) * 8);
                                    auVar52 = ZEXT816(10000000000000000000) * auVar30 + auVar52;
                                    uVar73 = auVar52._8_8_;
                                    *(long *)((long)local_238 + (uVar112 + 1) * 8) = auVar52._0_8_;
                                  }
                                  if (uVar73 != 0) {
                                    uVar116 = uVar116 + 1;
                                    *(ulong *)((long)local_238 + (uVar118 + 1) * 8) = uVar73;
                                  }
                                }
                                if (iVar102 != 0) {
                                  uVar73 = *(ulong *)(u64_pow10_table + (long)iVar102 * 8);
                                  for (uVar112 = 0;
                                      (uVar97 = uVar118, uVar118 != uVar112 &&
                                      (uVar97 = uVar112,
                                      *(long *)((long)local_238 + (uVar112 + 1) * 8) == 0));
                                      uVar112 = uVar112 + 1) {
                                  }
                                  uVar112 = 0;
                                  for (; auVar56._8_8_ = 0, auVar56._0_8_ = uVar112,
                                      uVar97 < uVar118; uVar97 = uVar97 + 1) {
                                    auVar10._8_8_ = 0;
                                    auVar10._0_8_ = uVar73;
                                    auVar34._8_8_ = 0;
                                    auVar34._0_8_ = *(ulong *)((long)local_238 + (uVar97 + 1) * 8);
                                    auVar56 = auVar10 * auVar34 + auVar56;
                                    uVar112 = auVar56._8_8_;
                                    *(long *)((long)local_238 + (uVar97 + 1) * 8) = auVar56._0_8_;
                                  }
                                  if (uVar112 != 0) {
                                    uVar116 = uVar116 + 1;
                                    local_238[0] = uVar116;
                                    *(ulong *)((long)local_238 + (uVar118 + 1) * 8) = uVar112;
                                  }
                                }
                              }
                              else {
                                for (; uVar118 = (ulong)big_full.used, 0x12 < iVar102;
                                    iVar102 = iVar102 + -0x13) {
                                  for (uVar73 = 0;
                                      (uVar112 = uVar118, uVar118 != uVar73 &&
                                      (uVar112 = uVar73, big_full.bits[uVar73] == 0));
                                      uVar73 = uVar73 + 1) {
                                  }
                                  uVar73 = 0;
                                  for (; auVar51._8_8_ = 0, auVar51._0_8_ = uVar73,
                                      uVar112 < uVar118; uVar112 = uVar112 + 1) {
                                    auVar29._8_8_ = 0;
                                    auVar29._0_8_ = big_full.bits[uVar112];
                                    auVar51 = ZEXT816(10000000000000000000) * auVar29 + auVar51;
                                    uVar73 = auVar51._8_8_;
                                    big_full.bits[uVar112] = auVar51._0_8_;
                                  }
                                  if (uVar73 != 0) {
                                    big_full.used = big_full.used + 1;
                                    big_full.bits[uVar118] = uVar73;
                                  }
                                }
                                uVar116 = 1;
                                if (iVar102 != 0) {
                                  uVar73 = *(ulong *)(u64_pow10_table + (long)iVar102 * 8);
                                  for (uVar112 = 0;
                                      (uVar97 = uVar118, uVar118 != uVar112 &&
                                      (uVar97 = uVar112, big_full.bits[uVar112] == 0));
                                      uVar112 = uVar112 + 1) {
                                  }
                                  uVar112 = 0;
                                  for (; auVar54._8_8_ = 0, auVar54._0_8_ = uVar112,
                                      uVar97 < uVar118; uVar97 = uVar97 + 1) {
                                    auVar9._8_8_ = 0;
                                    auVar9._0_8_ = uVar73;
                                    auVar32._8_8_ = 0;
                                    auVar32._0_8_ = big_full.bits[uVar97];
                                    auVar54 = auVar9 * auVar32 + auVar54;
                                    uVar112 = auVar54._8_8_;
                                    big_full.bits[uVar97] = auVar54._0_8_;
                                  }
                                  if (uVar112 != 0) {
                                    big_full.used = big_full.used + 1;
                                    big_full.bits[uVar118] = uVar112;
                                  }
                                }
                              }
                              if ((int)(uint)local_4f0 < 1) {
                                uVar103 = -(uint)local_4f0 >> 6;
                                uVar118 = (ulong)uVar103;
                                uVar73 = (ulong)big_full.used;
                                uVar110 = -(uint)local_4f0 & 0x3f;
                                if (uVar110 == 0) {
                                  while (uVar73 != 0) {
                                    big_full.bits[(int)uVar73 + (uVar103 - 1)] =
                                         big_full.bits[uVar73 - 1];
                                    uVar73 = uVar73 - 1;
                                  }
                                  big_full.used = big_full.used + uVar103;
                                  while (uVar118 != 0) {
                                    big_full.bits[uVar118 - 1] = 0;
                                    uVar118 = uVar118 - 1;
                                  }
                                }
                                else {
                                  big_full.bits[uVar73] = 0;
                                  sVar67 = (sbyte)uVar110;
                                  uVar110 = big_full.used + uVar103;
                                  while (uVar112 = uVar73 - 1, uVar112 != 0xffffffffffffffff) {
                                    big_full.bits[uVar110] =
                                         big_full.bits[uVar112 & 0xffffffff] >>
                                         (0x40U - sVar67 & 0x3f) | big_full.bits[uVar73] << sVar67;
                                    uVar110 = uVar110 - 1;
                                    uVar73 = uVar112;
                                  }
                                  big_full.bits[uVar118] = big_full.bits[0] << sVar67;
                                  big_full.used =
                                       (big_full.used + uVar103 + 1) -
                                       (uint)(big_full.bits[big_full.used + uVar103] == 0);
                                  while (uVar118 != 0) {
                                    big_full.bits[uVar118 - 1] = 0;
                                    uVar118 = uVar118 - 1;
                                  }
                                }
                              }
                              else {
                                uVar103 = (uint)local_4f0 >> 6;
                                uVar118 = (ulong)uVar103;
                                uVar73 = (ulong)uVar116;
                                bVar84 = (byte)local_4f0 & 0x3f;
                                if (((ulong)local_4f0 & 0x3f) == 0) {
                                  while (uVar73 != 0) {
                                    *(undefined8 *)
                                     ((long)local_238 +
                                     ((ulong)((int)uVar73 + (uVar103 - 1)) + 1) * 8) =
                                         *(undefined8 *)((long)local_238 + uVar73 * 8);
                                    uVar73 = uVar73 - 1;
                                  }
                                  uVar116 = uVar116 + uVar103;
                                  while (uVar118 != 0) {
                                    *(undefined8 *)((long)local_238 + uVar118 * 8) = 0;
                                    uVar118 = uVar118 - 1;
                                  }
                                }
                                else {
                                  *(undefined8 *)((long)local_238 + (uVar73 + 1) * 8) = 0;
                                  uVar110 = uVar116 + uVar103;
                                  while (uVar112 = uVar73 - 1, uVar112 != 0xffffffffffffffff) {
                                    *(ulong *)((long)local_238 + ((ulong)uVar110 + 1) * 8) =
                                         *(ulong *)((long)local_238 +
                                                   ((uVar112 & 0xffffffff) + 1) * 8) >>
                                         (0x40 - bVar84 & 0x3f) |
                                         *(long *)((long)local_238 + (uVar73 + 1) * 8) << bVar84;
                                    uVar110 = uVar110 - 1;
                                    uVar73 = uVar112;
                                  }
                                  *(long *)((long)local_238 + (uVar118 + 1) * 8) =
                                       local_230[0] << bVar84;
                                  uVar116 = (uVar116 + uVar103 + 1) -
                                            (uint)(*(long *)((long)local_238 +
                                                            ((ulong)(uVar116 + uVar103) + 1) * 8) ==
                                                  0);
                                  while (uVar118 != 0) {
                                    *(undefined8 *)((long)local_238 + uVar118 * 8) = 0;
                                    uVar118 = uVar118 - 1;
                                  }
                                }
                              }
                              uVar73 = (ulong)big_full.used;
                              uVar118 = 0;
                              if ((uVar116 <= big_full.used) &&
                                 (uVar118 = 1, big_full.used <= uVar116)) {
                                do {
                                  if (uVar73 == 0) {
                                    uVar118 = (ulong)((uint)local_4a8 & 1);
                                    break;
                                  }
                                  puVar1 = (ulong *)((long)local_238 + uVar73 * 8);
                                  lVar85 = uVar73 - 1;
                                  if (big_full.bits[lVar85] < *puVar1) {
                                    uVar118 = 0;
                                    break;
                                  }
                                  uVar73 = uVar73 - 1;
                                } while (big_full.bits[lVar85] <= *puVar1);
                              }
                              if (uVar118 + local_4a8 != 0x7ff0000000000000) {
                                local_508->root = (yyjson_val *)0x14;
                                p_Var77 = (_func_void_void_ptr_void_ptr *)
                                          (uVar118 + local_4a8 |
                                          (ulong)((char)local_530 == '-') << 0x3f);
                                goto LAB_00f1862f;
                              }
                              if (-1 < local_554) {
                                if ((flg & 0x10) != 0) {
                                  local_508->root = (yyjson_val *)0x14;
                                  p_Var77 = (_func_void_void_ptr_void_ptr *)0x7ff0000000000000;
                                  if ((char)local_530 == '-') {
                                    p_Var77 = (_func_void_void_ptr_void_ptr *)0xfff0000000000000;
                                  }
                                  goto LAB_00f1862f;
                                }
                                goto LAB_00f161f8;
                              }
LAB_00f18689:
                              if (local_500->root != (yyjson_val *)0x0) {
                                *(code *)&local_500->root->tag = (code)0x0;
                              }
                              local_508->root =
                                   (yyjson_val *)(((long)pyVar96 - (long)pyVar78) * 0x100 + 1);
                              (local_508->alc).malloc = (_func_void_ptr_void_ptr_size_t *)pyVar78;
                              local_500->root = (yyjson_val *)pyVar96;
                              puVar95 = local_4e8;
                              pyVar104 = local_540;
                              pyVar109 = local_538;
                              pyVar74 = local_548;
                              pyVar120 = local_508;
                              pyVar98 = local_500;
                              pyVar76 = local_520;
                              local_550 = pyVar96;
                            }
                            else {
                              pyVar120->root = (yyjson_val *)0x14;
                              (pyVar120->alc).malloc =
                                   (_func_void_ptr_void_ptr_size_t *)
                                   (uVar97 | (ulong)(cVar101 == (code)0x2d) << 0x3f);
                              local_550 = pyVar96;
                            }
                          }
                          else {
                            uVar97 = 0x3f;
                            if (uVar73 != 0) {
                              for (; uVar73 >> uVar97 == 0; uVar97 = uVar97 - 1) {
                              }
                            }
                            uVar116 = (uVar116 + (int)uStackY_580) - (int)(uVar97 ^ 0x3f);
                            if ((int)uVar116 < 0x3c1) {
                              uVar73 = (uVar73 << ((byte)(uVar97 ^ 0x3f) & 0x3f)) >> 0xb;
                              if ((int)uVar116 < -0x43d) {
                                uVar97 = 0;
                                if (0xfffffb8e < uVar116) {
                                  uVar97 = uVar73 >> (-(char)uVar116 - 0x3dU & 0x3f);
                                }
                              }
                              else {
                                uVar97 = uVar73 & 0xfffffffffffff | (ulong)(uVar116 + 0x43e) << 0x34
                                ;
                                if (uVar97 == 0x7ff0000000000000) goto LAB_00f161e2;
                              }
                              goto LAB_00f15c8a;
                            }
LAB_00f161e2:
                            if (local_554 < '\0') goto LAB_00f18689;
                            if ((flg & 0x10) == 0) goto LAB_00f161f8;
                            pyVar120->root = (yyjson_val *)0x14;
                            p_Var77 = (_func_void_void_ptr_void_ptr *)
                                      (((ulong)(cVar101 != (code)0x2d) << 0x3f) + -0x10000000000000)
                            ;
LAB_00f1862f:
                            (local_508->alc).malloc = (_func_void_ptr_void_ptr_size_t *)p_Var77;
                            puVar95 = local_4e8;
                            pyVar104 = local_540;
                            pyVar109 = local_538;
                            pyVar74 = local_548;
                            pyVar120 = local_508;
                            pyVar98 = local_500;
                            pyVar76 = local_520;
                            local_550 = pyVar96;
                          }
                        }
                      }
                    }
                    goto LAB_00f1ce8a;
                  }
LAB_00f13f63:
                  cVar99 = *(code *)((long)&pyVar96->root + 1);
                  uVar118 = (ulong)((digi_table[(byte)cVar99] & 0xc) != 0);
                  if ((digi_table[(byte)*(code *)((long)&pyVar96->root + uVar118 + 1)] & 3) == 0)
                  goto LAB_00f1ea43;
                  pyVar96 = (yyjson_doc *)((long)&pyVar96->root + uVar118);
                  pyVar111 = (yyjson_val *)((long)pyVar96 * 0x100 + (long)local_550 * -0x100 + 1);
                  do {
                    cVar89 = *(code *)((long)&pyVar96->root + 1);
                    pyVar96 = (yyjson_doc *)((long)&pyVar96->root + 1);
                    pyVar111 = pyVar111 + 0x10;
                  } while (cVar89 == (code)0x30);
                  lVar117 = 0;
                  lVar85 = 0;
                  while ((digi_table[(byte)cVar89] & 3) != 0) {
                    lVar85 = lVar85 * 10 + (ulong)(byte)((char)cVar89 - 0x30);
                    cVar89 = *(code *)((long)&pyVar96->root + 1);
                    pyVar96 = (yyjson_doc *)((long)&pyVar96->root + 1);
                    pyVar111 = pyVar111 + 0x10;
                    lVar117 = lVar117 + 1;
                  }
                  if (lVar117 < 0x13) {
                    lVar117 = -lVar85;
                    if (cVar99 != (code)0x2d) {
                      lVar117 = lVar85;
                    }
                    p_Var77 = p_Var77 + lVar117;
LAB_00f14005:
                    if ((long)p_Var77 < -0x157) {
                      pyVar120->root = (yyjson_val *)0x14;
                      (pyVar120->alc).malloc =
                           (_func_void_ptr_void_ptr_size_t *)
                           ((ulong)(cVar101 == (code)0x2d) << 0x3f);
                      local_550 = pyVar96;
                    }
                    else {
                      if ((long)p_Var77 < 0x135) goto LAB_00f14029;
                      if (local_554 < '\0') {
                        if (pyVar98->root != (yyjson_val *)0x0) {
                          *(code *)&pyVar98->root->tag = (code)0x0;
                        }
                        pyVar120->root =
                             (yyjson_val *)(((long)pyVar96 - (long)local_550) * 0x100 + 1);
                        (pyVar120->alc).malloc = (_func_void_ptr_void_ptr_size_t *)local_550;
                        pyVar98->root = (yyjson_val *)pyVar96;
                        local_550 = pyVar96;
                      }
                      else {
                        if ((flg & 0x10) == 0) goto LAB_00f15cfd;
                        pyVar120->root = (yyjson_val *)0x14;
                        (pyVar120->alc).malloc =
                             (_func_void_ptr_void_ptr_size_t *)
                             (((ulong)(cVar101 != (code)0x2d) << 0x3f) + -0x10000000000000);
                        local_550 = pyVar96;
                      }
                    }
                    goto LAB_00f1ce8a;
                  }
                  if (cVar99 == (code)0x2d) {
                    pyVar120->root = (yyjson_val *)0x14;
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               ((ulong)(cVar101 == (code)0x2d) << 0x3f);
                  }
                  else {
                    if (local_554 < '\0') {
                      if (pyVar98->root != (yyjson_val *)0x0) {
                        *(code *)&pyVar98->root->tag = (code)0x0;
                      }
                      pyVar120->root = pyVar111;
                      (pyVar120->alc).malloc = (_func_void_ptr_void_ptr_size_t *)local_550;
                      pyVar98->root = (yyjson_val *)pyVar96;
                      local_550 = pyVar96;
                      goto LAB_00f1ce8a;
                    }
                    if ((flg & 0x10) == 0) goto LAB_00f15cfd;
                    pyVar120->root = (yyjson_val *)0x14;
                    p_Var108 = (_func_void_ptr_void_ptr_size_t *)
                               (((ulong)(cVar101 != (code)0x2d) << 0x3f) + -0x10000000000000);
                  }
                  (pyVar120->alc).malloc = p_Var108;
                  local_550 = pyVar96;
                  goto LAB_00f1ce8a;
                }
                local_550 = (yyjson_doc *)((long)&local_550->root + 1);
LAB_00f1cf3a:
                p_Var108 = (pyVar109->alc).malloc;
                (pyVar109->alc).malloc =
                     (_func_void_ptr_void_ptr_size_t *)((long)pyVar120 + (0x10 - (long)pyVar109));
                pyVar109->root = (yyjson_val *)((long)puVar95 << 8 | 6);
              }
LAB_00f1cf7f:
              pyVar78 = pyVar109;
              pyVar74 = pyVar75;
              while( true ) {
                cVar101 = *(code *)&local_550->root;
                if (cVar101 == (code)0x2c) {
                  local_550 = (yyjson_doc *)((long)&local_550->root + 1);
                  local_540 = pyVar104;
                  goto LAB_00f1d05d;
                }
                if (cVar101 == (code)0x7d) break;
                local_548 = pyVar74;
                local_520 = pyVar76;
                local_538 = pyVar78;
                local_508 = pyVar120;
                if ((char_table[(byte)cVar101] & 1) == 0) {
                  local_540 = pyVar104;
                  puVar69 = local_4e8;
                  if ((flg & 8) == 0) goto LAB_00f1efed;
                  bVar70 = skip_spaces_and_comments((u8 **)&local_550);
                  pyVar104 = local_540;
                  pyVar78 = local_538;
                  pyVar74 = local_548;
                  pyVar120 = local_508;
                  pyVar76 = local_520;
                  if (!bVar70) goto LAB_00f18ddc;
                }
                else {
                  do {
                    local_550 = (yyjson_doc *)((long)&local_550->root + 1);
                    local_540 = pyVar104;
                  } while ((char_table[(byte)*(code *)&local_550->root] & 1) != 0);
                }
              }
              local_550 = (yyjson_doc *)((long)&local_550->root + 1);
              puVar95 = local_4e8;
              pyVar109 = pyVar78;
            } while( true );
          }
          local_538 = pyVar109;
          local_508 = pyVar120;
          if ((char_table[(byte)cVar101] & 1) == 0) {
            local_548 = pyVar74;
            puVar69 = local_4e8;
            if ((flg & 8) == 0) goto LAB_00f1efed;
            bVar70 = skip_spaces_and_comments((u8 **)&local_550);
            pyVar109 = local_538;
            pyVar74 = local_548;
            pyVar120 = local_508;
            if (!bVar70) goto LAB_00f18ddc;
          }
          else {
            do {
              local_550 = (yyjson_doc *)((long)&local_550->root + 1);
              local_548 = pyVar74;
            } while ((char_table[(byte)*(code *)&local_550->root] & 1) != 0);
          }
        }
        pyVar120 = (yyjson_doc *)&(pyVar120->alc).realloc;
        local_520 = pyVar76;
        if (local_540 <= pyVar120) {
          local_520 = (yyjson_doc *)((long)&pyVar76->root + ((ulong)pyVar76 >> 1));
          sVar119 = (long)local_520 * 0x10;
          local_500 = pyVar98;
          pyVar78 = (yyjson_doc *)(*local_4b0)(local_4d8,pyVar74,(long)pyVar76 << 4,sVar119);
          pyVar98 = pyVar74;
          if (pyVar78 == (yyjson_doc *)0x0) goto LAB_00f1e929;
          pyVar120 = (yyjson_doc *)(((long)pyVar120 - (long)pyVar74) + (long)pyVar78);
          pyVar109 = (yyjson_doc *)(((long)pyVar109 - (long)pyVar74) + (long)pyVar78);
          local_540 = (yyjson_doc *)((long)pyVar78 + (sVar119 - 0x20));
          pyVar74 = pyVar78;
          pyVar98 = local_500;
        }
        puVar95 = local_4e8 + 1;
        pyVar75 = (yyjson_doc *)((long)&local_550->root + 1);
        uStackY_580 = 0xd;
        pyVar78 = pyVar75;
LAB_00f1d150:
        while (uVar118 = (ulong)(byte)*(code *)&pyVar78->root, (char_table[uVar118] & 0xc) == 0) {
          uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 1);
          if ((char_table[uVar118] & 0xc) != 0) {
            pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 1);
            break;
          }
          uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 2);
          if ((char_table[uVar118] & 0xc) != 0) {
            pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 2);
            break;
          }
          uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 3);
          if ((char_table[uVar118] & 0xc) != 0) {
            pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 3);
            break;
          }
          uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 4);
          if ((char_table[uVar118] & 0xc) != 0) {
            pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 4);
            break;
          }
          uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 5);
          if ((char_table[uVar118] & 0xc) != 0) {
            pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 5);
            break;
          }
          uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 6);
          if ((char_table[uVar118] & 0xc) != 0) {
            pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 6);
            break;
          }
          uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 7);
          if ((char_table[uVar118] & 0xc) != 0) {
            pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 7);
            break;
          }
          uVar118 = (ulong)(byte)*(code *)&(pyVar78->alc).malloc;
          if ((char_table[uVar118] & 0xc) != 0) {
            pyVar78 = (yyjson_doc *)&pyVar78->alc;
            break;
          }
          uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 1);
          if ((char_table[uVar118] & 0xc) != 0) {
            pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 1);
            break;
          }
          uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 2);
          if ((char_table[uVar118] & 0xc) != 0) {
            pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 2);
            break;
          }
          uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 3);
          if ((char_table[uVar118] & 0xc) != 0) {
            pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 3);
            break;
          }
          uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 4);
          if ((char_table[uVar118] & 0xc) != 0) {
            pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 4);
            break;
          }
          uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 5);
          if ((char_table[uVar118] & 0xc) != 0) {
            pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 5);
            break;
          }
          uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 6);
          if ((char_table[uVar118] & 0xc) != 0) {
            pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 6);
            break;
          }
          uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 7);
          if ((char_table[uVar118] & 0xc) != 0) {
            pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 7);
            break;
          }
          pyVar78 = (yyjson_doc *)&(pyVar78->alc).realloc;
        }
        pyVar94 = pyVar78;
        local_530 = pyVar120;
        local_548 = pyVar74;
        if ((char)uVar118 == '\"') goto LAB_00f1d372;
        if ((char)uVar118 < '\0') {
          lVar85 = 0;
          for (; ((uVar116 = *(uint *)&pyVar78->root, (uVar116 & 0xc0c0f0) == 0x8080e0 &&
                  ((uVar116 & 0x200f) != 0)) && ((uVar116 & 0x200f) != 0x200d));
              pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 3)) {
            lVar85 = lVar85 + -3;
          }
          if ((char)uVar116 < '\0') {
            while (((uVar116 & 0xc0e0) == 0x80c0 && ((uVar116 & 0x1e) != 0))) {
              ppyVar68 = &pyVar78->root;
              pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 2);
              lVar85 = lVar85 + -2;
              uVar116 = *(uint *)((long)ppyVar68 + 2);
            }
            while ((((uVar116 & 0xc0c0c0f8) == 0x808080f0 && ((uVar116 & 0x3007) != 0)) &&
                   (((byte)uVar116 >> 2 & (uVar116 & 0x3003) != 0) == 0))) {
              ppyVar68 = &pyVar78->root;
              pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 4);
              lVar85 = lVar85 + -4;
              uVar116 = *(uint *)((long)ppyVar68 + 4);
            }
            if (lVar85 == 0) {
              if ((flg & 0x40) == 0) goto LAB_00f1ff1b;
              pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 1);
            }
          }
          goto LAB_00f1d150;
        }
LAB_00f1e364:
        if (SUB81(uVar118,0) == (code)0x5c) {
          cVar101 = *(code *)((long)&pyVar94->root + 1);
          local_500 = pyVar98;
          switch(cVar101) {
          case (code)0x6e:
            *(code *)&pyVar78->root = (code)0xa;
            break;
          case (code)0x6f:
          case (code)0x70:
          case (code)0x71:
          case (code)0x73:
            goto switchD_00f164e5_caseD_6f;
          case (code)0x72:
            *(code *)&pyVar78->root = (code)0xd;
            break;
          case (code)0x74:
            *(code *)&pyVar78->root = (code)0x9;
            break;
          case (code)0x75:
            uVar2 = CONCAT11(hex_conv_table[(byte)*(code *)((long)&pyVar94->root + 3)],
                             hex_conv_table[(byte)*(code *)((long)&pyVar94->root + 5)]);
            if (((uVar2 | CONCAT11(hex_conv_table[(byte)*(code *)((long)&pyVar94->root + 2)],
                                   hex_conv_table[(byte)*(code *)((long)&pyVar94->root + 4)])) &
                0xf0f0) != 0) goto LAB_00f1fc17;
            uVar116 = (uint)CONCAT11(hex_conv_table[(byte)*(code *)((long)&pyVar94->root + 2)],
                                     hex_conv_table[(byte)*(code *)((long)&pyVar94->root + 4)]) << 4
            ;
            uVar103 = uVar2 | uVar116;
            pyVar93 = (yyjson_doc *)((long)&pyVar94->root + 6);
            if ((uVar103 & 0xf800) != 0xd800) {
              cVar101 = SUB41(uVar103,0);
              if ((ushort)uVar103 < 0x800) {
                if ((ushort)uVar103 < 0x80) {
                  *(code *)&pyVar78->root = cVar101;
                  pyVar76 = (yyjson_doc *)((long)&pyVar78->root + 1);
                }
                else {
                  *(byte *)&pyVar78->root = (byte)(uVar103 >> 6) | 0xc0;
                  *(byte *)((long)&pyVar78->root + 1) = (byte)cVar101 & 0x3f | 0x80;
                  pyVar76 = (yyjson_doc *)((long)&pyVar78->root + 2);
                }
              }
              else {
                *(byte *)&pyVar78->root = (byte)(((uint)uVar2 | uVar116 & 0xffff) >> 0xc) | 0xe0;
                *(byte *)((long)&pyVar78->root + 1) = (byte)(uVar103 >> 6) & 0x3f | 0x80;
                *(byte *)((long)&pyVar78->root + 2) = (byte)cVar101 & 0x3f | 0x80;
                pyVar76 = (yyjson_doc *)((long)&pyVar78->root + 3);
              }
              goto LAB_00f1e48d;
            }
            if ((uVar103 & 0xdc00) != 0xd800) goto LAB_00f1fee1;
            if (*(short *)&pyVar93->root != 0x755c) goto LAB_00f1feed;
            if (((CONCAT11(hex_conv_table[(byte)*(code *)((long)&(pyVar94->alc).malloc + 1)],
                           hex_conv_table[(byte)*(code *)((long)&(pyVar94->alc).malloc + 3)]) |
                 CONCAT11(hex_conv_table[(byte)*(code *)&(pyVar94->alc).malloc],
                          hex_conv_table[(byte)*(code *)((long)&(pyVar94->alc).malloc + 2)])) &
                0xf0f0) != 0) goto LAB_00f1fef6;
            uVar116 = (CONCAT11(hex_conv_table[(byte)*(code *)&(pyVar94->alc).malloc],
                                hex_conv_table[(byte)*(code *)((long)&(pyVar94->alc).malloc + 2)]) &
                      0xfff) << 4 |
                      (uint)CONCAT11(hex_conv_table
                                     [(byte)*(code *)((long)&(pyVar94->alc).malloc + 1)],
                                     hex_conv_table
                                     [(byte)*(code *)((long)&(pyVar94->alc).malloc + 3)]);
            if ((uVar116 & 0xfc00) != 0xdc00) goto LAB_00f1feff;
            iVar102 = (uVar103 & 0xdbff) * 0x400;
            uVar103 = iVar102 + uVar116 + 0xfca02400;
            *(byte *)&pyVar78->root = (byte)(uVar103 >> 0x12) | 0xf0;
            *(byte *)((long)&pyVar78->root + 1) = (byte)(uVar103 >> 0xc) & 0x3f | 0x80;
            *(byte *)((long)&pyVar78->root + 2) =
                 (byte)(uVar116 + iVar102 + 0x400 >> 6) & 0x3f | 0x80;
            *(byte *)((long)&pyVar78->root + 3) = (byte)uVar116 & 0x3f | 0x80;
            pyVar93 = (yyjson_doc *)((long)&(pyVar94->alc).malloc + 4);
            pyVar76 = (yyjson_doc *)((long)&pyVar78->root + 4);
            goto LAB_00f1e48d;
          default:
            if (cVar101 == (code)0x66) {
              *(code *)&pyVar78->root = (code)0xc;
            }
            else if (cVar101 == (code)0x2f) {
              *(code *)&pyVar78->root = (code)0x2f;
            }
            else if (cVar101 == (code)0x5c) {
              *(code *)&pyVar78->root = (code)0x5c;
            }
            else if (cVar101 == (code)0x62) {
              *(code *)&pyVar78->root = (code)0x8;
            }
            else {
              if (cVar101 != (code)0x22) goto switchD_00f164e5_caseD_6f;
              *(code *)&pyVar78->root = (code)0x22;
            }
          }
          pyVar93 = (yyjson_doc *)((long)&pyVar94->root + 2);
          pyVar76 = (yyjson_doc *)((long)&pyVar78->root + 1);
        }
        else {
          if ((int)uVar118 == 0x22) goto LAB_00f1ee67;
          local_500 = pyVar98;
          if ((flg & 0x40) == 0) goto LAB_00f1ff33;
          if (local_4d0 <= pyVar94) goto LAB_00f1ff27;
          *(code *)&pyVar78->root = SUB81(uVar118,0);
          pyVar93 = (yyjson_doc *)((long)&pyVar94->root + 1);
          pyVar76 = (yyjson_doc *)((long)&pyVar78->root + 1);
        }
LAB_00f1e48d:
        do {
          pyVar78 = pyVar76;
          pyVar94 = pyVar93;
          if ((char_table[(byte)*(code *)&pyVar94->root] & 0xc) != 0) {
LAB_00f1e6e0:
            while( true ) {
              uVar118 = (ulong)(byte)*(code *)&pyVar94->root;
              if (-1 < (char)*(code *)&pyVar94->root) goto LAB_00f1e364;
              lVar85 = 0;
              pyVar76 = pyVar78;
              for (pyVar93 = pyVar94;
                  ((uVar116 = *(uint *)&pyVar93->root, (uVar116 & 0xc0c0f0) == 0x8080e0 &&
                   ((uVar116 & 0x200f) != 0)) && ((uVar116 & 0x200f) != 0x200d));
                  pyVar93 = (yyjson_doc *)((long)&pyVar93->root + 3)) {
                *(uint *)&pyVar76->root = uVar116;
                pyVar76 = (yyjson_doc *)((long)&pyVar76->root + 3);
                lVar85 = lVar85 + 3;
              }
              if (-1 < (char)uVar116) break;
              while (((uVar116 & 0xc0e0) == 0x80c0 && ((uVar116 & 0x1e) != 0))) {
                *(short *)&pyVar76->root = (short)uVar116;
                pyVar76 = (yyjson_doc *)((long)&pyVar76->root + 2);
                ppyVar68 = &pyVar93->root;
                pyVar93 = (yyjson_doc *)((long)&pyVar93->root + 2);
                lVar85 = lVar85 + 2;
                uVar116 = *(uint *)((long)ppyVar68 + 2);
              }
              while ((((uVar116 & 0x3007) != 0 && ((uVar116 & 0xc0c0c0f8) == 0x808080f0)) &&
                     (((byte)uVar116 >> 2 & (uVar116 & 0x3003) != 0) == 0))) {
                *(uint *)((long)&pyVar78->root + lVar85) = uVar116;
                lVar117 = lVar85 + 4;
                lVar85 = lVar85 + 4;
                uVar116 = *(uint *)((long)&pyVar94->root + lVar117);
              }
              pyVar93 = (yyjson_doc *)((long)&pyVar94->root + lVar85);
              pyVar78 = (yyjson_doc *)((long)&pyVar78->root + lVar85);
              pyVar76 = pyVar78;
              if (lVar85 != 0) break;
              local_500 = pyVar98;
              if ((flg & 0x40) == 0) goto LAB_00f18e10;
LAB_00f1e598:
              *(short *)&pyVar78->root = (short)uVar116;
              pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 1);
              pyVar94 = (yyjson_doc *)((long)&pyVar93->root + 1);
            }
            goto LAB_00f1e48d;
          }
          if ((char_table[(byte)*(code *)((long)&pyVar94->root + 1)] & 0xc) != 0) {
            uVar116 = (uint)*(ushort *)&pyVar94->root;
            pyVar93 = pyVar94;
            goto LAB_00f1e598;
          }
          if ((char_table[(byte)*(code *)((long)&pyVar94->root + 2)] & 0xc) != 0) {
            ppyVar68 = &pyVar94->root;
            pyVar94 = (yyjson_doc *)((long)&pyVar94->root + 2);
            *(undefined2 *)&pyVar78->root = *(undefined2 *)ppyVar68;
            pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 2);
            goto LAB_00f1e6e0;
          }
          if ((char_table[(byte)*(code *)((long)&pyVar94->root + 3)] & 0xc) != 0) {
            ppyVar68 = &pyVar94->root;
            pyVar94 = (yyjson_doc *)((long)&pyVar94->root + 3);
            *(undefined4 *)&pyVar78->root = *(undefined4 *)ppyVar68;
            pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 3);
            goto LAB_00f1e6e0;
          }
          if ((char_table[(byte)*(code *)((long)&pyVar94->root + 4)] & 0xc) != 0) {
            ppyVar68 = &pyVar94->root;
            pyVar94 = (yyjson_doc *)((long)&pyVar94->root + 4);
            *(undefined4 *)&pyVar78->root = *(undefined4 *)ppyVar68;
            pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 4);
            goto LAB_00f1e6e0;
          }
          if ((char_table[(byte)*(code *)((long)&pyVar94->root + 5)] & 0xc) != 0) {
            *(undefined4 *)&pyVar78->root = *(undefined4 *)&pyVar94->root;
            *(undefined2 *)((long)&pyVar78->root + 4) = *(undefined2 *)((long)&pyVar94->root + 4);
            pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 5);
            pyVar94 = (yyjson_doc *)((long)&pyVar94->root + 5);
            goto LAB_00f1e6e0;
          }
          if ((char_table[(byte)*(code *)((long)&pyVar94->root + 6)] & 0xc) != 0) {
            *(undefined4 *)&pyVar78->root = *(undefined4 *)&pyVar94->root;
            *(undefined2 *)((long)&pyVar78->root + 4) = *(undefined2 *)((long)&pyVar94->root + 4);
            pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 6);
            pyVar94 = (yyjson_doc *)((long)&pyVar94->root + 6);
            goto LAB_00f1e6e0;
          }
          if ((char_table[(byte)*(code *)((long)&pyVar94->root + 7)] & 0xc) != 0) {
            ppyVar68 = &pyVar94->root;
            pyVar94 = (yyjson_doc *)((long)&pyVar94->root + 7);
            pyVar78->root = *ppyVar68;
            pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 7);
            goto LAB_00f1e6e0;
          }
          if ((char_table[(byte)*(code *)&(pyVar94->alc).malloc] & 0xc) != 0) {
            ppyVar68 = &pyVar94->root;
            pyVar94 = (yyjson_doc *)&pyVar94->alc;
            pyVar78->root = *ppyVar68;
            pyVar78 = (yyjson_doc *)&pyVar78->alc;
            goto LAB_00f1e6e0;
          }
          if ((char_table[(byte)*(code *)((long)&(pyVar94->alc).malloc + 1)] & 0xc) != 0) {
            pyVar78->root = pyVar94->root;
            *(undefined2 *)&(pyVar78->alc).malloc = *(undefined2 *)&(pyVar94->alc).malloc;
            pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 1);
            pyVar94 = (yyjson_doc *)((long)&(pyVar94->alc).malloc + 1);
            goto LAB_00f1e6e0;
          }
          if ((char_table[(byte)*(code *)((long)&(pyVar94->alc).malloc + 2)] & 0xc) != 0) {
            pyVar78->root = pyVar94->root;
            *(undefined2 *)&(pyVar78->alc).malloc = *(undefined2 *)&(pyVar94->alc).malloc;
            pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 2);
            pyVar94 = (yyjson_doc *)((long)&(pyVar94->alc).malloc + 2);
            goto LAB_00f1e6e0;
          }
          if ((char_table[(byte)*(code *)((long)&(pyVar94->alc).malloc + 3)] & 0xc) != 0) {
            pyVar78->root = pyVar94->root;
            *(undefined4 *)&(pyVar78->alc).malloc = *(undefined4 *)&(pyVar94->alc).malloc;
            pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 3);
            pyVar94 = (yyjson_doc *)((long)&(pyVar94->alc).malloc + 3);
            goto LAB_00f1e6e0;
          }
          if ((char_table[(byte)*(code *)((long)&(pyVar94->alc).malloc + 4)] & 0xc) != 0) {
            pyVar78->root = pyVar94->root;
            *(undefined4 *)&(pyVar78->alc).malloc = *(undefined4 *)&(pyVar94->alc).malloc;
            pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 4);
            pyVar94 = (yyjson_doc *)((long)&(pyVar94->alc).malloc + 4);
            goto LAB_00f1e6e0;
          }
          if ((char_table[(byte)*(code *)((long)&(pyVar94->alc).malloc + 5)] & 0xc) != 0) {
            pyVar78->root = pyVar94->root;
            *(undefined4 *)&(pyVar78->alc).malloc = *(undefined4 *)&(pyVar94->alc).malloc;
            *(undefined2 *)((long)&(pyVar78->alc).malloc + 4) =
                 *(undefined2 *)((long)&(pyVar94->alc).malloc + 4);
            pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 5);
            pyVar94 = (yyjson_doc *)((long)&(pyVar94->alc).malloc + 5);
            goto LAB_00f1e6e0;
          }
          if ((char_table[(byte)*(code *)((long)&(pyVar94->alc).malloc + 6)] & 0xc) != 0) {
            pyVar78->root = pyVar94->root;
            *(undefined4 *)&(pyVar78->alc).malloc = *(undefined4 *)&(pyVar94->alc).malloc;
            *(undefined2 *)((long)&(pyVar78->alc).malloc + 4) =
                 *(undefined2 *)((long)&(pyVar94->alc).malloc + 4);
            pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 6);
            pyVar94 = (yyjson_doc *)((long)&(pyVar94->alc).malloc + 6);
            goto LAB_00f1e6e0;
          }
          bVar84 = char_table[(byte)*(code *)((long)&(pyVar94->alc).malloc + 7)];
          p_Var77 = (_func_void_void_ptr_void_ptr *)(pyVar94->alc).malloc;
          pyVar78->root = pyVar94->root;
          (pyVar78->alc).malloc = (_func_void_ptr_void_ptr_size_t *)p_Var77;
          if ((bVar84 & 0xc) != 0) {
            pyVar94 = (yyjson_doc *)((long)&(pyVar94->alc).malloc + 7);
            pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 7);
            goto LAB_00f1e6e0;
          }
          pyVar93 = (yyjson_doc *)&(pyVar94->alc).realloc;
          pyVar76 = (yyjson_doc *)&(pyVar78->alc).realloc;
        } while( true );
      }
LAB_00f1e929:
      local_548 = pyVar98;
      pyVar75 = local_4d0;
      pyVar78 = local_518;
      pyVar120 = local_550;
      bVar70 = is_truncated_end((u8 *)local_518,(u8 *)local_550,(u8 *)local_4d0,2,flg);
      pyVar87 = local_4b8;
      pyVar82 = local_4e0;
      if (bVar70) {
        pyVar120 = pyVar75;
      }
      pcVar88 = "memory allocation failed";
      if (bVar70) {
        pcVar88 = "unexpected end of data";
      }
      pyVar80 = local_4b8;
      if (local_4b8 == (yyjson_read_err *)0x0) {
        pyVar80 = &dummy_err;
      }
      pyVar80->pos = (long)pyVar120 - (long)pyVar78;
      local_4e0->code = (uint)bVar70 * 3 + 2;
      pyVar80->msg = pcVar88;
      if (local_548 != (yyjson_doc *)0x0) {
        (*local_4c0)(local_4d8,local_548);
      }
      pyVar78 = (yyjson_doc *)0x0;
      pyVar120 = local_518;
    }
    else {
      alc.realloc = local_4b0;
      alc.malloc = pcVar107;
      alc.free = local_4c0;
      alc.ctx = local_4d8;
      pyVar78 = read_root_single((u8 *)local_518,(u8 *)pyVar78,(u8 *)local_4d0,alc,flg,pyVar82);
      pyVar87 = local_4b8;
    }
    goto LAB_00f18e40;
  }
  if ((flg & 8) == 0) {
    while ((bVar84 & 1) != 0) {
      local_478 = (yyjson_doc *)((long)&pyVar78->root + 1);
      bVar84 = char_table[(byte)*(code *)((long)&pyVar78->root + 1)];
      pyVar78 = local_478;
    }
LAB_00f14302:
    if (pyVar78 < local_4d0) {
      cVar101 = *(code *)&pyVar78->root;
      goto LAB_00f1260e;
    }
    pyVar87 = &dummy_err;
    if (local_4b8 != (yyjson_read_err *)0x0) {
      pyVar87 = local_4b8;
    }
    pyVar87->pos = 0;
    pyVar87->msg = "input data is empty";
    pyVar82->code = 3;
    pyVar120 = local_518;
  }
  else {
    bVar70 = skip_spaces_and_comments((u8 **)&local_478);
    pyVar78 = local_478;
    if (bVar70) goto LAB_00f14302;
    pyVar87 = &dummy_err;
    if (local_4b8 != (yyjson_read_err *)0x0) {
      pyVar87 = local_4b8;
    }
    pyVar87->pos = (long)local_478 - (long)local_518;
    pyVar87->msg = "unclosed multiline comment";
    pyVar82->code = 8;
    pyVar120 = local_518;
  }
  local_518 = pyVar120;
  if ((flg & 1) != 0) {
    return (yyjson_doc *)0x0;
  }
  goto LAB_00f18f98;
LAB_00f19464:
  uVar118 = (ulong)(byte)*(code *)&pyVar78->root;
  if ((char_table[uVar118] & 0xc) == 0) {
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 1);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 1);
      goto LAB_00f195ac;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 2);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 2);
      goto LAB_00f195ac;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 3);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 3);
      goto LAB_00f195ac;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 4);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 4);
      goto LAB_00f195ac;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 5);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 5);
      goto LAB_00f195ac;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 6);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 6);
      goto LAB_00f195ac;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 7);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 7);
      goto LAB_00f195ac;
    }
    uVar118 = (ulong)(byte)*(code *)&(pyVar78->alc).malloc;
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)&pyVar78->alc;
      goto LAB_00f195ac;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 1);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 1);
      goto LAB_00f195ac;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 2);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 2);
      goto LAB_00f195ac;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 3);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 3);
      goto LAB_00f195ac;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 4);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 4);
      goto LAB_00f195ac;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 5);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 5);
      goto LAB_00f195ac;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 6);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 6);
      goto LAB_00f195ac;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 7);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 7);
      goto LAB_00f195ac;
    }
    pyVar78 = (yyjson_doc *)&(pyVar78->alc).realloc;
    goto LAB_00f19464;
  }
LAB_00f195ac:
  pyVar74 = pyVar78;
  local_548 = pyVar75;
  if ((char)uVar118 == '\"') goto LAB_00f196b1;
  if ((char)uVar118 < '\0') {
    lVar85 = 0;
    for (; ((uVar116 = *(uint *)&pyVar78->root, (uVar116 & 0xc0c0f0) == 0x8080e0 &&
            ((uVar116 & 0x200f) != 0)) && ((uVar116 & 0x200f) != 0x200d));
        pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 3)) {
      lVar85 = lVar85 + -3;
    }
    if ((char)uVar116 < '\0') {
      while (((uVar116 & 0xc0e0) == 0x80c0 && ((uVar116 & 0x1e) != 0))) {
        ppyVar68 = &pyVar78->root;
        pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 2);
        lVar85 = lVar85 + -2;
        uVar116 = *(uint *)((long)ppyVar68 + 2);
      }
      while ((((uVar116 & 0xc0c0c0f8) == 0x808080f0 && ((uVar116 & 0x3007) != 0)) &&
             (((byte)uVar116 >> 2 & (uVar116 & 0x3003) != 0) == 0))) {
        ppyVar68 = &pyVar78->root;
        pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 4);
        lVar85 = lVar85 + -4;
        uVar116 = *(uint *)((long)ppyVar68 + 4);
      }
      if (lVar85 == 0) {
        if ((flg & 0x40) == 0) goto LAB_00f1c707;
        pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 1);
      }
    }
    goto LAB_00f19464;
  }
LAB_00f1a628:
  if (SUB81(uVar118,0) == (code)0x5c) {
    cVar101 = *(code *)((long)&pyVar74->root + 1);
    switch(cVar101) {
    case (code)0x6e:
      *(code *)&pyVar78->root = (code)0xa;
      break;
    case (code)0x6f:
    case (code)0x70:
    case (code)0x71:
    case (code)0x73:
      goto switchD_00f16e5b_caseD_6f;
    case (code)0x72:
      *(code *)&pyVar78->root = (code)0xd;
      break;
    case (code)0x74:
      *(code *)&pyVar78->root = (code)0x9;
      break;
    case (code)0x75:
      uVar2 = CONCAT11(hex_conv_table[(byte)*(code *)((long)&pyVar74->root + 3)],
                       hex_conv_table[(byte)*(code *)((long)&pyVar74->root + 5)]);
      if (((uVar2 | CONCAT11(hex_conv_table[(byte)*(code *)((long)&pyVar74->root + 2)],
                             hex_conv_table[(byte)*(code *)((long)&pyVar74->root + 4)])) & 0xf0f0)
          != 0) goto LAB_00f1be85;
      uVar116 = (uint)CONCAT11(hex_conv_table[(byte)*(code *)((long)&pyVar74->root + 2)],
                               hex_conv_table[(byte)*(code *)((long)&pyVar74->root + 4)]) << 4;
      uVar103 = uVar2 | uVar116;
      pyVar109 = (yyjson_doc *)((long)&pyVar74->root + 6);
      if ((uVar103 & 0xf800) != 0xd800) {
        cVar101 = SUB41(uVar103,0);
        if ((ushort)uVar103 < 0x800) {
          if ((ushort)uVar103 < 0x80) {
            *(code *)&pyVar78->root = cVar101;
            pyVar98 = (yyjson_doc *)((long)&pyVar78->root + 1);
          }
          else {
            *(byte *)&pyVar78->root = (byte)(uVar103 >> 6) | 0xc0;
            *(byte *)((long)&pyVar78->root + 1) = (byte)cVar101 & 0x3f | 0x80;
            pyVar98 = (yyjson_doc *)((long)&pyVar78->root + 2);
          }
        }
        else {
          *(byte *)&pyVar78->root = (byte)(((uint)uVar2 | uVar116 & 0xffff) >> 0xc) | 0xe0;
          *(byte *)((long)&pyVar78->root + 1) = (byte)(uVar103 >> 6) & 0x3f | 0x80;
          *(byte *)((long)&pyVar78->root + 2) = (byte)cVar101 & 0x3f | 0x80;
          pyVar98 = (yyjson_doc *)((long)&pyVar78->root + 3);
        }
        goto LAB_00f1a754;
      }
      if ((uVar103 & 0xdc00) != 0xd800) goto LAB_00f1c6f2;
      if (*(short *)&pyVar109->root != 0x755c) goto LAB_00f1c6fe;
      if (((CONCAT11(hex_conv_table[(byte)*(code *)((long)&(pyVar74->alc).malloc + 1)],
                     hex_conv_table[(byte)*(code *)((long)&(pyVar74->alc).malloc + 3)]) |
           CONCAT11(hex_conv_table[(byte)*(code *)&(pyVar74->alc).malloc],
                    hex_conv_table[(byte)*(code *)((long)&(pyVar74->alc).malloc + 2)])) & 0xf0f0) !=
          0) goto LAB_00f1c71f;
      uVar116 = (CONCAT11(hex_conv_table[(byte)*(code *)&(pyVar74->alc).malloc],
                          hex_conv_table[(byte)*(code *)((long)&(pyVar74->alc).malloc + 2)]) & 0xfff
                ) << 4 | (uint)CONCAT11(hex_conv_table
                                        [(byte)*(code *)((long)&(pyVar74->alc).malloc + 1)],
                                        hex_conv_table
                                        [(byte)*(code *)((long)&(pyVar74->alc).malloc + 3)]);
      if ((uVar116 & 0xfc00) != 0xdc00) goto LAB_00f1c728;
      iVar102 = (uVar103 & 0xdbff) * 0x400;
      uVar103 = iVar102 + uVar116 + 0xfca02400;
      *(byte *)&pyVar78->root = (byte)(uVar103 >> 0x12) | 0xf0;
      *(byte *)((long)&pyVar78->root + 1) = (byte)(uVar103 >> 0xc) & 0x3f | 0x80;
      *(byte *)((long)&pyVar78->root + 2) = (byte)(uVar116 + iVar102 + 0x400 >> 6) & 0x3f | 0x80;
      *(byte *)((long)&pyVar78->root + 3) = (byte)uVar116 & 0x3f | 0x80;
      pyVar109 = (yyjson_doc *)((long)&(pyVar74->alc).malloc + 4);
      pyVar98 = (yyjson_doc *)((long)&pyVar78->root + 4);
      goto LAB_00f1a754;
    default:
      if (cVar101 == (code)0x66) {
        *(code *)&pyVar78->root = (code)0xc;
      }
      else if (cVar101 == (code)0x2f) {
        *(code *)&pyVar78->root = (code)0x2f;
      }
      else if (cVar101 == (code)0x5c) {
        *(code *)&pyVar78->root = (code)0x5c;
      }
      else if (cVar101 == (code)0x62) {
        *(code *)&pyVar78->root = (code)0x8;
      }
      else {
        if (cVar101 != (code)0x22) goto switchD_00f16e5b_caseD_6f;
        *(code *)&pyVar78->root = (code)0x22;
      }
    }
    pyVar109 = (yyjson_doc *)((long)&pyVar74->root + 2);
    pyVar98 = (yyjson_doc *)((long)&pyVar78->root + 1);
  }
  else {
    if ((int)uVar118 == 0x22) goto LAB_00f1b15b;
    if ((flg & 0x40) == 0) goto LAB_00f1c744;
    if (local_4d0 <= pyVar74) goto LAB_00f1c713;
    pyVar109 = (yyjson_doc *)((long)&pyVar74->root + 1);
    *(code *)&pyVar78->root = SUB81(uVar118,0);
    pyVar98 = (yyjson_doc *)((long)&pyVar78->root + 1);
  }
LAB_00f1a754:
  do {
    pyVar78 = pyVar98;
    pyVar74 = pyVar109;
    if ((char_table[(byte)*(code *)&pyVar109->root] & 0xc) != 0) {
LAB_00f1a9a7:
      while( true ) {
        uVar118 = (ulong)(byte)*(code *)&pyVar74->root;
        if (-1 < (char)*(code *)&pyVar74->root) goto LAB_00f1a628;
        lVar85 = 0;
        pyVar98 = pyVar78;
        for (pyVar109 = pyVar74;
            ((uVar116 = *(uint *)&pyVar109->root, (uVar116 & 0xc0c0f0) == 0x8080e0 &&
             ((uVar116 & 0x200f) != 0)) && ((uVar116 & 0x200f) != 0x200d));
            pyVar109 = (yyjson_doc *)((long)&pyVar109->root + 3)) {
          *(uint *)&pyVar98->root = uVar116;
          pyVar98 = (yyjson_doc *)((long)&pyVar98->root + 3);
          lVar85 = lVar85 + 3;
        }
        if (-1 < (char)uVar116) break;
        while (((uVar116 & 0xc0e0) == 0x80c0 && ((uVar116 & 0x1e) != 0))) {
          *(short *)&pyVar98->root = (short)uVar116;
          pyVar98 = (yyjson_doc *)((long)&pyVar98->root + 2);
          ppyVar68 = &pyVar109->root;
          pyVar109 = (yyjson_doc *)((long)&pyVar109->root + 2);
          lVar85 = lVar85 + 2;
          uVar116 = *(uint *)((long)ppyVar68 + 2);
        }
        while ((((uVar116 & 0x3007) != 0 && ((uVar116 & 0xc0c0c0f8) == 0x808080f0)) &&
               (((byte)uVar116 >> 2 & (uVar116 & 0x3003) != 0) == 0))) {
          *(uint *)((long)&pyVar78->root + lVar85) = uVar116;
          lVar117 = lVar85 + 4;
          lVar85 = lVar85 + 4;
          uVar116 = *(uint *)((long)&pyVar74->root + lVar117);
        }
        pyVar109 = (yyjson_doc *)((long)&pyVar74->root + lVar85);
        pyVar78 = (yyjson_doc *)((long)&pyVar78->root + lVar85);
        pyVar98 = pyVar78;
        if (lVar85 != 0) break;
        if ((flg & 0x40) == 0) goto LAB_00f18e27;
LAB_00f1a85f:
        *(short *)&pyVar78->root = (short)uVar116;
        pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 1);
        pyVar74 = (yyjson_doc *)((long)&pyVar109->root + 1);
      }
      goto LAB_00f1a754;
    }
    if ((char_table[(byte)*(code *)((long)&pyVar109->root + 1)] & 0xc) != 0) {
      uVar116 = (uint)*(ushort *)&pyVar109->root;
      goto LAB_00f1a85f;
    }
    if ((char_table[(byte)*(code *)((long)&pyVar109->root + 2)] & 0xc) != 0) {
      pyVar74 = (yyjson_doc *)((long)&pyVar109->root + 2);
      *(undefined2 *)&pyVar78->root = *(undefined2 *)&pyVar109->root;
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 2);
      goto LAB_00f1a9a7;
    }
    if ((char_table[(byte)*(code *)((long)&pyVar109->root + 3)] & 0xc) != 0) {
      pyVar74 = (yyjson_doc *)((long)&pyVar109->root + 3);
      *(undefined4 *)&pyVar78->root = *(undefined4 *)&pyVar109->root;
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 3);
      goto LAB_00f1a9a7;
    }
    if ((char_table[(byte)*(code *)((long)&pyVar109->root + 4)] & 0xc) != 0) {
      pyVar74 = (yyjson_doc *)((long)&pyVar109->root + 4);
      *(undefined4 *)&pyVar78->root = *(undefined4 *)&pyVar109->root;
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 4);
      goto LAB_00f1a9a7;
    }
    if ((char_table[(byte)*(code *)((long)&pyVar109->root + 5)] & 0xc) != 0) {
      *(undefined4 *)&pyVar78->root = *(undefined4 *)&pyVar109->root;
      *(undefined2 *)((long)&pyVar78->root + 4) = *(undefined2 *)((long)&pyVar109->root + 4);
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 5);
      pyVar74 = (yyjson_doc *)((long)&pyVar109->root + 5);
      goto LAB_00f1a9a7;
    }
    if ((char_table[(byte)*(code *)((long)&pyVar109->root + 6)] & 0xc) != 0) {
      *(undefined4 *)&pyVar78->root = *(undefined4 *)&pyVar109->root;
      *(undefined2 *)((long)&pyVar78->root + 4) = *(undefined2 *)((long)&pyVar109->root + 4);
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 6);
      pyVar74 = (yyjson_doc *)((long)&pyVar109->root + 6);
      goto LAB_00f1a9a7;
    }
    if ((char_table[(byte)*(code *)((long)&pyVar109->root + 7)] & 0xc) != 0) {
      pyVar74 = (yyjson_doc *)((long)&pyVar109->root + 7);
      pyVar78->root = pyVar109->root;
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 7);
      goto LAB_00f1a9a7;
    }
    if ((char_table[(byte)*(code *)&(pyVar109->alc).malloc] & 0xc) != 0) {
      pyVar74 = (yyjson_doc *)&pyVar109->alc;
      pyVar78->root = pyVar109->root;
      pyVar78 = (yyjson_doc *)&pyVar78->alc;
      goto LAB_00f1a9a7;
    }
    if ((char_table[(byte)*(code *)((long)&(pyVar109->alc).malloc + 1)] & 0xc) != 0) {
      pyVar78->root = pyVar109->root;
      *(undefined2 *)&(pyVar78->alc).malloc = *(undefined2 *)&(pyVar109->alc).malloc;
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 1);
      pyVar74 = (yyjson_doc *)((long)&(pyVar109->alc).malloc + 1);
      goto LAB_00f1a9a7;
    }
    if ((char_table[(byte)*(code *)((long)&(pyVar109->alc).malloc + 2)] & 0xc) != 0) {
      pyVar78->root = pyVar109->root;
      *(undefined2 *)&(pyVar78->alc).malloc = *(undefined2 *)&(pyVar109->alc).malloc;
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 2);
      pyVar74 = (yyjson_doc *)((long)&(pyVar109->alc).malloc + 2);
      goto LAB_00f1a9a7;
    }
    if ((char_table[(byte)*(code *)((long)&(pyVar109->alc).malloc + 3)] & 0xc) != 0) {
      pyVar78->root = pyVar109->root;
      *(undefined4 *)&(pyVar78->alc).malloc = *(undefined4 *)&(pyVar109->alc).malloc;
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 3);
      pyVar74 = (yyjson_doc *)((long)&(pyVar109->alc).malloc + 3);
      goto LAB_00f1a9a7;
    }
    if ((char_table[(byte)*(code *)((long)&(pyVar109->alc).malloc + 4)] & 0xc) != 0) {
      pyVar78->root = pyVar109->root;
      *(undefined4 *)&(pyVar78->alc).malloc = *(undefined4 *)&(pyVar109->alc).malloc;
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 4);
      pyVar74 = (yyjson_doc *)((long)&(pyVar109->alc).malloc + 4);
      goto LAB_00f1a9a7;
    }
    if ((char_table[(byte)*(code *)((long)&(pyVar109->alc).malloc + 5)] & 0xc) != 0) {
      pyVar78->root = pyVar109->root;
      *(undefined4 *)&(pyVar78->alc).malloc = *(undefined4 *)&(pyVar109->alc).malloc;
      *(undefined2 *)((long)&(pyVar78->alc).malloc + 4) =
           *(undefined2 *)((long)&(pyVar109->alc).malloc + 4);
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 5);
      pyVar74 = (yyjson_doc *)((long)&(pyVar109->alc).malloc + 5);
      goto LAB_00f1a9a7;
    }
    if ((char_table[(byte)*(code *)((long)&(pyVar109->alc).malloc + 6)] & 0xc) != 0) {
      pyVar78->root = pyVar109->root;
      *(undefined4 *)&(pyVar78->alc).malloc = *(undefined4 *)&(pyVar109->alc).malloc;
      *(undefined2 *)((long)&(pyVar78->alc).malloc + 4) =
           *(undefined2 *)((long)&(pyVar109->alc).malloc + 4);
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 6);
      pyVar74 = (yyjson_doc *)((long)&(pyVar109->alc).malloc + 6);
      goto LAB_00f1a9a7;
    }
    bVar84 = char_table[(byte)*(code *)((long)&(pyVar109->alc).malloc + 7)];
    p_Var77 = (_func_void_void_ptr_void_ptr *)(pyVar109->alc).malloc;
    pyVar78->root = pyVar109->root;
    (pyVar78->alc).malloc = (_func_void_ptr_void_ptr_size_t *)p_Var77;
    if ((bVar84 & 0xc) != 0) {
      pyVar74 = (yyjson_doc *)((long)&(pyVar109->alc).malloc + 7);
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 7);
      goto LAB_00f1a9a7;
    }
    pyVar109 = (yyjson_doc *)&(pyVar109->alc).realloc;
    pyVar98 = (yyjson_doc *)&(pyVar78->alc).realloc;
  } while( true );
LAB_00f1b15b:
  uStackY_580 = 5;
LAB_00f196b1:
  local_540->root = (yyjson_val *)(((long)pyVar78 - (long)pyVar120) * 0x100 | uStackY_580);
  (local_540->alc).malloc = (_func_void_ptr_void_ptr_size_t *)pyVar120;
  *(code *)&pyVar78->root = (code)0x0;
  local_550 = (yyjson_doc *)((long)&pyVar74->root + 1);
  pyVar74 = local_540;
  pyVar98 = local_530;
  while ((pyVar120 = local_518, lVar85 = 2, *(short *)&local_550->root != 0x203a &&
         (bVar84 = (byte)*(short *)&local_550->root, lVar85 = 1, bVar84 != 0x3a))) {
    if ((char_table[bVar84] & 1) == 0) {
      pyVar75 = local_520;
      if ((flg & 8) == 0) goto LAB_00f19777;
      bVar70 = skip_spaces_and_comments((u8 **)&local_550);
      pyVar74 = local_540;
      pyVar98 = local_530;
      pyVar75 = local_548;
      if (!bVar70) {
        sVar71 = *(short *)&local_550->root;
        pyVar120 = local_518;
        goto joined_r0x00f1abfd;
      }
    }
    else {
      do {
        local_550 = (yyjson_doc *)((long)&local_550->root + 1);
      } while ((char_table[(byte)*(code *)&local_550->root] & 1) != 0);
    }
  }
  local_550 = (yyjson_doc *)((long)&local_550->root + lVar85);
LAB_00f197e9:
  pyVar78 = local_550;
  cVar101 = *(code *)&local_550->root;
  uVar118 = (ulong)(byte)cVar101;
  pyVar104 = local_548;
  if (uVar118 == 0x22) {
    local_538 = (yyjson_doc *)&(pyVar74->alc).realloc;
    local_520 = (yyjson_doc *)((long)&local_520->root + 2);
    pyVar120 = (yyjson_doc *)((long)&local_550->root + 1);
    uStackY_580 = 0xd;
    pyVar78 = pyVar120;
    goto LAB_00f199c8;
  }
  if ((char_table[uVar118] & 2) == 0) {
    pyVar78 = local_538;
    if (cVar101 == (code)0x5b) goto LAB_00f1342a;
    pyVar94 = local_520;
    if (cVar101 == (code)0x66) {
      if (*(int *)((long)&local_550->root + 1) == 0x65736c61) {
        (pyVar74->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x3;
        local_550 = (yyjson_doc *)((long)&local_550->root + 5);
LAB_00f19f5e:
        local_520 = (yyjson_doc *)((long)&local_520->root + 2);
        local_538 = (yyjson_doc *)&(pyVar74->alc).realloc;
        local_530 = pyVar98;
        goto LAB_00f190ad;
      }
      goto LAB_00f15aeb;
    }
    if (cVar101 == (code)0x6e) {
      local_538 = (yyjson_doc *)&(pyVar74->alc).realloc;
      pyVar94 = (yyjson_doc *)((long)&local_520->root + 2);
      uVar116 = *(uint *)&local_550->root;
      if (uVar116 == 0x6c6c756e) {
        *(_func_void_ptr_void_ptr_void_ptr_size_t_size_t **)local_538 =
             (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x2;
        local_530 = pyVar98;
        local_550 = (yyjson_doc *)((long)&local_550->root + 4);
        local_520 = pyVar94;
        goto LAB_00f190ad;
      }
      if (((((flg & 0x10) == 0) || ((uVar116 & 0xff | 0x20) != 0x6e)) ||
          ((uVar116 >> 8 & 0xff | 0x20) != 0x61)) || ((uVar116 >> 0x10 & 0xff | 0x20) != 0x6e))
      goto LAB_00f15aeb;
LAB_00f1b25c:
      pyVar120 = (yyjson_doc *)((long)&local_550->root + 3);
      if ((flg & 0xa0) == 0) {
        (local_540->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x14;
        p_Var77 = (_func_void_void_ptr_void_ptr *)0x7ff8000000000000;
        local_550 = pyVar120;
LAB_00f1b55f:
        (local_540->alc).free = p_Var77;
      }
      else {
        if (pyVar76->root != (yyjson_val *)0x0) {
          *(code *)&pyVar76->root->tag = (code)0x0;
        }
        pyVar76->root = (yyjson_val *)pyVar120;
        (local_540->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x301;
        (local_540->alc).free = (_func_void_void_ptr_void_ptr *)local_550;
        local_550 = pyVar120;
      }
      goto LAB_00f1b563;
    }
    pyVar109 = local_508;
    if (cVar101 != (code)0x7b) {
      if (cVar101 == (code)0x74) {
        if (*(int *)&local_550->root == 0x65757274) {
          (pyVar74->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0xb;
          local_550 = (yyjson_doc *)((long)&local_550->root + 4);
          goto LAB_00f19f5e;
        }
        goto LAB_00f15aeb;
      }
      if ((char_table[uVar118] & 1) != 0) goto LAB_00f1988c;
      if ((((flg & 0x10) != 0) && ((byte)cVar101 - 0x49 < 0x21)) &&
         ((0x100000021U >> ((ulong)((byte)cVar101 - 0x49) & 0x3f) & 1) != 0)) {
        local_538 = (yyjson_doc *)&(local_540->alc).realloc;
        pyVar75 = (yyjson_doc *)((long)&local_520->root + 2);
        if (uVar118 != 0x69) {
          if (cVar101 == (code)0x4e) {
LAB_00f1b240:
            pyVar120 = local_518;
            if ((((byte)*(code *)((long)&local_550->root + 1) | 0x20) == 0x61) &&
               (((byte)*(code *)((long)&local_550->root + 2) | 0x20) == 0x6e)) goto LAB_00f1b25c;
          }
          else {
            pyVar120 = local_518;
            if (cVar101 == (code)0x49) goto LAB_00f198e5;
          }
          goto LAB_00f19777;
        }
LAB_00f198e5:
        if ((((byte)*(code *)((long)&local_550->root + 1) | 0x20) != 0x6e) ||
           (((byte)*(code *)((long)&local_550->root + 2) | 0x20) != 0x66)) {
          pyVar120 = local_518;
          if (cVar101 == (code)0x4e) goto LAB_00f1b240;
          goto LAB_00f19777;
        }
        pyVar120 = (yyjson_doc *)((long)&local_550->root + 3);
        if ((((((byte)*(code *)((long)&local_550->root + 3) | 0x20) == 0x69) &&
             (((byte)*(code *)((long)&local_550->root + 4) | 0x20) == 0x6e)) &&
            (((byte)*(code *)((long)&local_550->root + 5) | 0x20) == 0x69)) &&
           ((((byte)*(code *)((long)&local_550->root + 6) | 0x20) == 0x74 &&
            (((byte)*(code *)((long)&local_550->root + 7) | 0x20) == 0x79)))) {
          pyVar120 = (yyjson_doc *)&local_550->alc;
        }
        if ((flg & 0xa0) == 0) {
          (local_540->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x14;
          p_Var77 = (_func_void_void_ptr_void_ptr *)0x7ff0000000000000;
          local_550 = pyVar120;
          goto LAB_00f1b55f;
        }
        if (pyVar76->root != (yyjson_val *)0x0) {
          *(code *)&pyVar76->root->tag = (code)0x0;
        }
        pyVar76->root = (yyjson_val *)pyVar120;
        (local_540->alc).realloc =
             (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)
             (((long)pyVar120 - (long)local_550) * 0x100 + 1);
        (local_540->alc).free = (_func_void_void_ptr_void_ptr *)local_550;
        local_550 = pyVar120;
        goto LAB_00f1b563;
      }
      pyVar75 = local_520;
      if ((flg & 8) == 0) goto LAB_00f19777;
      bVar70 = skip_spaces_and_comments((u8 **)&local_550);
      pyVar74 = local_540;
      pyVar98 = local_530;
      pyVar75 = local_548;
      if (!bVar70) goto LAB_00f18dee;
      goto LAB_00f197e9;
    }
LAB_00f134a5:
    local_550 = (yyjson_doc *)((long)&local_550->root + 1);
    pyVar98->root =
         (yyjson_val *)((ulong)(byte)*(code *)&pyVar98->root + (long)pyVar78 * 0x100 + 0x100);
    pyVar74 = (yyjson_doc *)&(pyVar74->alc).realloc;
    if (local_4e8 <= pyVar74) {
      local_540 = (yyjson_doc *)((long)&pyVar109->root + ((ulong)pyVar109 >> 1));
      sVar119 = (long)local_540 * 0x10;
      local_528 = pyVar76;
      pyVar120 = (yyjson_doc *)(*local_4b0)(local_4d8,pyVar75,(long)pyVar109 << 4,sVar119);
      pyVar78 = local_550;
      if (pyVar120 == (yyjson_doc *)0x0) goto LAB_00f146d8;
      pyVar74 = (yyjson_doc *)(((long)pyVar74 - (long)pyVar75) + (long)pyVar120);
      pyVar98 = (yyjson_doc *)(((long)pyVar98 - (long)pyVar75) + (long)pyVar120);
      local_4e8 = (undefined1 *)((long)pyVar120 + (sVar119 - 0x20));
      pyVar109 = local_540;
      pyVar76 = local_528;
      pyVar75 = pyVar120;
    }
    pyVar74->root = (yyjson_val *)0x7;
    (pyVar74->alc).malloc = (_func_void_ptr_void_ptr_size_t *)((long)pyVar74 - (long)pyVar98);
    if (*(code *)&local_550->root == (code)0xa) {
      pyVar120 = (yyjson_doc *)((long)&local_550->root + 1);
LAB_00f13501:
      local_550 = pyVar120;
    }
    goto LAB_00f129ac;
  }
  local_538 = (yyjson_doc *)&(pyVar74->alc).realloc;
  exp = 0;
  pyVar74 = (yyjson_doc *)((long)&local_520->root + 2);
  if (-1 < local_554 && (flg & 0xa0) != 0) {
    local_520 = pyVar74;
    bVar70 = read_number_raw((u8 **)&local_550,(u8 **)pyVar76,flg,(yyjson_val *)local_538,&msg);
    pyVar104 = local_548;
    if (bVar70) goto LAB_00f190ad;
    goto LAB_00f1c788;
  }
  uVar73 = (ulong)(cVar101 == (code)0x2d);
  pyVar109 = (yyjson_doc *)((long)&local_550->root + uVar73);
  cVar99 = *(code *)((long)&local_550->root + uVar73);
  uVar112 = (ulong)(byte)cVar99;
  if ((digi_table[uVar112] & 2) != 0) {
    p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar112 - 0x30);
    cVar99 = *(code *)((long)&pyVar109->root + 1);
    uVar73 = (ulong)(byte)cVar99 - 0x30;
    pyVar120 = pyVar109;
    if (9 < uVar73) {
      pyVar98 = (yyjson_doc *)((long)&pyVar109->root + 1);
      if ((digi_table[(byte)cVar99] & 0x30) == 0) {
        (local_540->alc).realloc =
             (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)
             ((ulong)(cVar101 == (code)0x2d) * 8 + 4);
        if (cVar101 == (code)0x2d) {
          p_Var77 = (_func_void_void_ptr_void_ptr *)(0x30 - uVar112);
        }
        (local_540->alc).free = p_Var77;
        pyVar75 = local_548;
        local_550 = pyVar98;
        local_528 = pyVar76;
        local_520 = pyVar74;
        goto LAB_00f190ad;
      }
      p_Var114 = (_func_void_void_ptr_void_ptr *)0x0;
      local_510 = (yyjson_doc *)0x0;
      local_500 = pyVar98;
      local_4f0 = pyVar98;
      if (cVar99 != (code)0x2e) goto LAB_00f1a322;
      goto LAB_00f1c2c4;
    }
    p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar73 + (long)p_Var77 * 10);
    cVar99 = *(code *)((long)&pyVar109->root + 2);
    uVar73 = (ulong)(byte)cVar99 - 0x30;
    if (uVar73 < 10) {
      p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar73 + (long)p_Var77 * 10);
      cVar99 = *(code *)((long)&pyVar109->root + 3);
      uVar73 = (ulong)(byte)cVar99 - 0x30;
      if (9 < uVar73) {
        pyVar98 = (yyjson_doc *)((long)&pyVar109->root + 3);
        if ((digi_table[(byte)cVar99] & 0x30) == 0) {
LAB_00f1b0a8:
          (local_540->alc).realloc =
               (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)
               ((ulong)(cVar101 == (code)0x2d) * 8 + 4);
          p_Var114 = (_func_void_void_ptr_void_ptr *)-(long)p_Var77;
          if (cVar101 != (code)0x2d) {
            p_Var114 = p_Var77;
          }
          (local_540->alc).free = p_Var114;
          pyVar75 = local_548;
          local_550 = pyVar98;
          local_528 = pyVar76;
          local_520 = pyVar74;
          goto LAB_00f190ad;
        }
        p_Var114 = (_func_void_void_ptr_void_ptr *)0x0;
        local_510 = (yyjson_doc *)0x0;
        local_500 = pyVar98;
        local_4f0 = pyVar98;
        if (cVar99 == (code)0x2e) goto LAB_00f1c320;
        goto LAB_00f1a322;
      }
      p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar73 + (long)p_Var77 * 10);
      cVar99 = *(code *)((long)&pyVar109->root + 4);
      uVar73 = (ulong)(byte)cVar99 - 0x30;
      if (uVar73 < 10) {
        p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar73 + (long)p_Var77 * 10);
        cVar99 = *(code *)((long)&pyVar109->root + 5);
        uVar73 = (ulong)(byte)cVar99 - 0x30;
        if (9 < uVar73) {
          pyVar98 = (yyjson_doc *)((long)&pyVar109->root + 5);
          if ((digi_table[(byte)cVar99] & 0x30) == 0) goto LAB_00f1b0a8;
          p_Var114 = (_func_void_void_ptr_void_ptr *)0x0;
          local_510 = (yyjson_doc *)0x0;
          local_500 = pyVar98;
          local_4f0 = pyVar98;
          if (cVar99 == (code)0x2e) goto LAB_00f1c37c;
          goto LAB_00f1a322;
        }
        p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar73 + (long)p_Var77 * 10);
        cVar99 = *(code *)((long)&pyVar109->root + 6);
        uVar73 = (ulong)(byte)cVar99 - 0x30;
        if (uVar73 < 10) {
          p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar73 + (long)p_Var77 * 10);
          cVar99 = *(code *)((long)&pyVar109->root + 7);
          uVar73 = (ulong)(byte)cVar99 - 0x30;
          if (9 < uVar73) {
            pyVar98 = (yyjson_doc *)((long)&pyVar109->root + 7);
            if ((digi_table[(byte)cVar99] & 0x30) == 0) goto LAB_00f1b0a8;
            p_Var114 = (_func_void_void_ptr_void_ptr *)0x0;
            local_510 = (yyjson_doc *)0x0;
            local_500 = pyVar98;
            local_4f0 = pyVar98;
            if (cVar99 == (code)0x2e) goto LAB_00f1c3d8;
            goto LAB_00f1a322;
          }
          p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar73 + (long)p_Var77 * 10);
          cVar99 = *(code *)&(pyVar109->alc).malloc;
          uVar73 = (ulong)(byte)cVar99 - 0x30;
          if (uVar73 < 10) {
            p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar73 + (long)p_Var77 * 10);
            cVar99 = *(code *)((long)&(pyVar109->alc).malloc + 1);
            uVar73 = (ulong)(byte)cVar99 - 0x30;
            if (9 < uVar73) {
              pyVar98 = (yyjson_doc *)((long)&(pyVar109->alc).malloc + 1);
              if ((digi_table[(byte)cVar99] & 0x30) == 0) goto LAB_00f1b0a8;
              p_Var114 = (_func_void_void_ptr_void_ptr *)0x0;
              local_510 = (yyjson_doc *)0x0;
              local_500 = pyVar98;
              local_4f0 = pyVar98;
              if (cVar99 == (code)0x2e) goto LAB_00f1c434;
              goto LAB_00f1a322;
            }
            p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar73 + (long)p_Var77 * 10);
            cVar99 = *(code *)((long)&(pyVar109->alc).malloc + 2);
            uVar73 = (ulong)(byte)cVar99 - 0x30;
            if (uVar73 < 10) {
              p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar73 + (long)p_Var77 * 10);
              cVar99 = *(code *)((long)&(pyVar109->alc).malloc + 3);
              uVar73 = (ulong)(byte)cVar99 - 0x30;
              if (9 < uVar73) {
                pyVar98 = (yyjson_doc *)((long)&(pyVar109->alc).malloc + 3);
                if ((digi_table[(byte)cVar99] & 0x30) == 0) goto LAB_00f1b0a8;
                p_Var114 = (_func_void_void_ptr_void_ptr *)0x0;
                local_510 = (yyjson_doc *)0x0;
                local_500 = pyVar98;
                local_4f0 = pyVar98;
                if (cVar99 == (code)0x2e) goto LAB_00f1c490;
                goto LAB_00f1a322;
              }
              p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar73 + (long)p_Var77 * 10);
              cVar99 = *(code *)((long)&(pyVar109->alc).malloc + 4);
              uVar73 = (ulong)(byte)cVar99 - 0x30;
              if (uVar73 < 10) {
                p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar73 + (long)p_Var77 * 10);
                cVar99 = *(code *)((long)&(pyVar109->alc).malloc + 5);
                uVar73 = (ulong)(byte)cVar99 - 0x30;
                if (9 < uVar73) {
                  pyVar98 = (yyjson_doc *)((long)&(pyVar109->alc).malloc + 5);
                  if ((digi_table[(byte)cVar99] & 0x30) == 0) goto LAB_00f1b0a8;
                  p_Var114 = (_func_void_void_ptr_void_ptr *)0x0;
                  local_510 = (yyjson_doc *)0x0;
                  local_500 = pyVar98;
                  local_4f0 = pyVar98;
                  if (cVar99 == (code)0x2e) goto LAB_00f1c4ec;
                  goto LAB_00f1a322;
                }
                p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar73 + (long)p_Var77 * 10);
                cVar99 = *(code *)((long)&(pyVar109->alc).malloc + 6);
                uVar73 = (ulong)(byte)cVar99 - 0x30;
                if (uVar73 < 10) {
                  p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar73 + (long)p_Var77 * 10);
                  cVar99 = *(code *)((long)&(pyVar109->alc).malloc + 7);
                  uVar73 = (ulong)(byte)cVar99 - 0x30;
                  if (9 < uVar73) {
                    pyVar98 = (yyjson_doc *)((long)&(pyVar109->alc).malloc + 7);
                    if ((digi_table[(byte)cVar99] & 0x30) == 0) goto LAB_00f1b0a8;
                    p_Var114 = (_func_void_void_ptr_void_ptr *)0x0;
                    local_510 = (yyjson_doc *)0x0;
                    local_500 = pyVar98;
                    local_4f0 = pyVar98;
                    if (cVar99 == (code)0x2e) goto LAB_00f1c548;
                    goto LAB_00f1a322;
                  }
                  p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar73 + (long)p_Var77 * 10);
                  bVar84 = *(byte *)&(pyVar109->alc).realloc;
                  uVar73 = (ulong)bVar84 - 0x30;
                  if (uVar73 < 10) {
                    p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar73 + (long)p_Var77 * 10);
                    bVar84 = *(undefined1 *)((long)&(pyVar109->alc).realloc + 1);
                    uVar73 = (ulong)bVar84 - 0x30;
                    if (9 < uVar73) {
                      pyVar98 = (yyjson_doc *)((long)&(pyVar109->alc).realloc + 1);
                      if ((digi_table[bVar84] & 0x30) == 0) goto LAB_00f1b0a8;
                      p_Var114 = (_func_void_void_ptr_void_ptr *)0x0;
                      local_510 = (yyjson_doc *)0x0;
                      local_500 = pyVar98;
                      local_4f0 = pyVar98;
                      if (bVar84 == 0x2e) goto LAB_00f1c5a4;
                      goto LAB_00f1a322;
                    }
                    p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar73 + (long)p_Var77 * 10);
                    bVar84 = *(undefined1 *)((long)&(pyVar109->alc).realloc + 2);
                    uVar73 = (ulong)bVar84 - 0x30;
                    if (uVar73 < 10) {
                      p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar73 + (long)p_Var77 * 10);
                      pyVar98 = (yyjson_doc *)((long)&(pyVar109->alc).realloc + 3);
                      bVar100 = *(undefined1 *)((long)&(pyVar109->alc).realloc + 3);
                      bVar84 = digi_table[bVar100];
                      if ((bVar84 & 0x33) == 0) {
                        if ((cVar101 == (code)0x2d) &&
                           ((_func_void_void_ptr_void_ptr *)0x8000000000000000 < p_Var77)) {
                          if (local_554 < '\0') {
                            if (pyVar76->root != (yyjson_val *)0x0) {
                              *(code *)&pyVar76->root->tag = (code)0x0;
                            }
                            (local_540->alc).realloc =
                                 (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)
                                 (((long)pyVar98 - (long)local_550) * 0x100 + 1);
                            (local_540->alc).free = (_func_void_void_ptr_void_ptr *)local_550;
                            pyVar76->root = (yyjson_val *)pyVar98;
                            pyVar75 = local_548;
                            local_550 = pyVar98;
                            local_528 = pyVar76;
                            local_520 = pyVar74;
                            goto LAB_00f190ad;
                          }
                          auVar125._8_4_ = (int)((ulong)p_Var77 >> 0x20);
                          auVar125._0_8_ = p_Var77;
                          auVar125._12_4_ = 0x45300000;
                          (local_540->alc).realloc =
                               (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x14;
                          (local_540->alc).free =
                               (_func_void_void_ptr_void_ptr *)
                               -((auVar125._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)p_Var77) - 4503599627370496.0));
                          pyVar75 = local_548;
                          local_550 = pyVar98;
                          local_528 = pyVar76;
                          local_520 = pyVar74;
                          goto LAB_00f190ad;
                        }
                        (local_540->alc).realloc =
                             (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)
                             ((ulong)(uVar118 == 0x2d) * 8 + 4);
                        p_Var114 = (_func_void_void_ptr_void_ptr *)-(long)p_Var77;
                        if (cVar101 != (code)0x2d) {
                          p_Var114 = p_Var77;
                        }
                        (local_540->alc).free = p_Var114;
                        pyVar75 = local_548;
                        local_550 = pyVar98;
                        local_528 = pyVar76;
                        local_520 = pyVar74;
                        goto LAB_00f190ad;
                      }
                      local_500 = pyVar98;
                      if (((bVar84 & 3) != 0) &&
                         ((digi_table[(byte)*(undefined1 *)((long)&(pyVar109->alc).realloc + 4)] &
                          0x33) == 0)) {
                        puVar95 = (undefined1 *)((long)&(pyVar109->alc).realloc + 4);
                        uVar118 = (ulong)bVar100 - 0x30;
                        if ((p_Var77 < (_func_void_void_ptr_void_ptr *)0x1999999999999999) ||
                           ((p_Var77 == (_func_void_void_ptr_void_ptr *)0x1999999999999999 &&
                            (uVar118 < 6)))) {
                          p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar118 + (long)p_Var77 * 10);
                          if (cVar101 != (code)0x2d) {
                            (local_540->alc).realloc =
                                 (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x4;
                            (local_540->alc).free = p_Var77;
                            pyVar75 = local_548;
                            local_550 = (yyjson_doc *)puVar95;
                            local_528 = pyVar76;
                            local_520 = pyVar74;
                            goto LAB_00f190ad;
                          }
                          if (-1 < local_554) {
                            auVar126._8_4_ = (int)((ulong)p_Var77 >> 0x20);
                            auVar126._0_8_ = p_Var77;
                            auVar126._12_4_ = 0x45300000;
                            (local_540->alc).realloc =
                                 (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x14;
                            (local_540->alc).free =
                                 (_func_void_void_ptr_void_ptr *)
                                 -((auVar126._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)p_Var77) - 4503599627370496.0));
                            pyVar75 = local_548;
                            local_550 = (yyjson_doc *)puVar95;
                            local_528 = pyVar76;
                            local_520 = pyVar74;
                            goto LAB_00f190ad;
                          }
                          if (pyVar76->root != (yyjson_val *)0x0) {
                            *(code *)&pyVar76->root->tag = (code)0x0;
                          }
                          (local_540->alc).realloc =
                               (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)
                               (((long)puVar95 - (long)local_550) * 0x100 + 1);
                          (local_540->alc).free = (_func_void_void_ptr_void_ptr *)local_550;
                          pyVar76->root = (yyjson_val *)puVar95;
                          pyVar75 = local_548;
                          local_550 = (yyjson_doc *)puVar95;
                          local_528 = pyVar76;
                          local_520 = pyVar74;
                          goto LAB_00f190ad;
                        }
                      }
                      p_Var114 = (_func_void_void_ptr_void_ptr *)0x0;
                      if ((bVar84 & 0x20) != 0) {
                        local_4f0 = (yyjson_doc *)0x0;
                        local_510 = (yyjson_doc *)0x0;
                        goto LAB_00f1a322;
                      }
                      pyVar120 = pyVar98;
                      pyVar75 = (yyjson_doc *)0x0;
                      if (bVar100 != 0x2e) goto LAB_00f1a0c2;
                      bVar100 = *(undefined1 *)((long)&(pyVar109->alc).realloc + 4);
                      pyVar120 = (yyjson_doc *)((long)&(pyVar109->alc).realloc + 4);
                      pyVar75 = pyVar98;
                      local_528 = pyVar76;
                      if ((digi_table[bVar100] & 3) == 0) goto LAB_00f1c765;
                      goto LAB_00f1a0c2;
                    }
                    pyVar98 = (yyjson_doc *)((long)&(pyVar109->alc).realloc + 2);
                    if ((digi_table[bVar84] & 0x30) != 0) {
                      p_Var114 = (_func_void_void_ptr_void_ptr *)0x0;
                      local_510 = (yyjson_doc *)0x0;
                      local_500 = pyVar98;
                      local_4f0 = pyVar98;
                      if (bVar84 == 0x2e) goto LAB_00f1c5d2;
                      goto LAB_00f1a322;
                    }
                  }
                  else {
                    pyVar98 = (yyjson_doc *)&(pyVar109->alc).realloc;
                    if ((digi_table[bVar84] & 0x30) != 0) {
                      p_Var114 = (_func_void_void_ptr_void_ptr *)0x0;
                      local_510 = (yyjson_doc *)0x0;
                      local_500 = pyVar98;
                      local_4f0 = pyVar98;
                      if (bVar84 == 0x2e) goto LAB_00f1c576;
                      goto LAB_00f1a322;
                    }
                  }
                }
                else {
                  pyVar98 = (yyjson_doc *)((long)&(pyVar109->alc).malloc + 6);
                  if ((digi_table[(byte)cVar99] & 0x30) != 0) {
                    p_Var114 = (_func_void_void_ptr_void_ptr *)0x0;
                    local_510 = (yyjson_doc *)0x0;
                    local_500 = pyVar98;
                    local_4f0 = pyVar98;
                    if (cVar99 == (code)0x2e) goto LAB_00f1c51a;
                    goto LAB_00f1a322;
                  }
                }
              }
              else {
                pyVar98 = (yyjson_doc *)((long)&(pyVar109->alc).malloc + 4);
                if ((digi_table[(byte)cVar99] & 0x30) != 0) {
                  p_Var114 = (_func_void_void_ptr_void_ptr *)0x0;
                  local_510 = (yyjson_doc *)0x0;
                  local_500 = pyVar98;
                  local_4f0 = pyVar98;
                  if (cVar99 == (code)0x2e) goto LAB_00f1c4be;
                  goto LAB_00f1a322;
                }
              }
            }
            else {
              pyVar98 = (yyjson_doc *)((long)&(pyVar109->alc).malloc + 2);
              if ((digi_table[(byte)cVar99] & 0x30) != 0) {
                p_Var114 = (_func_void_void_ptr_void_ptr *)0x0;
                local_510 = (yyjson_doc *)0x0;
                local_500 = pyVar98;
                local_4f0 = pyVar98;
                if (cVar99 == (code)0x2e) goto LAB_00f1c462;
                goto LAB_00f1a322;
              }
            }
          }
          else {
            pyVar98 = (yyjson_doc *)&pyVar109->alc;
            if ((digi_table[(byte)cVar99] & 0x30) != 0) {
              p_Var114 = (_func_void_void_ptr_void_ptr *)0x0;
              local_510 = (yyjson_doc *)0x0;
              local_500 = pyVar98;
              local_4f0 = pyVar98;
              if (cVar99 == (code)0x2e) goto LAB_00f1c406;
              goto LAB_00f1a322;
            }
          }
        }
        else {
          pyVar98 = (yyjson_doc *)((long)&pyVar109->root + 6);
          if ((digi_table[(byte)cVar99] & 0x30) != 0) {
            p_Var114 = (_func_void_void_ptr_void_ptr *)0x0;
            local_510 = (yyjson_doc *)0x0;
            local_500 = pyVar98;
            local_4f0 = pyVar98;
            if (cVar99 == (code)0x2e) goto LAB_00f1c3aa;
            goto LAB_00f1a322;
          }
        }
      }
      else {
        pyVar98 = (yyjson_doc *)((long)&pyVar109->root + 4);
        if ((digi_table[(byte)cVar99] & 0x30) != 0) {
          p_Var114 = (_func_void_void_ptr_void_ptr *)0x0;
          local_510 = (yyjson_doc *)0x0;
          local_500 = pyVar98;
          local_4f0 = pyVar98;
          if (cVar99 == (code)0x2e) goto LAB_00f1c34e;
          goto LAB_00f1a322;
        }
      }
    }
    else {
      pyVar98 = (yyjson_doc *)((long)&pyVar109->root + 2);
      if ((digi_table[(byte)cVar99] & 0x30) != 0) {
        p_Var114 = (_func_void_void_ptr_void_ptr *)0x0;
        local_510 = (yyjson_doc *)0x0;
        local_500 = pyVar98;
        local_4f0 = pyVar98;
        if (cVar99 == (code)0x2e) goto LAB_00f1c2f2;
        goto LAB_00f1a322;
      }
    }
    (local_540->alc).realloc =
         (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)((ulong)(uVar118 == 0x2d) * 8 + 4);
    p_Var114 = (_func_void_void_ptr_void_ptr *)-(long)p_Var77;
    if (cVar101 != (code)0x2d) {
      p_Var114 = p_Var77;
    }
    (local_540->alc).free = p_Var114;
    pyVar75 = local_548;
    local_550 = pyVar98;
    local_528 = pyVar76;
    local_520 = pyVar74;
    goto LAB_00f190ad;
  }
  if (cVar99 != (code)0x30) {
    local_528 = pyVar76;
    local_520 = pyVar74;
    if ((flg & 0x10) == 0) goto LAB_00f17e71;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((long)pyVar109 - (ulong)(cVar101 == (code)0x2d));
    if (uVar112 == 0x49) {
LAB_00f1c1b4:
      if ((((byte)*(code *)((long)&pyVar109->root + 1) | 0x20) == 0x6e) &&
         (((byte)*(code *)((long)&pyVar109->root + 2) | 0x20) == 0x66)) {
        local_550 = (yyjson_doc *)((long)&pyVar109->root + 3);
        if (((((byte)*(code *)((long)&pyVar109->root + 3) | 0x20) == 0x69) &&
            (((((byte)*(code *)((long)&pyVar109->root + 4) | 0x20) == 0x6e &&
              (((byte)*(code *)((long)&pyVar109->root + 5) | 0x20) == 0x69)) &&
             (((byte)*(code *)((long)&pyVar109->root + 6) | 0x20) == 0x74)))) &&
           (((byte)*(code *)((long)&pyVar109->root + 7) | 0x20) == 0x79)) {
          local_550 = (yyjson_doc *)&pyVar109->alc;
        }
        if ((flg & 0xa0) == 0) {
          (local_540->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x14;
          p_Var77 = (_func_void_void_ptr_void_ptr *)
                    (((ulong)(cVar101 != (code)0x2d) << 0x3f) + -0x10000000000000);
        }
        else {
          if (pyVar76->root != (yyjson_val *)0x0) {
            *(code *)&pyVar76->root->tag = (code)0x0;
          }
          pyVar76->root = (yyjson_val *)local_550;
          (local_540->alc).realloc =
               (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)
               (((long)local_550 - (long)p_Var77) * 0x100 + 1);
        }
        (local_540->alc).free = p_Var77;
        pyVar75 = local_548;
        goto LAB_00f190ad;
      }
      if (((byte)cVar99 | 0x20) != 0x6e) goto LAB_00f17e71;
    }
    else if ((cVar99 != (code)0x4e) && (cVar99 != (code)0x6e)) {
      if (cVar99 == (code)0x69) goto LAB_00f1c1b4;
      goto LAB_00f17e71;
    }
    if ((((byte)*(code *)((long)&pyVar109->root + 1) | 0x20) == 0x61) &&
       (((byte)*(code *)((long)&pyVar109->root + 2) | 0x20) == 0x6e)) {
      local_550 = (yyjson_doc *)((long)&pyVar109->root + 3);
      if ((flg & 0xa0) == 0) {
        (local_540->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x14;
        p_Var77 = (_func_void_void_ptr_void_ptr *)
                  (((ulong)(cVar101 != (code)0x2d) << 0x3f) + -0x8000000000000);
      }
      else {
        if (pyVar76->root != (yyjson_val *)0x0) {
          *(code *)&pyVar76->root->tag = (code)0x0;
        }
        pyVar76->root = (yyjson_val *)local_550;
        (local_540->alc).realloc =
             (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)
             ((ulong)(cVar101 == (code)0x2d) * 0x100 + 0x301);
      }
      (local_540->alc).free = p_Var77;
      pyVar75 = local_548;
      goto LAB_00f190ad;
    }
LAB_00f17e71:
    msg = "no digit after minus sign";
    goto LAB_00f1c76c;
  }
  pyVar94 = (yyjson_doc *)((long)&pyVar109->root + 1);
  cVar99 = *(code *)((long)&pyVar109->root + 1);
  bVar84 = digi_table[(byte)cVar99];
  if ((bVar84 & 0x33) == 0) {
    (local_540->alc).realloc =
         (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)((ulong)(cVar101 == (code)0x2d) * 8 + 4);
    (local_540->alc).free = (_func_void_void_ptr_void_ptr *)0x0;
    pyVar75 = local_548;
    local_550 = pyVar94;
    local_528 = pyVar76;
    local_520 = pyVar74;
    goto LAB_00f190ad;
  }
  if (cVar99 != (code)0x2e) goto LAB_00f1cbe0;
  local_528 = pyVar76;
  if ((digi_table[(byte)*(code *)((long)&pyVar109->root + 2)] & 3) == 0) goto LAB_00f1c761;
  pyVar94 = (yyjson_doc *)((long)&local_550->root + uVar73 + 1);
  do {
    pyVar120 = pyVar94;
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar120->root + 1);
    pyVar94 = (yyjson_doc *)((long)&pyVar120->root + 1);
  } while (uVar118 == 0x30);
  bVar84 = digi_table[uVar118];
  if ((bVar84 & 3) == 0) goto LAB_00f1cbe0;
  p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar118 - 0x30);
LAB_00f1c2c4:
  pyVar98 = (yyjson_doc *)((long)&pyVar109->root + 1);
  local_4f0 = (yyjson_doc *)((long)&pyVar120->root + 2);
  uVar118 = (ulong)(byte)*(code *)((long)&pyVar120->root + 2);
  local_500 = pyVar98;
  if (uVar118 - 0x30 < 10) {
    p_Var77 = (_func_void_void_ptr_void_ptr *)((uVar118 - 0x30) + (long)p_Var77 * 10);
LAB_00f1c2f2:
    local_4f0 = (yyjson_doc *)((long)&pyVar120->root + 3);
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar120->root + 3);
    local_500 = pyVar98;
    if (9 < uVar118 - 0x30) goto LAB_00f1c61c;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((uVar118 - 0x30) + (long)p_Var77 * 10);
LAB_00f1c320:
    local_4f0 = (yyjson_doc *)((long)&pyVar120->root + 4);
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar120->root + 4);
    local_500 = pyVar98;
    if (9 < uVar118 - 0x30) goto LAB_00f1c61c;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((uVar118 - 0x30) + (long)p_Var77 * 10);
LAB_00f1c34e:
    local_4f0 = (yyjson_doc *)((long)&pyVar120->root + 5);
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar120->root + 5);
    local_500 = pyVar98;
    if (9 < uVar118 - 0x30) goto LAB_00f1c61c;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((uVar118 - 0x30) + (long)p_Var77 * 10);
LAB_00f1c37c:
    local_4f0 = (yyjson_doc *)((long)&pyVar120->root + 6);
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar120->root + 6);
    local_500 = pyVar98;
    if (9 < uVar118 - 0x30) goto LAB_00f1c61c;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((uVar118 - 0x30) + (long)p_Var77 * 10);
LAB_00f1c3aa:
    local_4f0 = (yyjson_doc *)((long)&pyVar120->root + 7);
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar120->root + 7);
    local_500 = pyVar98;
    if (9 < uVar118 - 0x30) goto LAB_00f1c61c;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((uVar118 - 0x30) + (long)p_Var77 * 10);
LAB_00f1c3d8:
    local_4f0 = (yyjson_doc *)&pyVar120->alc;
    uVar118 = (ulong)(byte)*(code *)&(pyVar120->alc).malloc;
    local_500 = pyVar98;
    if (9 < uVar118 - 0x30) goto LAB_00f1c61c;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((uVar118 - 0x30) + (long)p_Var77 * 10);
LAB_00f1c406:
    local_4f0 = (yyjson_doc *)((long)&(pyVar120->alc).malloc + 1);
    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar120->alc).malloc + 1);
    local_500 = pyVar98;
    if (9 < uVar118 - 0x30) goto LAB_00f1c61c;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((uVar118 - 0x30) + (long)p_Var77 * 10);
LAB_00f1c434:
    local_4f0 = (yyjson_doc *)((long)&(pyVar120->alc).malloc + 2);
    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar120->alc).malloc + 2);
    local_500 = pyVar98;
    if (9 < uVar118 - 0x30) goto LAB_00f1c61c;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((uVar118 - 0x30) + (long)p_Var77 * 10);
LAB_00f1c462:
    local_4f0 = (yyjson_doc *)((long)&(pyVar120->alc).malloc + 3);
    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar120->alc).malloc + 3);
    local_500 = pyVar98;
    if (9 < uVar118 - 0x30) goto LAB_00f1c61c;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((uVar118 - 0x30) + (long)p_Var77 * 10);
LAB_00f1c490:
    local_4f0 = (yyjson_doc *)((long)&(pyVar120->alc).malloc + 4);
    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar120->alc).malloc + 4);
    local_500 = pyVar98;
    if (9 < uVar118 - 0x30) goto LAB_00f1c61c;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((uVar118 - 0x30) + (long)p_Var77 * 10);
LAB_00f1c4be:
    local_4f0 = (yyjson_doc *)((long)&(pyVar120->alc).malloc + 5);
    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar120->alc).malloc + 5);
    local_500 = pyVar98;
    if (9 < uVar118 - 0x30) goto LAB_00f1c61c;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((uVar118 - 0x30) + (long)p_Var77 * 10);
LAB_00f1c4ec:
    local_4f0 = (yyjson_doc *)((long)&(pyVar120->alc).malloc + 6);
    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar120->alc).malloc + 6);
    local_500 = pyVar98;
    if (9 < uVar118 - 0x30) goto LAB_00f1c61c;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((uVar118 - 0x30) + (long)p_Var77 * 10);
LAB_00f1c51a:
    local_4f0 = (yyjson_doc *)((long)&(pyVar120->alc).malloc + 7);
    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar120->alc).malloc + 7);
    local_500 = pyVar98;
    if (9 < uVar118 - 0x30) goto LAB_00f1c61c;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((uVar118 - 0x30) + (long)p_Var77 * 10);
LAB_00f1c548:
    local_4f0 = (yyjson_doc *)&(pyVar120->alc).realloc;
    uVar118 = (ulong)*(byte *)&(pyVar120->alc).realloc;
    local_500 = pyVar98;
    if (9 < uVar118 - 0x30) goto LAB_00f1c61c;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((uVar118 - 0x30) + (long)p_Var77 * 10);
LAB_00f1c576:
    local_4f0 = (yyjson_doc *)((long)&(pyVar120->alc).realloc + 1);
    uVar118 = (ulong)(byte)*(undefined1 *)((long)&(pyVar120->alc).realloc + 1);
    local_500 = pyVar98;
    if (9 < uVar118 - 0x30) goto LAB_00f1c61c;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((uVar118 - 0x30) + (long)p_Var77 * 10);
LAB_00f1c5a4:
    local_4f0 = (yyjson_doc *)((long)&(pyVar120->alc).realloc + 2);
    uVar118 = (ulong)(byte)*(undefined1 *)((long)&(pyVar120->alc).realloc + 2);
    local_500 = pyVar98;
    if (9 < uVar118 - 0x30) goto LAB_00f1c61c;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((uVar118 - 0x30) + (long)p_Var77 * 10);
LAB_00f1c5d2:
    local_4f0 = (yyjson_doc *)((long)&(pyVar120->alc).realloc + 3);
    uVar118 = (ulong)(byte)*(undefined1 *)((long)&(pyVar120->alc).realloc + 3);
    local_500 = pyVar98;
    if (9 < uVar118 - 0x30) goto LAB_00f1c61c;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((uVar118 - 0x30) + (long)p_Var77 * 10);
    bVar100 = *(undefined1 *)((long)&(pyVar120->alc).realloc + 4);
    uVar118 = (ulong)bVar100;
    local_4f0 = (yyjson_doc *)((long)&(pyVar120->alc).realloc + 4);
    pyVar120 = local_4f0;
    pyVar75 = pyVar98;
    if ((digi_table[uVar118] & 3) == 0) goto LAB_00f1c61c;
LAB_00f1a0c2:
    p_Var113 = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)
               ((long)pyVar120 * 0x100 + (long)local_550 * -0x100 + 1);
    pyVar109 = (yyjson_doc *)((long)&pyVar120->root + 1);
    do {
      pyVar94 = pyVar109;
      bVar84 = digi_table[(byte)*(code *)&pyVar94->root];
      pyVar109 = (yyjson_doc *)((long)&pyVar94->root + 1);
      p_Var113 = p_Var113 + 0x100;
    } while ((bVar84 & 3) != 0);
    p_Var77 = p_Var77 + (0x34 < bVar100);
    pyVar98 = pyVar94;
    if (pyVar75 == (yyjson_doc *)0x0) {
      if ((local_554 < '\0') && ((bVar84 & 0x30) == 0)) {
        if (pyVar76->root != (yyjson_val *)0x0) {
          *(code *)&pyVar76->root->tag = (code)0x0;
        }
        (local_540->alc).realloc = p_Var113;
        (local_540->alc).free = (_func_void_void_ptr_void_ptr *)local_550;
        pyVar76->root = (yyjson_val *)pyVar94;
        pyVar75 = local_548;
        local_550 = pyVar94;
        local_528 = pyVar76;
        local_520 = pyVar74;
        goto LAB_00f190ad;
      }
      pyVar75 = pyVar94;
      if (*(code *)&pyVar94->root == (code)0x2e) {
        if ((digi_table[(byte)*(code *)&pyVar109->root] & 3) == 0) {
          msg = "no digit after decimal point";
          pyVar120 = local_518;
          pyVar75 = local_548;
          local_550 = pyVar109;
          local_528 = pyVar76;
          local_520 = pyVar74;
          goto LAB_00f1c788;
        }
        do {
          pyVar98 = (yyjson_doc *)((long)&pyVar94->root + 1);
          bVar84 = digi_table[(byte)*(code *)((long)&pyVar94->root + 1)];
          pyVar94 = pyVar98;
        } while ((bVar84 & 3) != 0);
      }
    }
    pyVar109 = pyVar98;
    do {
      do {
        pyVar109 = (yyjson_doc *)((long)&pyVar109[-1].str_pool + 7);
      } while (*(code *)&pyVar109->root == (code)0x30);
    } while (*(code *)&pyVar109->root == (code)0x2e);
    p_Var114 = (_func_void_void_ptr_void_ptr *)
               ((long)pyVar75 + ((ulong)(pyVar75 < pyVar120) - (long)pyVar120));
    local_510 = pyVar120;
    local_4f0 = pyVar98;
    if (pyVar109 < pyVar120) {
      local_510 = (yyjson_doc *)0x0;
      local_4f0 = (yyjson_doc *)0x0;
    }
    local_500 = pyVar75;
    if ((bVar84 & 0x20) != 0) goto LAB_00f1a322;
LAB_00f1a3c2:
    if ((long)p_Var114 < -0x157) {
      (local_540->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x14;
      (local_540->alc).free =
           (_func_void_void_ptr_void_ptr *)((ulong)(cVar101 == (code)0x2d) << 0x3f);
      pyVar75 = local_548;
      local_550 = pyVar98;
      local_528 = pyVar76;
      local_520 = pyVar74;
      goto LAB_00f190ad;
    }
    if ((long)p_Var114 < 0x135) {
LAB_00f1a3e9:
      exp = (i32)p_Var114;
      if (((ulong)p_Var77 >> 0x35 == 0) && (exp + 0x16U < 0x2d)) {
        if (exp < 0) {
          p_Var77 = (_func_void_void_ptr_void_ptr *)
                    ((double)(long)p_Var77 / *(double *)(f64_pow10_table + (ulong)(uint)-exp * 8));
        }
        else {
          p_Var77 = (_func_void_void_ptr_void_ptr *)
                    ((double)(long)p_Var77 *
                    *(double *)(f64_pow10_table + (ulong)(exp & 0x7fffffff) * 8));
        }
        (local_540->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x14;
        p_Var114 = (_func_void_void_ptr_void_ptr *)((ulong)p_Var77 ^ 0x8000000000000000);
        if (cVar101 != (code)0x2d) {
          p_Var114 = p_Var77;
        }
        (local_540->alc).free = p_Var114;
        pyVar75 = local_548;
        local_550 = pyVar98;
        local_528 = pyVar76;
        local_520 = pyVar74;
        goto LAB_00f190ad;
      }
      if ((exp + 0x132U < 0x252) && (local_510 == (yyjson_doc *)0x0)) {
        lVar85 = (long)(exp * 2 + 0x2ae);
        uVar118 = 0x3f;
        if (p_Var77 != (_func_void_void_ptr_void_ptr *)0x0) {
          for (; (ulong)p_Var77 >> uVar118 == 0; uVar118 = uVar118 - 1) {
          }
        }
        iVar102 = (int)(uVar118 ^ 0x3f);
        uVar118 = (long)p_Var77 << ((byte)(uVar118 ^ 0x3f) & 0x3f);
        auVar13._8_8_ = 0;
        auVar13._0_8_ = uVar118;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = *(ulong *)(pow10_sig_table + lVar85 * 8);
        auVar13 = auVar13 * auVar37;
        lVar117 = auVar13._8_8_;
        uVar73 = auVar13._0_8_;
        iVar115 = exp * 0x3526a + -0x3f0000 >> 0x10;
        if ((ulong)(auVar13._8_4_ & 0x1ff) - 1 < 0x1fe) {
LAB_00f1a4d0:
          uVar118 = lVar117 << (-1 < lVar117);
          uVar118 = (uVar118 & 0x400) + uVar118;
          (local_540->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x14;
          (local_540->alc).free =
               (_func_void_void_ptr_void_ptr *)
               ((ulong)(cVar101 == (code)0x2d) << 0x3f |
               uVar118 >> 0xb & 0xfffffffffffff |
               (ulong)(((iVar115 - iVar102) - (uint)(-1 < lVar117)) + 0x47e +
                      (uint)(uVar118 < 0x400)) << 0x34);
          pyVar75 = local_548;
          local_550 = pyVar98;
          local_528 = pyVar76;
          local_520 = pyVar74;
          goto LAB_00f190ad;
        }
        local_4a8 = (ulong)(exp * 2 + 0x2af);
        auVar14._8_8_ = 0;
        auVar14._0_8_ = uVar118;
        auVar38._8_8_ = 0;
        auVar38._0_8_ = *(ulong *)(pow10_sig_table + local_4a8 * 8);
        lVar91 = SUB168(auVar14 * auVar38,8);
        if ((lVar91 + uVar73) - 1 < 0xfffffffffffffffe) {
          lVar117 = lVar117 + (ulong)(lVar91 + uVar73 < uVar73);
          goto LAB_00f1a4d0;
        }
      }
      else {
        uVar118 = 0x3f;
        if (p_Var77 != (_func_void_void_ptr_void_ptr *)0x0) {
          for (; (ulong)p_Var77 >> uVar118 == 0; uVar118 = uVar118 - 1) {
          }
        }
        iVar102 = (int)(uVar118 ^ 0x3f);
        uVar118 = (long)p_Var77 << ((byte)(uVar118 ^ 0x3f) & 0x3f);
        lVar85 = (long)(exp * 2 + 0x2ae);
        local_4a8 = (ulong)(exp * 2 + 0x2af);
        iVar115 = exp * 0x3526a + -0x3f0000 >> 0x10;
      }
      lVar117 = ((ulong)(local_510 != (yyjson_doc *)0x0) << 2) << ((byte)iVar102 & 0x3f);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar118;
      auVar39._8_8_ = 0;
      auVar39._0_8_ =
           *(long *)(pow10_sig_table + lVar85 * 8) -
           (*(long *)(pow10_sig_table + local_4a8 * 8) >> 0x3f);
      uVar73 = SUB168(auVar15 * auVar39,8) - (SUB168(auVar15 * auVar39,0) >> 0x3f);
      uVar118 = 0x3f;
      if (uVar73 != 0) {
        for (; uVar73 >> uVar118 == 0; uVar118 = uVar118 - 1) {
        }
      }
      bVar84 = (byte)(uVar118 ^ 0x3f);
      uVar73 = uVar73 << (bVar84 & 0x3f);
      uVar112 = (9 - (ulong)(lVar117 == 0)) + lVar117 << (bVar84 & 0x3f);
      uVar116 = ((iVar115 - (int)(uVar118 ^ 0x3f)) - iVar102) + 0x40;
      iVar102 = 0xb;
      if (((int)uVar116 < -0x43d) &&
         ((iVar102 = 0x40, uVar116 < 0xfffffb8f ||
          (iVar102 = -0x432 - uVar116, uVar116 < 0xfffffb92)))) {
        bVar84 = (char)iVar102 - 0x3c;
        uVar73 = uVar73 >> (bVar84 & 0x3f);
        uVar116 = (uVar116 + iVar102) - 0x3c;
        uVar112 = (uVar112 >> (bVar84 & 0x3f)) + 9;
        iVar102 = 0x3c;
      }
      bVar84 = (byte)iVar102;
      lVar85 = 8L << (bVar84 - 1 & 0x3f);
      uVar105 = (~(-1L << (bVar84 & 0x3f)) & uVar73) * 8;
      uVar118 = lVar85 + uVar112;
      uVar97 = 0;
      uVar73 = (ulong)(uVar118 <= uVar105) + (uVar73 >> (bVar84 & 0x3f));
      if (uVar73 == 0) {
LAB_00f1b487:
        if ((uVar105 <= lVar85 - uVar112) || (uVar118 <= uVar105)) {
          (local_540->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x14;
          (local_540->alc).free =
               (_func_void_void_ptr_void_ptr *)(uVar97 | (ulong)(cVar101 == (code)0x2d) << 0x3f);
          pyVar75 = local_548;
          local_550 = pyVar98;
          local_528 = pyVar76;
          local_520 = pyVar74;
          goto LAB_00f190ad;
        }
        iVar102 = -0x433;
        if (0xfffffffffffff < uVar97) {
          iVar102 = (uint)(uVar97 >> 0x34) - 0x434;
        }
        local_4a8 = CONCAT44(local_4a8._4_4_,iVar102);
        uVar118 = (uVar97 & 0xfffffffffffff) + 0x10000000000000;
        if (0xfffffffffffff >= uVar97) {
          uVar118 = uVar97;
        }
        local_528 = pyVar76;
        local_520 = pyVar74;
        bigint_set_buf(&big_full,(u64)p_Var77,&exp,(u8 *)local_510,(u8 *)local_4f0,(u8 *)local_500);
        local_230[0] = uVar118 * 2 + 1;
        iVar102 = exp;
        if (exp < 0) {
          uVar116 = 1;
          for (iVar102 = -exp; uVar118 = (ulong)uVar116, 0x12 < iVar102; iVar102 = iVar102 + -0x13)
          {
            for (uVar73 = 0;
                (uVar112 = uVar118, uVar118 != uVar73 &&
                (uVar112 = uVar73, *(long *)((long)local_238 + (uVar73 + 1) * 8) == 0));
                uVar73 = uVar73 + 1) {
            }
            uVar73 = 0;
            for (; auVar60._8_8_ = 0, auVar60._0_8_ = uVar73, uVar112 < uVar118;
                uVar112 = uVar112 + 1) {
              auVar41._8_8_ = 0;
              auVar41._0_8_ = *(ulong *)((long)local_238 + (uVar112 + 1) * 8);
              auVar60 = ZEXT816(10000000000000000000) * auVar41 + auVar60;
              uVar73 = auVar60._8_8_;
              *(long *)((long)local_238 + (uVar112 + 1) * 8) = auVar60._0_8_;
            }
            if (uVar73 != 0) {
              uVar116 = uVar116 + 1;
              *(ulong *)((long)local_238 + (uVar118 + 1) * 8) = uVar73;
            }
          }
          if (iVar102 != 0) {
            uVar73 = *(ulong *)(u64_pow10_table + (long)iVar102 * 8);
            for (uVar112 = 0;
                (uVar105 = uVar118, uVar118 != uVar112 &&
                (uVar105 = uVar112, *(long *)((long)local_238 + (uVar112 + 1) * 8) == 0));
                uVar112 = uVar112 + 1) {
            }
            uVar112 = 0;
            for (; auVar62._8_8_ = 0, auVar62._0_8_ = uVar112, uVar105 < uVar118;
                uVar105 = uVar105 + 1) {
              auVar17._8_8_ = 0;
              auVar17._0_8_ = uVar73;
              auVar43._8_8_ = 0;
              auVar43._0_8_ = *(ulong *)((long)local_238 + (uVar105 + 1) * 8);
              auVar62 = auVar17 * auVar43 + auVar62;
              uVar112 = auVar62._8_8_;
              *(long *)((long)local_238 + (uVar105 + 1) * 8) = auVar62._0_8_;
            }
            if (uVar112 != 0) {
              uVar116 = uVar116 + 1;
              local_238[0] = uVar116;
              *(ulong *)((long)local_238 + (uVar118 + 1) * 8) = uVar112;
            }
          }
        }
        else {
          for (; uVar118 = (ulong)big_full.used, 0x12 < iVar102; iVar102 = iVar102 + -0x13) {
            for (uVar73 = 0;
                (uVar112 = uVar118, uVar118 != uVar73 &&
                (uVar112 = uVar73, big_full.bits[uVar73] == 0)); uVar73 = uVar73 + 1) {
            }
            uVar73 = 0;
            for (; auVar59._8_8_ = 0, auVar59._0_8_ = uVar73, uVar112 < uVar118;
                uVar112 = uVar112 + 1) {
              auVar40._8_8_ = 0;
              auVar40._0_8_ = big_full.bits[uVar112];
              auVar59 = ZEXT816(10000000000000000000) * auVar40 + auVar59;
              uVar73 = auVar59._8_8_;
              big_full.bits[uVar112] = auVar59._0_8_;
            }
            if (uVar73 != 0) {
              big_full.used = big_full.used + 1;
              big_full.bits[uVar118] = uVar73;
            }
          }
          uVar116 = 1;
          if (iVar102 != 0) {
            uVar73 = *(ulong *)(u64_pow10_table + (long)iVar102 * 8);
            for (uVar112 = 0;
                (uVar105 = uVar118, uVar118 != uVar112 &&
                (uVar105 = uVar112, big_full.bits[uVar112] == 0)); uVar112 = uVar112 + 1) {
            }
            uVar112 = 0;
            for (; auVar61._8_8_ = 0, auVar61._0_8_ = uVar112, uVar105 < uVar118;
                uVar105 = uVar105 + 1) {
              auVar16._8_8_ = 0;
              auVar16._0_8_ = uVar73;
              auVar42._8_8_ = 0;
              auVar42._0_8_ = big_full.bits[uVar105];
              auVar61 = auVar16 * auVar42 + auVar61;
              uVar112 = auVar61._8_8_;
              big_full.bits[uVar105] = auVar61._0_8_;
            }
            if (uVar112 != 0) {
              big_full.used = big_full.used + 1;
              big_full.bits[uVar118] = uVar112;
            }
          }
        }
        if ((int)(uint)local_4a8 < 1) {
          uVar110 = -(uint)local_4a8 >> 6;
          uVar118 = (ulong)uVar110;
          uVar73 = (ulong)big_full.used;
          uVar103 = -(uint)local_4a8 & 0x3f;
          if (uVar103 == 0) {
            while (uVar73 != 0) {
              big_full.bits[(int)uVar73 + (uVar110 - 1)] = big_full.bits[uVar73 - 1];
              uVar73 = uVar73 - 1;
            }
            big_full.used = big_full.used + uVar110;
            while (uVar118 != 0) {
              big_full.bits[uVar118 - 1] = 0;
              uVar118 = uVar118 - 1;
            }
          }
          else {
            big_full.bits[uVar73] = 0;
            sVar67 = (sbyte)uVar103;
            uVar103 = big_full.used + uVar110;
            while (uVar112 = uVar73 - 1, uVar112 != 0xffffffffffffffff) {
              big_full.bits[uVar103] =
                   big_full.bits[uVar112 & 0xffffffff] >> (0x40U - sVar67 & 0x3f) |
                   big_full.bits[uVar73] << sVar67;
              uVar103 = uVar103 - 1;
              uVar73 = uVar112;
            }
            big_full.bits[uVar118] = big_full.bits[0] << sVar67;
            big_full.used =
                 (big_full.used + uVar110 + 1) - (uint)(big_full.bits[big_full.used + uVar110] == 0)
            ;
            while (uVar118 != 0) {
              big_full.bits[uVar118 - 1] = 0;
              uVar118 = uVar118 - 1;
            }
          }
        }
        else {
          uVar103 = (uint)local_4a8 >> 6;
          uVar118 = (ulong)uVar103;
          uVar73 = (ulong)uVar116;
          bVar84 = (byte)local_4a8 & 0x3f;
          if ((local_4a8 & 0x3f) == 0) {
            while (uVar73 != 0) {
              *(undefined8 *)((long)local_238 + ((ulong)((int)uVar73 + (uVar103 - 1)) + 1) * 8) =
                   *(undefined8 *)((long)local_238 + uVar73 * 8);
              uVar73 = uVar73 - 1;
            }
            uVar116 = uVar116 + uVar103;
            while (uVar118 != 0) {
              *(undefined8 *)((long)local_238 + uVar118 * 8) = 0;
              uVar118 = uVar118 - 1;
            }
          }
          else {
            *(undefined8 *)((long)local_238 + (uVar73 + 1) * 8) = 0;
            uVar110 = uVar116 + uVar103;
            while (uVar112 = uVar73 - 1, uVar112 != 0xffffffffffffffff) {
              *(ulong *)((long)local_238 + ((ulong)uVar110 + 1) * 8) =
                   *(ulong *)((long)local_238 + ((uVar112 & 0xffffffff) + 1) * 8) >>
                   (0x40 - bVar84 & 0x3f) | *(long *)((long)local_238 + (uVar73 + 1) * 8) << bVar84;
              uVar110 = uVar110 - 1;
              uVar73 = uVar112;
            }
            *(long *)((long)local_238 + (uVar118 + 1) * 8) = local_230[0] << bVar84;
            uVar116 = (uVar116 + uVar103 + 1) -
                      (uint)(*(long *)((long)local_238 + ((ulong)(uVar116 + uVar103) + 1) * 8) == 0)
            ;
            while (uVar118 != 0) {
              *(undefined8 *)((long)local_238 + uVar118 * 8) = 0;
              uVar118 = uVar118 - 1;
            }
          }
        }
        uVar73 = (ulong)big_full.used;
        uVar118 = 0;
        if ((uVar116 <= big_full.used) && (uVar118 = 1, big_full.used <= uVar116)) {
          do {
            if (uVar73 == 0) {
              uVar118 = (ulong)((uint)uVar97 & 1);
              break;
            }
            puVar1 = (ulong *)((long)local_238 + uVar73 * 8);
            lVar85 = uVar73 - 1;
            if (big_full.bits[lVar85] < *puVar1) {
              uVar118 = 0;
              break;
            }
            uVar73 = uVar73 - 1;
          } while (big_full.bits[lVar85] <= *puVar1);
        }
        if (uVar118 + uVar97 != 0x7ff0000000000000) {
          (local_540->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x14;
          p_Var77 = (_func_void_void_ptr_void_ptr *)
                    (uVar118 + uVar97 | (ulong)(cVar101 == (code)0x2d) << 0x3f);
LAB_00f1ca69:
          (local_540->alc).free = p_Var77;
          pyVar76 = local_528;
          pyVar75 = local_548;
          local_550 = pyVar98;
          pyVar104 = local_548;
          goto LAB_00f190ad;
        }
        if (local_554 < '\0') {
LAB_00f1caaf:
          if (local_528->root != (yyjson_val *)0x0) {
            *(code *)&local_528->root->tag = (code)0x0;
          }
          (local_540->alc).realloc =
               (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)
               (((long)pyVar98 - (long)pyVar78) * 0x100 + 1);
          (local_540->alc).free = (_func_void_void_ptr_void_ptr *)pyVar78;
          local_528->root = (yyjson_val *)pyVar98;
          pyVar76 = local_528;
          pyVar75 = local_548;
          local_550 = pyVar98;
          pyVar104 = local_548;
          goto LAB_00f190ad;
        }
        if ((flg & 0x10) != 0) {
          (local_540->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x14;
          p_Var77 = (_func_void_void_ptr_void_ptr *)0x7ff0000000000000;
          if (cVar101 == (code)0x2d) {
            p_Var77 = (_func_void_void_ptr_void_ptr *)0xfff0000000000000;
          }
          goto LAB_00f1ca69;
        }
      }
      else {
        uVar97 = 0x3f;
        if (uVar73 != 0) {
          for (; uVar73 >> uVar97 == 0; uVar97 = uVar97 - 1) {
          }
        }
        uVar116 = (uVar116 + iVar102) - (int)(uVar97 ^ 0x3f);
        if ((int)uVar116 < 0x3c1) {
          uVar73 = (uVar73 << ((byte)(uVar97 ^ 0x3f) & 0x3f)) >> 0xb;
          if ((int)uVar116 < -0x43d) {
            uVar97 = 0;
            if (0xfffffb8e < uVar116) {
              uVar97 = uVar73 >> (-(char)uVar116 - 0x3dU & 0x3f);
            }
          }
          else {
            uVar97 = uVar73 & 0xfffffffffffff | (ulong)(uVar116 + 0x43e) << 0x34;
            if (uVar97 == 0x7ff0000000000000) goto LAB_00f1b633;
          }
          goto LAB_00f1b487;
        }
LAB_00f1b633:
        local_528 = pyVar76;
        local_520 = pyVar74;
        if (local_554 < '\0') goto LAB_00f1caaf;
        if ((flg & 0x10) != 0) {
          (local_540->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x14;
          p_Var77 = (_func_void_void_ptr_void_ptr *)
                    (((ulong)(cVar101 != (code)0x2d) << 0x3f) + -0x10000000000000);
          goto LAB_00f1ca69;
        }
      }
      msg = "number is infinity when parsed as double";
      pyVar120 = local_518;
      pyVar75 = local_548;
      local_550 = pyVar78;
    }
    else {
      if (local_554 < '\0') {
        if (pyVar76->root != (yyjson_val *)0x0) {
          *(code *)&pyVar76->root->tag = (code)0x0;
        }
        (local_540->alc).realloc =
             (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)
             (((long)pyVar98 - (long)local_550) * 0x100 + 1);
        (local_540->alc).free = (_func_void_void_ptr_void_ptr *)local_550;
        pyVar76->root = (yyjson_val *)pyVar98;
        local_550 = pyVar98;
        local_528 = pyVar76;
LAB_00f1b563:
        local_520 = (yyjson_doc *)((long)&local_520->root + 2);
        pyVar75 = local_548;
        goto LAB_00f190ad;
      }
      local_528 = pyVar76;
      local_520 = pyVar74;
      if ((flg & 0x10) != 0) {
        (local_540->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x14;
        (local_540->alc).free =
             (_func_void_void_ptr_void_ptr *)
             (((ulong)(cVar101 != (code)0x2d) << 0x3f) + -0x10000000000000);
        pyVar75 = local_548;
        local_550 = pyVar98;
        goto LAB_00f190ad;
      }
LAB_00f1b4f3:
      exp = 0;
      msg = "number is infinity when parsed as double";
      pyVar120 = local_518;
      pyVar75 = local_548;
    }
  }
  else {
LAB_00f1c61c:
    local_528 = pyVar76;
    if ((yyjson_doc *)((long)&local_500->root + 1U) == local_4f0) {
LAB_00f1c85a:
      local_520 = pyVar74;
      exp = 0;
      msg = "no digit after decimal point";
      local_550 = local_4f0;
      pyVar120 = local_518;
      pyVar75 = local_548;
      goto LAB_00f1c788;
    }
    p_Var114 = (_func_void_void_ptr_void_ptr *)((long)local_500 + (1 - (long)local_4f0));
    local_510 = (yyjson_doc *)0x0;
    pyVar98 = local_4f0;
    if ((digi_table[uVar118] & 0x20) == 0) {
      local_510 = (yyjson_doc *)0x0;
      if ((long)p_Var114 < -0x157) {
        (local_540->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x14;
        (local_540->alc).free =
             (_func_void_void_ptr_void_ptr *)((ulong)(cVar101 == (code)0x2d) << 0x3f);
        local_550 = local_4f0;
        pyVar75 = local_548;
        local_520 = pyVar74;
        goto LAB_00f190ad;
      }
      goto LAB_00f1a3e9;
    }
LAB_00f1a322:
    cVar99 = *(code *)((long)&pyVar98->root + 1);
    uVar118 = (ulong)((digi_table[(byte)cVar99] & 0xc) != 0);
    if ((digi_table[(byte)*(code *)((long)&pyVar98->root + uVar118 + 1)] & 3) != 0) {
      pyVar98 = (yyjson_doc *)((long)&pyVar98->root + uVar118);
      p_Var113 = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)
                 ((long)pyVar98 * 0x100 + (long)local_550 * -0x100 + 1);
      do {
        cVar89 = *(code *)((long)&pyVar98->root + 1);
        pyVar98 = (yyjson_doc *)((long)&pyVar98->root + 1);
        p_Var113 = p_Var113 + 0x100;
      } while (cVar89 == (code)0x30);
      lVar117 = 0;
      lVar85 = 0;
      while ((digi_table[(byte)cVar89] & 3) != 0) {
        lVar85 = lVar85 * 10 + (ulong)(byte)((char)cVar89 - 0x30);
        cVar89 = *(code *)((long)&pyVar98->root + 1);
        pyVar98 = (yyjson_doc *)((long)&pyVar98->root + 1);
        p_Var113 = p_Var113 + 0x100;
        lVar117 = lVar117 + 1;
      }
      if (lVar117 < 0x13) {
        lVar117 = -lVar85;
        if (cVar99 != (code)0x2d) {
          lVar117 = lVar85;
        }
        p_Var114 = p_Var114 + lVar117;
        goto LAB_00f1a3c2;
      }
      if (cVar99 == (code)0x2d) {
        (local_540->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x14;
        (local_540->alc).free =
             (_func_void_void_ptr_void_ptr *)((ulong)(cVar101 == (code)0x2d) << 0x3f);
        pyVar75 = local_548;
        local_550 = pyVar98;
        local_528 = pyVar76;
        local_520 = pyVar74;
        goto LAB_00f190ad;
      }
      if (local_554 < '\0') {
        if (pyVar76->root != (yyjson_val *)0x0) {
          *(code *)&pyVar76->root->tag = (code)0x0;
        }
        (local_540->alc).realloc = p_Var113;
        (local_540->alc).free = (_func_void_void_ptr_void_ptr *)local_550;
        pyVar76->root = (yyjson_val *)pyVar98;
        pyVar75 = local_548;
        local_550 = pyVar98;
        local_528 = pyVar76;
        local_520 = pyVar74;
        goto LAB_00f190ad;
      }
      local_528 = pyVar76;
      local_520 = pyVar74;
      if ((flg & 0x10) != 0) {
        (local_540->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x14;
        (local_540->alc).free =
             (_func_void_void_ptr_void_ptr *)
             (((ulong)(cVar101 != (code)0x2d) << 0x3f) + -0x10000000000000);
        pyVar75 = local_548;
        local_550 = pyVar98;
        goto LAB_00f190ad;
      }
      goto LAB_00f1b4f3;
    }
    msg = "no digit after exponent sign";
    pyVar120 = local_518;
    pyVar75 = local_548;
    local_550 = (yyjson_doc *)((long)&pyVar98->root + uVar118 + 1);
    local_528 = pyVar76;
    local_520 = pyVar74;
  }
LAB_00f1c788:
  pyVar78 = local_550;
  bVar70 = is_truncated_end((u8 *)pyVar120,(u8 *)local_550,(u8 *)local_4d0,9,flg);
  if (bVar70) {
    pyVar82 = local_4b8;
    if (local_4b8 == (yyjson_read_err *)0x0) {
      pyVar82 = &dummy_err;
    }
    pyVar82->pos = (long)local_4d0 - (long)local_518;
    local_4e0->code = 5;
    pcVar88 = "unexpected end of data";
  }
  else {
    pyVar82 = local_4b8;
    if (local_4b8 == (yyjson_read_err *)0x0) {
      pyVar82 = &dummy_err;
    }
    pyVar82->pos = (long)pyVar78 - (long)local_518;
    local_4e0->code = 9;
    pcVar88 = msg;
  }
  pyVar82 = local_4b8;
  if (local_4b8 == (yyjson_read_err *)0x0) {
    pyVar82 = &dummy_err;
  }
  pyVar82->msg = pcVar88;
  pyVar87 = local_4b8;
  goto joined_r0x00f1c844;
LAB_00f199c8:
  uVar118 = (ulong)(byte)*(code *)&pyVar78->root;
  if ((char_table[uVar118] & 0xc) == 0) {
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 1);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 1);
      goto LAB_00f19b10;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 2);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 2);
      goto LAB_00f19b10;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 3);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 3);
      goto LAB_00f19b10;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 4);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 4);
      goto LAB_00f19b10;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 5);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 5);
      goto LAB_00f19b10;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 6);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 6);
      goto LAB_00f19b10;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 7);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 7);
      goto LAB_00f19b10;
    }
    uVar118 = (ulong)(byte)*(code *)&(pyVar78->alc).malloc;
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)&pyVar78->alc;
      goto LAB_00f19b10;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 1);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 1);
      goto LAB_00f19b10;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 2);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 2);
      goto LAB_00f19b10;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 3);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 3);
      goto LAB_00f19b10;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 4);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 4);
      goto LAB_00f19b10;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 5);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 5);
      goto LAB_00f19b10;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 6);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 6);
      goto LAB_00f19b10;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 7);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 7);
      goto LAB_00f19b10;
    }
    pyVar78 = (yyjson_doc *)&(pyVar78->alc).realloc;
    goto LAB_00f199c8;
  }
LAB_00f19b10:
  pyVar74 = pyVar78;
  if ((char)uVar118 == '\"') goto LAB_00f19c1f;
  if (-1 < (char)uVar118) goto LAB_00f1b844;
  lVar85 = 0;
  for (; ((uVar116 = *(uint *)&pyVar78->root, (uVar116 & 0xc0c0f0) == 0x8080e0 &&
          ((uVar116 & 0x200f) != 0)) && ((uVar116 & 0x200f) != 0x200d));
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 3)) {
    lVar85 = lVar85 + -3;
  }
  pyVar75 = local_548;
  local_528 = pyVar76;
  if (-1 < (char)uVar116) goto LAB_00f199c8;
  while (((uVar116 & 0xc0e0) == 0x80c0 && ((uVar116 & 0x1e) != 0))) {
    ppyVar68 = &pyVar78->root;
    pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 2);
    lVar85 = lVar85 + -2;
    uVar116 = *(uint *)((long)ppyVar68 + 2);
  }
  while ((((uVar116 & 0xc0c0c0f8) == 0x808080f0 && ((uVar116 & 0x3007) != 0)) &&
         (((byte)uVar116 >> 2 & (uVar116 & 0x3003) != 0) == 0))) {
    ppyVar68 = &pyVar78->root;
    pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 4);
    lVar85 = lVar85 + -4;
    uVar116 = *(uint *)((long)ppyVar68 + 4);
  }
  if (lVar85 != 0) goto LAB_00f199c8;
  if ((flg & 0x40) != 0) {
    pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 1);
    goto LAB_00f199c8;
  }
LAB_00f1c707:
  msg = "invalid UTF-8 encoding in string";
  pyVar74 = pyVar78;
LAB_00f1be1f:
  pyVar78 = local_4d0;
  pcVar88 = msg;
  pyVar120 = local_518;
  local_550 = pyVar74;
  bVar70 = is_truncated_end((u8 *)local_518,(u8 *)pyVar74,(u8 *)local_4d0,10,flg);
  if (bVar70) {
    pyVar74 = pyVar78;
  }
  pcVar81 = "unexpected end of data";
  if (!bVar70) {
    pcVar81 = pcVar88;
  }
  pyVar82 = local_4b8;
  if (local_4b8 == (yyjson_read_err *)0x0) {
    pyVar82 = &dummy_err;
  }
  pyVar82->pos = (long)pyVar74 - (long)pyVar120;
  goto LAB_00f1cdb2;
LAB_00f1b844:
  if (SUB81(uVar118,0) != (code)0x5c) {
    if ((int)uVar118 == 0x22) {
      uStackY_580 = 5;
      pyVar75 = local_548;
      local_528 = pyVar76;
LAB_00f19c1f:
      (local_540->alc).realloc =
           (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)
           (((long)pyVar78 - (long)pyVar120) * 0x100 | uStackY_580);
      (local_540->alc).free = (_func_void_void_ptr_void_ptr *)pyVar120;
      *(code *)&pyVar78->root = (code)0x0;
      local_550 = (yyjson_doc *)((long)&pyVar74->root + 1);
      goto LAB_00f190ad;
    }
    local_528 = pyVar76;
    if ((flg & 0x40) == 0) goto LAB_00f1c744;
    if (local_4d0 <= pyVar74) goto LAB_00f1c713;
    pyVar109 = (yyjson_doc *)((long)&pyVar74->root + 1);
    *(code *)&pyVar78->root = SUB81(uVar118,0);
    pyVar75 = (yyjson_doc *)((long)&pyVar78->root + 1);
    goto LAB_00f1b973;
  }
  cVar101 = *(code *)((long)&pyVar74->root + 1);
  local_528 = pyVar76;
  switch(cVar101) {
  case (code)0x6e:
    *(code *)&pyVar78->root = (code)0xa;
    break;
  case (code)0x6f:
  case (code)0x70:
  case (code)0x71:
  case (code)0x73:
    goto switchD_00f16e5b_caseD_6f;
  case (code)0x72:
    *(code *)&pyVar78->root = (code)0xd;
    break;
  case (code)0x74:
    *(code *)&pyVar78->root = (code)0x9;
    break;
  case (code)0x75:
    uVar2 = CONCAT11(hex_conv_table[(byte)*(code *)((long)&pyVar74->root + 3)],
                     hex_conv_table[(byte)*(code *)((long)&pyVar74->root + 5)]);
    if (((uVar2 | CONCAT11(hex_conv_table[(byte)*(code *)((long)&pyVar74->root + 2)],
                           hex_conv_table[(byte)*(code *)((long)&pyVar74->root + 4)])) & 0xf0f0) !=
        0) goto LAB_00f1be85;
    uVar116 = (uint)CONCAT11(hex_conv_table[(byte)*(code *)((long)&pyVar74->root + 2)],
                             hex_conv_table[(byte)*(code *)((long)&pyVar74->root + 4)]) << 4;
    uVar103 = uVar2 | uVar116;
    pyVar109 = (yyjson_doc *)((long)&pyVar74->root + 6);
    if ((uVar103 & 0xf800) != 0xd800) {
      cVar101 = SUB41(uVar103,0);
      if ((ushort)uVar103 < 0x800) {
        if ((ushort)uVar103 < 0x80) {
          *(code *)&pyVar78->root = cVar101;
          pyVar75 = (yyjson_doc *)((long)&pyVar78->root + 1);
        }
        else {
          *(byte *)&pyVar78->root = (byte)(uVar103 >> 6) | 0xc0;
          *(byte *)((long)&pyVar78->root + 1) = (byte)cVar101 & 0x3f | 0x80;
          pyVar75 = (yyjson_doc *)((long)&pyVar78->root + 2);
        }
      }
      else {
        *(byte *)&pyVar78->root = (byte)(((uint)uVar2 | uVar116 & 0xffff) >> 0xc) | 0xe0;
        *(byte *)((long)&pyVar78->root + 1) = (byte)(uVar103 >> 6) & 0x3f | 0x80;
        *(byte *)((long)&pyVar78->root + 2) = (byte)cVar101 & 0x3f | 0x80;
        pyVar75 = (yyjson_doc *)((long)&pyVar78->root + 3);
      }
      goto LAB_00f1b973;
    }
    if ((uVar103 & 0xdc00) == 0xd800) {
      if (*(short *)&pyVar109->root == 0x755c) {
        if (((CONCAT11(hex_conv_table[(byte)*(code *)((long)&(pyVar74->alc).malloc + 1)],
                       hex_conv_table[(byte)*(code *)((long)&(pyVar74->alc).malloc + 3)]) |
             CONCAT11(hex_conv_table[(byte)*(code *)&(pyVar74->alc).malloc],
                      hex_conv_table[(byte)*(code *)((long)&(pyVar74->alc).malloc + 2)])) & 0xf0f0)
            == 0) {
          uVar116 = (CONCAT11(hex_conv_table[(byte)*(code *)&(pyVar74->alc).malloc],
                              hex_conv_table[(byte)*(code *)((long)&(pyVar74->alc).malloc + 2)]) &
                    0xfff) << 4 |
                    (uint)CONCAT11(hex_conv_table[(byte)*(code *)((long)&(pyVar74->alc).malloc + 1)]
                                   ,hex_conv_table
                                    [(byte)*(code *)((long)&(pyVar74->alc).malloc + 3)]);
          if ((uVar116 & 0xfc00) == 0xdc00) {
            iVar102 = (uVar103 & 0xdbff) * 0x400;
            uVar103 = iVar102 + uVar116 + 0xfca02400;
            *(byte *)&pyVar78->root = (byte)(uVar103 >> 0x12) | 0xf0;
            *(byte *)((long)&pyVar78->root + 1) = (byte)(uVar103 >> 0xc) & 0x3f | 0x80;
            *(byte *)((long)&pyVar78->root + 2) =
                 (byte)(uVar116 + iVar102 + 0x400 >> 6) & 0x3f | 0x80;
            *(byte *)((long)&pyVar78->root + 3) = (byte)uVar116 & 0x3f | 0x80;
            pyVar109 = (yyjson_doc *)((long)&(pyVar74->alc).malloc + 4);
            pyVar75 = (yyjson_doc *)((long)&pyVar78->root + 4);
            goto LAB_00f1b973;
          }
LAB_00f1c728:
          msg = "invalid low surrogate in string";
          pyVar74 = pyVar109;
        }
        else {
LAB_00f1c71f:
          msg = "invalid escaped sequence in string";
          pyVar74 = pyVar109;
        }
      }
      else {
LAB_00f1c6fe:
        msg = "no low surrogate in string";
        pyVar74 = pyVar109;
      }
    }
    else {
LAB_00f1c6f2:
      msg = "invalid high surrogate in string";
    }
    goto LAB_00f1be1f;
  default:
    if (cVar101 == (code)0x66) {
      *(code *)&pyVar78->root = (code)0xc;
    }
    else if (cVar101 == (code)0x2f) {
      *(code *)&pyVar78->root = (code)0x2f;
    }
    else if (cVar101 == (code)0x5c) {
      *(code *)&pyVar78->root = (code)0x5c;
    }
    else if (cVar101 == (code)0x62) {
      *(code *)&pyVar78->root = (code)0x8;
    }
    else {
      if (cVar101 != (code)0x22) goto switchD_00f16e5b_caseD_6f;
      *(code *)&pyVar78->root = (code)0x22;
    }
  }
  pyVar109 = (yyjson_doc *)((long)&pyVar74->root + 2);
  pyVar75 = (yyjson_doc *)((long)&pyVar78->root + 1);
LAB_00f1b973:
  do {
    pyVar78 = pyVar75;
    pyVar74 = pyVar109;
    if ((char_table[(byte)*(code *)&pyVar109->root] & 0xc) != 0) {
LAB_00f1bbc6:
      while( true ) {
        uVar118 = (ulong)(byte)*(code *)&pyVar74->root;
        if (-1 < (char)*(code *)&pyVar74->root) goto LAB_00f1b844;
        lVar85 = 0;
        pyVar75 = pyVar78;
        for (pyVar109 = pyVar74;
            ((uVar116 = *(uint *)&pyVar109->root, (uVar116 & 0xc0c0f0) == 0x8080e0 &&
             ((uVar116 & 0x200f) != 0)) && ((uVar116 & 0x200f) != 0x200d));
            pyVar109 = (yyjson_doc *)((long)&pyVar109->root + 3)) {
          *(uint *)&pyVar75->root = uVar116;
          pyVar75 = (yyjson_doc *)((long)&pyVar75->root + 3);
          lVar85 = lVar85 + 3;
        }
        if (-1 < (char)uVar116) break;
        while (((uVar116 & 0xc0e0) == 0x80c0 && ((uVar116 & 0x1e) != 0))) {
          *(short *)&pyVar75->root = (short)uVar116;
          pyVar75 = (yyjson_doc *)((long)&pyVar75->root + 2);
          ppyVar68 = &pyVar109->root;
          pyVar109 = (yyjson_doc *)((long)&pyVar109->root + 2);
          lVar85 = lVar85 + 2;
          uVar116 = *(uint *)((long)ppyVar68 + 2);
        }
        while ((((uVar116 & 0x3007) != 0 && ((uVar116 & 0xc0c0c0f8) == 0x808080f0)) &&
               (((byte)uVar116 >> 2 & (uVar116 & 0x3003) != 0) == 0))) {
          *(uint *)((long)&pyVar78->root + lVar85) = uVar116;
          lVar117 = lVar85 + 4;
          lVar85 = lVar85 + 4;
          uVar116 = *(uint *)((long)&pyVar74->root + lVar117);
        }
        pyVar109 = (yyjson_doc *)((long)&pyVar74->root + lVar85);
        pyVar78 = (yyjson_doc *)((long)&pyVar78->root + lVar85);
        pyVar75 = pyVar78;
        if (lVar85 != 0) break;
        local_528 = pyVar76;
        if ((flg & 0x40) == 0) goto LAB_00f18e27;
LAB_00f1ba7e:
        *(short *)&pyVar78->root = (short)uVar116;
        pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 1);
        pyVar74 = (yyjson_doc *)((long)&pyVar109->root + 1);
      }
      goto LAB_00f1b973;
    }
    if ((char_table[(byte)*(code *)((long)&pyVar109->root + 1)] & 0xc) != 0) {
      uVar116 = (uint)*(ushort *)&pyVar109->root;
      goto LAB_00f1ba7e;
    }
    if ((char_table[(byte)*(code *)((long)&pyVar109->root + 2)] & 0xc) != 0) {
      pyVar74 = (yyjson_doc *)((long)&pyVar109->root + 2);
      *(undefined2 *)&pyVar78->root = *(undefined2 *)&pyVar109->root;
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 2);
      goto LAB_00f1bbc6;
    }
    if ((char_table[(byte)*(code *)((long)&pyVar109->root + 3)] & 0xc) != 0) {
      pyVar74 = (yyjson_doc *)((long)&pyVar109->root + 3);
      *(undefined4 *)&pyVar78->root = *(undefined4 *)&pyVar109->root;
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 3);
      goto LAB_00f1bbc6;
    }
    if ((char_table[(byte)*(code *)((long)&pyVar109->root + 4)] & 0xc) != 0) {
      pyVar74 = (yyjson_doc *)((long)&pyVar109->root + 4);
      *(undefined4 *)&pyVar78->root = *(undefined4 *)&pyVar109->root;
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 4);
      goto LAB_00f1bbc6;
    }
    if ((char_table[(byte)*(code *)((long)&pyVar109->root + 5)] & 0xc) != 0) {
      *(undefined4 *)&pyVar78->root = *(undefined4 *)&pyVar109->root;
      *(undefined2 *)((long)&pyVar78->root + 4) = *(undefined2 *)((long)&pyVar109->root + 4);
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 5);
      pyVar74 = (yyjson_doc *)((long)&pyVar109->root + 5);
      goto LAB_00f1bbc6;
    }
    if ((char_table[(byte)*(code *)((long)&pyVar109->root + 6)] & 0xc) != 0) {
      *(undefined4 *)&pyVar78->root = *(undefined4 *)&pyVar109->root;
      *(undefined2 *)((long)&pyVar78->root + 4) = *(undefined2 *)((long)&pyVar109->root + 4);
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 6);
      pyVar74 = (yyjson_doc *)((long)&pyVar109->root + 6);
      goto LAB_00f1bbc6;
    }
    if ((char_table[(byte)*(code *)((long)&pyVar109->root + 7)] & 0xc) != 0) {
      pyVar74 = (yyjson_doc *)((long)&pyVar109->root + 7);
      pyVar78->root = pyVar109->root;
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 7);
      goto LAB_00f1bbc6;
    }
    if ((char_table[(byte)*(code *)&(pyVar109->alc).malloc] & 0xc) != 0) {
      pyVar74 = (yyjson_doc *)&pyVar109->alc;
      pyVar78->root = pyVar109->root;
      pyVar78 = (yyjson_doc *)&pyVar78->alc;
      goto LAB_00f1bbc6;
    }
    if ((char_table[(byte)*(code *)((long)&(pyVar109->alc).malloc + 1)] & 0xc) != 0) {
      pyVar78->root = pyVar109->root;
      *(undefined2 *)&(pyVar78->alc).malloc = *(undefined2 *)&(pyVar109->alc).malloc;
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 1);
      pyVar74 = (yyjson_doc *)((long)&(pyVar109->alc).malloc + 1);
      goto LAB_00f1bbc6;
    }
    if ((char_table[(byte)*(code *)((long)&(pyVar109->alc).malloc + 2)] & 0xc) != 0) {
      pyVar78->root = pyVar109->root;
      *(undefined2 *)&(pyVar78->alc).malloc = *(undefined2 *)&(pyVar109->alc).malloc;
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 2);
      pyVar74 = (yyjson_doc *)((long)&(pyVar109->alc).malloc + 2);
      goto LAB_00f1bbc6;
    }
    if ((char_table[(byte)*(code *)((long)&(pyVar109->alc).malloc + 3)] & 0xc) != 0) {
      pyVar78->root = pyVar109->root;
      *(undefined4 *)&(pyVar78->alc).malloc = *(undefined4 *)&(pyVar109->alc).malloc;
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 3);
      pyVar74 = (yyjson_doc *)((long)&(pyVar109->alc).malloc + 3);
      goto LAB_00f1bbc6;
    }
    if ((char_table[(byte)*(code *)((long)&(pyVar109->alc).malloc + 4)] & 0xc) != 0) {
      pyVar78->root = pyVar109->root;
      *(undefined4 *)&(pyVar78->alc).malloc = *(undefined4 *)&(pyVar109->alc).malloc;
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 4);
      pyVar74 = (yyjson_doc *)((long)&(pyVar109->alc).malloc + 4);
      goto LAB_00f1bbc6;
    }
    if ((char_table[(byte)*(code *)((long)&(pyVar109->alc).malloc + 5)] & 0xc) != 0) {
      pyVar78->root = pyVar109->root;
      *(undefined4 *)&(pyVar78->alc).malloc = *(undefined4 *)&(pyVar109->alc).malloc;
      *(undefined2 *)((long)&(pyVar78->alc).malloc + 4) =
           *(undefined2 *)((long)&(pyVar109->alc).malloc + 4);
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 5);
      pyVar74 = (yyjson_doc *)((long)&(pyVar109->alc).malloc + 5);
      goto LAB_00f1bbc6;
    }
    if ((char_table[(byte)*(code *)((long)&(pyVar109->alc).malloc + 6)] & 0xc) != 0) {
      pyVar78->root = pyVar109->root;
      *(undefined4 *)&(pyVar78->alc).malloc = *(undefined4 *)&(pyVar109->alc).malloc;
      *(undefined2 *)((long)&(pyVar78->alc).malloc + 4) =
           *(undefined2 *)((long)&(pyVar109->alc).malloc + 4);
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 6);
      pyVar74 = (yyjson_doc *)((long)&(pyVar109->alc).malloc + 6);
      goto LAB_00f1bbc6;
    }
    bVar84 = char_table[(byte)*(code *)((long)&(pyVar109->alc).malloc + 7)];
    p_Var77 = (_func_void_void_ptr_void_ptr *)(pyVar109->alc).malloc;
    pyVar78->root = pyVar109->root;
    (pyVar78->alc).malloc = (_func_void_ptr_void_ptr_size_t *)p_Var77;
    if ((bVar84 & 0xc) != 0) {
      pyVar74 = (yyjson_doc *)((long)&(pyVar109->alc).malloc + 7);
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 7);
      goto LAB_00f1bbc6;
    }
    pyVar109 = (yyjson_doc *)&(pyVar109->alc).realloc;
    pyVar75 = (yyjson_doc *)&(pyVar78->alc).realloc;
  } while( true );
LAB_00f1988c:
  do {
    local_550 = (yyjson_doc *)((long)&local_550->root + 1);
  } while ((char_table[(byte)*(code *)&local_550->root] & 1) != 0);
  goto LAB_00f197e9;
LAB_00f1cbe0:
  local_528 = pyVar76;
  local_520 = pyVar74;
  if ((bVar84 & 3) == 0) {
    if ((bVar84 & 0x20) == 0) {
LAB_00f1cbf0:
      (local_540->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x14;
      (local_540->alc).free =
           (_func_void_void_ptr_void_ptr *)((ulong)(cVar101 == (code)0x2d) << 0x3f);
      pyVar75 = local_548;
      local_550 = pyVar94;
      goto LAB_00f190ad;
    }
    bVar70 = (digi_table[(byte)*(code *)((long)&pyVar94->root + 1)] & 0xc) == 0;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((long)pyVar94 + (2 - (ulong)bVar70));
    pyVar94 = (yyjson_doc *)((long)pyVar94 + (2 - (ulong)bVar70));
    if ((digi_table[(byte)*p_Var77] & 3) != 0) {
      do {
        ppyVar68 = &pyVar94->root;
        pyVar94 = (yyjson_doc *)((long)&pyVar94->root + 1);
      } while ((digi_table[(byte)*(code *)((long)ppyVar68 + 1)] & 3) != 0);
      goto LAB_00f1cbf0;
    }
LAB_00f1cd2b:
    msg = "no digit after exponent sign";
  }
  else {
LAB_00f1cc13:
    msg = "number with leading zero is not allowed";
    pyVar94 = (yyjson_doc *)((long)&pyVar94[-1].str_pool + 7);
  }
  exp = 0;
  pyVar120 = local_518;
  pyVar75 = local_548;
  local_550 = pyVar94;
  goto LAB_00f1c788;
LAB_00f1b581:
  for (; *(code *)&local_550->root != (code)0x2c;
      local_550 = (yyjson_doc *)((long)&local_550[-1].str_pool + 7)) {
  }
  goto LAB_00f1b586;
LAB_00f1c761:
  local_520 = pyVar74;
  pyVar120 = (yyjson_doc *)((long)&pyVar109->root + 2);
  pyVar74 = local_520;
LAB_00f1c765:
  local_520 = pyVar74;
  msg = "no digit after decimal point";
  pyVar109 = pyVar120;
LAB_00f1c76c:
  exp = 0;
  pyVar120 = local_518;
  pyVar75 = local_548;
  local_550 = pyVar109;
  goto LAB_00f1c788;
LAB_00f15aeb:
  local_520 = pyVar94;
  pyVar75 = local_4d0;
  pyVar78 = local_518;
  pyVar120 = local_550;
  bVar70 = is_truncated_end((u8 *)local_518,(u8 *)local_550,(u8 *)local_4d0,0xb,flg);
  if (bVar70) {
    pyVar120 = pyVar75;
  }
  yVar72 = 5;
  if (!bVar70) {
    yVar72 = 0xb;
  }
  pcVar88 = "invalid literal";
  if (bVar70) {
    pcVar88 = "unexpected end of data";
  }
  sVar119 = (long)pyVar120 - (long)pyVar78;
  goto LAB_00f1ea32;
LAB_00f18dee:
  sVar71 = *(short *)&local_550->root;
joined_r0x00f1abfd:
  pyVar98 = pyVar120;
  pyVar75 = local_520;
  if (sVar71 == 0x2a2f) {
LAB_00f1ac1f:
    pyVar78 = local_4d0;
    pyVar120 = local_550;
    bVar70 = is_truncated_end((u8 *)pyVar98,(u8 *)local_550,(u8 *)local_4d0,8,flg);
    if (bVar70) {
      pyVar120 = pyVar78;
    }
    pcVar88 = "unclosed multiline comment";
    if (bVar70) {
      pcVar88 = "unexpected end of data";
    }
    sVar119 = (long)pyVar120 - (long)pyVar98;
    yVar72 = (uint)!bVar70 * 3 + 5;
    pyVar82 = local_4b8;
    if (local_4b8 == (yyjson_read_err *)0x0) {
      pyVar82 = &dummy_err;
    }
    goto LAB_00f1cd6b;
  }
LAB_00f19777:
  local_520 = pyVar75;
  pyVar75 = local_4d0;
  pyVar78 = local_550;
  bVar70 = is_truncated_end((u8 *)pyVar120,(u8 *)local_550,(u8 *)local_4d0,6,flg);
  if (bVar70) {
    pyVar78 = pyVar75;
  }
  pcVar88 = "unexpected character";
  if (bVar70) {
    pcVar88 = "unexpected end of data";
  }
  sVar119 = (long)pyVar78 - (long)pyVar120;
  pyVar82 = local_4b8;
  if (local_4b8 == (yyjson_read_err *)0x0) {
    pyVar82 = &dummy_err;
  }
  goto LAB_00f1cd44;
LAB_00f17858:
  uStackY_580 = 5;
LAB_00f13b9a:
  local_538->root = (yyjson_val *)(((long)pyVar78 - (long)pyVar75) * 0x100 | uStackY_580);
  (local_538->alc).malloc = (_func_void_ptr_void_ptr_size_t *)pyVar75;
  *(code *)&pyVar78->root = (code)0x0;
  local_550 = (yyjson_doc *)((long)&pyVar74->root + 1);
  pyVar78 = local_530;
  goto LAB_00f18fb0;
LAB_00f1c744:
  msg = "unexpected control character in string";
  goto LAB_00f1be1f;
LAB_00f1c713:
  msg = "unclosed string";
  goto LAB_00f1be1f;
LAB_00f1be85:
  msg = "invalid escaped sequence in string";
  goto LAB_00f1be1f;
switchD_00f16e5b_caseD_6f:
  pyVar74 = (yyjson_doc *)((long)&pyVar74->root + 1);
  msg = "invalid escaped character in string";
  goto LAB_00f1be1f;
LAB_00f18e27:
  msg = "invalid UTF-8 encoding in string";
  goto LAB_00f1be1f;
LAB_00f158f0:
  for (; *(code *)&local_550->root != (code)0x2c;
      local_550 = (yyjson_doc *)((long)&local_550[-1].str_pool + 7)) {
  }
LAB_00f1b586:
  pyVar75 = local_4d0;
  pyVar78 = local_518;
  pyVar120 = local_550;
  bVar70 = is_truncated_end((u8 *)local_518,(u8 *)local_550,(u8 *)local_4d0,7,flg);
  if (bVar70) {
    pyVar120 = pyVar75;
  }
  pcVar88 = "trailing comma is not allowed";
  if (bVar70) {
    pcVar88 = "unexpected end of data";
  }
  yVar72 = !bVar70 + 5 + (uint)!bVar70;
  pyVar82 = local_4b8;
  if (local_4b8 == (yyjson_read_err *)0x0) {
    pyVar82 = &dummy_err;
  }
  pyVar82->pos = (long)pyVar120 - (long)pyVar78;
  goto LAB_00f1cd6f;
LAB_00f1a592:
  if (((flg & 0xa0) != 0) && (local_528->root != (yyjson_val *)0x0)) {
    *(code *)&local_528->root->tag = (code)0x0;
  }
  local_548->root = (yyjson_val *)(local_548 + 1);
  (local_548->alc).malloc = pcVar107;
  (local_548->alc).realloc = local_4b0;
  (local_548->alc).free = local_4c0;
  (local_548->alc).ctx = local_4d8;
  local_548->dat_read = (long)local_550 - (long)local_518;
  local_548->val_read = ((long)local_538 - (long)local_548 >> 4) - 3;
LAB_00f1dd18:
  local_548->str_pool = (char *)local_488;
  pyVar78 = local_548;
  pyVar120 = local_518;
  pyVar82 = local_4e0;
  pyVar87 = local_4b8;
  goto LAB_00f18e40;
LAB_00f1ee67:
  uStackY_580 = 5;
  local_500 = pyVar98;
LAB_00f1d372:
  pyVar120->root = (yyjson_val *)(((long)pyVar78 - (long)pyVar75) * 0x100 | uStackY_580);
  (pyVar120->alc).malloc = (_func_void_ptr_void_ptr_size_t *)pyVar75;
  *(code *)&pyVar78->root = (code)0x0;
  local_550 = (yyjson_doc *)((long)&pyVar94->root + 1);
  pyVar104 = local_540;
  while ((ulong)(byte)*(code *)&local_550->root != 0x3a) {
    if ((char_table[(byte)*(code *)&local_550->root] & 1) == 0) {
      puVar69 = local_4e8;
      if ((flg & 8) == 0) goto LAB_00f1efed;
      bVar70 = skip_spaces_and_comments((u8 **)&local_550);
      pyVar104 = local_540;
      pyVar74 = local_548;
      if (!bVar70) {
        sVar71 = *(short *)&local_550->root;
        goto joined_r0x00f1e9d3;
      }
    }
    else {
      do {
        local_550 = (yyjson_doc *)((long)&local_550->root + 1);
      } while ((char_table[(byte)*(code *)&local_550->root] & 1) != 0);
    }
  }
  local_550 = (yyjson_doc *)((long)&local_550->root + 1);
  pyVar75 = pyVar74;
LAB_00f1d40e:
  pyVar78 = local_550;
  cVar101 = *(code *)&local_550->root;
  uVar118 = (ulong)(byte)cVar101;
  pyVar76 = local_520;
  if (uVar118 == 0x22) {
    pyVar120 = (yyjson_doc *)&(local_530->alc).realloc;
    local_4e8 = local_4e8 + 2;
    pyVar74 = (yyjson_doc *)((long)&local_550->root + 1);
    uStackY_580 = 0xd;
    pyVar78 = pyVar74;
    goto LAB_00f1d5d1;
  }
  if ((char_table[uVar118] & 2) == 0) {
    pyVar120 = local_530;
    pyVar78 = local_520;
    if (cVar101 == (code)0x5b) goto LAB_00f1cddc;
    puVar69 = local_4e8;
    if (cVar101 == (code)0x66) {
      if (*(int *)((long)&local_550->root + 1) != 0x65736c61) goto LAB_00f14f45;
      (local_530->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x3;
      local_550 = (yyjson_doc *)((long)&local_550->root + 5);
      goto LAB_00f1dbc5;
    }
    if (cVar101 == (code)0x6e) {
      puVar69 = local_4e8 + 2;
      uVar116 = *(uint *)&local_550->root;
      if (uVar116 == 0x6c6c756e) {
        (local_530->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x2;
        goto LAB_00f1dbbc;
      }
      if (((((flg & 0x10) == 0) || ((uVar116 & 0xff | 0x20) != 0x6e)) ||
          ((uVar116 >> 8 & 0xff | 0x20) != 0x61)) || ((uVar116 >> 0x10 & 0xff | 0x20) != 0x6e))
      goto LAB_00f14f45;
LAB_00f1efaf:
      pyVar120 = (yyjson_doc *)((long)&local_550->root + 3);
      if ((flg & 0xa0) == 0) {
        (local_530->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x14;
        p_Var77 = (_func_void_void_ptr_void_ptr *)0x7ff8000000000000;
        local_550 = pyVar120;
LAB_00f1f366:
        (local_530->alc).free = p_Var77;
        pyVar104 = local_540;
        pyVar75 = local_548;
      }
      else {
        if (pyVar98->root != (yyjson_val *)0x0) {
          *(code *)&pyVar98->root->tag = (code)0x0;
        }
        pyVar98->root = (yyjson_val *)pyVar120;
        (local_530->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x301;
        (local_530->alc).free = (_func_void_void_ptr_void_ptr *)local_550;
        pyVar104 = local_540;
        pyVar75 = local_548;
        local_550 = pyVar120;
      }
      goto LAB_00f1dbc5;
    }
    pyVar94 = local_520;
    if (cVar101 != (code)0x7b) {
      if (cVar101 == (code)0x74) {
        if (*(int *)&local_550->root != 0x65757274) goto LAB_00f14f45;
        (local_530->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0xb;
LAB_00f1dbbc:
        local_550 = (yyjson_doc *)((long)&local_550->root + 4);
        goto LAB_00f1dbc5;
      }
      if ((char_table[uVar118] & 1) != 0) goto LAB_00f1d4a2;
      if ((((flg & 0x10) != 0) && ((byte)cVar101 - 0x49 < 0x21)) &&
         ((0x100000021U >> ((ulong)((byte)cVar101 - 0x49) & 0x3f) & 1) != 0)) {
        puVar69 = local_4e8 + 2;
        if (uVar118 != 0x69) {
          if (cVar101 == (code)0x4e) {
LAB_00f1ef93:
            if ((((byte)*(code *)((long)&local_550->root + 1) | 0x20) == 0x61) &&
               (((byte)*(code *)((long)&local_550->root + 2) | 0x20) == 0x6e)) goto LAB_00f1efaf;
          }
          else if (cVar101 == (code)0x49) goto LAB_00f1d503;
          goto LAB_00f1efed;
        }
LAB_00f1d503:
        if ((((byte)*(code *)((long)&local_550->root + 1) | 0x20) != 0x6e) ||
           (((byte)*(code *)((long)&local_550->root + 2) | 0x20) != 0x66)) {
          if (cVar101 == (code)0x4e) goto LAB_00f1ef93;
          goto LAB_00f1efed;
        }
        pyVar120 = (yyjson_doc *)((long)&local_550->root + 3);
        if ((((((byte)*(code *)((long)&local_550->root + 3) | 0x20) == 0x69) &&
             (((byte)*(code *)((long)&local_550->root + 4) | 0x20) == 0x6e)) &&
            (((byte)*(code *)((long)&local_550->root + 5) | 0x20) == 0x69)) &&
           ((((byte)*(code *)((long)&local_550->root + 6) | 0x20) == 0x74 &&
            (((byte)*(code *)((long)&local_550->root + 7) | 0x20) == 0x79)))) {
          pyVar120 = (yyjson_doc *)&local_550->alc;
        }
        if ((flg & 0xa0) == 0) {
          (local_530->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x14;
          p_Var77 = (_func_void_void_ptr_void_ptr *)0x7ff0000000000000;
          local_550 = pyVar120;
          goto LAB_00f1f366;
        }
        if (pyVar98->root != (yyjson_val *)0x0) {
          *(code *)&pyVar98->root->tag = (code)0x0;
        }
        pyVar98->root = (yyjson_val *)pyVar120;
        (local_530->alc).realloc =
             (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)
             (((long)pyVar120 - (long)local_550) * 0x100 + 1);
        (local_530->alc).free = (_func_void_void_ptr_void_ptr *)local_550;
        pyVar104 = local_540;
        pyVar75 = local_548;
        local_550 = pyVar120;
        goto LAB_00f1dbc5;
      }
      if ((flg & 8) == 0) goto LAB_00f1efed;
      bVar70 = skip_spaces_and_comments((u8 **)&local_550);
      pyVar104 = local_540;
      pyVar75 = local_548;
      if (!bVar70) goto LAB_00f18ddc;
      goto LAB_00f1d40e;
    }
LAB_00f1db49:
    local_550 = (yyjson_doc *)((long)&local_550->root + 1);
    pyVar109->root = (yyjson_val *)((ulong)*(byte *)&pyVar109->root + (long)puVar95 * 0x100 + 0x100)
    ;
    pyVar78 = (yyjson_doc *)&(pyVar120->alc).realloc;
    pyVar74 = pyVar75;
    pyVar76 = pyVar94;
    if (pyVar104 <= pyVar78) {
      pyVar76 = (yyjson_doc *)((long)&pyVar94->root + ((ulong)pyVar94 >> 1));
      local_500 = pyVar98;
      pyVar74 = (yyjson_doc *)
                (*local_4b0)(local_4d8,pyVar75,(long)pyVar94 << 4,(long)pyVar76 * 0x10);
      pyVar98 = pyVar75;
      if (pyVar74 == (yyjson_doc *)0x0) goto LAB_00f1e929;
      pyVar78 = (yyjson_doc *)(((long)pyVar78 - (long)pyVar75) + (long)pyVar74);
      pyVar109 = (yyjson_doc *)(((long)pyVar109 - (long)pyVar75) + (long)pyVar74);
      pyVar104 = (yyjson_doc *)((long)pyVar74 + ((long)pyVar76 * 0x10 - 0x20U));
      pyVar98 = local_500;
    }
    pyVar78->root = (yyjson_val *)0x7;
    (pyVar78->alc).malloc = (_func_void_ptr_void_ptr_size_t *)((long)pyVar78 - (long)pyVar109);
    local_4e8 = (undefined1 *)0x0;
    local_540 = pyVar104;
    pyVar120 = pyVar78;
    goto LAB_00f1d05d;
  }
  pyVar120 = (yyjson_doc *)&(local_530->alc).realloc;
  exp = 0;
  puVar95 = local_4e8 + 2;
  local_508 = pyVar120;
  if (-1 < local_554 && (flg & 0xa0) != 0) {
    local_4e8 = puVar95;
    bVar70 = read_number_raw((u8 **)&local_550,(u8 **)pyVar98,flg,(yyjson_val *)pyVar120,&msg);
    pyVar104 = local_540;
    pyVar120 = local_508;
    pyVar76 = local_520;
    if (bVar70) goto LAB_00f1cf7f;
    goto LAB_00f1e222;
  }
  uVar73 = (ulong)(cVar101 == (code)0x2d);
  pyVar94 = (yyjson_doc *)((long)&local_550->root + uVar73);
  cVar99 = *(code *)((long)&local_550->root + uVar73);
  uVar112 = (ulong)(byte)cVar99;
  if ((digi_table[uVar112] & 2) != 0) {
    p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar112 - 0x30);
    cVar99 = *(code *)((long)&pyVar94->root + 1);
    uVar73 = (ulong)(byte)cVar99 - 0x30;
    pyVar74 = pyVar94;
    if (9 < uVar73) {
      pyVar93 = (yyjson_doc *)((long)&pyVar94->root + 1);
      if ((digi_table[(byte)cVar99] & 0x30) == 0) {
        (local_530->alc).realloc =
             (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)
             ((ulong)(cVar101 == (code)0x2d) * 8 + 4);
        if (cVar101 == (code)0x2d) {
          p_Var77 = (_func_void_void_ptr_void_ptr *)(0x30 - uVar112);
        }
        (local_530->alc).free = p_Var77;
        pyVar104 = local_540;
        pyVar75 = local_548;
        local_550 = pyVar93;
        local_538 = pyVar109;
        local_4e8 = puVar95;
        goto LAB_00f1cf7f;
      }
      p_Var114 = (_func_void_void_ptr_void_ptr *)0x0;
      local_528 = (yyjson_doc *)0x0;
      pyVar96 = pyVar93;
      local_510 = pyVar93;
      if (cVar99 != (code)0x2e) goto LAB_00f1df8b;
      goto LAB_00f20090;
    }
    p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar73 + (long)p_Var77 * 10);
    cVar99 = *(code *)((long)&pyVar94->root + 2);
    uVar73 = (ulong)(byte)cVar99 - 0x30;
    if (uVar73 < 10) {
      p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar73 + (long)p_Var77 * 10);
      cVar99 = *(code *)((long)&pyVar94->root + 3);
      uVar73 = (ulong)(byte)cVar99 - 0x30;
      if (9 < uVar73) {
        pyVar93 = (yyjson_doc *)((long)&pyVar94->root + 3);
        if ((digi_table[(byte)cVar99] & 0x30) == 0) {
LAB_00f1edef:
          (local_530->alc).realloc =
               (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)
               ((ulong)(cVar101 == (code)0x2d) * 8 + 4);
          p_Var114 = (_func_void_void_ptr_void_ptr *)-(long)p_Var77;
          if (cVar101 != (code)0x2d) {
            p_Var114 = p_Var77;
          }
          (local_530->alc).free = p_Var114;
          pyVar104 = local_540;
          pyVar75 = local_548;
          local_550 = pyVar93;
          local_538 = pyVar109;
          local_4e8 = puVar95;
          goto LAB_00f1cf7f;
        }
        p_Var114 = (_func_void_void_ptr_void_ptr *)0x0;
        local_528 = (yyjson_doc *)0x0;
        pyVar96 = pyVar93;
        local_510 = pyVar93;
        if (cVar99 == (code)0x2e) goto LAB_00f200e6;
        goto LAB_00f1df8b;
      }
      p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar73 + (long)p_Var77 * 10);
      cVar99 = *(code *)((long)&pyVar94->root + 4);
      uVar73 = (ulong)(byte)cVar99 - 0x30;
      if (uVar73 < 10) {
        p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar73 + (long)p_Var77 * 10);
        cVar99 = *(code *)((long)&pyVar94->root + 5);
        uVar73 = (ulong)(byte)cVar99 - 0x30;
        if (9 < uVar73) {
          pyVar93 = (yyjson_doc *)((long)&pyVar94->root + 5);
          if ((digi_table[(byte)cVar99] & 0x30) == 0) goto LAB_00f1edef;
          p_Var114 = (_func_void_void_ptr_void_ptr *)0x0;
          local_528 = (yyjson_doc *)0x0;
          pyVar96 = pyVar93;
          local_510 = pyVar93;
          if (cVar99 == (code)0x2e) goto LAB_00f2013c;
          goto LAB_00f1df8b;
        }
        p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar73 + (long)p_Var77 * 10);
        cVar99 = *(code *)((long)&pyVar94->root + 6);
        uVar73 = (ulong)(byte)cVar99 - 0x30;
        if (uVar73 < 10) {
          p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar73 + (long)p_Var77 * 10);
          cVar99 = *(code *)((long)&pyVar94->root + 7);
          uVar73 = (ulong)(byte)cVar99 - 0x30;
          if (9 < uVar73) {
            pyVar93 = (yyjson_doc *)((long)&pyVar94->root + 7);
            if ((digi_table[(byte)cVar99] & 0x30) == 0) goto LAB_00f1edef;
            p_Var114 = (_func_void_void_ptr_void_ptr *)0x0;
            local_528 = (yyjson_doc *)0x0;
            pyVar96 = pyVar93;
            local_510 = pyVar93;
            if (cVar99 == (code)0x2e) goto LAB_00f20192;
            goto LAB_00f1df8b;
          }
          p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar73 + (long)p_Var77 * 10);
          cVar99 = *(code *)&pyVar94->alc;
          uVar73 = (ulong)(byte)cVar99 - 0x30;
          if (uVar73 < 10) {
            p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar73 + (long)p_Var77 * 10);
            cVar99 = *(code *)((long)&pyVar94->alc + 1);
            uVar73 = (ulong)(byte)cVar99 - 0x30;
            if (9 < uVar73) {
              pyVar93 = (yyjson_doc *)((long)&pyVar94->alc + 1);
              if ((digi_table[(byte)cVar99] & 0x30) == 0) goto LAB_00f1edef;
              p_Var114 = (_func_void_void_ptr_void_ptr *)0x0;
              local_528 = (yyjson_doc *)0x0;
              pyVar96 = pyVar93;
              local_510 = pyVar93;
              if (cVar99 == (code)0x2e) goto LAB_00f201e8;
              goto LAB_00f1df8b;
            }
            p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar73 + (long)p_Var77 * 10);
            cVar99 = *(code *)((long)&pyVar94->alc + 2);
            uVar73 = (ulong)(byte)cVar99 - 0x30;
            if (uVar73 < 10) {
              p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar73 + (long)p_Var77 * 10);
              cVar99 = *(code *)((long)&pyVar94->alc + 3);
              uVar73 = (ulong)(byte)cVar99 - 0x30;
              if (9 < uVar73) {
                pyVar93 = (yyjson_doc *)((long)&pyVar94->alc + 3);
                if ((digi_table[(byte)cVar99] & 0x30) == 0) goto LAB_00f1edef;
                p_Var114 = (_func_void_void_ptr_void_ptr *)0x0;
                local_528 = (yyjson_doc *)0x0;
                pyVar96 = pyVar93;
                local_510 = pyVar93;
                if (cVar99 == (code)0x2e) goto LAB_00f2023e;
                goto LAB_00f1df8b;
              }
              p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar73 + (long)p_Var77 * 10);
              cVar99 = *(code *)((long)&pyVar94->alc + 4);
              uVar73 = (ulong)(byte)cVar99 - 0x30;
              if (uVar73 < 10) {
                p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar73 + (long)p_Var77 * 10);
                cVar99 = *(code *)((long)&pyVar94->alc + 5);
                uVar73 = (ulong)(byte)cVar99 - 0x30;
                if (9 < uVar73) {
                  pyVar93 = (yyjson_doc *)((long)&pyVar94->alc + 5);
                  if ((digi_table[(byte)cVar99] & 0x30) == 0) goto LAB_00f1edef;
                  p_Var114 = (_func_void_void_ptr_void_ptr *)0x0;
                  local_528 = (yyjson_doc *)0x0;
                  pyVar96 = pyVar93;
                  local_510 = pyVar93;
                  if (cVar99 == (code)0x2e) goto LAB_00f20294;
                  goto LAB_00f1df8b;
                }
                p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar73 + (long)p_Var77 * 10);
                cVar99 = *(code *)((long)&pyVar94->alc + 6);
                uVar73 = (ulong)(byte)cVar99 - 0x30;
                if (uVar73 < 10) {
                  p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar73 + (long)p_Var77 * 10);
                  cVar99 = *(code *)((long)&pyVar94->alc + 7);
                  uVar73 = (ulong)(byte)cVar99 - 0x30;
                  if (9 < uVar73) {
                    pyVar93 = (yyjson_doc *)((long)&pyVar94->alc + 7);
                    if ((digi_table[(byte)cVar99] & 0x30) == 0) goto LAB_00f1edef;
                    p_Var114 = (_func_void_void_ptr_void_ptr *)0x0;
                    local_528 = (yyjson_doc *)0x0;
                    pyVar96 = pyVar93;
                    local_510 = pyVar93;
                    if (cVar99 == (code)0x2e) goto LAB_00f202ea;
                    goto LAB_00f1df8b;
                  }
                  p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar73 + (long)p_Var77 * 10);
                  cVar99 = *(code *)((yyjson_val_uni *)&pyVar94->alc + 1);
                  uVar73 = (ulong)(byte)cVar99 - 0x30;
                  if (uVar73 < 10) {
                    p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar73 + (long)p_Var77 * 10);
                    cVar99 = *(code *)((long)&pyVar94->alc + 9);
                    uVar73 = (ulong)(byte)cVar99 - 0x30;
                    if (9 < uVar73) {
                      pyVar93 = (yyjson_doc *)((long)&pyVar94->alc + 9);
                      if ((digi_table[(byte)cVar99] & 0x30) == 0) goto LAB_00f1edef;
                      p_Var114 = (_func_void_void_ptr_void_ptr *)0x0;
                      local_528 = (yyjson_doc *)0x0;
                      pyVar96 = pyVar93;
                      local_510 = pyVar93;
                      if (cVar99 == (code)0x2e) goto LAB_00f20340;
                      goto LAB_00f1df8b;
                    }
                    p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar73 + (long)p_Var77 * 10);
                    cVar99 = *(code *)((long)&pyVar94->alc + 10);
                    uVar73 = (ulong)(byte)cVar99 - 0x30;
                    if (uVar73 < 10) {
                      p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar73 + (long)p_Var77 * 10);
                      pyVar93 = (yyjson_doc *)((long)&pyVar94->alc + 0xb);
                      cVar99 = *(code *)((long)&pyVar94->alc + 0xb);
                      bVar84 = digi_table[(byte)cVar99];
                      if ((bVar84 & 0x33) == 0) {
                        if ((cVar101 != (code)0x2d) ||
                           (p_Var77 < (_func_void_void_ptr_void_ptr *)0x8000000000000001)) {
                          (local_530->alc).realloc =
                               (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)
                               ((ulong)(uVar118 == 0x2d) * 8 + 4);
                          p_Var114 = (_func_void_void_ptr_void_ptr *)-(long)p_Var77;
                          if (cVar101 != (code)0x2d) {
                            p_Var114 = p_Var77;
                          }
                          (local_530->alc).free = p_Var114;
                          pyVar104 = local_540;
                          local_550 = pyVar93;
                          local_538 = pyVar109;
                          local_4e8 = puVar95;
                          goto LAB_00f1cf7f;
                        }
                        if (local_554 < '\0') {
                          if (pyVar98->root != (yyjson_val *)0x0) {
                            *(code *)&pyVar98->root->tag = (code)0x0;
                          }
                          (local_530->alc).realloc =
                               (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)
                               (((long)pyVar93 - (long)local_550) * 0x100 + 1);
                          (local_530->alc).free = (_func_void_void_ptr_void_ptr *)local_550;
                          pyVar98->root = (yyjson_val *)pyVar93;
                          pyVar104 = local_540;
                          local_550 = pyVar93;
                          local_538 = pyVar109;
                          local_4e8 = puVar95;
                          goto LAB_00f1cf7f;
                        }
                        auVar127._8_4_ = (int)((ulong)p_Var77 >> 0x20);
                        auVar127._0_8_ = p_Var77;
                        auVar127._12_4_ = 0x45300000;
                        (local_530->alc).realloc =
                             (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x14;
                        (local_530->alc).free =
                             (_func_void_void_ptr_void_ptr *)
                             -((auVar127._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)p_Var77) - 4503599627370496.0));
                        pyVar104 = local_540;
                        local_550 = pyVar93;
                        local_538 = pyVar109;
                        goto LAB_00f1dbc5;
                      }
                      if (((bVar84 & 3) != 0) &&
                         ((digi_table[(byte)*(code *)((long)&pyVar94->alc + 0xc)] & 0x33) == 0)) {
                        pcVar83 = (code *)((long)&pyVar94->alc + 0xc);
                        uVar118 = (ulong)(byte)cVar99 - 0x30;
                        if ((p_Var77 < (_func_void_void_ptr_void_ptr *)0x1999999999999999) ||
                           ((p_Var77 == (_func_void_void_ptr_void_ptr *)0x1999999999999999 &&
                            (uVar118 < 6)))) {
                          p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar118 + (long)p_Var77 * 10);
                          if (cVar101 != (code)0x2d) {
                            (local_530->alc).realloc =
                                 (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x4;
                            (local_530->alc).free = p_Var77;
                            pyVar104 = local_540;
                            local_550 = (yyjson_doc *)pcVar83;
                            local_538 = pyVar109;
                            local_4e8 = puVar95;
                            goto LAB_00f1cf7f;
                          }
                          if (local_554 < '\0') {
                            if (pyVar98->root != (yyjson_val *)0x0) {
                              *(code *)&pyVar98->root->tag = (code)0x0;
                            }
                            (local_530->alc).realloc =
                                 (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)
                                 (((long)pcVar83 - (long)local_550) * 0x100 + 1);
                            (local_530->alc).free = (_func_void_void_ptr_void_ptr *)local_550;
                            pyVar98->root = (yyjson_val *)pcVar83;
                            pyVar104 = local_540;
                            local_550 = (yyjson_doc *)pcVar83;
                            local_538 = pyVar109;
                            local_4e8 = puVar95;
                            goto LAB_00f1cf7f;
                          }
                          auVar128._8_4_ = (int)((ulong)p_Var77 >> 0x20);
                          auVar128._0_8_ = p_Var77;
                          auVar128._12_4_ = 0x45300000;
                          (local_530->alc).realloc =
                               (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x14;
                          (local_530->alc).free =
                               (_func_void_void_ptr_void_ptr *)
                               -((auVar128._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)p_Var77) - 4503599627370496.0));
                          pyVar104 = local_540;
                          local_550 = (yyjson_doc *)pcVar83;
                          local_538 = pyVar109;
                          local_4e8 = puVar95;
                          goto LAB_00f1cf7f;
                        }
                      }
                      p_Var114 = (_func_void_void_ptr_void_ptr *)0x0;
                      if ((bVar84 & 0x20) != 0) {
                        local_510 = (yyjson_doc *)0x0;
                        local_528 = (yyjson_doc *)0x0;
                        pyVar96 = pyVar93;
                        goto LAB_00f1df8b;
                      }
                      pyVar75 = pyVar93;
                      pyVar74 = (yyjson_doc *)0x0;
                      if (cVar99 != (code)0x2e) goto LAB_00f1de8b;
                      cVar99 = *(code *)((long)&pyVar94->alc + 0xc);
                      pyVar75 = (yyjson_doc *)((long)&pyVar94->alc + 0xc);
                      pyVar74 = pyVar93;
                      local_538 = pyVar109;
                      if ((digi_table[(byte)cVar99] & 3) == 0) goto LAB_00f20058;
                      goto LAB_00f1de8b;
                    }
                    pyVar93 = (yyjson_doc *)((long)&pyVar94->alc + 10);
                    if ((digi_table[(byte)cVar99] & 0x30) != 0) {
                      p_Var114 = (_func_void_void_ptr_void_ptr *)0x0;
                      local_528 = (yyjson_doc *)0x0;
                      pyVar96 = pyVar93;
                      local_510 = pyVar93;
                      if (cVar99 == (code)0x2e) goto LAB_00f2036b;
                      goto LAB_00f1df8b;
                    }
                  }
                  else {
                    pyVar93 = (yyjson_doc *)((yyjson_val_uni *)&pyVar94->alc + 1);
                    if ((digi_table[(byte)cVar99] & 0x30) != 0) {
                      p_Var114 = (_func_void_void_ptr_void_ptr *)0x0;
                      local_528 = (yyjson_doc *)0x0;
                      pyVar96 = pyVar93;
                      local_510 = pyVar93;
                      if (cVar99 == (code)0x2e) goto LAB_00f20315;
                      goto LAB_00f1df8b;
                    }
                  }
                }
                else {
                  pyVar93 = (yyjson_doc *)((long)&pyVar94->alc + 6);
                  if ((digi_table[(byte)cVar99] & 0x30) != 0) {
                    p_Var114 = (_func_void_void_ptr_void_ptr *)0x0;
                    local_528 = (yyjson_doc *)0x0;
                    pyVar96 = pyVar93;
                    local_510 = pyVar93;
                    if (cVar99 == (code)0x2e) goto LAB_00f202bf;
                    goto LAB_00f1df8b;
                  }
                }
              }
              else {
                pyVar93 = (yyjson_doc *)((long)&pyVar94->alc + 4);
                if ((digi_table[(byte)cVar99] & 0x30) != 0) {
                  p_Var114 = (_func_void_void_ptr_void_ptr *)0x0;
                  local_528 = (yyjson_doc *)0x0;
                  pyVar96 = pyVar93;
                  local_510 = pyVar93;
                  if (cVar99 == (code)0x2e) goto LAB_00f20269;
                  goto LAB_00f1df8b;
                }
              }
            }
            else {
              pyVar93 = (yyjson_doc *)((long)&pyVar94->alc + 2);
              if ((digi_table[(byte)cVar99] & 0x30) != 0) {
                p_Var114 = (_func_void_void_ptr_void_ptr *)0x0;
                local_528 = (yyjson_doc *)0x0;
                pyVar96 = pyVar93;
                local_510 = pyVar93;
                if (cVar99 == (code)0x2e) goto LAB_00f20213;
                goto LAB_00f1df8b;
              }
            }
          }
          else {
            pyVar93 = (yyjson_doc *)&pyVar94->alc;
            if ((digi_table[(byte)cVar99] & 0x30) != 0) {
              p_Var114 = (_func_void_void_ptr_void_ptr *)0x0;
              local_528 = (yyjson_doc *)0x0;
              pyVar96 = pyVar93;
              local_510 = pyVar93;
              if (cVar99 == (code)0x2e) goto LAB_00f201bd;
              goto LAB_00f1df8b;
            }
          }
        }
        else {
          pyVar93 = (yyjson_doc *)((long)&pyVar94->root + 6);
          if ((digi_table[(byte)cVar99] & 0x30) != 0) {
            p_Var114 = (_func_void_void_ptr_void_ptr *)0x0;
            local_528 = (yyjson_doc *)0x0;
            pyVar96 = pyVar93;
            local_510 = pyVar93;
            if (cVar99 == (code)0x2e) goto LAB_00f20167;
            goto LAB_00f1df8b;
          }
        }
      }
      else {
        pyVar93 = (yyjson_doc *)((long)&pyVar94->root + 4);
        if ((digi_table[(byte)cVar99] & 0x30) != 0) {
          p_Var114 = (_func_void_void_ptr_void_ptr *)0x0;
          local_528 = (yyjson_doc *)0x0;
          pyVar96 = pyVar93;
          local_510 = pyVar93;
          if (cVar99 == (code)0x2e) goto LAB_00f20111;
          goto LAB_00f1df8b;
        }
      }
    }
    else {
      pyVar93 = (yyjson_doc *)((long)&pyVar94->root + 2);
      if ((digi_table[(byte)cVar99] & 0x30) != 0) {
        p_Var114 = (_func_void_void_ptr_void_ptr *)0x0;
        local_528 = (yyjson_doc *)0x0;
        pyVar96 = pyVar93;
        local_510 = pyVar93;
        if (cVar99 == (code)0x2e) goto LAB_00f200bb;
        goto LAB_00f1df8b;
      }
    }
    (local_530->alc).realloc =
         (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)((ulong)(uVar118 == 0x2d) * 8 + 4);
    p_Var114 = (_func_void_void_ptr_void_ptr *)-(long)p_Var77;
    if (cVar101 != (code)0x2d) {
      p_Var114 = p_Var77;
    }
    (local_530->alc).free = p_Var114;
    pyVar104 = local_540;
    pyVar75 = local_548;
    local_550 = pyVar93;
    local_538 = pyVar109;
    local_4e8 = puVar95;
    goto LAB_00f1cf7f;
  }
  if (cVar99 != (code)0x30) {
    local_538 = pyVar109;
    local_4e8 = puVar95;
    if ((flg & 0x10) == 0) goto LAB_00f178f4;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((long)pyVar94 - (ulong)(cVar101 == (code)0x2d));
    if (uVar112 == 0x49) {
LAB_00f1ff7a:
      if ((((byte)*(code *)((long)&pyVar94->root + 1) | 0x20) == 0x6e) &&
         (((byte)*(code *)((long)&pyVar94->root + 2) | 0x20) == 0x66)) {
        local_550 = (yyjson_doc *)((long)&pyVar94->root + 3);
        if (((((byte)*(code *)((long)&pyVar94->root + 3) | 0x20) == 0x69) &&
            (((((byte)*(code *)((long)&pyVar94->root + 4) | 0x20) == 0x6e &&
              (((byte)*(code *)((long)&pyVar94->root + 5) | 0x20) == 0x69)) &&
             (((byte)*(code *)((long)&pyVar94->root + 6) | 0x20) == 0x74)))) &&
           (((byte)*(code *)((long)&pyVar94->root + 7) | 0x20) == 0x79)) {
          local_550 = (yyjson_doc *)&pyVar94->alc;
        }
        if ((flg & 0xa0) == 0) {
          (local_530->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x14;
          p_Var77 = (_func_void_void_ptr_void_ptr *)
                    (((ulong)(cVar101 != (code)0x2d) << 0x3f) + -0x10000000000000);
        }
        else {
          if (pyVar98->root != (yyjson_val *)0x0) {
            *(code *)&pyVar98->root->tag = (code)0x0;
          }
          pyVar98->root = (yyjson_val *)local_550;
          (local_530->alc).realloc =
               (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)
               (((long)local_550 - (long)p_Var77) * 0x100 + 1);
        }
        (local_530->alc).free = p_Var77;
        pyVar104 = local_540;
        pyVar75 = local_548;
        goto LAB_00f1cf7f;
      }
      if (((byte)cVar99 | 0x20) != 0x6e) goto LAB_00f178f4;
    }
    else if ((cVar99 != (code)0x4e) && (cVar99 != (code)0x6e)) {
      if (cVar99 == (code)0x69) goto LAB_00f1ff7a;
      goto LAB_00f178f4;
    }
    if ((((byte)*(code *)((long)&pyVar94->root + 1) | 0x20) == 0x61) &&
       (((byte)*(code *)((long)&pyVar94->root + 2) | 0x20) == 0x6e)) {
      local_550 = (yyjson_doc *)((long)&pyVar94->root + 3);
      if ((flg & 0xa0) == 0) {
        (local_530->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x14;
        p_Var77 = (_func_void_void_ptr_void_ptr *)
                  (((ulong)(cVar101 != (code)0x2d) << 0x3f) + -0x8000000000000);
      }
      else {
        if (pyVar98->root != (yyjson_val *)0x0) {
          *(code *)&pyVar98->root->tag = (code)0x0;
        }
        pyVar98->root = (yyjson_val *)local_550;
        (local_530->alc).realloc =
             (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)
             ((ulong)(cVar101 == (code)0x2d) * 0x100 + 0x301);
      }
      (local_530->alc).free = p_Var77;
      pyVar104 = local_540;
      pyVar75 = local_548;
      goto LAB_00f1cf7f;
    }
LAB_00f178f4:
    msg = "no digit after minus sign";
    goto LAB_00f2005f;
  }
  pyVar93 = (yyjson_doc *)((long)&pyVar94->root + 1);
  cVar99 = *(code *)((long)&pyVar94->root + 1);
  bVar84 = digi_table[(byte)cVar99];
  if ((bVar84 & 0x33) == 0) {
    (local_530->alc).realloc =
         (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)((ulong)(cVar101 == (code)0x2d) * 8 + 4);
    (local_530->alc).free = (_func_void_void_ptr_void_ptr *)0x0;
    pyVar104 = local_540;
    pyVar75 = local_548;
    local_550 = pyVar93;
    local_538 = pyVar109;
    local_4e8 = puVar95;
    goto LAB_00f1cf7f;
  }
  if (cVar99 != (code)0x2e) goto LAB_00f2072e;
  local_538 = pyVar109;
  if ((digi_table[(byte)*(code *)((long)&pyVar94->root + 2)] & 3) == 0) goto LAB_00f20054;
  pyVar93 = (yyjson_doc *)((long)&local_550->root + uVar73 + 1);
  do {
    pyVar74 = pyVar93;
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar74->root + 1);
    pyVar93 = (yyjson_doc *)((long)&pyVar74->root + 1);
  } while (uVar118 == 0x30);
  bVar84 = digi_table[uVar118];
  if ((bVar84 & 3) == 0) goto LAB_00f2072e;
  p_Var77 = (_func_void_void_ptr_void_ptr *)(uVar118 - 0x30);
LAB_00f20090:
  pyVar93 = (yyjson_doc *)((long)&pyVar94->root + 1);
  local_510 = (yyjson_doc *)((long)&pyVar74->root + 2);
  uVar118 = (ulong)(byte)*(code *)((long)&pyVar74->root + 2);
  if (uVar118 - 0x30 < 10) {
    p_Var77 = (_func_void_void_ptr_void_ptr *)((uVar118 - 0x30) + (long)p_Var77 * 10);
LAB_00f200bb:
    local_510 = (yyjson_doc *)((long)&pyVar74->root + 3);
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar74->root + 3);
    if (9 < uVar118 - 0x30) goto LAB_00f203ad;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((uVar118 - 0x30) + (long)p_Var77 * 10);
LAB_00f200e6:
    local_510 = (yyjson_doc *)((long)&pyVar74->root + 4);
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar74->root + 4);
    if (9 < uVar118 - 0x30) goto LAB_00f203ad;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((uVar118 - 0x30) + (long)p_Var77 * 10);
LAB_00f20111:
    local_510 = (yyjson_doc *)((long)&pyVar74->root + 5);
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar74->root + 5);
    if (9 < uVar118 - 0x30) goto LAB_00f203ad;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((uVar118 - 0x30) + (long)p_Var77 * 10);
LAB_00f2013c:
    local_510 = (yyjson_doc *)((long)&pyVar74->root + 6);
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar74->root + 6);
    if (9 < uVar118 - 0x30) goto LAB_00f203ad;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((uVar118 - 0x30) + (long)p_Var77 * 10);
LAB_00f20167:
    local_510 = (yyjson_doc *)((long)&pyVar74->root + 7);
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar74->root + 7);
    if (9 < uVar118 - 0x30) goto LAB_00f203ad;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((uVar118 - 0x30) + (long)p_Var77 * 10);
LAB_00f20192:
    local_510 = (yyjson_doc *)&pyVar74->alc;
    uVar118 = (ulong)(byte)*(code *)&pyVar74->alc;
    if (9 < uVar118 - 0x30) goto LAB_00f203ad;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((uVar118 - 0x30) + (long)p_Var77 * 10);
LAB_00f201bd:
    local_510 = (yyjson_doc *)((long)&pyVar74->alc + 1);
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar74->alc + 1);
    if (9 < uVar118 - 0x30) goto LAB_00f203ad;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((uVar118 - 0x30) + (long)p_Var77 * 10);
LAB_00f201e8:
    local_510 = (yyjson_doc *)((long)&pyVar74->alc + 2);
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar74->alc + 2);
    if (9 < uVar118 - 0x30) goto LAB_00f203ad;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((uVar118 - 0x30) + (long)p_Var77 * 10);
LAB_00f20213:
    local_510 = (yyjson_doc *)((long)&pyVar74->alc + 3);
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar74->alc + 3);
    if (9 < uVar118 - 0x30) goto LAB_00f203ad;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((uVar118 - 0x30) + (long)p_Var77 * 10);
LAB_00f2023e:
    local_510 = (yyjson_doc *)((long)&pyVar74->alc + 4);
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar74->alc + 4);
    if (9 < uVar118 - 0x30) goto LAB_00f203ad;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((uVar118 - 0x30) + (long)p_Var77 * 10);
LAB_00f20269:
    local_510 = (yyjson_doc *)((long)&pyVar74->alc + 5);
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar74->alc + 5);
    if (9 < uVar118 - 0x30) goto LAB_00f203ad;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((uVar118 - 0x30) + (long)p_Var77 * 10);
LAB_00f20294:
    local_510 = (yyjson_doc *)((long)&pyVar74->alc + 6);
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar74->alc + 6);
    if (9 < uVar118 - 0x30) goto LAB_00f203ad;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((uVar118 - 0x30) + (long)p_Var77 * 10);
LAB_00f202bf:
    local_510 = (yyjson_doc *)((long)&pyVar74->alc + 7);
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar74->alc + 7);
    if (9 < uVar118 - 0x30) goto LAB_00f203ad;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((uVar118 - 0x30) + (long)p_Var77 * 10);
LAB_00f202ea:
    local_510 = (yyjson_doc *)((yyjson_val_uni *)&pyVar74->alc + 1);
    uVar118 = (ulong)(byte)*(code *)((yyjson_val_uni *)&pyVar74->alc + 1);
    if (9 < uVar118 - 0x30) goto LAB_00f203ad;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((uVar118 - 0x30) + (long)p_Var77 * 10);
LAB_00f20315:
    local_510 = (yyjson_doc *)((long)&pyVar74->alc + 9);
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar74->alc + 9);
    if (9 < uVar118 - 0x30) goto LAB_00f203ad;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((uVar118 - 0x30) + (long)p_Var77 * 10);
LAB_00f20340:
    local_510 = (yyjson_doc *)((long)&pyVar74->alc + 10);
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar74->alc + 10);
    if (9 < uVar118 - 0x30) goto LAB_00f203ad;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((uVar118 - 0x30) + (long)p_Var77 * 10);
LAB_00f2036b:
    local_510 = (yyjson_doc *)((long)&pyVar74->alc + 0xb);
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar74->alc + 0xb);
    if (9 < uVar118 - 0x30) goto LAB_00f203ad;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((uVar118 - 0x30) + (long)p_Var77 * 10);
    cVar99 = *(code *)((long)&pyVar74->alc + 0xc);
    uVar118 = (ulong)(byte)cVar99;
    local_510 = (yyjson_doc *)((long)&pyVar74->alc + 0xc);
    pyVar75 = local_510;
    pyVar74 = pyVar93;
    if ((digi_table[uVar118] & 3) == 0) goto LAB_00f203ad;
LAB_00f1de8b:
    p_Var113 = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)
               ((long)pyVar75 * 0x100 + (long)local_550 * -0x100 + 1);
    pyVar94 = (yyjson_doc *)((long)&pyVar75->root + 1);
    do {
      pyVar86 = pyVar94;
      bVar84 = digi_table[(byte)*(code *)&pyVar86->root];
      pyVar94 = (yyjson_doc *)((long)&pyVar86->root + 1);
      p_Var113 = p_Var113 + 0x100;
    } while ((bVar84 & 3) != 0);
    p_Var77 = p_Var77 + (0x34 < (byte)cVar99);
    pyVar93 = pyVar74;
    pyVar96 = pyVar86;
    if (pyVar74 == (yyjson_doc *)0x0) {
      if ((local_554 < '\0') && ((bVar84 & 0x30) == 0)) {
        if (pyVar98->root != (yyjson_val *)0x0) {
          *(code *)&pyVar98->root->tag = (code)0x0;
        }
        (local_530->alc).realloc = p_Var113;
        (local_530->alc).free = (_func_void_void_ptr_void_ptr *)local_550;
        pyVar98->root = (yyjson_val *)pyVar86;
        pyVar104 = local_540;
        pyVar75 = local_548;
        local_550 = pyVar86;
        local_538 = pyVar109;
        local_4e8 = puVar95;
        goto LAB_00f1cf7f;
      }
      pyVar93 = pyVar86;
      if (*(code *)&pyVar86->root == (code)0x2e) {
        local_538 = pyVar109;
        if ((digi_table[(byte)*(code *)&pyVar94->root] & 3) == 0) {
LAB_00f1e204:
          local_4e8 = puVar95;
          exp = 0;
          msg = "no digit after decimal point";
          pyVar75 = local_548;
          local_550 = pyVar94;
          goto LAB_00f1e222;
        }
        do {
          pyVar96 = (yyjson_doc *)((long)&pyVar86->root + 1);
          bVar84 = digi_table[(byte)*(code *)((long)&pyVar86->root + 1)];
          pyVar86 = pyVar96;
        } while ((bVar84 & 3) != 0);
      }
    }
    pyVar74 = pyVar96;
    do {
      do {
        pyVar74 = (yyjson_doc *)((long)&pyVar74[-1].str_pool + 7);
      } while (*(code *)&pyVar74->root == (code)0x30);
    } while (*(code *)&pyVar74->root == (code)0x2e);
    p_Var114 = (_func_void_void_ptr_void_ptr *)
               ((long)pyVar93 + ((ulong)(pyVar93 < pyVar75) - (long)pyVar75));
    local_528 = pyVar75;
    local_510 = pyVar96;
    if (pyVar74 < pyVar75) {
      local_528 = (yyjson_doc *)0x0;
      local_510 = (yyjson_doc *)0x0;
    }
    if ((bVar84 & 0x20) != 0) goto LAB_00f1df8b;
LAB_00f1e02d:
    if ((long)p_Var114 < -0x157) {
      (local_530->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x14;
      (local_530->alc).free =
           (_func_void_void_ptr_void_ptr *)((ulong)(cVar101 == (code)0x2d) << 0x3f);
      pyVar104 = local_540;
      pyVar75 = local_548;
      local_550 = pyVar96;
      local_538 = pyVar109;
      goto LAB_00f1dbc5;
    }
    if (0x134 < (long)p_Var114) {
      if (local_554 < '\0') {
        if (pyVar98->root != (yyjson_val *)0x0) {
          *(code *)&pyVar98->root->tag = (code)0x0;
        }
        (local_530->alc).realloc =
             (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)
             (((long)pyVar96 - (long)local_550) * 0x100 + 1);
        (local_530->alc).free = (_func_void_void_ptr_void_ptr *)local_550;
        pyVar98->root = (yyjson_val *)pyVar96;
        pyVar104 = local_540;
        pyVar75 = local_548;
        local_550 = pyVar96;
        local_538 = pyVar109;
        local_4e8 = puVar95;
        goto LAB_00f1cf7f;
      }
      local_538 = pyVar109;
      local_4e8 = puVar95;
      if ((flg & 0x10) != 0) {
        (local_530->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x14;
        (local_530->alc).free =
             (_func_void_void_ptr_void_ptr *)
             (((ulong)(cVar101 != (code)0x2d) << 0x3f) + -0x10000000000000);
        pyVar104 = local_540;
        pyVar75 = local_548;
        local_550 = pyVar96;
        goto LAB_00f1cf7f;
      }
LAB_00f15cfd:
      exp = 0;
      msg = "number is infinity when parsed as double";
      pyVar75 = local_548;
      goto LAB_00f1e222;
    }
LAB_00f1e051:
    exp = (i32)p_Var114;
    if (((ulong)p_Var77 >> 0x35 == 0) && (exp + 0x16U < 0x2d)) {
      if (exp < 0) {
        p_Var77 = (_func_void_void_ptr_void_ptr *)
                  ((double)(long)p_Var77 / *(double *)(f64_pow10_table + (ulong)(uint)-exp * 8));
      }
      else {
        p_Var77 = (_func_void_void_ptr_void_ptr *)
                  ((double)(long)p_Var77 *
                  *(double *)(f64_pow10_table + (ulong)(exp & 0x7fffffff) * 8));
      }
      (local_530->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x14;
      p_Var114 = (_func_void_void_ptr_void_ptr *)((ulong)p_Var77 ^ 0x8000000000000000);
      if (cVar101 != (code)0x2d) {
        p_Var114 = p_Var77;
      }
      (local_530->alc).free = p_Var114;
      pyVar104 = local_540;
      pyVar75 = local_548;
      local_550 = pyVar96;
      local_538 = pyVar109;
LAB_00f1dbc5:
      pyVar120 = (yyjson_doc *)&(local_530->alc).realloc;
      local_4e8 = local_4e8 + 2;
      goto LAB_00f1cf7f;
    }
    if ((exp + 0x132U < 0x252) && (local_528 == (yyjson_doc *)0x0)) {
      local_4f0 = (yyjson_doc *)(long)(exp * 2 + 0x2ae);
      uVar118 = 0x3f;
      if (p_Var77 != (_func_void_void_ptr_void_ptr *)0x0) {
        for (; (ulong)p_Var77 >> uVar118 == 0; uVar118 = uVar118 - 1) {
        }
      }
      iVar102 = (int)(uVar118 ^ 0x3f);
      uVar118 = (long)p_Var77 << ((byte)(uVar118 ^ 0x3f) & 0x3f);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar118;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = *(ulong *)(pow10_sig_table + (long)local_4f0 * 8);
      auVar18 = auVar18 * auVar44;
      lVar85 = auVar18._8_8_;
      uVar73 = auVar18._0_8_;
      iVar115 = exp * 0x3526a + -0x3f0000 >> 0x10;
      if ((ulong)(auVar18._8_4_ & 0x1ff) - 1 < 0x1fe) {
LAB_00f1e149:
        uVar118 = lVar85 << (-1 < lVar85);
        uVar118 = (uVar118 & 0x400) + uVar118;
        (local_530->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x14;
        (local_530->alc).free =
             (_func_void_void_ptr_void_ptr *)
             ((ulong)(cVar101 == (code)0x2d) << 0x3f |
             uVar118 >> 0xb & 0xfffffffffffff |
             (ulong)(((iVar115 - iVar102) - (uint)(-1 < lVar85)) + 0x47e + (uint)(uVar118 < 0x400))
             << 0x34);
        pyVar104 = local_540;
        pyVar75 = local_548;
        local_550 = pyVar96;
        local_538 = pyVar109;
        local_500 = pyVar98;
        local_4e8 = puVar95;
        goto LAB_00f1cf7f;
      }
      local_4a8 = (ulong)(exp * 2 + 0x2af);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar118;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = *(ulong *)(pow10_sig_table + local_4a8 * 8);
      lVar117 = SUB168(auVar19 * auVar45,8);
      if ((lVar117 + uVar73) - 1 < 0xfffffffffffffffe) {
        lVar85 = lVar85 + (ulong)(lVar117 + uVar73 < uVar73);
        goto LAB_00f1e149;
      }
    }
    else {
      uVar118 = 0x3f;
      if (p_Var77 != (_func_void_void_ptr_void_ptr *)0x0) {
        for (; (ulong)p_Var77 >> uVar118 == 0; uVar118 = uVar118 - 1) {
        }
      }
      iVar102 = (int)(uVar118 ^ 0x3f);
      uVar118 = (long)p_Var77 << ((byte)(uVar118 ^ 0x3f) & 0x3f);
      local_4f0 = (yyjson_doc *)(long)(exp * 2 + 0x2ae);
      local_4a8 = (ulong)(exp * 2 + 0x2af);
      iVar115 = exp * 0x3526a + -0x3f0000 >> 0x10;
    }
    lVar85 = ((ulong)(local_528 != (yyjson_doc *)0x0) << 2) << ((byte)iVar102 & 0x3f);
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar118;
    auVar46._8_8_ = 0;
    auVar46._0_8_ =
         *(long *)(pow10_sig_table + (long)local_4f0 * 8) -
         (*(long *)(pow10_sig_table + local_4a8 * 8) >> 0x3f);
    uVar73 = SUB168(auVar20 * auVar46,8) - (SUB168(auVar20 * auVar46,0) >> 0x3f);
    uVar118 = 0x3f;
    if (uVar73 != 0) {
      for (; uVar73 >> uVar118 == 0; uVar118 = uVar118 - 1) {
      }
    }
    bVar84 = (byte)(uVar118 ^ 0x3f);
    uVar73 = uVar73 << (bVar84 & 0x3f);
    uVar112 = (9 - (ulong)(lVar85 == 0)) + lVar85 << (bVar84 & 0x3f);
    uVar116 = ((iVar115 - (int)(uVar118 ^ 0x3f)) - iVar102) + 0x40;
    iVar102 = 0xb;
    if (((int)uVar116 < -0x43d) &&
       ((iVar102 = 0x40, uVar116 < 0xfffffb8f || (iVar102 = -0x432 - uVar116, uVar116 < 0xfffffb92))
       )) {
      bVar84 = (char)iVar102 - 0x3c;
      uVar73 = uVar73 >> (bVar84 & 0x3f);
      uVar116 = (uVar116 + iVar102) - 0x3c;
      uVar112 = (uVar112 >> (bVar84 & 0x3f)) + 9;
      iVar102 = 0x3c;
    }
    bVar84 = (byte)iVar102;
    lVar85 = 8L << (bVar84 - 1 & 0x3f);
    uVar97 = (~(-1L << (bVar84 & 0x3f)) & uVar73) * 8;
    uVar118 = lVar85 + uVar112;
    local_4f0 = (yyjson_doc *)0x0;
    uVar73 = (ulong)(uVar118 <= uVar97) + (uVar73 >> (bVar84 & 0x3f));
    if (uVar73 == 0) {
LAB_00f1f216:
      if ((uVar97 <= lVar85 - uVar112) || (uVar118 <= uVar97)) {
        (local_530->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x14;
        (local_530->alc).free =
             (_func_void_void_ptr_void_ptr *)
             ((ulong)local_4f0 | (ulong)(cVar101 == (code)0x2d) << 0x3f);
        pyVar104 = local_540;
        pyVar75 = local_548;
        local_550 = pyVar96;
        local_538 = pyVar109;
        local_500 = pyVar98;
        local_4e8 = puVar95;
        goto LAB_00f1cf7f;
      }
      iVar102 = -0x433;
      if ((yyjson_doc *)0xfffffffffffff < local_4f0) {
        iVar102 = (uint)((ulong)local_4f0 >> 0x34) - 0x434;
      }
      local_4a8 = CONCAT44(local_4a8._4_4_,iVar102);
      pyVar120 = (yyjson_doc *)(((ulong)local_4f0 & 0xfffffffffffff) + 0x10000000000000);
      if ((yyjson_doc *)0xfffffffffffff >= local_4f0) {
        pyVar120 = local_4f0;
      }
      local_538 = pyVar109;
      local_500 = pyVar98;
      local_4e8 = puVar95;
      bigint_set_buf(&big_full,(u64)p_Var77,&exp,(u8 *)local_528,(u8 *)local_510,(u8 *)pyVar93);
      local_230[0] = (long)pyVar120 * 2 + 1;
      iVar102 = exp;
      if (exp < 0) {
        uVar116 = 1;
        for (iVar102 = -exp; uVar118 = (ulong)uVar116, 0x12 < iVar102; iVar102 = iVar102 + -0x13) {
          for (uVar73 = 0;
              (uVar112 = uVar118, uVar118 != uVar73 &&
              (uVar112 = uVar73, *(long *)((long)local_238 + (uVar73 + 1) * 8) == 0));
              uVar73 = uVar73 + 1) {
          }
          uVar73 = 0;
          for (; auVar64._8_8_ = 0, auVar64._0_8_ = uVar73, uVar112 < uVar118; uVar112 = uVar112 + 1
              ) {
            auVar48._8_8_ = 0;
            auVar48._0_8_ = *(ulong *)((long)local_238 + (uVar112 + 1) * 8);
            auVar64 = ZEXT816(10000000000000000000) * auVar48 + auVar64;
            uVar73 = auVar64._8_8_;
            *(long *)((long)local_238 + (uVar112 + 1) * 8) = auVar64._0_8_;
          }
          if (uVar73 != 0) {
            uVar116 = uVar116 + 1;
            *(ulong *)((long)local_238 + (uVar118 + 1) * 8) = uVar73;
          }
        }
        if (iVar102 != 0) {
          uVar73 = *(ulong *)(u64_pow10_table + (long)iVar102 * 8);
          for (uVar112 = 0;
              (uVar97 = uVar118, uVar118 != uVar112 &&
              (uVar97 = uVar112, *(long *)((long)local_238 + (uVar112 + 1) * 8) == 0));
              uVar112 = uVar112 + 1) {
          }
          uVar112 = 0;
          for (; auVar66._8_8_ = 0, auVar66._0_8_ = uVar112, uVar97 < uVar118; uVar97 = uVar97 + 1)
          {
            auVar22._8_8_ = 0;
            auVar22._0_8_ = uVar73;
            auVar50._8_8_ = 0;
            auVar50._0_8_ = *(ulong *)((long)local_238 + (uVar97 + 1) * 8);
            auVar66 = auVar22 * auVar50 + auVar66;
            uVar112 = auVar66._8_8_;
            *(long *)((long)local_238 + (uVar97 + 1) * 8) = auVar66._0_8_;
          }
          if (uVar112 != 0) {
            uVar116 = uVar116 + 1;
            local_238[0] = uVar116;
            *(ulong *)((long)local_238 + (uVar118 + 1) * 8) = uVar112;
          }
        }
      }
      else {
        for (; uVar118 = (ulong)big_full.used, 0x12 < iVar102; iVar102 = iVar102 + -0x13) {
          for (uVar73 = 0;
              (uVar112 = uVar118, uVar118 != uVar73 &&
              (uVar112 = uVar73, big_full.bits[uVar73] == 0)); uVar73 = uVar73 + 1) {
          }
          uVar73 = 0;
          for (; auVar63._8_8_ = 0, auVar63._0_8_ = uVar73, uVar112 < uVar118; uVar112 = uVar112 + 1
              ) {
            auVar47._8_8_ = 0;
            auVar47._0_8_ = big_full.bits[uVar112];
            auVar63 = ZEXT816(10000000000000000000) * auVar47 + auVar63;
            uVar73 = auVar63._8_8_;
            big_full.bits[uVar112] = auVar63._0_8_;
          }
          if (uVar73 != 0) {
            big_full.used = big_full.used + 1;
            big_full.bits[uVar118] = uVar73;
          }
        }
        uVar116 = 1;
        if (iVar102 != 0) {
          uVar73 = *(ulong *)(u64_pow10_table + (long)iVar102 * 8);
          for (uVar112 = 0;
              (uVar97 = uVar118, uVar118 != uVar112 &&
              (uVar97 = uVar112, big_full.bits[uVar112] == 0)); uVar112 = uVar112 + 1) {
          }
          uVar112 = 0;
          for (; auVar65._8_8_ = 0, auVar65._0_8_ = uVar112, uVar97 < uVar118; uVar97 = uVar97 + 1)
          {
            auVar21._8_8_ = 0;
            auVar21._0_8_ = uVar73;
            auVar49._8_8_ = 0;
            auVar49._0_8_ = big_full.bits[uVar97];
            auVar65 = auVar21 * auVar49 + auVar65;
            uVar112 = auVar65._8_8_;
            big_full.bits[uVar97] = auVar65._0_8_;
          }
          if (uVar112 != 0) {
            big_full.used = big_full.used + 1;
            big_full.bits[uVar118] = uVar112;
          }
        }
      }
      if ((int)(uint)local_4a8 < 1) {
        uVar110 = -(uint)local_4a8 >> 6;
        uVar118 = (ulong)uVar110;
        uVar73 = (ulong)big_full.used;
        uVar103 = -(uint)local_4a8 & 0x3f;
        if (uVar103 == 0) {
          while (uVar73 != 0) {
            big_full.bits[(int)uVar73 + (uVar110 - 1)] = big_full.bits[uVar73 - 1];
            uVar73 = uVar73 - 1;
          }
          big_full.used = big_full.used + uVar110;
          while (uVar118 != 0) {
            big_full.bits[uVar118 - 1] = 0;
            uVar118 = uVar118 - 1;
          }
        }
        else {
          big_full.bits[uVar73] = 0;
          sVar67 = (sbyte)uVar103;
          uVar103 = big_full.used + uVar110;
          while (uVar112 = uVar73 - 1, uVar112 != 0xffffffffffffffff) {
            big_full.bits[uVar103] =
                 big_full.bits[uVar112 & 0xffffffff] >> (0x40U - sVar67 & 0x3f) |
                 big_full.bits[uVar73] << sVar67;
            uVar103 = uVar103 - 1;
            uVar73 = uVar112;
          }
          big_full.bits[uVar118] = big_full.bits[0] << sVar67;
          big_full.used =
               (big_full.used + uVar110 + 1) - (uint)(big_full.bits[big_full.used + uVar110] == 0);
          while (uVar118 != 0) {
            big_full.bits[uVar118 - 1] = 0;
            uVar118 = uVar118 - 1;
          }
        }
      }
      else {
        uVar103 = (uint)local_4a8 >> 6;
        uVar118 = (ulong)uVar103;
        uVar73 = (ulong)uVar116;
        bVar84 = (byte)local_4a8 & 0x3f;
        if ((local_4a8 & 0x3f) == 0) {
          while (uVar73 != 0) {
            *(undefined8 *)((long)local_238 + ((ulong)((int)uVar73 + (uVar103 - 1)) + 1) * 8) =
                 *(undefined8 *)((long)local_238 + uVar73 * 8);
            uVar73 = uVar73 - 1;
          }
          uVar116 = uVar116 + uVar103;
          while (uVar118 != 0) {
            *(undefined8 *)((long)local_238 + uVar118 * 8) = 0;
            uVar118 = uVar118 - 1;
          }
        }
        else {
          *(undefined8 *)((long)local_238 + (uVar73 + 1) * 8) = 0;
          uVar110 = uVar116 + uVar103;
          while (uVar112 = uVar73 - 1, uVar112 != 0xffffffffffffffff) {
            *(ulong *)((long)local_238 + ((ulong)uVar110 + 1) * 8) =
                 *(ulong *)((long)local_238 + ((uVar112 & 0xffffffff) + 1) * 8) >>
                 (0x40 - bVar84 & 0x3f) | *(long *)((long)local_238 + (uVar73 + 1) * 8) << bVar84;
            uVar110 = uVar110 - 1;
            uVar73 = uVar112;
          }
          *(long *)((long)local_238 + (uVar118 + 1) * 8) = local_230[0] << bVar84;
          uVar116 = (uVar116 + uVar103 + 1) -
                    (uint)(*(long *)((long)local_238 + ((ulong)(uVar116 + uVar103) + 1) * 8) == 0);
          while (uVar118 != 0) {
            *(undefined8 *)((long)local_238 + uVar118 * 8) = 0;
            uVar118 = uVar118 - 1;
          }
        }
      }
      uVar73 = (ulong)big_full.used;
      uVar118 = 0;
      if ((uVar116 <= big_full.used) && (uVar118 = 1, big_full.used <= uVar116)) {
        do {
          if (uVar73 == 0) {
            uVar118 = (ulong)((uint)local_4f0 & 1);
            break;
          }
          puVar1 = (ulong *)((long)local_238 + uVar73 * 8);
          lVar85 = uVar73 - 1;
          if (big_full.bits[lVar85] < *puVar1) {
            uVar118 = 0;
            break;
          }
          uVar73 = uVar73 - 1;
        } while (big_full.bits[lVar85] <= *puVar1);
      }
      pcVar83 = (code *)((long)&local_4f0->root + uVar118);
      if (pcVar83 != (code *)0x7ff0000000000000) {
        (local_530->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x14;
        p_Var77 = (_func_void_void_ptr_void_ptr *)
                  ((ulong)pcVar83 | (ulong)(cVar101 == (code)0x2d) << 0x3f);
LAB_00f20674:
        (local_530->alc).free = p_Var77;
        pyVar104 = local_540;
        pyVar109 = local_538;
        pyVar75 = local_548;
        pyVar120 = local_508;
        pyVar98 = local_500;
        pyVar76 = local_520;
        local_550 = pyVar96;
        goto LAB_00f1cf7f;
      }
      if (local_554 < '\0') {
LAB_00f206ba:
        if (local_500->root != (yyjson_val *)0x0) {
          *(code *)&local_500->root->tag = (code)0x0;
        }
        (local_530->alc).realloc =
             (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)
             (((long)pyVar96 - (long)pyVar78) * 0x100 + 1);
        (local_530->alc).free = (_func_void_void_ptr_void_ptr *)pyVar78;
        local_500->root = (yyjson_val *)pyVar96;
        pyVar104 = local_540;
        pyVar109 = local_538;
        pyVar75 = local_548;
        pyVar120 = local_508;
        pyVar98 = local_500;
        pyVar76 = local_520;
        local_550 = pyVar96;
        goto LAB_00f1cf7f;
      }
      if ((flg & 0x10) != 0) {
        (local_530->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x14;
        p_Var77 = (_func_void_void_ptr_void_ptr *)0x7ff0000000000000;
        if (cVar101 == (code)0x2d) {
          p_Var77 = (_func_void_void_ptr_void_ptr *)0xfff0000000000000;
        }
        goto LAB_00f20674;
      }
    }
    else {
      uVar105 = 0x3f;
      if (uVar73 != 0) {
        for (; uVar73 >> uVar105 == 0; uVar105 = uVar105 - 1) {
        }
      }
      uVar116 = (uVar116 + iVar102) - (int)(uVar105 ^ 0x3f);
      if ((int)uVar116 < 0x3c1) {
        uVar73 = (uVar73 << ((byte)(uVar105 ^ 0x3f) & 0x3f)) >> 0xb;
        if ((int)uVar116 < -0x43d) {
          local_4f0 = (yyjson_doc *)0x0;
          if (0xfffffb8e < uVar116) {
            local_4f0 = (yyjson_doc *)(uVar73 >> (-(char)uVar116 - 0x3dU & 0x3f));
          }
        }
        else {
          local_4f0 = (yyjson_doc *)(uVar73 & 0xfffffffffffff | (ulong)(uVar116 + 0x43e) << 0x34);
          if (local_4f0 == (yyjson_doc *)0x7ff0000000000000) goto LAB_00f1f3bb;
        }
        goto LAB_00f1f216;
      }
LAB_00f1f3bb:
      local_538 = pyVar109;
      local_500 = pyVar98;
      local_4e8 = puVar95;
      if (local_554 < '\0') goto LAB_00f206ba;
      if ((flg & 0x10) != 0) {
        (local_530->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x14;
        p_Var77 = (_func_void_void_ptr_void_ptr *)
                  (((ulong)(cVar101 != (code)0x2d) << 0x3f) + -0x10000000000000);
        goto LAB_00f20674;
      }
    }
LAB_00f161f8:
    msg = "number is infinity when parsed as double";
    pyVar75 = local_548;
    local_550 = pyVar78;
    goto LAB_00f1e222;
  }
LAB_00f203ad:
  local_538 = pyVar109;
  if ((yyjson_doc *)((long)&pyVar93->root + 1U) == local_510) {
LAB_00f2040c:
    local_4e8 = puVar95;
    msg = "no digit after decimal point";
    local_550 = local_510;
  }
  else {
    p_Var114 = (_func_void_void_ptr_void_ptr *)((long)pyVar93 + (1 - (long)local_510));
    local_528 = (yyjson_doc *)0x0;
    pyVar96 = local_510;
    if ((digi_table[uVar118] & 0x20) == 0) {
      local_528 = (yyjson_doc *)0x0;
      if ((long)p_Var114 < -0x157) {
        (local_530->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x14;
        (local_530->alc).free =
             (_func_void_void_ptr_void_ptr *)((ulong)(cVar101 == (code)0x2d) << 0x3f);
        local_550 = local_510;
        pyVar104 = local_540;
        pyVar75 = local_548;
        local_4e8 = puVar95;
        goto LAB_00f1cf7f;
      }
      goto LAB_00f1e051;
    }
LAB_00f1df8b:
    cVar99 = *(code *)((long)&pyVar96->root + 1);
    uVar118 = (ulong)((digi_table[(byte)cVar99] & 0xc) != 0);
    local_538 = pyVar109;
    if ((digi_table[(byte)*(code *)((long)&pyVar96->root + uVar118 + 1)] & 3) != 0) {
      pyVar96 = (yyjson_doc *)((long)&pyVar96->root + uVar118);
      p_Var113 = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)
                 ((long)pyVar96 * 0x100 + (long)local_550 * -0x100 + 1);
      do {
        cVar89 = *(code *)((long)&pyVar96->root + 1);
        pyVar96 = (yyjson_doc *)((long)&pyVar96->root + 1);
        p_Var113 = p_Var113 + 0x100;
      } while (cVar89 == (code)0x30);
      lVar117 = 0;
      lVar85 = 0;
      while ((digi_table[(byte)cVar89] & 3) != 0) {
        lVar85 = lVar85 * 10 + (ulong)(byte)((char)cVar89 - 0x30);
        cVar89 = *(code *)((long)&pyVar96->root + 1);
        pyVar96 = (yyjson_doc *)((long)&pyVar96->root + 1);
        p_Var113 = p_Var113 + 0x100;
        lVar117 = lVar117 + 1;
      }
      if (lVar117 < 0x13) {
        lVar117 = -lVar85;
        if (cVar99 != (code)0x2d) {
          lVar117 = lVar85;
        }
        p_Var114 = p_Var114 + lVar117;
        goto LAB_00f1e02d;
      }
      if (cVar99 == (code)0x2d) {
        (local_530->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x14;
        (local_530->alc).free =
             (_func_void_void_ptr_void_ptr *)((ulong)(cVar101 == (code)0x2d) << 0x3f);
        pyVar104 = local_540;
        pyVar75 = local_548;
        local_550 = pyVar96;
        local_4e8 = puVar95;
        goto LAB_00f1cf7f;
      }
      if (local_554 < '\0') {
        if (pyVar98->root != (yyjson_val *)0x0) {
          *(code *)&pyVar98->root->tag = (code)0x0;
        }
        (local_530->alc).realloc = p_Var113;
        (local_530->alc).free = (_func_void_void_ptr_void_ptr *)local_550;
        pyVar98->root = (yyjson_val *)pyVar96;
        pyVar104 = local_540;
        pyVar75 = local_548;
        local_550 = pyVar96;
        local_4e8 = puVar95;
        goto LAB_00f1cf7f;
      }
      local_4e8 = puVar95;
      if ((flg & 0x10) != 0) {
        (local_530->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x14;
        (local_530->alc).free =
             (_func_void_void_ptr_void_ptr *)
             (((ulong)(cVar101 != (code)0x2d) << 0x3f) + -0x10000000000000);
        pyVar104 = local_540;
        pyVar75 = local_548;
        local_550 = pyVar96;
        goto LAB_00f1cf7f;
      }
      goto LAB_00f15cfd;
    }
LAB_00f1ea43:
    local_4e8 = puVar95;
    msg = "no digit after exponent sign";
    local_550 = (yyjson_doc *)((long)&pyVar96->root + uVar118 + 1);
  }
  exp = 0;
  pyVar75 = local_548;
LAB_00f1e222:
  pyVar76 = local_4d0;
  pyVar78 = local_518;
  pyVar120 = local_550;
  bVar70 = is_truncated_end((u8 *)local_518,(u8 *)local_550,(u8 *)local_4d0,9,flg);
  if (bVar70) {
    pyVar82 = local_4b8;
    if (local_4b8 == (yyjson_read_err *)0x0) {
      pyVar82 = &dummy_err;
    }
    pyVar82->pos = (long)pyVar76 - (long)pyVar78;
    local_4e0->code = 5;
    pcVar88 = "unexpected end of data";
  }
  else {
    pyVar82 = local_4b8;
    if (local_4b8 == (yyjson_read_err *)0x0) {
      pyVar82 = &dummy_err;
    }
    pyVar82->pos = (long)pyVar120 - (long)pyVar78;
    local_4e0->code = 9;
    pcVar88 = msg;
  }
  pyVar82 = local_4b8;
  if (local_4b8 == (yyjson_read_err *)0x0) {
    pyVar82 = &dummy_err;
  }
  pyVar82->msg = pcVar88;
  pyVar87 = local_4b8;
  goto joined_r0x00f1c844;
LAB_00f1f5da:
  if (SUB81(uVar118,0) != (code)0x5c) {
    if ((int)uVar118 == 0x22) {
      uStackY_580 = 5;
      pyVar104 = local_540;
      pyVar75 = local_548;
      local_538 = pyVar109;
      local_500 = pyVar98;
LAB_00f1d82e:
      (local_530->alc).realloc =
           (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)
           (((long)pyVar78 - (long)pyVar74) * 0x100 | uStackY_580);
      (local_530->alc).free = (_func_void_void_ptr_void_ptr *)pyVar74;
      *(code *)&pyVar78->root = (code)0x0;
      local_550 = (yyjson_doc *)((long)&pyVar94->root + 1);
      goto LAB_00f1cf7f;
    }
    local_538 = pyVar109;
    local_500 = pyVar98;
    if ((flg & 0x40) == 0) goto LAB_00f1ff33;
    if (local_4d0 <= pyVar94) goto LAB_00f1ff27;
    *(code *)&pyVar78->root = SUB81(uVar118,0);
    pyVar93 = (yyjson_doc *)((long)&pyVar94->root + 1);
    pyVar75 = (yyjson_doc *)((long)&pyVar78->root + 1);
    goto LAB_00f1f706;
  }
  cVar101 = *(code *)((long)&pyVar94->root + 1);
  local_538 = pyVar109;
  local_500 = pyVar98;
  switch(cVar101) {
  case (code)0x6e:
    *(code *)&pyVar78->root = (code)0xa;
    break;
  case (code)0x6f:
  case (code)0x70:
  case (code)0x71:
  case (code)0x73:
    goto switchD_00f164e5_caseD_6f;
  case (code)0x72:
    *(code *)&pyVar78->root = (code)0xd;
    break;
  case (code)0x74:
    *(code *)&pyVar78->root = (code)0x9;
    break;
  case (code)0x75:
    uVar2 = CONCAT11(hex_conv_table[(byte)*(code *)((long)&pyVar94->root + 3)],
                     hex_conv_table[(byte)*(code *)((long)&pyVar94->root + 5)]);
    if (((uVar2 | CONCAT11(hex_conv_table[(byte)*(code *)((long)&pyVar94->root + 2)],
                           hex_conv_table[(byte)*(code *)((long)&pyVar94->root + 4)])) & 0xf0f0) !=
        0) goto LAB_00f1fc17;
    uVar116 = (uint)CONCAT11(hex_conv_table[(byte)*(code *)((long)&pyVar94->root + 2)],
                             hex_conv_table[(byte)*(code *)((long)&pyVar94->root + 4)]) << 4;
    uVar103 = uVar2 | uVar116;
    pyVar93 = (yyjson_doc *)((long)&pyVar94->root + 6);
    if ((uVar103 & 0xf800) != 0xd800) {
      cVar101 = SUB41(uVar103,0);
      if ((ushort)uVar103 < 0x800) {
        if ((ushort)uVar103 < 0x80) {
          *(code *)&pyVar78->root = cVar101;
          pyVar75 = (yyjson_doc *)((long)&pyVar78->root + 1);
        }
        else {
          *(byte *)&pyVar78->root = (byte)(uVar103 >> 6) | 0xc0;
          *(byte *)((long)&pyVar78->root + 1) = (byte)cVar101 & 0x3f | 0x80;
          pyVar75 = (yyjson_doc *)((long)&pyVar78->root + 2);
        }
      }
      else {
        *(byte *)&pyVar78->root = (byte)(((uint)uVar2 | uVar116 & 0xffff) >> 0xc) | 0xe0;
        *(byte *)((long)&pyVar78->root + 1) = (byte)(uVar103 >> 6) & 0x3f | 0x80;
        *(byte *)((long)&pyVar78->root + 2) = (byte)cVar101 & 0x3f | 0x80;
        pyVar75 = (yyjson_doc *)((long)&pyVar78->root + 3);
      }
      goto LAB_00f1f706;
    }
    if ((uVar103 & 0xdc00) == 0xd800) {
      if (*(short *)&pyVar93->root == 0x755c) {
        if (((CONCAT11(hex_conv_table[(byte)*(code *)((long)&(pyVar94->alc).malloc + 1)],
                       hex_conv_table[(byte)*(code *)((long)&(pyVar94->alc).malloc + 3)]) |
             CONCAT11(hex_conv_table[(byte)*(code *)&(pyVar94->alc).malloc],
                      hex_conv_table[(byte)*(code *)((long)&(pyVar94->alc).malloc + 2)])) & 0xf0f0)
            == 0) {
          uVar116 = (CONCAT11(hex_conv_table[(byte)*(code *)&(pyVar94->alc).malloc],
                              hex_conv_table[(byte)*(code *)((long)&(pyVar94->alc).malloc + 2)]) &
                    0xfff) << 4 |
                    (uint)CONCAT11(hex_conv_table[(byte)*(code *)((long)&(pyVar94->alc).malloc + 1)]
                                   ,hex_conv_table
                                    [(byte)*(code *)((long)&(pyVar94->alc).malloc + 3)]);
          if ((uVar116 & 0xfc00) == 0xdc00) {
            iVar102 = (uVar103 & 0xdbff) * 0x400;
            uVar103 = iVar102 + uVar116 + 0xfca02400;
            *(byte *)&pyVar78->root = (byte)(uVar103 >> 0x12) | 0xf0;
            *(byte *)((long)&pyVar78->root + 1) = (byte)(uVar103 >> 0xc) & 0x3f | 0x80;
            *(byte *)((long)&pyVar78->root + 2) =
                 (byte)(uVar116 + iVar102 + 0x400 >> 6) & 0x3f | 0x80;
            *(byte *)((long)&pyVar78->root + 3) = (byte)uVar116 & 0x3f | 0x80;
            pyVar93 = (yyjson_doc *)((long)&(pyVar94->alc).malloc + 4);
            pyVar75 = (yyjson_doc *)((long)&pyVar78->root + 4);
            goto LAB_00f1f706;
          }
LAB_00f1feff:
          msg = "invalid low surrogate in string";
          pyVar94 = pyVar93;
        }
        else {
LAB_00f1fef6:
          msg = "invalid escaped sequence in string";
          pyVar94 = pyVar93;
        }
      }
      else {
LAB_00f1feed:
        msg = "no low surrogate in string";
        pyVar94 = pyVar93;
      }
    }
    else {
LAB_00f1fee1:
      msg = "invalid high surrogate in string";
    }
    goto LAB_00f1fbb1;
  default:
    if (cVar101 == (code)0x66) {
      *(code *)&pyVar78->root = (code)0xc;
    }
    else if (cVar101 == (code)0x2f) {
      *(code *)&pyVar78->root = (code)0x2f;
    }
    else if (cVar101 == (code)0x5c) {
      *(code *)&pyVar78->root = (code)0x5c;
    }
    else if (cVar101 == (code)0x62) {
      *(code *)&pyVar78->root = (code)0x8;
    }
    else {
      if (cVar101 != (code)0x22) goto switchD_00f164e5_caseD_6f;
      *(code *)&pyVar78->root = (code)0x22;
    }
  }
  pyVar93 = (yyjson_doc *)((long)&pyVar94->root + 2);
  pyVar75 = (yyjson_doc *)((long)&pyVar78->root + 1);
LAB_00f1f706:
  do {
    pyVar78 = pyVar75;
    pyVar94 = pyVar93;
    if ((char_table[(byte)*(code *)&pyVar94->root] & 0xc) != 0) {
LAB_00f1f959:
      while( true ) {
        uVar118 = (ulong)(byte)*(code *)&pyVar94->root;
        if (-1 < (char)*(code *)&pyVar94->root) goto LAB_00f1f5da;
        lVar85 = 0;
        pyVar75 = pyVar78;
        for (pyVar93 = pyVar94;
            ((uVar116 = *(uint *)&pyVar93->root, (uVar116 & 0xc0c0f0) == 0x8080e0 &&
             ((uVar116 & 0x200f) != 0)) && ((uVar116 & 0x200f) != 0x200d));
            pyVar93 = (yyjson_doc *)((long)&pyVar93->root + 3)) {
          *(uint *)&pyVar75->root = uVar116;
          pyVar75 = (yyjson_doc *)((long)&pyVar75->root + 3);
          lVar85 = lVar85 + 3;
        }
        if (-1 < (char)uVar116) break;
        while (((uVar116 & 0xc0e0) == 0x80c0 && ((uVar116 & 0x1e) != 0))) {
          *(short *)&pyVar75->root = (short)uVar116;
          pyVar75 = (yyjson_doc *)((long)&pyVar75->root + 2);
          ppyVar68 = &pyVar93->root;
          pyVar93 = (yyjson_doc *)((long)&pyVar93->root + 2);
          lVar85 = lVar85 + 2;
          uVar116 = *(uint *)((long)ppyVar68 + 2);
        }
        while ((((uVar116 & 0x3007) != 0 && ((uVar116 & 0xc0c0c0f8) == 0x808080f0)) &&
               (((byte)uVar116 >> 2 & (uVar116 & 0x3003) != 0) == 0))) {
          *(uint *)((long)&pyVar78->root + lVar85) = uVar116;
          lVar117 = lVar85 + 4;
          lVar85 = lVar85 + 4;
          uVar116 = *(uint *)((long)&pyVar94->root + lVar117);
        }
        pyVar93 = (yyjson_doc *)((long)&pyVar94->root + lVar85);
        pyVar78 = (yyjson_doc *)((long)&pyVar78->root + lVar85);
        pyVar75 = pyVar78;
        if (lVar85 != 0) break;
        local_538 = pyVar109;
        local_500 = pyVar98;
        if ((flg & 0x40) == 0) goto LAB_00f18e10;
LAB_00f1f811:
        *(short *)&pyVar78->root = (short)uVar116;
        pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 1);
        pyVar94 = (yyjson_doc *)((long)&pyVar93->root + 1);
      }
      goto LAB_00f1f706;
    }
    if ((char_table[(byte)*(code *)((long)&pyVar94->root + 1)] & 0xc) != 0) {
      uVar116 = (uint)*(ushort *)&pyVar94->root;
      pyVar93 = pyVar94;
      goto LAB_00f1f811;
    }
    if ((char_table[(byte)*(code *)((long)&pyVar94->root + 2)] & 0xc) != 0) {
      ppyVar68 = &pyVar94->root;
      pyVar94 = (yyjson_doc *)((long)&pyVar94->root + 2);
      *(undefined2 *)&pyVar78->root = *(undefined2 *)ppyVar68;
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 2);
      goto LAB_00f1f959;
    }
    if ((char_table[(byte)*(code *)((long)&pyVar94->root + 3)] & 0xc) != 0) {
      ppyVar68 = &pyVar94->root;
      pyVar94 = (yyjson_doc *)((long)&pyVar94->root + 3);
      *(undefined4 *)&pyVar78->root = *(undefined4 *)ppyVar68;
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 3);
      goto LAB_00f1f959;
    }
    if ((char_table[(byte)*(code *)((long)&pyVar94->root + 4)] & 0xc) != 0) {
      ppyVar68 = &pyVar94->root;
      pyVar94 = (yyjson_doc *)((long)&pyVar94->root + 4);
      *(undefined4 *)&pyVar78->root = *(undefined4 *)ppyVar68;
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 4);
      goto LAB_00f1f959;
    }
    if ((char_table[(byte)*(code *)((long)&pyVar94->root + 5)] & 0xc) != 0) {
      *(undefined4 *)&pyVar78->root = *(undefined4 *)&pyVar94->root;
      *(undefined2 *)((long)&pyVar78->root + 4) = *(undefined2 *)((long)&pyVar94->root + 4);
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 5);
      pyVar94 = (yyjson_doc *)((long)&pyVar94->root + 5);
      goto LAB_00f1f959;
    }
    if ((char_table[(byte)*(code *)((long)&pyVar94->root + 6)] & 0xc) != 0) {
      *(undefined4 *)&pyVar78->root = *(undefined4 *)&pyVar94->root;
      *(undefined2 *)((long)&pyVar78->root + 4) = *(undefined2 *)((long)&pyVar94->root + 4);
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 6);
      pyVar94 = (yyjson_doc *)((long)&pyVar94->root + 6);
      goto LAB_00f1f959;
    }
    if ((char_table[(byte)*(code *)((long)&pyVar94->root + 7)] & 0xc) != 0) {
      ppyVar68 = &pyVar94->root;
      pyVar94 = (yyjson_doc *)((long)&pyVar94->root + 7);
      pyVar78->root = *ppyVar68;
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 7);
      goto LAB_00f1f959;
    }
    if ((char_table[(byte)*(code *)&(pyVar94->alc).malloc] & 0xc) != 0) {
      ppyVar68 = &pyVar94->root;
      pyVar94 = (yyjson_doc *)&pyVar94->alc;
      pyVar78->root = *ppyVar68;
      pyVar78 = (yyjson_doc *)&pyVar78->alc;
      goto LAB_00f1f959;
    }
    if ((char_table[(byte)*(code *)((long)&(pyVar94->alc).malloc + 1)] & 0xc) != 0) {
      pyVar78->root = pyVar94->root;
      *(undefined2 *)&(pyVar78->alc).malloc = *(undefined2 *)&(pyVar94->alc).malloc;
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 1);
      pyVar94 = (yyjson_doc *)((long)&(pyVar94->alc).malloc + 1);
      goto LAB_00f1f959;
    }
    if ((char_table[(byte)*(code *)((long)&(pyVar94->alc).malloc + 2)] & 0xc) != 0) {
      pyVar78->root = pyVar94->root;
      *(undefined2 *)&(pyVar78->alc).malloc = *(undefined2 *)&(pyVar94->alc).malloc;
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 2);
      pyVar94 = (yyjson_doc *)((long)&(pyVar94->alc).malloc + 2);
      goto LAB_00f1f959;
    }
    if ((char_table[(byte)*(code *)((long)&(pyVar94->alc).malloc + 3)] & 0xc) != 0) {
      pyVar78->root = pyVar94->root;
      *(undefined4 *)&(pyVar78->alc).malloc = *(undefined4 *)&(pyVar94->alc).malloc;
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 3);
      pyVar94 = (yyjson_doc *)((long)&(pyVar94->alc).malloc + 3);
      goto LAB_00f1f959;
    }
    if ((char_table[(byte)*(code *)((long)&(pyVar94->alc).malloc + 4)] & 0xc) != 0) {
      pyVar78->root = pyVar94->root;
      *(undefined4 *)&(pyVar78->alc).malloc = *(undefined4 *)&(pyVar94->alc).malloc;
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 4);
      pyVar94 = (yyjson_doc *)((long)&(pyVar94->alc).malloc + 4);
      goto LAB_00f1f959;
    }
    if ((char_table[(byte)*(code *)((long)&(pyVar94->alc).malloc + 5)] & 0xc) != 0) {
      pyVar78->root = pyVar94->root;
      *(undefined4 *)&(pyVar78->alc).malloc = *(undefined4 *)&(pyVar94->alc).malloc;
      *(undefined2 *)((long)&(pyVar78->alc).malloc + 4) =
           *(undefined2 *)((long)&(pyVar94->alc).malloc + 4);
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 5);
      pyVar94 = (yyjson_doc *)((long)&(pyVar94->alc).malloc + 5);
      goto LAB_00f1f959;
    }
    if ((char_table[(byte)*(code *)((long)&(pyVar94->alc).malloc + 6)] & 0xc) != 0) {
      pyVar78->root = pyVar94->root;
      *(undefined4 *)&(pyVar78->alc).malloc = *(undefined4 *)&(pyVar94->alc).malloc;
      *(undefined2 *)((long)&(pyVar78->alc).malloc + 4) =
           *(undefined2 *)((long)&(pyVar94->alc).malloc + 4);
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 6);
      pyVar94 = (yyjson_doc *)((long)&(pyVar94->alc).malloc + 6);
      goto LAB_00f1f959;
    }
    bVar84 = char_table[(byte)*(code *)((long)&(pyVar94->alc).malloc + 7)];
    p_Var77 = (_func_void_void_ptr_void_ptr *)(pyVar94->alc).malloc;
    pyVar78->root = pyVar94->root;
    (pyVar78->alc).malloc = (_func_void_ptr_void_ptr_size_t *)p_Var77;
    if ((bVar84 & 0xc) != 0) {
      pyVar94 = (yyjson_doc *)((long)&(pyVar94->alc).malloc + 7);
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 7);
      goto LAB_00f1f959;
    }
    pyVar93 = (yyjson_doc *)&(pyVar94->alc).realloc;
    pyVar75 = (yyjson_doc *)&(pyVar78->alc).realloc;
  } while( true );
LAB_00f1d4a2:
  do {
    local_550 = (yyjson_doc *)((long)&local_550->root + 1);
  } while ((char_table[(byte)*(code *)&local_550->root] & 1) != 0);
  goto LAB_00f1d40e;
LAB_00f2072e:
  local_538 = pyVar109;
  local_4e8 = puVar95;
  if ((bVar84 & 3) == 0) {
    if ((bVar84 & 0x20) == 0) {
LAB_00f2073e:
      (local_530->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x14;
      (local_530->alc).free =
           (_func_void_void_ptr_void_ptr *)((ulong)(cVar101 == (code)0x2d) << 0x3f);
      pyVar104 = local_540;
      pyVar75 = local_548;
      local_550 = pyVar93;
      goto LAB_00f1cf7f;
    }
    bVar70 = (digi_table[(byte)*(code *)((long)&pyVar93->root + 1)] & 0xc) == 0;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((long)pyVar93 + (2 - (ulong)bVar70));
    pyVar93 = (yyjson_doc *)((long)pyVar93 + (2 - (ulong)bVar70));
    if ((digi_table[(byte)*p_Var77] & 3) != 0) {
      do {
        ppyVar68 = &pyVar93->root;
        pyVar93 = (yyjson_doc *)((long)&pyVar93->root + 1);
      } while ((digi_table[(byte)*(code *)((long)ppyVar68 + 1)] & 3) != 0);
      goto LAB_00f2073e;
    }
LAB_00f2086f:
    msg = "no digit after exponent sign";
  }
  else {
LAB_00f20761:
    msg = "number with leading zero is not allowed";
    pyVar93 = (yyjson_doc *)((long)&pyVar93[-1].str_pool + 7);
  }
  exp = 0;
  pyVar75 = local_548;
  local_550 = pyVar93;
  goto LAB_00f1e222;
LAB_00f1f311:
  while ((char_table[(byte)*(code *)&local_550->root] & 1) != 0) {
    local_550 = (yyjson_doc *)((long)&local_550->root + 1);
  }
LAB_00f204e5:
  pyVar76 = local_4d0;
  pyVar75 = local_518;
  pyVar78 = local_550;
  if (local_4d0 <= local_550) {
LAB_00f1dcab:
    if (((flg & 0xa0) != 0) && (pyVar98->root != (yyjson_val *)0x0)) {
      *(code *)&pyVar98->root->tag = (code)0x0;
    }
    local_548->root = (yyjson_val *)(local_548 + 1);
    (local_548->alc).malloc = pcVar107;
    (local_548->alc).realloc = local_4b0;
    (local_548->alc).free = local_4c0;
    (local_548->alc).ctx = local_4d8;
    local_548->dat_read = (long)local_550 - (long)local_518;
    local_548->val_read = ((long)pyVar120 - (long)(local_548 + 1) >> 4) + 1;
    goto LAB_00f1dd18;
  }
  bVar70 = is_truncated_end((u8 *)local_518,(u8 *)local_550,(u8 *)local_4d0,4,flg);
  if (bVar70) {
    pyVar78 = pyVar76;
  }
  pcVar88 = "unexpected content after document";
  if (bVar70) {
    pcVar88 = "unexpected end of data";
  }
  pyVar82 = local_4b8;
  if (local_4b8 == (yyjson_read_err *)0x0) {
    pyVar82 = &dummy_err;
  }
  pyVar82->pos = (long)pyVar78 - (long)pyVar75;
LAB_00f1cdc2:
  local_4e0->code = bVar70 + 4;
  pyVar82->msg = pcVar88;
  pyVar75 = local_548;
  pyVar87 = local_4b8;
  goto joined_r0x00f1c844;
LAB_00f1cddc:
  local_550 = (yyjson_doc *)((long)&local_550->root + 1);
  pyVar109->root = (yyjson_val *)((ulong)*(byte *)&pyVar109->root + (long)puVar95 * 0x100 + 0x100);
  pyVar120 = (yyjson_doc *)&(pyVar120->alc).realloc;
  pyVar74 = pyVar75;
  pyVar76 = pyVar78;
  if (pyVar104 <= pyVar120) {
    pyVar76 = (yyjson_doc *)((long)&pyVar78->root + ((ulong)pyVar78 >> 1));
    local_500 = pyVar98;
    pyVar74 = (yyjson_doc *)(*local_4b0)(local_4d8,pyVar75,(long)pyVar78 << 4,(long)pyVar76 * 0x10);
    pyVar98 = pyVar75;
    if (pyVar74 == (yyjson_doc *)0x0) goto LAB_00f1e929;
    pyVar120 = (yyjson_doc *)(((long)pyVar120 - (long)pyVar75) + (long)pyVar74);
    pyVar109 = (yyjson_doc *)(((long)pyVar109 - (long)pyVar75) + (long)pyVar74);
    pyVar104 = (yyjson_doc *)((long)pyVar74 + ((long)pyVar76 * 0x10 - 0x20U));
    pyVar98 = local_500;
  }
  pyVar120->root = (yyjson_val *)0x6;
  (pyVar120->alc).malloc = (_func_void_ptr_void_ptr_size_t *)((long)pyVar120 - (long)pyVar109);
  puVar95 = (undefined1 *)0x0;
  pyVar109 = pyVar120;
  goto LAB_00f12707;
LAB_00f14f45:
  local_4e8 = puVar69;
  pyVar75 = local_4d0;
  pyVar78 = local_518;
  pyVar120 = local_550;
  bVar70 = is_truncated_end((u8 *)local_518,(u8 *)local_550,(u8 *)local_4d0,0xb,flg);
  if (bVar70) {
    pyVar120 = pyVar75;
  }
  yVar72 = 5;
  if (!bVar70) {
    yVar72 = 0xb;
  }
  pcVar88 = "invalid literal";
  if (bVar70) {
    pcVar88 = "unexpected end of data";
  }
  sVar119 = (long)pyVar120 - (long)pyVar78;
  goto LAB_00f1ea32;
LAB_00f13043:
  uVar118 = (ulong)(byte)*(code *)&pyVar78->root;
  if ((char_table[uVar118] & 0xc) == 0) {
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 1);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 1);
      goto LAB_00f13172;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 2);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 2);
      goto LAB_00f13172;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 3);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 3);
      goto LAB_00f13172;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 4);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 4);
      goto LAB_00f13172;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 5);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 5);
      goto LAB_00f13172;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 6);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 6);
      goto LAB_00f13172;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 7);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 7);
      goto LAB_00f13172;
    }
    uVar118 = (ulong)(byte)*(code *)&(pyVar78->alc).malloc;
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)&pyVar78->alc;
      goto LAB_00f13172;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 1);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 1);
      goto LAB_00f13172;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 2);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 2);
      goto LAB_00f13172;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 3);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 3);
      goto LAB_00f13172;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 4);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 4);
      goto LAB_00f13172;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 5);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 5);
      goto LAB_00f13172;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 6);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 6);
      goto LAB_00f13172;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 7);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 7);
      goto LAB_00f13172;
    }
    pyVar78 = (yyjson_doc *)&(pyVar78->alc).realloc;
    goto LAB_00f13043;
  }
LAB_00f13172:
  pyVar94 = pyVar78;
  if ((char)uVar118 == '\"') goto LAB_00f1337c;
  local_540 = pyVar104;
  local_548 = pyVar75;
  local_538 = pyVar109;
  local_508 = pyVar120;
  local_500 = pyVar98;
  if ((char)uVar118 < '\0') {
    lVar85 = 0;
    for (; ((uVar116 = *(uint *)&pyVar78->root, (uVar116 & 0xc0c0f0) == 0x8080e0 &&
            ((uVar116 & 0x200f) != 0)) && ((uVar116 & 0x200f) != 0x200d));
        pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 3)) {
      lVar85 = lVar85 + -3;
    }
    if ((char)uVar116 < '\0') {
      while (((uVar116 & 0xc0e0) == 0x80c0 && ((uVar116 & 0x1e) != 0))) {
        ppyVar68 = &pyVar78->root;
        pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 2);
        lVar85 = lVar85 + -2;
        uVar116 = *(uint *)((long)ppyVar68 + 2);
      }
      while ((((uVar116 & 0xc0c0c0f8) == 0x808080f0 && ((uVar116 & 0x3007) != 0)) &&
             (((byte)uVar116 >> 2 & (uVar116 & 0x3003) != 0) == 0))) {
        ppyVar68 = &pyVar78->root;
        pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 4);
        lVar85 = lVar85 + -4;
        uVar116 = *(uint *)((long)ppyVar68 + 4);
      }
      if (lVar85 == 0) {
        if ((flg & 0x40) == 0) goto LAB_00f1ff1b;
        pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 1);
      }
    }
    goto LAB_00f13043;
  }
LAB_00f16493:
  if (SUB81(uVar118,0) == (code)0x5c) {
    cVar101 = *(code *)((long)&pyVar94->root + 1);
    switch(cVar101) {
    case (code)0x6e:
      *(code *)&pyVar78->root = (code)0xa;
      break;
    case (code)0x6f:
    case (code)0x70:
    case (code)0x71:
    case (code)0x73:
      goto switchD_00f164e5_caseD_6f;
    case (code)0x72:
      *(code *)&pyVar78->root = (code)0xd;
      break;
    case (code)0x74:
      *(code *)&pyVar78->root = (code)0x9;
      break;
    case (code)0x75:
      uVar2 = CONCAT11(hex_conv_table[(byte)*(code *)((long)&pyVar94->root + 3)],
                       hex_conv_table[(byte)*(code *)((long)&pyVar94->root + 5)]);
      if (((uVar2 | CONCAT11(hex_conv_table[(byte)*(code *)((long)&pyVar94->root + 2)],
                             hex_conv_table[(byte)*(code *)((long)&pyVar94->root + 4)])) & 0xf0f0)
          != 0) goto LAB_00f1fc17;
      uVar116 = (uint)CONCAT11(hex_conv_table[(byte)*(code *)((long)&pyVar94->root + 2)],
                               hex_conv_table[(byte)*(code *)((long)&pyVar94->root + 4)]) << 4;
      uVar103 = uVar2 | uVar116;
      pyVar93 = (yyjson_doc *)((long)&pyVar94->root + 6);
      if ((uVar103 & 0xf800) != 0xd800) {
        cVar101 = SUB41(uVar103,0);
        if ((ushort)uVar103 < 0x800) {
          if ((ushort)uVar103 < 0x80) {
            *(code *)&pyVar78->root = cVar101;
            pyVar74 = (yyjson_doc *)((long)&pyVar78->root + 1);
          }
          else {
            *(byte *)&pyVar78->root = (byte)(uVar103 >> 6) | 0xc0;
            *(byte *)((long)&pyVar78->root + 1) = (byte)cVar101 & 0x3f | 0x80;
            pyVar74 = (yyjson_doc *)((long)&pyVar78->root + 2);
          }
        }
        else {
          *(byte *)&pyVar78->root = (byte)(((uint)uVar2 | uVar116 & 0xffff) >> 0xc) | 0xe0;
          *(byte *)((long)&pyVar78->root + 1) = (byte)(uVar103 >> 6) & 0x3f | 0x80;
          *(byte *)((long)&pyVar78->root + 2) = (byte)cVar101 & 0x3f | 0x80;
          pyVar74 = (yyjson_doc *)((long)&pyVar78->root + 3);
        }
        goto LAB_00f165bc;
      }
      if ((uVar103 & 0xdc00) != 0xd800) goto LAB_00f1fee1;
      if (*(short *)&pyVar93->root != 0x755c) goto LAB_00f1feed;
      if (((CONCAT11(hex_conv_table[(byte)*(code *)((long)&(pyVar94->alc).malloc + 1)],
                     hex_conv_table[(byte)*(code *)((long)&(pyVar94->alc).malloc + 3)]) |
           CONCAT11(hex_conv_table[(byte)*(code *)&(pyVar94->alc).malloc],
                    hex_conv_table[(byte)*(code *)((long)&(pyVar94->alc).malloc + 2)])) & 0xf0f0) !=
          0) goto LAB_00f1fef6;
      uVar116 = (CONCAT11(hex_conv_table[(byte)*(code *)&(pyVar94->alc).malloc],
                          hex_conv_table[(byte)*(code *)((long)&(pyVar94->alc).malloc + 2)]) & 0xfff
                ) << 4 | (uint)CONCAT11(hex_conv_table
                                        [(byte)*(code *)((long)&(pyVar94->alc).malloc + 1)],
                                        hex_conv_table
                                        [(byte)*(code *)((long)&(pyVar94->alc).malloc + 3)]);
      if ((uVar116 & 0xfc00) != 0xdc00) goto LAB_00f1feff;
      iVar102 = (uVar103 & 0xdbff) * 0x400;
      uVar103 = iVar102 + uVar116 + 0xfca02400;
      *(byte *)&pyVar78->root = (byte)(uVar103 >> 0x12) | 0xf0;
      *(byte *)((long)&pyVar78->root + 1) = (byte)(uVar103 >> 0xc) & 0x3f | 0x80;
      *(byte *)((long)&pyVar78->root + 2) = (byte)(uVar116 + iVar102 + 0x400 >> 6) & 0x3f | 0x80;
      *(byte *)((long)&pyVar78->root + 3) = (byte)uVar116 & 0x3f | 0x80;
      pyVar93 = (yyjson_doc *)((long)&(pyVar94->alc).malloc + 4);
      pyVar74 = (yyjson_doc *)((long)&pyVar78->root + 4);
      goto LAB_00f165bc;
    default:
      if (cVar101 == (code)0x66) {
        *(code *)&pyVar78->root = (code)0xc;
      }
      else if (cVar101 == (code)0x2f) {
        *(code *)&pyVar78->root = (code)0x2f;
      }
      else if (cVar101 == (code)0x5c) {
        *(code *)&pyVar78->root = (code)0x5c;
      }
      else if (cVar101 == (code)0x62) {
        *(code *)&pyVar78->root = (code)0x8;
      }
      else {
        if (cVar101 != (code)0x22) goto switchD_00f164e5_caseD_6f;
        *(code *)&pyVar78->root = (code)0x22;
      }
    }
    pyVar93 = (yyjson_doc *)((long)&pyVar94->root + 2);
    pyVar74 = (yyjson_doc *)((long)&pyVar78->root + 1);
  }
  else {
    if ((int)uVar118 == 0x22) goto LAB_00f1767b;
    if ((flg & 0x40) == 0) goto LAB_00f1ff33;
    if (local_4d0 <= pyVar94) goto LAB_00f1ff27;
    *(code *)&pyVar78->root = SUB81(uVar118,0);
    pyVar93 = (yyjson_doc *)((long)&pyVar94->root + 1);
    pyVar74 = (yyjson_doc *)((long)&pyVar78->root + 1);
  }
LAB_00f165bc:
  do {
    pyVar78 = pyVar74;
    pyVar94 = pyVar93;
    if ((char_table[(byte)*(code *)&pyVar94->root] & 0xc) != 0) {
LAB_00f1680f:
      while( true ) {
        uVar118 = (ulong)(byte)*(code *)&pyVar94->root;
        if (-1 < (char)*(code *)&pyVar94->root) goto LAB_00f16493;
        lVar85 = 0;
        pyVar74 = pyVar78;
        for (pyVar93 = pyVar94;
            ((uVar116 = *(uint *)&pyVar93->root, (uVar116 & 0xc0c0f0) == 0x8080e0 &&
             ((uVar116 & 0x200f) != 0)) && ((uVar116 & 0x200f) != 0x200d));
            pyVar93 = (yyjson_doc *)((long)&pyVar93->root + 3)) {
          *(uint *)&pyVar74->root = uVar116;
          pyVar74 = (yyjson_doc *)((long)&pyVar74->root + 3);
          lVar85 = lVar85 + 3;
        }
        if (-1 < (char)uVar116) break;
        while (((uVar116 & 0xc0e0) == 0x80c0 && ((uVar116 & 0x1e) != 0))) {
          *(short *)&pyVar74->root = (short)uVar116;
          pyVar74 = (yyjson_doc *)((long)&pyVar74->root + 2);
          ppyVar68 = &pyVar93->root;
          pyVar93 = (yyjson_doc *)((long)&pyVar93->root + 2);
          lVar85 = lVar85 + 2;
          uVar116 = *(uint *)((long)ppyVar68 + 2);
        }
        while ((((uVar116 & 0x3007) != 0 && ((uVar116 & 0xc0c0c0f8) == 0x808080f0)) &&
               (((byte)uVar116 >> 2 & (uVar116 & 0x3003) != 0) == 0))) {
          *(uint *)((long)&pyVar78->root + lVar85) = uVar116;
          lVar117 = lVar85 + 4;
          lVar85 = lVar85 + 4;
          uVar116 = *(uint *)((long)&pyVar94->root + lVar117);
        }
        pyVar93 = (yyjson_doc *)((long)&pyVar94->root + lVar85);
        pyVar78 = (yyjson_doc *)((long)&pyVar78->root + lVar85);
        pyVar74 = pyVar78;
        if (lVar85 != 0) break;
        if ((flg & 0x40) == 0) goto LAB_00f18e10;
LAB_00f166c7:
        *(short *)&pyVar78->root = (short)uVar116;
        pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 1);
        pyVar94 = (yyjson_doc *)((long)&pyVar93->root + 1);
      }
      goto LAB_00f165bc;
    }
    if ((char_table[(byte)*(code *)((long)&pyVar94->root + 1)] & 0xc) != 0) {
      uVar116 = (uint)*(ushort *)&pyVar94->root;
      pyVar93 = pyVar94;
      goto LAB_00f166c7;
    }
    if ((char_table[(byte)*(code *)((long)&pyVar94->root + 2)] & 0xc) != 0) {
      ppyVar68 = &pyVar94->root;
      pyVar94 = (yyjson_doc *)((long)&pyVar94->root + 2);
      *(undefined2 *)&pyVar78->root = *(undefined2 *)ppyVar68;
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 2);
      goto LAB_00f1680f;
    }
    if ((char_table[(byte)*(code *)((long)&pyVar94->root + 3)] & 0xc) != 0) {
      ppyVar68 = &pyVar94->root;
      pyVar94 = (yyjson_doc *)((long)&pyVar94->root + 3);
      *(undefined4 *)&pyVar78->root = *(undefined4 *)ppyVar68;
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 3);
      goto LAB_00f1680f;
    }
    if ((char_table[(byte)*(code *)((long)&pyVar94->root + 4)] & 0xc) != 0) {
      ppyVar68 = &pyVar94->root;
      pyVar94 = (yyjson_doc *)((long)&pyVar94->root + 4);
      *(undefined4 *)&pyVar78->root = *(undefined4 *)ppyVar68;
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 4);
      goto LAB_00f1680f;
    }
    if ((char_table[(byte)*(code *)((long)&pyVar94->root + 5)] & 0xc) != 0) {
      *(undefined4 *)&pyVar78->root = *(undefined4 *)&pyVar94->root;
      *(undefined2 *)((long)&pyVar78->root + 4) = *(undefined2 *)((long)&pyVar94->root + 4);
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 5);
      pyVar94 = (yyjson_doc *)((long)&pyVar94->root + 5);
      goto LAB_00f1680f;
    }
    if ((char_table[(byte)*(code *)((long)&pyVar94->root + 6)] & 0xc) != 0) {
      *(undefined4 *)&pyVar78->root = *(undefined4 *)&pyVar94->root;
      *(undefined2 *)((long)&pyVar78->root + 4) = *(undefined2 *)((long)&pyVar94->root + 4);
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 6);
      pyVar94 = (yyjson_doc *)((long)&pyVar94->root + 6);
      goto LAB_00f1680f;
    }
    if ((char_table[(byte)*(code *)((long)&pyVar94->root + 7)] & 0xc) != 0) {
      ppyVar68 = &pyVar94->root;
      pyVar94 = (yyjson_doc *)((long)&pyVar94->root + 7);
      pyVar78->root = *ppyVar68;
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 7);
      goto LAB_00f1680f;
    }
    if ((char_table[(byte)*(code *)&(pyVar94->alc).malloc] & 0xc) != 0) {
      ppyVar68 = &pyVar94->root;
      pyVar94 = (yyjson_doc *)&pyVar94->alc;
      pyVar78->root = *ppyVar68;
      pyVar78 = (yyjson_doc *)&pyVar78->alc;
      goto LAB_00f1680f;
    }
    if ((char_table[(byte)*(code *)((long)&(pyVar94->alc).malloc + 1)] & 0xc) != 0) {
      pyVar78->root = pyVar94->root;
      *(undefined2 *)&(pyVar78->alc).malloc = *(undefined2 *)&(pyVar94->alc).malloc;
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 1);
      pyVar94 = (yyjson_doc *)((long)&(pyVar94->alc).malloc + 1);
      goto LAB_00f1680f;
    }
    if ((char_table[(byte)*(code *)((long)&(pyVar94->alc).malloc + 2)] & 0xc) != 0) {
      pyVar78->root = pyVar94->root;
      *(undefined2 *)&(pyVar78->alc).malloc = *(undefined2 *)&(pyVar94->alc).malloc;
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 2);
      pyVar94 = (yyjson_doc *)((long)&(pyVar94->alc).malloc + 2);
      goto LAB_00f1680f;
    }
    if ((char_table[(byte)*(code *)((long)&(pyVar94->alc).malloc + 3)] & 0xc) != 0) {
      pyVar78->root = pyVar94->root;
      *(undefined4 *)&(pyVar78->alc).malloc = *(undefined4 *)&(pyVar94->alc).malloc;
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 3);
      pyVar94 = (yyjson_doc *)((long)&(pyVar94->alc).malloc + 3);
      goto LAB_00f1680f;
    }
    if ((char_table[(byte)*(code *)((long)&(pyVar94->alc).malloc + 4)] & 0xc) != 0) {
      pyVar78->root = pyVar94->root;
      *(undefined4 *)&(pyVar78->alc).malloc = *(undefined4 *)&(pyVar94->alc).malloc;
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 4);
      pyVar94 = (yyjson_doc *)((long)&(pyVar94->alc).malloc + 4);
      goto LAB_00f1680f;
    }
    if ((char_table[(byte)*(code *)((long)&(pyVar94->alc).malloc + 5)] & 0xc) != 0) {
      pyVar78->root = pyVar94->root;
      *(undefined4 *)&(pyVar78->alc).malloc = *(undefined4 *)&(pyVar94->alc).malloc;
      *(undefined2 *)((long)&(pyVar78->alc).malloc + 4) =
           *(undefined2 *)((long)&(pyVar94->alc).malloc + 4);
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 5);
      pyVar94 = (yyjson_doc *)((long)&(pyVar94->alc).malloc + 5);
      goto LAB_00f1680f;
    }
    if ((char_table[(byte)*(code *)((long)&(pyVar94->alc).malloc + 6)] & 0xc) != 0) {
      pyVar78->root = pyVar94->root;
      *(undefined4 *)&(pyVar78->alc).malloc = *(undefined4 *)&(pyVar94->alc).malloc;
      *(undefined2 *)((long)&(pyVar78->alc).malloc + 4) =
           *(undefined2 *)((long)&(pyVar94->alc).malloc + 4);
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 6);
      pyVar94 = (yyjson_doc *)((long)&(pyVar94->alc).malloc + 6);
      goto LAB_00f1680f;
    }
    bVar84 = char_table[(byte)*(code *)((long)&(pyVar94->alc).malloc + 7)];
    p_Var77 = (_func_void_void_ptr_void_ptr *)(pyVar94->alc).malloc;
    pyVar78->root = pyVar94->root;
    (pyVar78->alc).malloc = (_func_void_ptr_void_ptr_size_t *)p_Var77;
    if ((bVar84 & 0xc) != 0) {
      pyVar94 = (yyjson_doc *)((long)&(pyVar94->alc).malloc + 7);
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 7);
      goto LAB_00f1680f;
    }
    pyVar93 = (yyjson_doc *)&(pyVar94->alc).realloc;
    pyVar74 = (yyjson_doc *)&(pyVar78->alc).realloc;
  } while( true );
LAB_00f1767b:
  uStackY_580 = 5;
LAB_00f1337c:
  pyVar120->root = (yyjson_val *)(((long)pyVar78 - (long)pyVar76) * 0x100 | uStackY_580);
  (pyVar120->alc).malloc = (_func_void_ptr_void_ptr_size_t *)pyVar76;
  *(code *)&pyVar78->root = (code)0x0;
  puVar95 = puVar95 + 1;
  pyVar74 = pyVar75;
  pyVar76 = local_520;
  local_550 = (yyjson_doc *)((long)&pyVar94->root + 1);
  goto LAB_00f1ce8a;
LAB_00f1ff33:
  msg = "unexpected control character in string";
  goto LAB_00f1fbb1;
LAB_00f1ff27:
  msg = "unclosed string";
  goto LAB_00f1fbb1;
LAB_00f1fc17:
  msg = "invalid escaped sequence in string";
  goto LAB_00f1fbb1;
switchD_00f164e5_caseD_6f:
  pyVar94 = (yyjson_doc *)((long)&pyVar94->root + 1);
  msg = "invalid escaped character in string";
  goto LAB_00f1fbb1;
LAB_00f18e10:
  msg = "invalid UTF-8 encoding in string";
  goto LAB_00f1fbb1;
LAB_00f127cd:
  do {
    local_550 = (yyjson_doc *)((long)&local_550->root + 1);
  } while ((char_table[(byte)*(code *)&local_550->root] & 1) != 0);
  goto LAB_00f12716;
LAB_00f18ddc:
  sVar71 = *(short *)&local_550->root;
joined_r0x00f1e9d3:
  puVar69 = local_4e8;
  if (sVar71 != 0x2a2f) {
LAB_00f1efed:
    local_4e8 = puVar69;
    pyVar75 = local_4d0;
    pyVar120 = local_518;
    pyVar78 = local_550;
    bVar70 = is_truncated_end((u8 *)local_518,(u8 *)local_550,(u8 *)local_4d0,6,flg);
    if (bVar70) {
      pyVar78 = pyVar75;
    }
    pcVar88 = "unexpected character";
    if (bVar70) {
      pcVar88 = "unexpected end of data";
    }
    sVar119 = (long)pyVar78 - (long)pyVar120;
    pyVar82 = local_4b8;
    if (local_4b8 == (yyjson_read_err *)0x0) {
      pyVar82 = &dummy_err;
    }
LAB_00f1cd44:
    pyVar82->pos = sVar119;
    local_4e0->code = 6 - bVar70;
    pyVar82->msg = pcVar88;
    pyVar75 = local_548;
    pyVar82 = local_4e0;
    pyVar87 = local_4b8;
joined_r0x00f14751:
    local_4e0 = pyVar82;
    local_4b8 = pyVar87;
    if (pyVar75 != (yyjson_doc *)0x0) {
      (*local_4c0)(local_4d8,pyVar75);
    }
    pyVar78 = (yyjson_doc *)0x0;
    goto LAB_00f18e40;
  }
LAB_00f1e9d9:
  pyVar75 = local_4d0;
  pyVar78 = local_518;
  pyVar120 = local_550;
  bVar70 = is_truncated_end((u8 *)local_518,(u8 *)local_550,(u8 *)local_4d0,8,flg);
  if (bVar70) {
    pyVar120 = pyVar75;
  }
  pcVar88 = "unclosed multiline comment";
  if (bVar70) {
    pcVar88 = "unexpected end of data";
  }
  sVar119 = (long)pyVar120 - (long)pyVar78;
  yVar72 = (uint)!bVar70 * 3 + 5;
  goto LAB_00f1ea32;
LAB_00f14e5b:
  for (; *(code *)&local_550->root != (code)0x2c;
      local_550 = (yyjson_doc *)((long)&local_550[-1].str_pool + 7)) {
  }
  goto LAB_00f14e62;
LAB_00f20054:
  local_4e8 = puVar95;
  pyVar75 = (yyjson_doc *)((long)&pyVar94->root + 2);
  puVar95 = local_4e8;
LAB_00f20058:
  local_4e8 = puVar95;
  msg = "no digit after decimal point";
  pyVar94 = pyVar75;
LAB_00f2005f:
  exp = 0;
  pyVar75 = local_548;
  local_550 = pyVar94;
  goto LAB_00f1e222;
LAB_00f18a27:
  if ((bVar84 & 3) != 0) goto LAB_00f20761;
  if ((bVar84 & 0x20) != 0) {
    bVar70 = (digi_table[(byte)*(code *)((long)&pyVar93->root + 1)] & 0xc) == 0;
    p_Var77 = (_func_void_void_ptr_void_ptr *)((long)pyVar93 + (2 - (ulong)bVar70));
    pyVar93 = (yyjson_doc *)((long)pyVar93 + (2 - (ulong)bVar70));
    if ((digi_table[(byte)*p_Var77] & 3) != 0) {
      do {
        ppyVar68 = &pyVar93->root;
        pyVar93 = (yyjson_doc *)((long)&pyVar93->root + 1);
      } while ((digi_table[(byte)*(code *)((long)ppyVar68 + 1)] & 3) != 0);
      goto LAB_00f18a3b;
    }
    goto LAB_00f2086f;
  }
LAB_00f18a3b:
  pyVar120->root = (yyjson_val *)0x14;
  p_Var79 = (_func_void_ptr_void_ptr_size_t *)((ulong)(cVar101 == (code)0x2d) << 0x3f);
LAB_00f14cba:
  (pyVar120->alc).malloc = p_Var79;
  local_550 = pyVar93;
  goto LAB_00f1ce8a;
LAB_00f1f33a:
  for (; *(code *)&local_550->root != (code)0x2c;
      local_550 = (yyjson_doc *)((long)&local_550[-1].str_pool + 7)) {
  }
LAB_00f14e62:
  pyVar75 = local_4d0;
  pyVar78 = local_518;
  pyVar120 = local_550;
  bVar70 = is_truncated_end((u8 *)local_518,(u8 *)local_550,(u8 *)local_4d0,7,flg);
  if (bVar70) {
    pyVar120 = pyVar75;
  }
  pcVar88 = "trailing comma is not allowed";
  if (bVar70) {
    pcVar88 = "unexpected end of data";
  }
  sVar119 = (long)pyVar120 - (long)pyVar78;
  yVar72 = !bVar70 + 5 + (uint)!bVar70;
LAB_00f1ea32:
  pyVar82 = local_4b8;
  if (local_4b8 == (yyjson_read_err *)0x0) {
    pyVar82 = &dummy_err;
  }
LAB_00f1cd6b:
  pyVar82->pos = sVar119;
LAB_00f1cd6f:
  local_4e0->code = yVar72;
  pyVar82->msg = pcVar88;
  pyVar75 = local_548;
  pyVar87 = local_4b8;
  goto joined_r0x00f1c844;
LAB_00f1d5d1:
  uVar118 = (ulong)(byte)*(code *)&pyVar78->root;
  if ((char_table[uVar118] & 0xc) == 0) {
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 1);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 1);
      goto LAB_00f1d700;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 2);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 2);
      goto LAB_00f1d700;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 3);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 3);
      goto LAB_00f1d700;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 4);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 4);
      goto LAB_00f1d700;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 5);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 5);
      goto LAB_00f1d700;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 6);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 6);
      goto LAB_00f1d700;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&pyVar78->root + 7);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 7);
      goto LAB_00f1d700;
    }
    uVar118 = (ulong)(byte)*(code *)&(pyVar78->alc).malloc;
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)&pyVar78->alc;
      goto LAB_00f1d700;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 1);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 1);
      goto LAB_00f1d700;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 2);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 2);
      goto LAB_00f1d700;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 3);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 3);
      goto LAB_00f1d700;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 4);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 4);
      goto LAB_00f1d700;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 5);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 5);
      goto LAB_00f1d700;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 6);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 6);
      goto LAB_00f1d700;
    }
    uVar118 = (ulong)(byte)*(code *)((long)&(pyVar78->alc).malloc + 7);
    if ((char_table[uVar118] & 0xc) != 0) {
      pyVar78 = (yyjson_doc *)((long)&(pyVar78->alc).malloc + 7);
      goto LAB_00f1d700;
    }
    pyVar78 = (yyjson_doc *)&(pyVar78->alc).realloc;
    goto LAB_00f1d5d1;
  }
LAB_00f1d700:
  pyVar94 = pyVar78;
  if ((char)uVar118 == '\"') goto LAB_00f1d82e;
  local_508 = pyVar120;
  if (-1 < (char)uVar118) goto LAB_00f1f5da;
  lVar85 = 0;
  for (; ((uVar116 = *(uint *)&pyVar78->root, (uVar116 & 0xc0c0f0) == 0x8080e0 &&
          ((uVar116 & 0x200f) != 0)) && ((uVar116 & 0x200f) != 0x200d));
      pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 3)) {
    lVar85 = lVar85 + -3;
  }
  pyVar104 = local_540;
  pyVar75 = local_548;
  local_538 = pyVar109;
  local_500 = pyVar98;
  if (-1 < (char)uVar116) goto LAB_00f1d5d1;
  while (((uVar116 & 0xc0e0) == 0x80c0 && ((uVar116 & 0x1e) != 0))) {
    ppyVar68 = &pyVar78->root;
    pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 2);
    lVar85 = lVar85 + -2;
    uVar116 = *(uint *)((long)ppyVar68 + 2);
  }
  while ((((uVar116 & 0xc0c0c0f8) == 0x808080f0 && ((uVar116 & 0x3007) != 0)) &&
         (((byte)uVar116 >> 2 & (uVar116 & 0x3003) != 0) == 0))) {
    ppyVar68 = &pyVar78->root;
    pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 4);
    lVar85 = lVar85 + -4;
    uVar116 = *(uint *)((long)ppyVar68 + 4);
  }
  if (lVar85 != 0) goto LAB_00f1d5d1;
  if ((flg & 0x40) != 0) {
    pyVar78 = (yyjson_doc *)((long)&pyVar78->root + 1);
    goto LAB_00f1d5d1;
  }
LAB_00f1ff1b:
  msg = "invalid UTF-8 encoding in string";
  pyVar94 = pyVar78;
LAB_00f1fbb1:
  pyVar78 = local_4d0;
  pcVar88 = msg;
  pyVar120 = local_518;
  local_550 = pyVar94;
  bVar70 = is_truncated_end((u8 *)local_518,(u8 *)pyVar94,(u8 *)local_4d0,10,flg);
  if (bVar70) {
    pyVar94 = pyVar78;
  }
  pcVar81 = "unexpected end of data";
  if (!bVar70) {
    pcVar81 = pcVar88;
  }
  pyVar82 = local_4b8;
  if (local_4b8 == (yyjson_read_err *)0x0) {
    pyVar82 = &dummy_err;
  }
  pyVar82->pos = (long)pyVar94 - (long)pyVar120;
LAB_00f1cdb2:
  local_4e0->code = (uint)!bVar70 * 5 + 5;
  pyVar82->msg = pcVar81;
  pyVar75 = local_548;
  pyVar87 = local_4b8;
joined_r0x00f1c844:
  local_4b8 = pyVar87;
  if (pyVar75 != (yyjson_doc *)0x0) {
    (*local_4c0)(local_4d8,pyVar75);
  }
  pyVar78 = (yyjson_doc *)0x0;
  pyVar120 = local_518;
  pyVar82 = local_4e0;
LAB_00f18e40:
  if (pyVar78 != (yyjson_doc *)0x0) {
    *(undefined8 *)pyVar82 = 0;
    pyVar82->msg = (char *)0x0;
    pyVar82->pos = 0;
    return pyVar78;
  }
  pyVar80 = pyVar87;
  if (pyVar87 == (yyjson_read_err *)0x0) {
    pyVar80 = &dummy_err;
  }
  if ((pyVar80->pos == 0) && (pyVar82->code != 2)) {
    cVar101 = *(code *)&pyVar120->root;
    if ((cVar101 == (code)0xef) &&
       ((*(code *)((long)&pyVar120->root + 1) == (code)0xbb &&
        (*(code *)((long)&pyVar120->root + 2) == (code)0xbf)))) {
      pcVar88 = "byte order mark (BOM) is not supported";
LAB_00f18f6a:
      pyVar82 = &dummy_err;
      if (pyVar87 != (yyjson_read_err *)0x0) {
        pyVar82 = pyVar87;
      }
      pyVar82->msg = pcVar88;
      pyVar120 = local_518;
    }
    else if (local_470 < 4) {
      if (local_470 != 1) {
        if (cVar101 == (code)0xff) {
          pyVar120 = local_518;
          if (*(code *)((long)&local_518->root + 1) == (code)0xfe) goto LAB_00f18f63;
        }
        else {
          pyVar120 = local_518;
          if (cVar101 == (code)0xfe) goto LAB_00f18f26;
        }
      }
    }
    else if (cVar101 == (code)0xff) {
      pyVar120 = local_518;
      if (*(code *)((long)&local_518->root + 1) == (code)0xfe) {
        if ((*(code *)((long)&local_518->root + 2) != (code)0x0) ||
           (*(code *)((long)&local_518->root + 3) != (code)0x0)) goto LAB_00f18f63;
LAB_00f18f4a:
        pcVar88 = "UTF-32 encoding is not supported";
        goto LAB_00f18f6a;
      }
    }
    else if (cVar101 == (code)0xfe) {
LAB_00f18f26:
      pyVar120 = local_518;
      if (*(code *)((long)&local_518->root + 1) == (code)0xff) {
LAB_00f18f63:
        pcVar88 = "UTF-16 encoding is not supported";
        goto LAB_00f18f6a;
      }
    }
    else {
      pyVar120 = local_518;
      if ((((cVar101 == (code)0x0) && (*(code *)((long)&local_518->root + 1) == (code)0x0)) &&
          (*(code *)((long)&local_518->root + 2) == (code)0xfe)) &&
         (*(code *)((long)&local_518->root + 3) == (code)0xff)) goto LAB_00f18f4a;
    }
  }
  if ((flg & 1) == 0) {
LAB_00f18f98:
    (*local_4c0)(local_4d8,pyVar120);
  }
  return (yyjson_doc *)0x0;
}

Assistant:

yyjson_doc *yyjson_read_opts(char *dat,
                             usize len,
                             yyjson_read_flag flg,
                             const yyjson_alc *alc_ptr,
                             yyjson_read_err *err) {

#define return_err(_pos, _code, _msg) do { \
    err->pos = (usize)(_pos); \
    err->msg = _msg; \
    err->code = YYJSON_READ_ERROR_##_code; \
    if (!has_read_flag(INSITU) && hdr) alc.free(alc.ctx, (void *)hdr); \
    return NULL; \
} while (false)

    yyjson_read_err dummy_err;
    yyjson_alc alc;
    yyjson_doc *doc;
    u8 *hdr = NULL, *end, *cur;

    /* validate input parameters */
    if (!err) err = &dummy_err;
    if (likely(!alc_ptr)) {
        alc = YYJSON_DEFAULT_ALC;
    } else {
        alc = *alc_ptr;
    }
    if (unlikely(!dat)) {
        return_err(0, INVALID_PARAMETER, "input data is NULL");
    }
    if (unlikely(!len)) {
        return_err(0, INVALID_PARAMETER, "input length is 0");
    }

    /* add 4-byte zero padding for input data if necessary */
    if (has_read_flag(INSITU)) {
        hdr = (u8 *)dat;
        end = (u8 *)dat + len;
        cur = (u8 *)dat;
    } else {
        if (unlikely(len >= USIZE_MAX - YYJSON_PADDING_SIZE)) {
            return_err(0, MEMORY_ALLOCATION, "memory allocation failed");
        }
        hdr = (u8 *)alc.malloc(alc.ctx, len + YYJSON_PADDING_SIZE);
        if (unlikely(!hdr)) {
            return_err(0, MEMORY_ALLOCATION, "memory allocation failed");
        }
        end = hdr + len;
        cur = hdr;
        memcpy(hdr, dat, len);
        memset(end, 0, YYJSON_PADDING_SIZE);
    }

    /* skip empty contents before json document */
    if (unlikely(char_is_space_or_comment(*cur))) {
        if (has_read_flag(ALLOW_COMMENTS)) {
            if (!skip_spaces_and_comments(&cur)) {
                return_err(cur - hdr, INVALID_COMMENT,
                           "unclosed multiline comment");
            }
        } else {
            if (likely(char_is_space(*cur))) {
                while (char_is_space(*++cur));
            }
        }
        if (unlikely(cur >= end)) {
            return_err(0, EMPTY_CONTENT, "input data is empty");
        }
    }

    /* read json document */
    if (likely(char_is_container(*cur))) {
        if (char_is_space(cur[1]) && char_is_space(cur[2])) {
            doc = read_root_pretty(hdr, cur, end, alc, flg, err);
        } else {
            doc = read_root_minify(hdr, cur, end, alc, flg, err);
        }
    } else {
        doc = read_root_single(hdr, cur, end, alc, flg, err);
    }

    /* check result */
    if (likely(doc)) {
        memset(err, 0, sizeof(yyjson_read_err));
    } else {
        /* RFC 8259: JSON text MUST be encoded using UTF-8 */
        if (err->pos == 0 && err->code != YYJSON_READ_ERROR_MEMORY_ALLOCATION) {
            if ((hdr[0] == 0xEF && hdr[1] == 0xBB && hdr[2] == 0xBF)) {
                err->msg = "byte order mark (BOM) is not supported";
            } else if (len >= 4 &&
                       ((hdr[0] == 0x00 && hdr[1] == 0x00 &&
                         hdr[2] == 0xFE && hdr[3] == 0xFF) ||
                        (hdr[0] == 0xFF && hdr[1] == 0xFE &&
                         hdr[2] == 0x00 && hdr[3] == 0x00))) {
                err->msg = "UTF-32 encoding is not supported";
            } else if (len >= 2 &&
                       ((hdr[0] == 0xFE && hdr[1] == 0xFF) ||
                        (hdr[0] == 0xFF && hdr[1] == 0xFE))) {
                err->msg = "UTF-16 encoding is not supported";
            }
        }
        if (!has_read_flag(INSITU)) alc.free(alc.ctx, (void *)hdr);
    }
    return doc;

#undef return_err
}